

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution_x86_avx512::forward
          (Deconvolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  uint uVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  uint uVar9;
  undefined4 uVar10;
  int *piVar11;
  size_t sVar12;
  size_t sVar13;
  _func_int **pp_Var14;
  bool bVar15;
  byte bVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  long lVar115;
  float afVar116 [16];
  float afVar117 [16];
  float afVar118 [16];
  float afVar119 [16];
  float afVar120 [16];
  float afVar121 [16];
  float afVar122 [16];
  float afVar123 [16];
  float afVar124 [16];
  float afVar125 [16];
  float afVar126 [16];
  float afVar127 [16];
  float afVar128 [16];
  float afVar129 [16];
  float afVar130 [16];
  float afVar131 [16];
  float afVar132 [16];
  Mat *pMVar133;
  uint uVar134;
  int iVar135;
  int iVar136;
  uint uVar137;
  uint uVar138;
  uint uVar139;
  int iVar140;
  uint uVar141;
  int iVar142;
  int iVar143;
  int iVar144;
  _func_int *p_Var145;
  long lVar146;
  ulong uVar147;
  ulong uVar148;
  _func_int **pp_Var149;
  uint uVar150;
  int iVar151;
  _func_int *p_Var152;
  long lVar153;
  ulong uVar154;
  uint uVar155;
  int iVar156;
  ulong uVar157;
  int iVar158;
  ulong uVar159;
  int y_6;
  _func_int ***ppp_Var160;
  long lVar161;
  void *pvVar162;
  int y;
  ulong uVar163;
  ulong uVar164;
  void *pvVar165;
  void *pvVar166;
  int iVar167;
  long lVar168;
  long lVar169;
  int i;
  int y_1;
  int iVar170;
  uint uVar171;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  undefined1 auVar284 [64];
  undefined1 auVar285 [64];
  undefined1 auVar286 [64];
  undefined1 auVar287 [64];
  undefined1 auVar288 [64];
  undefined1 auVar289 [64];
  undefined1 auVar290 [64];
  undefined1 auVar291 [64];
  undefined1 auVar292 [64];
  undefined1 auVar293 [64];
  undefined1 auVar294 [64];
  undefined1 auVar295 [64];
  undefined1 auVar296 [64];
  undefined1 auVar297 [64];
  undefined1 auVar298 [64];
  undefined1 auVar299 [64];
  undefined1 auVar300 [64];
  undefined1 auVar301 [64];
  undefined1 auVar302 [64];
  undefined1 auVar303 [64];
  undefined1 auVar304 [64];
  undefined1 auVar305 [64];
  undefined1 auVar306 [64];
  undefined1 auVar307 [64];
  undefined1 auVar308 [64];
  undefined1 auVar309 [64];
  undefined1 auVar310 [64];
  undefined1 auVar311 [64];
  undefined1 auVar312 [64];
  undefined1 auVar313 [64];
  undefined1 auVar314 [64];
  undefined1 auVar315 [64];
  undefined1 auVar316 [64];
  undefined1 auVar317 [64];
  undefined1 auVar318 [64];
  undefined1 auVar319 [64];
  undefined1 auVar321 [16];
  float fVar320;
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  float fVar338;
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  float fVar345;
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  v4sf one;
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  __m128 pos;
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [32];
  undefined1 auVar443 [32];
  undefined1 auVar444 [32];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [32];
  undefined1 auVar461 [32];
  undefined1 auVar462 [32];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [32];
  undefined1 auVar467 [32];
  undefined1 auVar468 [32];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [32];
  undefined1 auVar493 [32];
  undefined1 auVar494 [32];
  undefined1 auVar495 [32];
  undefined1 auVar496 [32];
  undefined1 auVar497 [32];
  undefined1 auVar498 [32];
  undefined1 in_ZMM29 [64];
  undefined1 in_ZMM30 [64];
  _func_int ***local_1c0;
  _func_int ***local_168;
  Mat local_f8;
  undefined1 local_a8 [64];
  Allocator *local_68;
  long local_60;
  ulong local_58;
  int local_50;
  int local_4c;
  long local_48;
  Option *local_40;
  Mat *local_38;
  
  auVar172 = in_ZMM29._0_16_;
  iVar156 = bottom_blob->w;
  iVar8 = bottom_blob->h;
  p_Var145 = this->_vptr_Deconvolution_x86_avx512[-3];
  local_4c = (*(int *)(&this->field_0xd4 + (long)p_Var145) + -1) *
             *(int *)(&this->field_0xdc + (long)p_Var145);
  uVar159 = bottom_blob->elemsize;
  iVar151 = *(int *)(&this->field_0xe4 + (long)p_Var145);
  local_50 = (*(int *)(&this->field_0xd8 + (long)p_Var145) + -1) *
             *(int *)(&this->field_0xe0 + (long)p_Var145);
  iVar170 = bottom_blob->elempack;
  iVar167 = *(int *)(&this->field_0xe8 + (long)p_Var145);
  iVar158 = *(int *)(&this->field_0xfc + (long)p_Var145);
  iVar143 = *(int *)(&this->field_0x100 + (long)p_Var145);
  if (opt->use_packing_layout == true) {
    uVar150 = *(uint *)(&this->field_0xd0 + (long)p_Var145);
    if ((uVar150 & 0xf) == 0) {
      uVar150 = 0x10;
    }
    else if ((uVar150 & 7) == 0) {
      uVar150 = 8;
    }
    else {
      uVar150 = (uint)((uVar150 & 3) == 0) * 3 + 1;
    }
  }
  else {
    uVar150 = 1;
  }
  local_f8.cstep = 0;
  local_f8.data = (Allocator *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_f8.elempack = 0;
  local_f8.h = 0;
  p_Var152 = this->_vptr_Deconvolution_x86_avx512[-3];
  p_Var145 = (_func_int *)((long)&this->_vptr_Deconvolution_x86_avx512 + (long)p_Var152);
  lVar153 = 0x10;
  local_f8.allocator = (Allocator *)local_f8.data;
  local_f8.dims = (int)local_f8.refcount;
  local_f8.w = local_f8.refcount._4_4_;
  local_f8.d = (int)local_f8.refcount;
  local_f8.c = local_f8.elempack;
  if (((((*(int *)(&this->field_0xec + (long)p_Var152) < 1) && (*(int *)(p_Var145 + 0xf0) < 1)) &&
       (*(int *)(p_Var145 + 0xf4) < 1)) && (*(int *)(p_Var145 + 0xf8) < 1)) &&
     ((*(int *)(p_Var145 + 0x104) < 1 || (*(int *)(p_Var145 + 0x108) < 1)))) {
    if (&local_f8 != top_blob) {
      piVar11 = top_blob->refcount;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      local_f8.data = top_blob->data;
      local_f8.refcount._0_4_ = (int)top_blob->refcount;
      local_f8.refcount._4_4_ = (uint)((ulong)top_blob->refcount >> 0x20);
      local_f8.elemsize = top_blob->elemsize;
      local_f8.elempack = top_blob->elempack;
      local_f8.allocator = top_blob->allocator;
      uVar4 = top_blob->dims;
      uVar5 = top_blob->w;
      uVar6 = top_blob->h;
      uVar7 = top_blob->d;
      local_f8.c = top_blob->c;
      local_f8.cstep = top_blob->cstep;
      p_Var152 = this->_vptr_Deconvolution_x86_avx512[-3];
      local_f8.dims = uVar4;
      local_f8.w = uVar5;
      local_f8.h = uVar6;
      local_f8.d = uVar7;
    }
    p_Var145 = (_func_int *)((long)&this->_vptr_Deconvolution_x86_avx512 + (long)p_Var152);
    lVar153 = 8;
  }
  local_40 = opt;
  Mat::create(&local_f8,iVar158 + (iVar156 + -1) * iVar151 + local_4c + 1,
              iVar143 + (iVar8 + -1) * iVar167 + local_50 + 1,
              *(int *)(p_Var145 + 0xd0) / (int)uVar150,
              (uVar159 / (ulong)(long)iVar170) * (ulong)uVar150,uVar150,
              *(Allocator **)(&opt->lightmode + lVar153));
  afVar125 = _ps512_cephes_exp_p5;
  afVar124 = _ps512_cephes_exp_p4;
  afVar123 = _ps512_cephes_exp_p3;
  afVar122 = _ps512_cephes_exp_p2;
  afVar121 = _ps512_cephes_exp_p1;
  afVar120 = _ps512_cephes_exp_p0;
  afVar119 = _ps512_cephes_LOG2EF;
  afVar118 = _ps512_exp_lo;
  afVar117 = _ps512_exp_hi;
  afVar116 = _ps512_1;
  iVar156 = -100;
  if (((Allocator *)local_f8.data != (Allocator *)0x0) && (local_f8.cstep * (long)local_f8.c != 0))
  {
    pp_Var149 = this->_vptr_Deconvolution_x86_avx512;
    p_Var145 = pp_Var149[-3];
    uVar171 = *(uint *)(&this->field_0xd4 + (long)p_Var145);
    local_48 = (long)(int)uVar171;
    uVar9 = *(uint *)(&this->field_0xd8 + (long)p_Var145);
    if ((iVar170 == 0x10) && (uVar150 == 0x10)) {
      iVar156 = *(int *)(&this->field_0xdc + (long)p_Var145);
      iVar8 = *(int *)(&this->field_0xe0 + (long)p_Var145);
      iVar151 = *(int *)(&this->field_0xe4 + (long)p_Var145);
      iVar167 = *(int *)(&this->field_0xe8 + (long)p_Var145);
      uVar10 = *(undefined4 *)(&this->field_0x114 + (long)p_Var145);
      lVar153 = *(long *)(&this->field_0x1a8 + (long)p_Var145);
      auVar282 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar283 = vxorps_avx512dq(auVar282,(undefined1  [64])_ps512_cephes_log_q2);
      auVar284 = vxorps_avx512dq(auVar282,(undefined1  [64])_ps512_cephes_log_q1);
      auVar285 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      local_a8 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar282);
      uVar164 = 0;
      uVar159 = 0;
      if (0 < (int)uVar171) {
        uVar159 = (ulong)uVar171;
      }
      uVar157 = 0;
      if (0 < (int)uVar9) {
        uVar157 = (ulong)uVar9;
      }
      uVar154 = (ulong)(uint)local_f8.c;
      if (local_f8.c < 1) {
        uVar154 = uVar164;
      }
      auVar172 = vxorps_avx512vl(auVar172,auVar172);
      auVar282 = ZEXT1664(auVar172);
      in_ZMM30 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      for (; uVar164 != uVar154; uVar164 = uVar164 + 1) {
        ppp_Var160 = (_func_int ***)
                     ((long)(_func_int ***)local_f8.data +
                     local_f8.cstep * uVar164 * local_f8.elemsize);
        iVar158 = bottom_blob->w;
        iVar143 = bottom_blob->h;
        uVar147 = 0;
        uVar148 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar148 = uVar147;
        }
        uVar134 = local_f8.w;
        if (local_f8.w < 1) {
          uVar134 = 0;
        }
        uVar138 = local_f8.h;
        if (local_f8.h < 1) {
          uVar138 = 0;
        }
        while (uVar155 = (uint)uVar147, uVar155 != uVar138) {
          iVar144 = (1 - uVar171) * iVar156;
          for (uVar137 = 0; uVar137 != uVar134; uVar137 = uVar137 + 1) {
            if (lVar153 == 0) {
              auVar302 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar302 = *(undefined1 (*) [64])(lVar153 + uVar164 * 0x40);
            }
            pvVar165 = bottom_blob->data;
            lVar168 = (long)(this->weight_data_tm).data +
                      (this->weight_data_tm).cstep * uVar164 * (this->weight_data_tm).elemsize +
                      0x3c0;
            for (uVar147 = 0; uVar147 != uVar148; uVar147 = uVar147 + 1) {
              lVar169 = lVar168;
              for (uVar163 = 0; uVar163 != uVar157; uVar163 = uVar163 + 1) {
                iVar135 = (((int)uVar163 - uVar9) + 1) * iVar8 + uVar155;
                if (((-1 < iVar135) && (iVar136 = iVar135 / iVar167, iVar135 % iVar167 == 0)) &&
                   (iVar136 < iVar143)) {
                  lVar115 = (long)iVar136 * (long)bottom_blob->w * bottom_blob->elemsize +
                            bottom_blob->cstep * bottom_blob->elemsize * uVar147;
                  iVar135 = iVar144;
                  for (lVar161 = 0; uVar159 * 0x400 != lVar161; lVar161 = lVar161 + 0x400) {
                    if (((-1 < iVar135) && (iVar136 = iVar135 / iVar151, iVar135 % iVar151 == 0)) &&
                       (iVar136 < iVar158)) {
                      lVar146 = (long)(iVar136 << 4);
                      auVar286 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 + lVar146 * 4 + lVar115
                                                             )));
                      auVar287 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 4)));
                      auVar288 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 8)));
                      auVar289 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0xc)));
                      auVar290 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x10)));
                      auVar291 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x14)));
                      auVar292 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x18)));
                      auVar293 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x1c)));
                      auVar294 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x20)));
                      auVar295 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x24)));
                      auVar296 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x28)));
                      auVar297 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x2c)));
                      auVar298 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x30)));
                      auVar299 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x34)));
                      auVar300 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x38)));
                      auVar301 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x3c)));
                      auVar302 = vfmadd231ps_avx512f(auVar302,auVar286,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x3c0 + lVar161));
                      auVar302 = vfmadd231ps_avx512f(auVar302,auVar287,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x380 + lVar161));
                      auVar302 = vfmadd231ps_avx512f(auVar302,auVar288,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x340 + lVar161));
                      auVar302 = vfmadd231ps_avx512f(auVar302,auVar289,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x300 + lVar161));
                      auVar302 = vfmadd231ps_avx512f(auVar302,auVar290,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x2c0 + lVar161));
                      auVar302 = vfmadd231ps_avx512f(auVar302,auVar291,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x280 + lVar161));
                      auVar302 = vfmadd231ps_avx512f(auVar302,auVar292,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x240 + lVar161));
                      auVar302 = vfmadd231ps_avx512f(auVar302,auVar293,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x200 + lVar161));
                      auVar302 = vfmadd231ps_avx512f(auVar302,auVar294,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x1c0 + lVar161));
                      auVar302 = vfmadd231ps_avx512f(auVar302,auVar295,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x180 + lVar161));
                      auVar302 = vfmadd231ps_avx512f(auVar302,auVar296,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x140 + lVar161));
                      auVar302 = vfmadd231ps_avx512f(auVar302,auVar297,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x100 + lVar161));
                      auVar302 = vfmadd231ps_avx512f(auVar302,auVar298,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0xc0 + lVar161));
                      auVar302 = vfmadd231ps_avx512f(auVar302,auVar299,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x80 + lVar161));
                      auVar302 = vfmadd231ps_avx512f(auVar302,auVar300,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x40 + lVar161));
                      auVar302 = vfmadd231ps_avx512f(auVar302,auVar301,
                                                     *(undefined1 (*) [64])(lVar169 + lVar161));
                    }
                    iVar135 = iVar135 + iVar156;
                  }
                }
                lVar169 = lVar169 + local_48 * 0x400;
              }
              lVar168 = lVar168 + (long)(int)(uVar171 * uVar9 * 0x100) * 4;
            }
            switch(uVar10) {
            case 1:
              auVar302 = vmaxps_avx512f(auVar302,auVar282);
              break;
            case 2:
              uVar147 = vcmpps_avx512f(auVar302,auVar282,1);
              uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
              auVar295._4_4_ = uVar1;
              auVar295._0_4_ = uVar1;
              auVar295._8_4_ = uVar1;
              auVar295._12_4_ = uVar1;
              auVar295._16_4_ = uVar1;
              auVar295._20_4_ = uVar1;
              auVar295._24_4_ = uVar1;
              auVar295._28_4_ = uVar1;
              auVar295._32_4_ = uVar1;
              auVar295._36_4_ = uVar1;
              auVar295._40_4_ = uVar1;
              auVar295._44_4_ = uVar1;
              auVar295._48_4_ = uVar1;
              auVar295._52_4_ = uVar1;
              auVar295._56_4_ = uVar1;
              auVar295._60_4_ = uVar1;
              auVar286 = vmulps_avx512f(auVar302,auVar295);
              bVar15 = (bool)((byte)uVar147 & 1);
              auVar296._0_4_ = (uint)bVar15 * auVar286._0_4_ | (uint)!bVar15 * auVar302._0_4_;
              bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
              auVar296._4_4_ = (uint)bVar15 * auVar286._4_4_ | (uint)!bVar15 * auVar302._4_4_;
              bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
              auVar296._8_4_ = (uint)bVar15 * auVar286._8_4_ | (uint)!bVar15 * auVar302._8_4_;
              bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
              auVar296._12_4_ = (uint)bVar15 * auVar286._12_4_ | (uint)!bVar15 * auVar302._12_4_;
              bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
              auVar296._16_4_ = (uint)bVar15 * auVar286._16_4_ | (uint)!bVar15 * auVar302._16_4_;
              bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
              auVar296._20_4_ = (uint)bVar15 * auVar286._20_4_ | (uint)!bVar15 * auVar302._20_4_;
              bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
              auVar296._24_4_ = (uint)bVar15 * auVar286._24_4_ | (uint)!bVar15 * auVar302._24_4_;
              bVar15 = (bool)((byte)(uVar147 >> 7) & 1);
              auVar296._28_4_ = (uint)bVar15 * auVar286._28_4_ | (uint)!bVar15 * auVar302._28_4_;
              bVar15 = (bool)((byte)(uVar147 >> 8) & 1);
              auVar296._32_4_ = (uint)bVar15 * auVar286._32_4_ | (uint)!bVar15 * auVar302._32_4_;
              bVar15 = (bool)((byte)(uVar147 >> 9) & 1);
              auVar296._36_4_ = (uint)bVar15 * auVar286._36_4_ | (uint)!bVar15 * auVar302._36_4_;
              bVar15 = (bool)((byte)(uVar147 >> 10) & 1);
              auVar296._40_4_ = (uint)bVar15 * auVar286._40_4_ | (uint)!bVar15 * auVar302._40_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xb) & 1);
              auVar296._44_4_ = (uint)bVar15 * auVar286._44_4_ | (uint)!bVar15 * auVar302._44_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xc) & 1);
              auVar296._48_4_ = (uint)bVar15 * auVar286._48_4_ | (uint)!bVar15 * auVar302._48_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xd) & 1);
              auVar296._52_4_ = (uint)bVar15 * auVar286._52_4_ | (uint)!bVar15 * auVar302._52_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xe) & 1);
              auVar296._56_4_ = (uint)bVar15 * auVar286._56_4_ | (uint)!bVar15 * auVar302._56_4_;
              bVar15 = SUB81(uVar147 >> 0xf,0);
              auVar296._60_4_ = (uint)bVar15 * auVar286._60_4_ | (uint)!bVar15 * auVar302._60_4_;
              auVar302 = auVar296;
              break;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
              auVar294._4_4_ = uVar1;
              auVar294._0_4_ = uVar1;
              auVar294._8_4_ = uVar1;
              auVar294._12_4_ = uVar1;
              auVar294._16_4_ = uVar1;
              auVar294._20_4_ = uVar1;
              auVar294._24_4_ = uVar1;
              auVar294._28_4_ = uVar1;
              auVar294._32_4_ = uVar1;
              auVar294._36_4_ = uVar1;
              auVar294._40_4_ = uVar1;
              auVar294._44_4_ = uVar1;
              auVar294._48_4_ = uVar1;
              auVar294._52_4_ = uVar1;
              auVar294._56_4_ = uVar1;
              auVar294._60_4_ = uVar1;
              auVar286 = vmaxps_avx512f(auVar302,auVar294);
              uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var145))[1];
              auVar302._4_4_ = uVar1;
              auVar302._0_4_ = uVar1;
              auVar302._8_4_ = uVar1;
              auVar302._12_4_ = uVar1;
              auVar302._16_4_ = uVar1;
              auVar302._20_4_ = uVar1;
              auVar302._24_4_ = uVar1;
              auVar302._28_4_ = uVar1;
              auVar302._32_4_ = uVar1;
              auVar302._36_4_ = uVar1;
              auVar302._40_4_ = uVar1;
              auVar302._44_4_ = uVar1;
              auVar302._48_4_ = uVar1;
              auVar302._52_4_ = uVar1;
              auVar302._56_4_ = uVar1;
              auVar302._60_4_ = uVar1;
              auVar302 = vminps_avx512f(auVar286,auVar302);
              break;
            case 4:
              auVar288._8_4_ = 0x80000000;
              auVar288._0_8_ = 0x8000000080000000;
              auVar288._12_4_ = 0x80000000;
              auVar288._16_4_ = 0x80000000;
              auVar288._20_4_ = 0x80000000;
              auVar288._24_4_ = 0x80000000;
              auVar288._28_4_ = 0x80000000;
              auVar288._32_4_ = 0x80000000;
              auVar288._36_4_ = 0x80000000;
              auVar288._40_4_ = 0x80000000;
              auVar288._44_4_ = 0x80000000;
              auVar288._48_4_ = 0x80000000;
              auVar288._52_4_ = 0x80000000;
              auVar288._56_4_ = 0x80000000;
              auVar288._60_4_ = 0x80000000;
              auVar302 = vxorps_avx512dq(auVar302,auVar288);
              auVar302 = vminps_avx512f(auVar302,(undefined1  [64])afVar117);
              auVar302 = vmaxps_avx512f(auVar302,(undefined1  [64])afVar118);
              auVar286 = vfmadd213ps_avx512f((undefined1  [64])afVar119,auVar302,
                                             (undefined1  [64])afVar125);
              auVar287 = vrndscaleps_avx512f(auVar286,1);
              uVar147 = vcmpps_avx512f(auVar286,auVar287,1);
              auVar286 = vsubps_avx512f(auVar287,(undefined1  [64])afVar116);
              bVar15 = (bool)((byte)uVar147 & 1);
              auVar293._0_4_ = (uint)bVar15 * auVar286._0_4_ | (uint)!bVar15 * auVar287._0_4_;
              bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
              auVar293._4_4_ = (uint)bVar15 * auVar286._4_4_ | (uint)!bVar15 * auVar287._4_4_;
              bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
              auVar293._8_4_ = (uint)bVar15 * auVar286._8_4_ | (uint)!bVar15 * auVar287._8_4_;
              bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
              auVar293._12_4_ = (uint)bVar15 * auVar286._12_4_ | (uint)!bVar15 * auVar287._12_4_;
              bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
              auVar293._16_4_ = (uint)bVar15 * auVar286._16_4_ | (uint)!bVar15 * auVar287._16_4_;
              bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
              auVar293._20_4_ = (uint)bVar15 * auVar286._20_4_ | (uint)!bVar15 * auVar287._20_4_;
              bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
              auVar293._24_4_ = (uint)bVar15 * auVar286._24_4_ | (uint)!bVar15 * auVar287._24_4_;
              bVar15 = (bool)((byte)(uVar147 >> 7) & 1);
              auVar293._28_4_ = (uint)bVar15 * auVar286._28_4_ | (uint)!bVar15 * auVar287._28_4_;
              bVar15 = (bool)((byte)(uVar147 >> 8) & 1);
              auVar293._32_4_ = (uint)bVar15 * auVar286._32_4_ | (uint)!bVar15 * auVar287._32_4_;
              bVar15 = (bool)((byte)(uVar147 >> 9) & 1);
              auVar293._36_4_ = (uint)bVar15 * auVar286._36_4_ | (uint)!bVar15 * auVar287._36_4_;
              bVar15 = (bool)((byte)(uVar147 >> 10) & 1);
              auVar293._40_4_ = (uint)bVar15 * auVar286._40_4_ | (uint)!bVar15 * auVar287._40_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xb) & 1);
              auVar293._44_4_ = (uint)bVar15 * auVar286._44_4_ | (uint)!bVar15 * auVar287._44_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xc) & 1);
              auVar293._48_4_ = (uint)bVar15 * auVar286._48_4_ | (uint)!bVar15 * auVar287._48_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xd) & 1);
              auVar293._52_4_ = (uint)bVar15 * auVar286._52_4_ | (uint)!bVar15 * auVar287._52_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xe) & 1);
              auVar293._56_4_ = (uint)bVar15 * auVar286._56_4_ | (uint)!bVar15 * auVar287._56_4_;
              bVar15 = SUB81(uVar147 >> 0xf,0);
              auVar293._60_4_ = (uint)bVar15 * auVar286._60_4_ | (uint)!bVar15 * auVar287._60_4_;
              auVar302 = vfmadd231ps_avx512f(auVar302,auVar293,auVar283);
              auVar302 = vfmadd231ps_avx512f(auVar302,auVar293,auVar284);
              auVar286 = vmulps_avx512f(auVar302,auVar302);
              auVar287 = vfmadd213ps_avx512f(auVar302,(undefined1  [64])afVar120,
                                             (undefined1  [64])afVar121);
              auVar287 = vfmadd213ps_avx512f(auVar287,auVar302,(undefined1  [64])afVar122);
              auVar287 = vfmadd213ps_avx512f(auVar287,auVar302,(undefined1  [64])afVar123);
              auVar287 = vfmadd213ps_avx512f(auVar287,auVar302,(undefined1  [64])afVar124);
              auVar287 = vfmadd213ps_avx512f(auVar287,auVar302,(undefined1  [64])afVar125);
              auVar302 = vfmadd213ps_avx512f(auVar287,auVar286,auVar302);
              auVar302 = vaddps_avx512f(auVar302,(undefined1  [64])afVar116);
              auVar286 = vcvttps2dq_avx512f(auVar293);
              auVar286 = vpaddd_avx512f(auVar286,auVar285);
              auVar286 = vpslld_avx512f(auVar286,0x17);
              auVar302 = vfmadd213ps_avx512f(auVar286,auVar302,in_ZMM30);
              auVar286 = vrcp14ps_avx512f(auVar302);
              auVar302 = vfmsub213ps_avx512f(auVar302,auVar286,in_ZMM30);
              auVar302 = vfnmadd132ps_avx512vl(auVar302,auVar286,auVar286);
              break;
            case 5:
              auVar286 = vminps_avx512f(auVar302,(undefined1  [64])afVar117);
              auVar286 = vmaxps_avx512f(auVar286,(undefined1  [64])afVar118);
              auVar287 = vfmadd213ps_avx512f((undefined1  [64])afVar119,auVar286,
                                             (undefined1  [64])afVar125);
              auVar288 = vrndscaleps_avx512f(auVar287,1);
              uVar147 = vcmpps_avx512f(auVar287,auVar288,1);
              auVar287 = vsubps_avx512f(auVar288,(undefined1  [64])afVar116);
              bVar15 = (bool)((byte)uVar147 & 1);
              auVar289._0_4_ = (uint)bVar15 * auVar287._0_4_ | (uint)!bVar15 * auVar288._0_4_;
              bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
              auVar289._4_4_ = (uint)bVar15 * auVar287._4_4_ | (uint)!bVar15 * auVar288._4_4_;
              bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
              auVar289._8_4_ = (uint)bVar15 * auVar287._8_4_ | (uint)!bVar15 * auVar288._8_4_;
              bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
              auVar289._12_4_ = (uint)bVar15 * auVar287._12_4_ | (uint)!bVar15 * auVar288._12_4_;
              bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
              auVar289._16_4_ = (uint)bVar15 * auVar287._16_4_ | (uint)!bVar15 * auVar288._16_4_;
              bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
              auVar289._20_4_ = (uint)bVar15 * auVar287._20_4_ | (uint)!bVar15 * auVar288._20_4_;
              bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
              auVar289._24_4_ = (uint)bVar15 * auVar287._24_4_ | (uint)!bVar15 * auVar288._24_4_;
              bVar15 = (bool)((byte)(uVar147 >> 7) & 1);
              auVar289._28_4_ = (uint)bVar15 * auVar287._28_4_ | (uint)!bVar15 * auVar288._28_4_;
              bVar15 = (bool)((byte)(uVar147 >> 8) & 1);
              auVar289._32_4_ = (uint)bVar15 * auVar287._32_4_ | (uint)!bVar15 * auVar288._32_4_;
              bVar15 = (bool)((byte)(uVar147 >> 9) & 1);
              auVar289._36_4_ = (uint)bVar15 * auVar287._36_4_ | (uint)!bVar15 * auVar288._36_4_;
              bVar15 = (bool)((byte)(uVar147 >> 10) & 1);
              auVar289._40_4_ = (uint)bVar15 * auVar287._40_4_ | (uint)!bVar15 * auVar288._40_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xb) & 1);
              auVar289._44_4_ = (uint)bVar15 * auVar287._44_4_ | (uint)!bVar15 * auVar288._44_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xc) & 1);
              auVar289._48_4_ = (uint)bVar15 * auVar287._48_4_ | (uint)!bVar15 * auVar288._48_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xd) & 1);
              auVar289._52_4_ = (uint)bVar15 * auVar287._52_4_ | (uint)!bVar15 * auVar288._52_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xe) & 1);
              auVar289._56_4_ = (uint)bVar15 * auVar287._56_4_ | (uint)!bVar15 * auVar288._56_4_;
              bVar15 = SUB81(uVar147 >> 0xf,0);
              auVar289._60_4_ = (uint)bVar15 * auVar287._60_4_ | (uint)!bVar15 * auVar288._60_4_;
              auVar286 = vfmadd231ps_avx512f(auVar286,auVar289,auVar283);
              auVar286 = vfmadd231ps_avx512f(auVar286,auVar289,auVar284);
              auVar287 = vmulps_avx512f(auVar286,auVar286);
              auVar288 = vfmadd213ps_avx512f(auVar286,(undefined1  [64])afVar120,
                                             (undefined1  [64])afVar121);
              auVar288 = vfmadd213ps_avx512f(auVar288,auVar286,(undefined1  [64])afVar122);
              auVar288 = vfmadd213ps_avx512f(auVar288,auVar286,(undefined1  [64])afVar123);
              auVar288 = vfmadd213ps_avx512f(auVar288,auVar286,(undefined1  [64])afVar124);
              auVar288 = vfmadd213ps_avx512f(auVar288,auVar286,(undefined1  [64])afVar125);
              auVar286 = vfmadd213ps_avx512f(auVar288,auVar287,auVar286);
              auVar286 = vaddps_avx512f(auVar286,(undefined1  [64])afVar116);
              auVar287 = vcvttps2dq_avx512f(auVar289);
              auVar287 = vpaddd_avx512f(auVar287,auVar285);
              auVar287 = vpslld_avx512f(auVar287,0x17);
              auVar286 = vfmadd213ps_avx512f(auVar287,auVar286,in_ZMM30);
              auVar287 = vmaxps_avx512f(auVar286,(undefined1  [64])_ps512_min_norm_pos);
              auVar288 = vpsrld_avx512f(auVar287,0x17);
              auVar287 = vpternlogd_avx512f(auVar287,(undefined1  [64])afVar125,
                                            (undefined1  [64])_ps512_inv_mant_mask,0xec);
              uVar147 = vcmpps_avx512f(auVar287,(undefined1  [64])_ps512_cephes_SQRTHF,1);
              auVar289 = vsubps_avx512f(auVar287,(undefined1  [64])afVar116);
              auVar290 = vaddps_avx512f(auVar289,auVar287);
              bVar15 = (bool)((byte)uVar147 & 1);
              auVar287._0_4_ = (uint)bVar15 * auVar290._0_4_ | (uint)!bVar15 * auVar289._0_4_;
              bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
              auVar287._4_4_ = (uint)bVar15 * auVar290._4_4_ | (uint)!bVar15 * auVar289._4_4_;
              bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
              auVar287._8_4_ = (uint)bVar15 * auVar290._8_4_ | (uint)!bVar15 * auVar289._8_4_;
              bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
              auVar287._12_4_ = (uint)bVar15 * auVar290._12_4_ | (uint)!bVar15 * auVar289._12_4_;
              bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
              auVar287._16_4_ = (uint)bVar15 * auVar290._16_4_ | (uint)!bVar15 * auVar289._16_4_;
              bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
              auVar287._20_4_ = (uint)bVar15 * auVar290._20_4_ | (uint)!bVar15 * auVar289._20_4_;
              bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
              auVar287._24_4_ = (uint)bVar15 * auVar290._24_4_ | (uint)!bVar15 * auVar289._24_4_;
              bVar15 = (bool)((byte)(uVar147 >> 7) & 1);
              auVar287._28_4_ = (uint)bVar15 * auVar290._28_4_ | (uint)!bVar15 * auVar289._28_4_;
              bVar16 = (byte)(uVar147 >> 8);
              bVar15 = (bool)(bVar16 & 1);
              auVar287._32_4_ = (uint)bVar15 * auVar290._32_4_ | (uint)!bVar15 * auVar289._32_4_;
              bVar15 = (bool)((byte)(uVar147 >> 9) & 1);
              auVar287._36_4_ = (uint)bVar15 * auVar290._36_4_ | (uint)!bVar15 * auVar289._36_4_;
              bVar15 = (bool)((byte)(uVar147 >> 10) & 1);
              auVar287._40_4_ = (uint)bVar15 * auVar290._40_4_ | (uint)!bVar15 * auVar289._40_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xb) & 1);
              auVar287._44_4_ = (uint)bVar15 * auVar290._44_4_ | (uint)!bVar15 * auVar289._44_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xc) & 1);
              auVar287._48_4_ = (uint)bVar15 * auVar290._48_4_ | (uint)!bVar15 * auVar289._48_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xd) & 1);
              auVar287._52_4_ = (uint)bVar15 * auVar290._52_4_ | (uint)!bVar15 * auVar289._52_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xe) & 1);
              auVar287._56_4_ = (uint)bVar15 * auVar290._56_4_ | (uint)!bVar15 * auVar289._56_4_;
              bVar15 = SUB81(uVar147 >> 0xf,0);
              auVar287._60_4_ = (uint)bVar15 * auVar290._60_4_ | (uint)!bVar15 * auVar289._60_4_;
              auVar289 = vmulps_avx512f(auVar287,auVar287);
              auVar290 = vfmadd132ps_avx512f(auVar287,(undefined1  [64])_ps512_cephes_log_p1,
                                             (undefined1  [64])_ps512_cephes_log_p0);
              auVar290 = vfmadd213ps_avx512f(auVar290,auVar287,
                                             (undefined1  [64])_ps512_cephes_log_p2);
              auVar290 = vfmadd213ps_avx512f(auVar290,auVar287,
                                             (undefined1  [64])_ps512_cephes_log_p3);
              auVar290 = vfmadd213ps_avx512f(auVar290,auVar287,
                                             (undefined1  [64])_ps512_cephes_log_p4);
              auVar290 = vfmadd213ps_avx512f(auVar290,auVar287,
                                             (undefined1  [64])_ps512_cephes_log_p5);
              auVar290 = vfmadd213ps_avx512f(auVar290,auVar287,
                                             (undefined1  [64])_ps512_cephes_log_p6);
              auVar290 = vfmadd213ps_avx512f(auVar290,auVar287,
                                             (undefined1  [64])_ps512_cephes_log_p7);
              auVar290 = vfmadd213ps_avx512f(auVar290,auVar287,
                                             (undefined1  [64])_ps512_cephes_log_p8);
              auVar291 = vmulps_avx512f(auVar289,auVar287);
              auVar287 = vfmadd213ps_avx512f(auVar291,auVar290,auVar287);
              uVar163 = vcmpps_avx512f(auVar286,auVar282,2);
              auVar286 = vpsubd_avx512f(auVar288,auVar285);
              auVar286 = vcvtdq2ps_avx512f(auVar286);
              auVar288 = vaddps_avx512f(auVar286,(undefined1  [64])afVar116);
              bVar15 = (bool)((byte)uVar147 & 1);
              auVar290._0_4_ = (uint)bVar15 * auVar286._0_4_ | (uint)!bVar15 * auVar288._0_4_;
              bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
              auVar290._4_4_ = (uint)bVar15 * auVar286._4_4_ | (uint)!bVar15 * auVar288._4_4_;
              bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
              auVar290._8_4_ = (uint)bVar15 * auVar286._8_4_ | (uint)!bVar15 * auVar288._8_4_;
              bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
              auVar290._12_4_ = (uint)bVar15 * auVar286._12_4_ | (uint)!bVar15 * auVar288._12_4_;
              bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
              auVar290._16_4_ = (uint)bVar15 * auVar286._16_4_ | (uint)!bVar15 * auVar288._16_4_;
              bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
              auVar290._20_4_ = (uint)bVar15 * auVar286._20_4_ | (uint)!bVar15 * auVar288._20_4_;
              bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
              auVar290._24_4_ = (uint)bVar15 * auVar286._24_4_ | (uint)!bVar15 * auVar288._24_4_;
              bVar15 = (bool)((byte)(uVar147 >> 7) & 1);
              auVar290._28_4_ = (uint)bVar15 * auVar286._28_4_ | (uint)!bVar15 * auVar288._28_4_;
              bVar15 = (bool)(bVar16 & 1);
              auVar290._32_4_ = (uint)bVar15 * auVar286._32_4_ | (uint)!bVar15 * auVar288._32_4_;
              bVar15 = (bool)((byte)(uVar147 >> 9) & 1);
              auVar290._36_4_ = (uint)bVar15 * auVar286._36_4_ | (uint)!bVar15 * auVar288._36_4_;
              bVar15 = (bool)((byte)(uVar147 >> 10) & 1);
              auVar290._40_4_ = (uint)bVar15 * auVar286._40_4_ | (uint)!bVar15 * auVar288._40_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xb) & 1);
              auVar290._44_4_ = (uint)bVar15 * auVar286._44_4_ | (uint)!bVar15 * auVar288._44_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xc) & 1);
              auVar290._48_4_ = (uint)bVar15 * auVar286._48_4_ | (uint)!bVar15 * auVar288._48_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xd) & 1);
              auVar290._52_4_ = (uint)bVar15 * auVar286._52_4_ | (uint)!bVar15 * auVar288._52_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xe) & 1);
              auVar290._56_4_ = (uint)bVar15 * auVar286._56_4_ | (uint)!bVar15 * auVar288._56_4_;
              bVar15 = SUB81(uVar147 >> 0xf,0);
              auVar290._60_4_ = (uint)bVar15 * auVar286._60_4_ | (uint)!bVar15 * auVar288._60_4_;
              auVar286 = vfmadd231ps_avx512f(auVar287,auVar290,
                                             (undefined1  [64])_ps512_cephes_log_q1);
              auVar286 = vfmadd231ps_avx512f(auVar286,auVar289,local_a8);
              auVar286 = vfmadd231ps_avx512f(auVar286,auVar290,
                                             (undefined1  [64])_ps512_cephes_log_q2);
              auVar287 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
              auVar286 = vmulps_avx512f(auVar286,auVar287);
              auVar288 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
              bVar15 = (bool)((byte)uVar163 & 1);
              auVar291._0_4_ = (uint)bVar15 * auVar288._0_4_ | (uint)!bVar15 * auVar286._0_4_;
              bVar15 = (bool)((byte)(uVar163 >> 1) & 1);
              auVar291._4_4_ = (uint)bVar15 * auVar288._4_4_ | (uint)!bVar15 * auVar286._4_4_;
              bVar15 = (bool)((byte)(uVar163 >> 2) & 1);
              auVar291._8_4_ = (uint)bVar15 * auVar288._8_4_ | (uint)!bVar15 * auVar286._8_4_;
              bVar15 = (bool)((byte)(uVar163 >> 3) & 1);
              auVar291._12_4_ = (uint)bVar15 * auVar288._12_4_ | (uint)!bVar15 * auVar286._12_4_;
              bVar15 = (bool)((byte)(uVar163 >> 4) & 1);
              auVar291._16_4_ = (uint)bVar15 * auVar288._16_4_ | (uint)!bVar15 * auVar286._16_4_;
              bVar15 = (bool)((byte)(uVar163 >> 5) & 1);
              auVar291._20_4_ = (uint)bVar15 * auVar288._20_4_ | (uint)!bVar15 * auVar286._20_4_;
              bVar15 = (bool)((byte)(uVar163 >> 6) & 1);
              auVar291._24_4_ = (uint)bVar15 * auVar288._24_4_ | (uint)!bVar15 * auVar286._24_4_;
              bVar15 = (bool)((byte)(uVar163 >> 7) & 1);
              auVar291._28_4_ = (uint)bVar15 * auVar288._28_4_ | (uint)!bVar15 * auVar286._28_4_;
              bVar15 = (bool)((byte)(uVar163 >> 8) & 1);
              auVar291._32_4_ = (uint)bVar15 * auVar288._32_4_ | (uint)!bVar15 * auVar286._32_4_;
              bVar15 = (bool)((byte)(uVar163 >> 9) & 1);
              auVar291._36_4_ = (uint)bVar15 * auVar288._36_4_ | (uint)!bVar15 * auVar286._36_4_;
              bVar15 = (bool)((byte)(uVar163 >> 10) & 1);
              auVar291._40_4_ = (uint)bVar15 * auVar288._40_4_ | (uint)!bVar15 * auVar286._40_4_;
              bVar15 = (bool)((byte)(uVar163 >> 0xb) & 1);
              auVar291._44_4_ = (uint)bVar15 * auVar288._44_4_ | (uint)!bVar15 * auVar286._44_4_;
              bVar15 = (bool)((byte)(uVar163 >> 0xc) & 1);
              auVar291._48_4_ = (uint)bVar15 * auVar288._48_4_ | (uint)!bVar15 * auVar286._48_4_;
              bVar15 = (bool)((byte)(uVar163 >> 0xd) & 1);
              auVar291._52_4_ = (uint)bVar15 * auVar288._52_4_ | (uint)!bVar15 * auVar286._52_4_;
              bVar15 = (bool)((byte)(uVar163 >> 0xe) & 1);
              auVar291._56_4_ = (uint)bVar15 * auVar288._56_4_ | (uint)!bVar15 * auVar286._56_4_;
              bVar15 = SUB81(uVar163 >> 0xf,0);
              auVar291._60_4_ = (uint)bVar15 * auVar288._60_4_ | (uint)!bVar15 * auVar286._60_4_;
              auVar286 = vminps_avx512f(auVar291,(undefined1  [64])afVar117);
              auVar286 = vmaxps_avx512f(auVar286,(undefined1  [64])afVar118);
              auVar288 = vfmadd213ps_avx512f((undefined1  [64])afVar119,auVar286,
                                             (undefined1  [64])afVar125);
              auVar289 = vrndscaleps_avx512f(auVar288,1);
              uVar147 = vcmpps_avx512f(auVar288,auVar289,1);
              auVar288 = vsubps_avx512f(auVar289,(undefined1  [64])afVar116);
              bVar15 = (bool)((byte)uVar147 & 1);
              auVar292._0_4_ = (uint)bVar15 * auVar288._0_4_ | (uint)!bVar15 * auVar289._0_4_;
              bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
              auVar292._4_4_ = (uint)bVar15 * auVar288._4_4_ | (uint)!bVar15 * auVar289._4_4_;
              bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
              auVar292._8_4_ = (uint)bVar15 * auVar288._8_4_ | (uint)!bVar15 * auVar289._8_4_;
              bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
              auVar292._12_4_ = (uint)bVar15 * auVar288._12_4_ | (uint)!bVar15 * auVar289._12_4_;
              bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
              auVar292._16_4_ = (uint)bVar15 * auVar288._16_4_ | (uint)!bVar15 * auVar289._16_4_;
              bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
              auVar292._20_4_ = (uint)bVar15 * auVar288._20_4_ | (uint)!bVar15 * auVar289._20_4_;
              bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
              auVar292._24_4_ = (uint)bVar15 * auVar288._24_4_ | (uint)!bVar15 * auVar289._24_4_;
              bVar15 = (bool)((byte)(uVar147 >> 7) & 1);
              auVar292._28_4_ = (uint)bVar15 * auVar288._28_4_ | (uint)!bVar15 * auVar289._28_4_;
              bVar15 = (bool)((byte)(uVar147 >> 8) & 1);
              auVar292._32_4_ = (uint)bVar15 * auVar288._32_4_ | (uint)!bVar15 * auVar289._32_4_;
              bVar15 = (bool)((byte)(uVar147 >> 9) & 1);
              auVar292._36_4_ = (uint)bVar15 * auVar288._36_4_ | (uint)!bVar15 * auVar289._36_4_;
              bVar15 = (bool)((byte)(uVar147 >> 10) & 1);
              auVar292._40_4_ = (uint)bVar15 * auVar288._40_4_ | (uint)!bVar15 * auVar289._40_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xb) & 1);
              auVar292._44_4_ = (uint)bVar15 * auVar288._44_4_ | (uint)!bVar15 * auVar289._44_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xc) & 1);
              auVar292._48_4_ = (uint)bVar15 * auVar288._48_4_ | (uint)!bVar15 * auVar289._48_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xd) & 1);
              auVar292._52_4_ = (uint)bVar15 * auVar288._52_4_ | (uint)!bVar15 * auVar289._52_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xe) & 1);
              auVar292._56_4_ = (uint)bVar15 * auVar288._56_4_ | (uint)!bVar15 * auVar289._56_4_;
              bVar15 = SUB81(uVar147 >> 0xf,0);
              auVar292._60_4_ = (uint)bVar15 * auVar288._60_4_ | (uint)!bVar15 * auVar289._60_4_;
              auVar286 = vfmadd231ps_avx512f(auVar286,auVar292,auVar283);
              auVar286 = vfmadd231ps_avx512f(auVar286,auVar292,auVar284);
              auVar288 = vmulps_avx512f(auVar286,auVar286);
              auVar289 = vfmadd213ps_avx512f(auVar286,(undefined1  [64])afVar120,
                                             (undefined1  [64])afVar121);
              auVar289 = vfmadd213ps_avx512f(auVar289,auVar286,(undefined1  [64])afVar122);
              auVar289 = vfmadd213ps_avx512f(auVar289,auVar286,(undefined1  [64])afVar123);
              auVar289 = vfmadd213ps_avx512f(auVar289,auVar286,(undefined1  [64])afVar124);
              auVar289 = vfmadd213ps_avx512f(auVar289,auVar286,(undefined1  [64])afVar125);
              auVar286 = vfmadd213ps_avx512f(auVar289,auVar288,auVar286);
              auVar286 = vaddps_avx512f(auVar286,(undefined1  [64])afVar116);
              auVar288 = vcvttps2dq_avx512f(auVar292);
              auVar288 = vpaddd_avx512f(auVar288,auVar285);
              auVar288 = vpslld_avx512f(auVar288,0x17);
              auVar286 = vfmadd213ps_avx512f(auVar288,auVar286,in_ZMM30);
              auVar288 = vrcp14ps_avx512f(auVar286);
              auVar286 = vfmsub213ps_avx512f(auVar286,auVar288,in_ZMM30);
              auVar286 = vfnmadd132ps_avx512vl(auVar286,auVar288,auVar288);
              auVar286 = vfnmsub213ps_avx512f(auVar286,auVar287,in_ZMM30);
              auVar302 = vmulps_avx512f(auVar286,auVar302);
              break;
            case 6:
              auVar287 = vbroadcastss_avx512f
                                   (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var145)));
              uVar139 = (*(uint **)(&this->field_0x118 + (long)p_Var145))[1];
              auVar286._4_4_ = uVar139;
              auVar286._0_4_ = uVar139;
              auVar286._8_4_ = uVar139;
              auVar286._12_4_ = uVar139;
              auVar286._16_4_ = uVar139;
              auVar286._20_4_ = uVar139;
              auVar286._24_4_ = uVar139;
              auVar286._28_4_ = uVar139;
              auVar286._32_4_ = uVar139;
              auVar286._36_4_ = uVar139;
              auVar286._40_4_ = uVar139;
              auVar286._44_4_ = uVar139;
              auVar286._48_4_ = uVar139;
              auVar286._52_4_ = uVar139;
              auVar286._56_4_ = uVar139;
              auVar286._60_4_ = uVar139;
              auVar286 = vfmadd213ps_avx512f(auVar287,auVar302,auVar286);
              auVar286 = vmaxps_avx512f(auVar286,auVar282);
              auVar286 = vminps_avx512f(auVar286,in_ZMM30);
              auVar302 = vmulps_avx512f(auVar286,auVar302);
            }
            *(undefined1 (*) [64])ppp_Var160 = auVar302;
            ppp_Var160 = ppp_Var160 + 8;
            iVar144 = iVar144 + 1;
          }
          uVar147 = (ulong)(uVar155 + 1);
        }
      }
    }
    afVar130 = _ps512_cephes_log_p8;
    afVar129 = _ps512_cephes_log_p7;
    afVar128 = _ps512_cephes_log_p6;
    afVar127 = _ps512_cephes_log_p5;
    afVar126 = _ps512_cephes_log_p4;
    afVar125 = _ps512_cephes_exp_p5;
    afVar124 = _ps512_cephes_exp_p4;
    afVar123 = _ps512_cephes_exp_p3;
    afVar122 = _ps512_cephes_exp_p2;
    afVar121 = _ps512_cephes_exp_p1;
    afVar120 = _ps512_cephes_exp_p0;
    afVar119 = _ps512_cephes_LOG2EF;
    afVar118 = _ps512_exp_lo;
    afVar117 = _ps512_exp_hi;
    afVar116 = _ps512_1;
    if ((iVar170 == 8) && (uVar150 == 0x10)) {
      p_Var145 = pp_Var149[-3];
      uVar171 = *(uint *)(&this->field_0xd4 + (long)p_Var145);
      uVar134 = *(uint *)(&this->field_0xd8 + (long)p_Var145);
      iVar156 = *(int *)(&this->field_0xdc + (long)p_Var145);
      iVar8 = *(int *)(&this->field_0xe0 + (long)p_Var145);
      iVar151 = *(int *)(&this->field_0xe4 + (long)p_Var145);
      iVar167 = *(int *)(&this->field_0xe8 + (long)p_Var145);
      uVar10 = *(undefined4 *)(&this->field_0x114 + (long)p_Var145);
      local_a8._0_8_ = p_Var145;
      lVar153 = *(long *)(&this->field_0x1a8 + (long)p_Var145);
      auVar282 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar283 = vxorps_avx512dq(auVar282,(undefined1  [64])_ps512_cephes_log_q2);
      auVar284 = vxorps_avx512dq(auVar282,(undefined1  [64])_ps512_cephes_log_q1);
      auVar285 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar302 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar282);
      uVar159 = 0;
      uVar164 = 0;
      if (0 < (int)uVar171) {
        uVar164 = (ulong)uVar171;
      }
      uVar157 = 0;
      if (0 < (int)uVar134) {
        uVar157 = (ulong)uVar134;
      }
      uVar154 = (ulong)(uint)local_f8.c;
      if (local_f8.c < 1) {
        uVar154 = uVar159;
      }
      auVar286 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar172 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
      in_ZMM30 = ZEXT1664(auVar172);
      auVar287 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      for (; uVar159 != uVar154; uVar159 = uVar159 + 1) {
        local_1c0 = (_func_int ***)
                    ((long)(_func_int ***)local_f8.data +
                    local_f8.cstep * uVar159 * local_f8.elemsize);
        iVar158 = bottom_blob->w;
        iVar143 = bottom_blob->h;
        uVar147 = 0;
        uVar148 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar148 = uVar147;
        }
        uVar138 = local_f8.w;
        if (local_f8.w < 1) {
          uVar138 = 0;
        }
        uVar155 = local_f8.h;
        if (local_f8.h < 1) {
          uVar155 = 0;
        }
        while (uVar137 = (uint)uVar147, uVar137 != uVar155) {
          iVar144 = (1 - uVar171) * iVar156;
          for (uVar139 = 0; uVar139 != uVar138; uVar139 = uVar139 + 1) {
            if (lVar153 == 0) {
              auVar288 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar288 = *(undefined1 (*) [64])(lVar153 + uVar159 * 0x40);
            }
            pvVar165 = bottom_blob->data;
            lVar168 = (long)(this->weight_data_tm).data +
                      (this->weight_data_tm).cstep * uVar159 * (this->weight_data_tm).elemsize +
                      0x1c0;
            for (uVar147 = 0; uVar147 != uVar148; uVar147 = uVar147 + 1) {
              lVar169 = lVar168;
              for (uVar163 = 0; uVar163 != uVar157; uVar163 = uVar163 + 1) {
                iVar135 = (((int)uVar163 - uVar134) + 1) * iVar8 + uVar137;
                if (((-1 < iVar135) && (iVar136 = iVar135 / iVar167, iVar135 % iVar167 == 0)) &&
                   (iVar136 < iVar143)) {
                  lVar115 = (long)iVar136 * (long)bottom_blob->w * bottom_blob->elemsize +
                            bottom_blob->cstep * bottom_blob->elemsize * uVar147;
                  iVar135 = iVar144;
                  for (lVar161 = 0; uVar164 * 0x200 != lVar161; lVar161 = lVar161 + 0x200) {
                    if (((-1 < iVar135) && (iVar136 = iVar135 / iVar151, iVar135 % iVar151 == 0)) &&
                       (iVar136 < iVar158)) {
                      lVar146 = (long)(iVar136 << 3);
                      auVar289 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 + lVar146 * 4 + lVar115
                                                             )));
                      auVar290 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 4)));
                      auVar291 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 8)));
                      auVar292 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0xc)));
                      auVar293 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x10)));
                      auVar294 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x14)));
                      auVar295 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x18)));
                      auVar296 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x1c)));
                      auVar288 = vfmadd231ps_avx512f(auVar288,auVar289,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x1c0 + lVar161));
                      auVar288 = vfmadd231ps_avx512f(auVar288,auVar290,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x180 + lVar161));
                      auVar288 = vfmadd231ps_avx512f(auVar288,auVar291,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x140 + lVar161));
                      auVar288 = vfmadd231ps_avx512f(auVar288,auVar292,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x100 + lVar161));
                      auVar288 = vfmadd231ps_avx512f(auVar288,auVar293,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0xc0 + lVar161));
                      auVar288 = vfmadd231ps_avx512f(auVar288,auVar294,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x80 + lVar161));
                      auVar288 = vfmadd231ps_avx512f(auVar288,auVar295,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x40 + lVar161));
                      auVar288 = vfmadd231ps_avx512f(auVar288,auVar296,
                                                     *(undefined1 (*) [64])(lVar169 + lVar161));
                    }
                    iVar135 = iVar135 + iVar156;
                  }
                }
                lVar169 = lVar169 + (long)(int)uVar171 * 0x200;
              }
              lVar168 = lVar168 + (long)(int)(uVar171 * uVar134 * 0x80) * 4;
            }
            auVar297 = auVar288;
            switch(uVar10) {
            case 1:
              auVar297 = vmaxps_avx512f(auVar288,in_ZMM30);
              break;
            case 2:
              uVar147 = vcmpps_avx512f(auVar288,in_ZMM30,1);
              uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
              auVar102._4_4_ = uVar1;
              auVar102._0_4_ = uVar1;
              auVar102._8_4_ = uVar1;
              auVar102._12_4_ = uVar1;
              auVar102._16_4_ = uVar1;
              auVar102._20_4_ = uVar1;
              auVar102._24_4_ = uVar1;
              auVar102._28_4_ = uVar1;
              auVar102._32_4_ = uVar1;
              auVar102._36_4_ = uVar1;
              auVar102._40_4_ = uVar1;
              auVar102._44_4_ = uVar1;
              auVar102._48_4_ = uVar1;
              auVar102._52_4_ = uVar1;
              auVar102._56_4_ = uVar1;
              auVar102._60_4_ = uVar1;
              auVar289 = vmulps_avx512f(auVar288,auVar102);
              bVar15 = (bool)((byte)uVar147 & 1);
              auVar297._0_4_ = (uint)bVar15 * auVar289._0_4_ | (uint)!bVar15 * auVar288._0_4_;
              bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
              auVar297._4_4_ = (uint)bVar15 * auVar289._4_4_ | (uint)!bVar15 * auVar288._4_4_;
              bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
              auVar297._8_4_ = (uint)bVar15 * auVar289._8_4_ | (uint)!bVar15 * auVar288._8_4_;
              bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
              auVar297._12_4_ = (uint)bVar15 * auVar289._12_4_ | (uint)!bVar15 * auVar288._12_4_;
              bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
              auVar297._16_4_ = (uint)bVar15 * auVar289._16_4_ | (uint)!bVar15 * auVar288._16_4_;
              bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
              auVar297._20_4_ = (uint)bVar15 * auVar289._20_4_ | (uint)!bVar15 * auVar288._20_4_;
              bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
              auVar297._24_4_ = (uint)bVar15 * auVar289._24_4_ | (uint)!bVar15 * auVar288._24_4_;
              bVar15 = (bool)((byte)(uVar147 >> 7) & 1);
              auVar297._28_4_ = (uint)bVar15 * auVar289._28_4_ | (uint)!bVar15 * auVar288._28_4_;
              bVar15 = (bool)((byte)(uVar147 >> 8) & 1);
              auVar297._32_4_ = (uint)bVar15 * auVar289._32_4_ | (uint)!bVar15 * auVar288._32_4_;
              bVar15 = (bool)((byte)(uVar147 >> 9) & 1);
              auVar297._36_4_ = (uint)bVar15 * auVar289._36_4_ | (uint)!bVar15 * auVar288._36_4_;
              bVar15 = (bool)((byte)(uVar147 >> 10) & 1);
              auVar297._40_4_ = (uint)bVar15 * auVar289._40_4_ | (uint)!bVar15 * auVar288._40_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xb) & 1);
              auVar297._44_4_ = (uint)bVar15 * auVar289._44_4_ | (uint)!bVar15 * auVar288._44_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xc) & 1);
              auVar297._48_4_ = (uint)bVar15 * auVar289._48_4_ | (uint)!bVar15 * auVar288._48_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xd) & 1);
              auVar297._52_4_ = (uint)bVar15 * auVar289._52_4_ | (uint)!bVar15 * auVar288._52_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xe) & 1);
              auVar297._56_4_ = (uint)bVar15 * auVar289._56_4_ | (uint)!bVar15 * auVar288._56_4_;
              bVar15 = SUB81(uVar147 >> 0xf,0);
              auVar297._60_4_ = (uint)bVar15 * auVar289._60_4_ | (uint)!bVar15 * auVar288._60_4_;
              break;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
              auVar100._4_4_ = uVar1;
              auVar100._0_4_ = uVar1;
              auVar100._8_4_ = uVar1;
              auVar100._12_4_ = uVar1;
              auVar100._16_4_ = uVar1;
              auVar100._20_4_ = uVar1;
              auVar100._24_4_ = uVar1;
              auVar100._28_4_ = uVar1;
              auVar100._32_4_ = uVar1;
              auVar100._36_4_ = uVar1;
              auVar100._40_4_ = uVar1;
              auVar100._44_4_ = uVar1;
              auVar100._48_4_ = uVar1;
              auVar100._52_4_ = uVar1;
              auVar100._56_4_ = uVar1;
              auVar100._60_4_ = uVar1;
              auVar288 = vmaxps_avx512f(auVar288,auVar100);
              uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var145))[1];
              auVar101._4_4_ = uVar1;
              auVar101._0_4_ = uVar1;
              auVar101._8_4_ = uVar1;
              auVar101._12_4_ = uVar1;
              auVar101._16_4_ = uVar1;
              auVar101._20_4_ = uVar1;
              auVar101._24_4_ = uVar1;
              auVar101._28_4_ = uVar1;
              auVar101._32_4_ = uVar1;
              auVar101._36_4_ = uVar1;
              auVar101._40_4_ = uVar1;
              auVar101._44_4_ = uVar1;
              auVar101._48_4_ = uVar1;
              auVar101._52_4_ = uVar1;
              auVar101._56_4_ = uVar1;
              auVar101._60_4_ = uVar1;
              auVar297 = vminps_avx512f(auVar288,auVar101);
              break;
            case 4:
              auVar288 = vxorps_avx512dq(auVar288,auVar282);
              auVar288 = vminps_avx512f(auVar288,(undefined1  [64])afVar117);
              auVar288 = vmaxps_avx512f(auVar288,(undefined1  [64])afVar118);
              auVar289 = vfmadd213ps_avx512f((undefined1  [64])afVar119,auVar288,
                                             (undefined1  [64])afVar125);
              auVar290 = vrndscaleps_avx512f(auVar289,1);
              uVar147 = vcmpps_avx512f(auVar289,auVar290,1);
              auVar289 = vsubps_avx512f(auVar290,(undefined1  [64])afVar116);
              bVar15 = (bool)((byte)uVar147 & 1);
              auVar305._0_4_ = (uint)bVar15 * auVar289._0_4_ | (uint)!bVar15 * auVar290._0_4_;
              bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
              auVar305._4_4_ = (uint)bVar15 * auVar289._4_4_ | (uint)!bVar15 * auVar290._4_4_;
              bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
              auVar305._8_4_ = (uint)bVar15 * auVar289._8_4_ | (uint)!bVar15 * auVar290._8_4_;
              bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
              auVar305._12_4_ = (uint)bVar15 * auVar289._12_4_ | (uint)!bVar15 * auVar290._12_4_;
              bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
              auVar305._16_4_ = (uint)bVar15 * auVar289._16_4_ | (uint)!bVar15 * auVar290._16_4_;
              bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
              auVar305._20_4_ = (uint)bVar15 * auVar289._20_4_ | (uint)!bVar15 * auVar290._20_4_;
              bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
              auVar305._24_4_ = (uint)bVar15 * auVar289._24_4_ | (uint)!bVar15 * auVar290._24_4_;
              bVar15 = (bool)((byte)(uVar147 >> 7) & 1);
              auVar305._28_4_ = (uint)bVar15 * auVar289._28_4_ | (uint)!bVar15 * auVar290._28_4_;
              bVar15 = (bool)((byte)(uVar147 >> 8) & 1);
              auVar305._32_4_ = (uint)bVar15 * auVar289._32_4_ | (uint)!bVar15 * auVar290._32_4_;
              bVar15 = (bool)((byte)(uVar147 >> 9) & 1);
              auVar305._36_4_ = (uint)bVar15 * auVar289._36_4_ | (uint)!bVar15 * auVar290._36_4_;
              bVar15 = (bool)((byte)(uVar147 >> 10) & 1);
              auVar305._40_4_ = (uint)bVar15 * auVar289._40_4_ | (uint)!bVar15 * auVar290._40_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xb) & 1);
              auVar305._44_4_ = (uint)bVar15 * auVar289._44_4_ | (uint)!bVar15 * auVar290._44_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xc) & 1);
              auVar305._48_4_ = (uint)bVar15 * auVar289._48_4_ | (uint)!bVar15 * auVar290._48_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xd) & 1);
              auVar305._52_4_ = (uint)bVar15 * auVar289._52_4_ | (uint)!bVar15 * auVar290._52_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xe) & 1);
              auVar305._56_4_ = (uint)bVar15 * auVar289._56_4_ | (uint)!bVar15 * auVar290._56_4_;
              bVar15 = SUB81(uVar147 >> 0xf,0);
              auVar305._60_4_ = (uint)bVar15 * auVar289._60_4_ | (uint)!bVar15 * auVar290._60_4_;
              auVar288 = vfmadd231ps_avx512f(auVar288,auVar305,auVar283);
              auVar288 = vfmadd231ps_avx512f(auVar288,auVar305,auVar284);
              auVar289 = vmulps_avx512f(auVar288,auVar288);
              auVar290 = vfmadd213ps_avx512f(auVar288,(undefined1  [64])afVar120,
                                             (undefined1  [64])afVar121);
              auVar290 = vfmadd213ps_avx512f(auVar290,auVar288,(undefined1  [64])afVar122);
              auVar290 = vfmadd213ps_avx512f(auVar290,auVar288,(undefined1  [64])afVar123);
              auVar290 = vfmadd213ps_avx512f(auVar290,auVar288,(undefined1  [64])afVar124);
              auVar290 = vfmadd213ps_avx512f(auVar290,auVar288,(undefined1  [64])afVar125);
              auVar288 = vfmadd213ps_avx512f(auVar290,auVar289,auVar288);
              auVar288 = vaddps_avx512f(auVar288,(undefined1  [64])afVar116);
              auVar289 = vcvttps2dq_avx512f(auVar305);
              auVar289 = vpaddd_avx512f(auVar289,auVar285);
              auVar289 = vpslld_avx512f(auVar289,0x17);
              auVar288 = vfmadd213ps_avx512f(auVar289,auVar288,auVar286);
              auVar289 = vrcp14ps_avx512f(auVar288);
              auVar288 = vfmsub213ps_avx512f(auVar288,auVar289,auVar286);
              auVar297 = vfnmadd132ps_avx512vl(auVar288,auVar289,auVar289);
              break;
            case 5:
              auVar289 = vminps_avx512f(auVar288,(undefined1  [64])afVar117);
              auVar289 = vmaxps_avx512f(auVar289,(undefined1  [64])afVar118);
              auVar290 = vfmadd213ps_avx512f((undefined1  [64])afVar119,auVar289,
                                             (undefined1  [64])afVar125);
              auVar291 = vrndscaleps_avx512f(auVar290,1);
              uVar147 = vcmpps_avx512f(auVar290,auVar291,1);
              auVar290 = vsubps_avx512f(auVar291,(undefined1  [64])afVar116);
              bVar15 = (bool)((byte)uVar147 & 1);
              auVar299._0_4_ = (uint)bVar15 * auVar290._0_4_ | (uint)!bVar15 * auVar291._0_4_;
              bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
              auVar299._4_4_ = (uint)bVar15 * auVar290._4_4_ | (uint)!bVar15 * auVar291._4_4_;
              bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
              auVar299._8_4_ = (uint)bVar15 * auVar290._8_4_ | (uint)!bVar15 * auVar291._8_4_;
              bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
              auVar299._12_4_ = (uint)bVar15 * auVar290._12_4_ | (uint)!bVar15 * auVar291._12_4_;
              bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
              auVar299._16_4_ = (uint)bVar15 * auVar290._16_4_ | (uint)!bVar15 * auVar291._16_4_;
              bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
              auVar299._20_4_ = (uint)bVar15 * auVar290._20_4_ | (uint)!bVar15 * auVar291._20_4_;
              bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
              auVar299._24_4_ = (uint)bVar15 * auVar290._24_4_ | (uint)!bVar15 * auVar291._24_4_;
              bVar15 = (bool)((byte)(uVar147 >> 7) & 1);
              auVar299._28_4_ = (uint)bVar15 * auVar290._28_4_ | (uint)!bVar15 * auVar291._28_4_;
              bVar15 = (bool)((byte)(uVar147 >> 8) & 1);
              auVar299._32_4_ = (uint)bVar15 * auVar290._32_4_ | (uint)!bVar15 * auVar291._32_4_;
              bVar15 = (bool)((byte)(uVar147 >> 9) & 1);
              auVar299._36_4_ = (uint)bVar15 * auVar290._36_4_ | (uint)!bVar15 * auVar291._36_4_;
              bVar15 = (bool)((byte)(uVar147 >> 10) & 1);
              auVar299._40_4_ = (uint)bVar15 * auVar290._40_4_ | (uint)!bVar15 * auVar291._40_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xb) & 1);
              auVar299._44_4_ = (uint)bVar15 * auVar290._44_4_ | (uint)!bVar15 * auVar291._44_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xc) & 1);
              auVar299._48_4_ = (uint)bVar15 * auVar290._48_4_ | (uint)!bVar15 * auVar291._48_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xd) & 1);
              auVar299._52_4_ = (uint)bVar15 * auVar290._52_4_ | (uint)!bVar15 * auVar291._52_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xe) & 1);
              auVar299._56_4_ = (uint)bVar15 * auVar290._56_4_ | (uint)!bVar15 * auVar291._56_4_;
              bVar15 = SUB81(uVar147 >> 0xf,0);
              auVar299._60_4_ = (uint)bVar15 * auVar290._60_4_ | (uint)!bVar15 * auVar291._60_4_;
              auVar289 = vfmadd231ps_avx512f(auVar289,auVar299,auVar283);
              auVar289 = vfmadd231ps_avx512f(auVar289,auVar299,auVar284);
              auVar290 = vmulps_avx512f(auVar289,auVar289);
              auVar291 = vfmadd213ps_avx512f(auVar289,(undefined1  [64])afVar120,
                                             (undefined1  [64])afVar121);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar122);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar123);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar124);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar125);
              auVar289 = vfmadd213ps_avx512f(auVar291,auVar290,auVar289);
              auVar289 = vaddps_avx512f(auVar289,(undefined1  [64])afVar116);
              auVar290 = vcvttps2dq_avx512f(auVar299);
              auVar290 = vpaddd_avx512f(auVar290,auVar285);
              auVar290 = vpslld_avx512f(auVar290,0x17);
              auVar289 = vfmadd213ps_avx512f(auVar290,auVar289,auVar286);
              auVar290 = vmaxps_avx512f(auVar289,(undefined1  [64])_ps512_min_norm_pos);
              auVar291 = vpsrld_avx512f(auVar290,0x17);
              auVar290 = vpternlogd_avx512f(auVar290,(undefined1  [64])afVar125,
                                            (undefined1  [64])_ps512_inv_mant_mask,0xec);
              uVar147 = vcmpps_avx512f(auVar290,(undefined1  [64])_ps512_cephes_SQRTHF,1);
              auVar292 = vsubps_avx512f(auVar290,(undefined1  [64])afVar116);
              auVar290 = vaddps_avx512f(auVar292,auVar290);
              bVar15 = (bool)((byte)uVar147 & 1);
              auVar300._0_4_ = (uint)bVar15 * auVar290._0_4_ | (uint)!bVar15 * auVar292._0_4_;
              bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
              auVar300._4_4_ = (uint)bVar15 * auVar290._4_4_ | (uint)!bVar15 * auVar292._4_4_;
              bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
              auVar300._8_4_ = (uint)bVar15 * auVar290._8_4_ | (uint)!bVar15 * auVar292._8_4_;
              bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
              auVar300._12_4_ = (uint)bVar15 * auVar290._12_4_ | (uint)!bVar15 * auVar292._12_4_;
              bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
              auVar300._16_4_ = (uint)bVar15 * auVar290._16_4_ | (uint)!bVar15 * auVar292._16_4_;
              bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
              auVar300._20_4_ = (uint)bVar15 * auVar290._20_4_ | (uint)!bVar15 * auVar292._20_4_;
              bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
              auVar300._24_4_ = (uint)bVar15 * auVar290._24_4_ | (uint)!bVar15 * auVar292._24_4_;
              bVar15 = (bool)((byte)(uVar147 >> 7) & 1);
              auVar300._28_4_ = (uint)bVar15 * auVar290._28_4_ | (uint)!bVar15 * auVar292._28_4_;
              bVar16 = (byte)(uVar147 >> 8);
              bVar15 = (bool)(bVar16 & 1);
              auVar300._32_4_ = (uint)bVar15 * auVar290._32_4_ | (uint)!bVar15 * auVar292._32_4_;
              bVar15 = (bool)((byte)(uVar147 >> 9) & 1);
              auVar300._36_4_ = (uint)bVar15 * auVar290._36_4_ | (uint)!bVar15 * auVar292._36_4_;
              bVar15 = (bool)((byte)(uVar147 >> 10) & 1);
              auVar300._40_4_ = (uint)bVar15 * auVar290._40_4_ | (uint)!bVar15 * auVar292._40_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xb) & 1);
              auVar300._44_4_ = (uint)bVar15 * auVar290._44_4_ | (uint)!bVar15 * auVar292._44_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xc) & 1);
              auVar300._48_4_ = (uint)bVar15 * auVar290._48_4_ | (uint)!bVar15 * auVar292._48_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xd) & 1);
              auVar300._52_4_ = (uint)bVar15 * auVar290._52_4_ | (uint)!bVar15 * auVar292._52_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xe) & 1);
              auVar300._56_4_ = (uint)bVar15 * auVar290._56_4_ | (uint)!bVar15 * auVar292._56_4_;
              bVar15 = SUB81(uVar147 >> 0xf,0);
              auVar300._60_4_ = (uint)bVar15 * auVar290._60_4_ | (uint)!bVar15 * auVar292._60_4_;
              auVar290 = vmulps_avx512f(auVar300,auVar300);
              auVar292 = vfmadd132ps_avx512f(auVar300,(undefined1  [64])_ps512_cephes_log_p1,
                                             (undefined1  [64])_ps512_cephes_log_p0);
              auVar292 = vfmadd213ps_avx512f(auVar292,auVar300,
                                             (undefined1  [64])_ps512_cephes_log_p2);
              auVar292 = vfmadd213ps_avx512f(auVar292,auVar300,
                                             (undefined1  [64])_ps512_cephes_log_p3);
              auVar292 = vfmadd213ps_avx512f(auVar292,auVar300,(undefined1  [64])afVar126);
              auVar292 = vfmadd213ps_avx512f(auVar292,auVar300,(undefined1  [64])afVar127);
              auVar292 = vfmadd213ps_avx512f(auVar292,auVar300,(undefined1  [64])afVar128);
              auVar292 = vfmadd213ps_avx512f(auVar292,auVar300,(undefined1  [64])afVar129);
              auVar292 = vfmadd213ps_avx512f(auVar292,auVar300,(undefined1  [64])afVar130);
              auVar293 = vmulps_avx512f(auVar290,auVar300);
              auVar292 = vfmadd213ps_avx512f(auVar293,auVar292,auVar300);
              uVar163 = vcmpps_avx512f(auVar289,in_ZMM30,2);
              auVar289 = vpsubd_avx512f(auVar291,auVar285);
              auVar289 = vcvtdq2ps_avx512f(auVar289);
              auVar291 = vaddps_avx512f(auVar289,(undefined1  [64])afVar116);
              bVar15 = (bool)((byte)uVar147 & 1);
              auVar301._0_4_ = (uint)bVar15 * auVar289._0_4_ | (uint)!bVar15 * auVar291._0_4_;
              bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
              auVar301._4_4_ = (uint)bVar15 * auVar289._4_4_ | (uint)!bVar15 * auVar291._4_4_;
              bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
              auVar301._8_4_ = (uint)bVar15 * auVar289._8_4_ | (uint)!bVar15 * auVar291._8_4_;
              bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
              auVar301._12_4_ = (uint)bVar15 * auVar289._12_4_ | (uint)!bVar15 * auVar291._12_4_;
              bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
              auVar301._16_4_ = (uint)bVar15 * auVar289._16_4_ | (uint)!bVar15 * auVar291._16_4_;
              bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
              auVar301._20_4_ = (uint)bVar15 * auVar289._20_4_ | (uint)!bVar15 * auVar291._20_4_;
              bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
              auVar301._24_4_ = (uint)bVar15 * auVar289._24_4_ | (uint)!bVar15 * auVar291._24_4_;
              bVar15 = (bool)((byte)(uVar147 >> 7) & 1);
              auVar301._28_4_ = (uint)bVar15 * auVar289._28_4_ | (uint)!bVar15 * auVar291._28_4_;
              bVar15 = (bool)(bVar16 & 1);
              auVar301._32_4_ = (uint)bVar15 * auVar289._32_4_ | (uint)!bVar15 * auVar291._32_4_;
              bVar15 = (bool)((byte)(uVar147 >> 9) & 1);
              auVar301._36_4_ = (uint)bVar15 * auVar289._36_4_ | (uint)!bVar15 * auVar291._36_4_;
              bVar15 = (bool)((byte)(uVar147 >> 10) & 1);
              auVar301._40_4_ = (uint)bVar15 * auVar289._40_4_ | (uint)!bVar15 * auVar291._40_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xb) & 1);
              auVar301._44_4_ = (uint)bVar15 * auVar289._44_4_ | (uint)!bVar15 * auVar291._44_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xc) & 1);
              auVar301._48_4_ = (uint)bVar15 * auVar289._48_4_ | (uint)!bVar15 * auVar291._48_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xd) & 1);
              auVar301._52_4_ = (uint)bVar15 * auVar289._52_4_ | (uint)!bVar15 * auVar291._52_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xe) & 1);
              auVar301._56_4_ = (uint)bVar15 * auVar289._56_4_ | (uint)!bVar15 * auVar291._56_4_;
              bVar15 = SUB81(uVar147 >> 0xf,0);
              auVar301._60_4_ = (uint)bVar15 * auVar289._60_4_ | (uint)!bVar15 * auVar291._60_4_;
              auVar289 = vfmadd231ps_avx512f(auVar292,auVar301,
                                             (undefined1  [64])_ps512_cephes_log_q1);
              auVar289 = vfmadd231ps_avx512f(auVar289,auVar302,auVar290);
              auVar289 = vfmadd231ps_avx512f(auVar289,auVar301,
                                             (undefined1  [64])_ps512_cephes_log_q2);
              auVar289 = vmulps_avx512f(auVar289,auVar287);
              auVar290 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
              bVar15 = (bool)((byte)uVar163 & 1);
              auVar303._0_4_ = (uint)bVar15 * auVar290._0_4_ | (uint)!bVar15 * auVar289._0_4_;
              bVar15 = (bool)((byte)(uVar163 >> 1) & 1);
              auVar303._4_4_ = (uint)bVar15 * auVar290._4_4_ | (uint)!bVar15 * auVar289._4_4_;
              bVar15 = (bool)((byte)(uVar163 >> 2) & 1);
              auVar303._8_4_ = (uint)bVar15 * auVar290._8_4_ | (uint)!bVar15 * auVar289._8_4_;
              bVar15 = (bool)((byte)(uVar163 >> 3) & 1);
              auVar303._12_4_ = (uint)bVar15 * auVar290._12_4_ | (uint)!bVar15 * auVar289._12_4_;
              bVar15 = (bool)((byte)(uVar163 >> 4) & 1);
              auVar303._16_4_ = (uint)bVar15 * auVar290._16_4_ | (uint)!bVar15 * auVar289._16_4_;
              bVar15 = (bool)((byte)(uVar163 >> 5) & 1);
              auVar303._20_4_ = (uint)bVar15 * auVar290._20_4_ | (uint)!bVar15 * auVar289._20_4_;
              bVar15 = (bool)((byte)(uVar163 >> 6) & 1);
              auVar303._24_4_ = (uint)bVar15 * auVar290._24_4_ | (uint)!bVar15 * auVar289._24_4_;
              bVar15 = (bool)((byte)(uVar163 >> 7) & 1);
              auVar303._28_4_ = (uint)bVar15 * auVar290._28_4_ | (uint)!bVar15 * auVar289._28_4_;
              bVar15 = (bool)((byte)(uVar163 >> 8) & 1);
              auVar303._32_4_ = (uint)bVar15 * auVar290._32_4_ | (uint)!bVar15 * auVar289._32_4_;
              bVar15 = (bool)((byte)(uVar163 >> 9) & 1);
              auVar303._36_4_ = (uint)bVar15 * auVar290._36_4_ | (uint)!bVar15 * auVar289._36_4_;
              bVar15 = (bool)((byte)(uVar163 >> 10) & 1);
              auVar303._40_4_ = (uint)bVar15 * auVar290._40_4_ | (uint)!bVar15 * auVar289._40_4_;
              bVar15 = (bool)((byte)(uVar163 >> 0xb) & 1);
              auVar303._44_4_ = (uint)bVar15 * auVar290._44_4_ | (uint)!bVar15 * auVar289._44_4_;
              bVar15 = (bool)((byte)(uVar163 >> 0xc) & 1);
              auVar303._48_4_ = (uint)bVar15 * auVar290._48_4_ | (uint)!bVar15 * auVar289._48_4_;
              bVar15 = (bool)((byte)(uVar163 >> 0xd) & 1);
              auVar303._52_4_ = (uint)bVar15 * auVar290._52_4_ | (uint)!bVar15 * auVar289._52_4_;
              bVar15 = (bool)((byte)(uVar163 >> 0xe) & 1);
              auVar303._56_4_ = (uint)bVar15 * auVar290._56_4_ | (uint)!bVar15 * auVar289._56_4_;
              bVar15 = SUB81(uVar163 >> 0xf,0);
              auVar303._60_4_ = (uint)bVar15 * auVar290._60_4_ | (uint)!bVar15 * auVar289._60_4_;
              auVar289 = vminps_avx512f(auVar303,(undefined1  [64])afVar117);
              auVar289 = vmaxps_avx512f(auVar289,(undefined1  [64])afVar118);
              auVar290 = vfmadd213ps_avx512f((undefined1  [64])afVar119,auVar289,
                                             (undefined1  [64])afVar125);
              auVar291 = vrndscaleps_avx512f(auVar290,1);
              uVar147 = vcmpps_avx512f(auVar290,auVar291,1);
              auVar290 = vsubps_avx512f(auVar291,(undefined1  [64])afVar116);
              bVar15 = (bool)((byte)uVar147 & 1);
              auVar304._0_4_ = (uint)bVar15 * auVar290._0_4_ | (uint)!bVar15 * auVar291._0_4_;
              bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
              auVar304._4_4_ = (uint)bVar15 * auVar290._4_4_ | (uint)!bVar15 * auVar291._4_4_;
              bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
              auVar304._8_4_ = (uint)bVar15 * auVar290._8_4_ | (uint)!bVar15 * auVar291._8_4_;
              bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
              auVar304._12_4_ = (uint)bVar15 * auVar290._12_4_ | (uint)!bVar15 * auVar291._12_4_;
              bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
              auVar304._16_4_ = (uint)bVar15 * auVar290._16_4_ | (uint)!bVar15 * auVar291._16_4_;
              bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
              auVar304._20_4_ = (uint)bVar15 * auVar290._20_4_ | (uint)!bVar15 * auVar291._20_4_;
              bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
              auVar304._24_4_ = (uint)bVar15 * auVar290._24_4_ | (uint)!bVar15 * auVar291._24_4_;
              bVar15 = (bool)((byte)(uVar147 >> 7) & 1);
              auVar304._28_4_ = (uint)bVar15 * auVar290._28_4_ | (uint)!bVar15 * auVar291._28_4_;
              bVar15 = (bool)((byte)(uVar147 >> 8) & 1);
              auVar304._32_4_ = (uint)bVar15 * auVar290._32_4_ | (uint)!bVar15 * auVar291._32_4_;
              bVar15 = (bool)((byte)(uVar147 >> 9) & 1);
              auVar304._36_4_ = (uint)bVar15 * auVar290._36_4_ | (uint)!bVar15 * auVar291._36_4_;
              bVar15 = (bool)((byte)(uVar147 >> 10) & 1);
              auVar304._40_4_ = (uint)bVar15 * auVar290._40_4_ | (uint)!bVar15 * auVar291._40_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xb) & 1);
              auVar304._44_4_ = (uint)bVar15 * auVar290._44_4_ | (uint)!bVar15 * auVar291._44_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xc) & 1);
              auVar304._48_4_ = (uint)bVar15 * auVar290._48_4_ | (uint)!bVar15 * auVar291._48_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xd) & 1);
              auVar304._52_4_ = (uint)bVar15 * auVar290._52_4_ | (uint)!bVar15 * auVar291._52_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xe) & 1);
              auVar304._56_4_ = (uint)bVar15 * auVar290._56_4_ | (uint)!bVar15 * auVar291._56_4_;
              bVar15 = SUB81(uVar147 >> 0xf,0);
              auVar304._60_4_ = (uint)bVar15 * auVar290._60_4_ | (uint)!bVar15 * auVar291._60_4_;
              auVar289 = vfmadd231ps_avx512f(auVar289,auVar304,auVar283);
              auVar289 = vfmadd231ps_avx512f(auVar289,auVar304,auVar284);
              auVar290 = vmulps_avx512f(auVar289,auVar289);
              auVar291 = vfmadd213ps_avx512f(auVar289,(undefined1  [64])afVar120,
                                             (undefined1  [64])afVar121);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar122);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar123);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar124);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar125);
              auVar289 = vfmadd213ps_avx512f(auVar291,auVar290,auVar289);
              auVar289 = vaddps_avx512f(auVar289,(undefined1  [64])afVar116);
              auVar290 = vcvttps2dq_avx512f(auVar304);
              auVar290 = vpaddd_avx512f(auVar290,auVar285);
              auVar290 = vpslld_avx512f(auVar290,0x17);
              auVar289 = vfmadd213ps_avx512f(auVar290,auVar289,auVar286);
              auVar290 = vrcp14ps_avx512f(auVar289);
              auVar289 = vfmsub213ps_avx512f(auVar289,auVar290,auVar286);
              auVar289 = vfnmadd132ps_avx512vl(auVar289,auVar290,auVar290);
              auVar289 = vfnmsub213ps_avx512f(auVar289,auVar287,auVar286);
              auVar297 = vmulps_avx512f(auVar289,auVar288);
              break;
            case 6:
              auVar289 = vbroadcastss_avx512f
                                   (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var145)));
              uVar141 = (*(uint **)(&this->field_0x118 + (long)p_Var145))[1];
              auVar298._4_4_ = uVar141;
              auVar298._0_4_ = uVar141;
              auVar298._8_4_ = uVar141;
              auVar298._12_4_ = uVar141;
              auVar298._16_4_ = uVar141;
              auVar298._20_4_ = uVar141;
              auVar298._24_4_ = uVar141;
              auVar298._28_4_ = uVar141;
              auVar298._32_4_ = uVar141;
              auVar298._36_4_ = uVar141;
              auVar298._40_4_ = uVar141;
              auVar298._44_4_ = uVar141;
              auVar298._48_4_ = uVar141;
              auVar298._52_4_ = uVar141;
              auVar298._56_4_ = uVar141;
              auVar298._60_4_ = uVar141;
              auVar289 = vfmadd213ps_avx512f(auVar289,auVar288,auVar298);
              auVar289 = vmaxps_avx512f(auVar289,in_ZMM30);
              auVar289 = vminps_avx512f(auVar289,auVar286);
              auVar297 = vmulps_avx512f(auVar289,auVar288);
            }
            *(undefined1 (*) [64])local_1c0 = auVar297;
            local_1c0 = local_1c0 + 8;
            iVar144 = iVar144 + 1;
          }
          uVar147 = (ulong)(uVar137 + 1);
        }
      }
    }
    if ((iVar170 == 0x10) && (uVar150 == 8)) {
      p_Var145 = pp_Var149[-3];
      uVar171 = *(uint *)(&this->field_0xd4 + (long)p_Var145);
      uVar134 = *(uint *)(&this->field_0xd8 + (long)p_Var145);
      iVar156 = *(int *)(&this->field_0xdc + (long)p_Var145);
      iVar8 = *(int *)(&this->field_0xe0 + (long)p_Var145);
      iVar151 = *(int *)(&this->field_0xe4 + (long)p_Var145);
      iVar167 = *(int *)(&this->field_0xe8 + (long)p_Var145);
      iVar158 = *(int *)(&this->field_0x114 + (long)p_Var145);
      local_a8._0_8_ = p_Var145;
      lVar153 = *(long *)(&this->field_0x1a8 + (long)p_Var145);
      uVar159 = 0;
      uVar164 = 0;
      if (0 < (int)uVar171) {
        uVar164 = (ulong)uVar171;
      }
      uVar157 = 0;
      if (0 < (int)uVar134) {
        uVar157 = (ulong)uVar134;
      }
      uVar154 = (ulong)(uint)local_f8.c;
      if (local_f8.c < 1) {
        uVar154 = uVar159;
      }
      auVar249._8_4_ = 0x42b0c0a5;
      auVar249._0_8_ = 0x42b0c0a542b0c0a5;
      auVar249._12_4_ = 0x42b0c0a5;
      auVar249._16_4_ = 0x42b0c0a5;
      auVar249._20_4_ = 0x42b0c0a5;
      auVar249._24_4_ = 0x42b0c0a5;
      auVar249._28_4_ = 0x42b0c0a5;
      auVar250._8_4_ = 0xc2b0c0a5;
      auVar250._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar250._12_4_ = 0xc2b0c0a5;
      auVar250._16_4_ = 0xc2b0c0a5;
      auVar250._20_4_ = 0xc2b0c0a5;
      auVar250._24_4_ = 0xc2b0c0a5;
      auVar250._28_4_ = 0xc2b0c0a5;
      auVar251._8_4_ = 0x3f000000;
      auVar251._0_8_ = 0x3f0000003f000000;
      auVar251._12_4_ = 0x3f000000;
      auVar251._16_4_ = 0x3f000000;
      auVar251._20_4_ = 0x3f000000;
      auVar251._24_4_ = 0x3f000000;
      auVar251._28_4_ = 0x3f000000;
      auVar252._8_4_ = 0x3fb8aa3b;
      auVar252._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar252._12_4_ = 0x3fb8aa3b;
      auVar252._16_4_ = 0x3fb8aa3b;
      auVar252._20_4_ = 0x3fb8aa3b;
      auVar252._24_4_ = 0x3fb8aa3b;
      auVar252._28_4_ = 0x3fb8aa3b;
      auVar253._8_4_ = 0x3f800000;
      auVar253._0_8_ = 0x3f8000003f800000;
      auVar253._12_4_ = 0x3f800000;
      auVar253._16_4_ = 0x3f800000;
      auVar253._20_4_ = 0x3f800000;
      auVar253._24_4_ = 0x3f800000;
      auVar253._28_4_ = 0x3f800000;
      auVar254._8_4_ = 0x3f318000;
      auVar254._0_8_ = 0x3f3180003f318000;
      auVar254._12_4_ = 0x3f318000;
      auVar254._16_4_ = 0x3f318000;
      auVar254._20_4_ = 0x3f318000;
      auVar254._24_4_ = 0x3f318000;
      auVar254._28_4_ = 0x3f318000;
      auVar228 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar255._8_4_ = 0x3ab743ce;
      auVar255._0_8_ = 0x3ab743ce3ab743ce;
      auVar255._12_4_ = 0x3ab743ce;
      auVar255._16_4_ = 0x3ab743ce;
      auVar255._20_4_ = 0x3ab743ce;
      auVar255._24_4_ = 0x3ab743ce;
      auVar255._28_4_ = 0x3ab743ce;
      auVar256._8_4_ = 0x3c088908;
      auVar256._0_8_ = 0x3c0889083c088908;
      auVar256._12_4_ = 0x3c088908;
      auVar256._16_4_ = 0x3c088908;
      auVar256._20_4_ = 0x3c088908;
      auVar256._24_4_ = 0x3c088908;
      auVar256._28_4_ = 0x3c088908;
      auVar257._8_4_ = 0x3d2aa9c1;
      auVar257._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar257._12_4_ = 0x3d2aa9c1;
      auVar257._16_4_ = 0x3d2aa9c1;
      auVar257._20_4_ = 0x3d2aa9c1;
      auVar257._24_4_ = 0x3d2aa9c1;
      auVar257._28_4_ = 0x3d2aa9c1;
      auVar258._8_4_ = 0x3e2aaaaa;
      auVar258._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar258._12_4_ = 0x3e2aaaaa;
      auVar258._16_4_ = 0x3e2aaaaa;
      auVar258._20_4_ = 0x3e2aaaaa;
      auVar258._24_4_ = 0x3e2aaaaa;
      auVar258._28_4_ = 0x3e2aaaaa;
      auVar259._8_4_ = 0x3f800000;
      auVar259._0_8_ = 0x3f8000003f800000;
      auVar259._12_4_ = 0x3f800000;
      auVar259._16_4_ = 0x3f800000;
      auVar259._20_4_ = 0x3f800000;
      auVar259._24_4_ = 0x3f800000;
      auVar259._28_4_ = 0x3f800000;
      auVar260._8_4_ = 0xb95e8083;
      auVar260._0_8_ = 0xb95e8083b95e8083;
      auVar260._12_4_ = 0xb95e8083;
      auVar260._16_4_ = 0xb95e8083;
      auVar260._20_4_ = 0xb95e8083;
      auVar260._24_4_ = 0xb95e8083;
      auVar260._28_4_ = 0xb95e8083;
      auVar172 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
      in_ZMM30 = ZEXT1664(auVar172);
      auVar229 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      for (; uVar159 != uVar154; uVar159 = uVar159 + 1) {
        local_1c0 = (_func_int ***)
                    ((long)(_func_int ***)local_f8.data +
                    local_f8.cstep * uVar159 * local_f8.elemsize);
        iVar143 = bottom_blob->w;
        iVar144 = bottom_blob->h;
        uVar147 = 0;
        uVar148 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar148 = uVar147;
        }
        uVar138 = local_f8.w;
        if (local_f8.w < 1) {
          uVar138 = 0;
        }
        uVar155 = local_f8.h;
        if (local_f8.h < 1) {
          uVar155 = 0;
        }
        while (uVar137 = (uint)uVar147, uVar137 != uVar155) {
          iVar135 = (1 - uVar171) * iVar156;
          for (uVar139 = 0; uVar139 != uVar138; uVar139 = uVar139 + 1) {
            if (lVar153 == 0) {
              auVar282 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar282 = ZEXT3264(*(undefined1 (*) [32])(lVar153 + uVar159 * 0x20));
            }
            pvVar165 = bottom_blob->data;
            lVar168 = (long)(this->weight_data_tm).data +
                      (this->weight_data_tm).cstep * uVar159 * (this->weight_data_tm).elemsize +
                      0x1e0;
            for (uVar147 = 0; uVar147 != uVar148; uVar147 = uVar147 + 1) {
              lVar169 = lVar168;
              for (uVar163 = 0; uVar163 != uVar157; uVar163 = uVar163 + 1) {
                iVar136 = (((int)uVar163 - uVar134) + 1) * iVar8 + uVar137;
                if (((-1 < iVar136) && (iVar140 = iVar136 / iVar167, iVar136 % iVar167 == 0)) &&
                   (iVar140 < iVar144)) {
                  lVar115 = (long)iVar140 * (long)bottom_blob->w * bottom_blob->elemsize +
                            bottom_blob->cstep * bottom_blob->elemsize * uVar147;
                  iVar136 = iVar135;
                  for (lVar161 = 0; uVar164 * 0x200 != lVar161; lVar161 = lVar161 + 0x200) {
                    if (((-1 < iVar136) && (iVar140 = iVar136 / iVar151, iVar136 % iVar151 == 0)) &&
                       (iVar140 < iVar143)) {
                      lVar146 = (long)(iVar140 << 4);
                      uVar10 = *(undefined4 *)((long)pvVar165 + lVar146 * 4 + lVar115);
                      auVar423._4_4_ = uVar10;
                      auVar423._0_4_ = uVar10;
                      auVar423._8_4_ = uVar10;
                      auVar423._12_4_ = uVar10;
                      auVar423._16_4_ = uVar10;
                      auVar423._20_4_ = uVar10;
                      auVar423._24_4_ = uVar10;
                      auVar423._28_4_ = uVar10;
                      uVar10 = *(undefined4 *)((long)pvVar165 + lVar146 * 4 + lVar115 + 4);
                      auVar421._4_4_ = uVar10;
                      auVar421._0_4_ = uVar10;
                      auVar421._8_4_ = uVar10;
                      auVar421._12_4_ = uVar10;
                      auVar421._16_4_ = uVar10;
                      auVar421._20_4_ = uVar10;
                      auVar421._24_4_ = uVar10;
                      auVar421._28_4_ = uVar10;
                      uVar10 = *(undefined4 *)((long)pvVar165 + lVar146 * 4 + lVar115 + 8);
                      auVar492._4_4_ = uVar10;
                      auVar492._0_4_ = uVar10;
                      auVar492._8_4_ = uVar10;
                      auVar492._12_4_ = uVar10;
                      auVar492._16_4_ = uVar10;
                      auVar492._20_4_ = uVar10;
                      auVar492._24_4_ = uVar10;
                      auVar492._28_4_ = uVar10;
                      auVar230 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0xc)));
                      auVar231 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x10)));
                      auVar232 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x14)));
                      auVar233 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x18)));
                      auVar234 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x1c)));
                      auVar235 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x20)));
                      auVar236 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x24)));
                      auVar237 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x28)));
                      auVar238 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x2c)));
                      auVar239 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x30)));
                      auVar240 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x34)));
                      auVar241 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x38)));
                      auVar242 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x3c)));
                      auVar173 = vfmadd231ps_fma(auVar282._0_32_,auVar423,
                                                 *(undefined1 (*) [32])(lVar169 + -0x1e0 + lVar161))
                      ;
                      auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar421,
                                                 *(undefined1 (*) [32])(lVar169 + -0x1c0 + lVar161))
                      ;
                      auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar492,
                                                 *(undefined1 (*) [32])(lVar169 + -0x1a0 + lVar161))
                      ;
                      auVar230 = vfmadd231ps_avx512vl
                                           (ZEXT1632(auVar173),auVar230,
                                            *(undefined1 (*) [32])(lVar169 + -0x180 + lVar161));
                      auVar230 = vfmadd231ps_avx512vl
                                           (auVar230,auVar231,
                                            *(undefined1 (*) [32])(lVar169 + -0x160 + lVar161));
                      auVar230 = vfmadd231ps_avx512vl
                                           (auVar230,auVar232,
                                            *(undefined1 (*) [32])(lVar169 + -0x140 + lVar161));
                      auVar230 = vfmadd231ps_avx512vl
                                           (auVar230,auVar233,
                                            *(undefined1 (*) [32])(lVar169 + -0x120 + lVar161));
                      auVar230 = vfmadd231ps_avx512vl
                                           (auVar230,auVar234,
                                            *(undefined1 (*) [32])(lVar169 + -0x100 + lVar161));
                      auVar230 = vfmadd231ps_avx512vl
                                           (auVar230,auVar235,
                                            *(undefined1 (*) [32])(lVar169 + -0xe0 + lVar161));
                      auVar230 = vfmadd231ps_avx512vl
                                           (auVar230,auVar236,
                                            *(undefined1 (*) [32])(lVar169 + -0xc0 + lVar161));
                      auVar230 = vfmadd231ps_avx512vl
                                           (auVar230,auVar237,
                                            *(undefined1 (*) [32])(lVar169 + -0xa0 + lVar161));
                      auVar230 = vfmadd231ps_avx512vl
                                           (auVar230,auVar238,
                                            *(undefined1 (*) [32])(lVar169 + -0x80 + lVar161));
                      auVar230 = vfmadd231ps_avx512vl
                                           (auVar230,auVar239,
                                            *(undefined1 (*) [32])(lVar169 + -0x60 + lVar161));
                      auVar230 = vfmadd231ps_avx512vl
                                           (auVar230,auVar240,
                                            *(undefined1 (*) [32])(lVar169 + -0x40 + lVar161));
                      auVar230 = vfmadd231ps_avx512vl
                                           (auVar230,auVar241,
                                            *(undefined1 (*) [32])(lVar169 + -0x20 + lVar161));
                      auVar230 = vfmadd231ps_avx512vl
                                           (auVar230,auVar242,
                                            *(undefined1 (*) [32])(lVar169 + lVar161));
                      auVar282 = ZEXT3264(auVar230);
                    }
                    iVar136 = iVar136 + iVar156;
                  }
                }
                lVar169 = lVar169 + (long)(int)uVar171 * 0x200;
              }
              lVar168 = lVar168 + (long)(int)(uVar171 * uVar134 * 0x80) * 4;
            }
            auVar231 = auVar282._0_32_;
            auVar230 = auVar231;
            if (iVar158 - 1U < 6) {
              auVar230 = vmaxps_avx512vl(auVar231,ZEXT1632(auVar172));
              switch(iVar158) {
              case 2:
                auVar231 = vminps_avx512vl(auVar231,ZEXT1632(auVar172));
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar69._4_4_ = uVar10;
                auVar69._0_4_ = uVar10;
                auVar69._8_4_ = uVar10;
                auVar69._12_4_ = uVar10;
                auVar69._16_4_ = uVar10;
                auVar69._20_4_ = uVar10;
                auVar69._24_4_ = uVar10;
                auVar69._28_4_ = uVar10;
                auVar230 = vfmadd231ps_avx512vl(auVar230,auVar231,auVar69);
                break;
              case 3:
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar67._4_4_ = uVar10;
                auVar67._0_4_ = uVar10;
                auVar67._8_4_ = uVar10;
                auVar67._12_4_ = uVar10;
                auVar67._16_4_ = uVar10;
                auVar67._20_4_ = uVar10;
                auVar67._24_4_ = uVar10;
                auVar67._28_4_ = uVar10;
                auVar230 = vmaxps_avx512vl(auVar231,auVar67);
                uVar10 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var145))[1];
                auVar68._4_4_ = uVar10;
                auVar68._0_4_ = uVar10;
                auVar68._8_4_ = uVar10;
                auVar68._12_4_ = uVar10;
                auVar68._16_4_ = uVar10;
                auVar68._20_4_ = uVar10;
                auVar68._24_4_ = uVar10;
                auVar68._28_4_ = uVar10;
                auVar230 = vminps_avx512vl(auVar230,auVar68);
                break;
              case 4:
                auVar65._8_4_ = 0x80000000;
                auVar65._0_8_ = 0x8000000080000000;
                auVar65._12_4_ = 0x80000000;
                auVar65._16_4_ = 0x80000000;
                auVar65._20_4_ = 0x80000000;
                auVar65._24_4_ = 0x80000000;
                auVar65._28_4_ = 0x80000000;
                auVar230 = vxorps_avx512vl(auVar231,auVar65);
                auVar230 = vminps_avx(auVar230,auVar249);
                auVar230 = vmaxps_avx(auVar230,auVar250);
                auVar173 = vfmadd231ps_fma(auVar251,auVar230,auVar252);
                auVar231 = vroundps_avx(ZEXT1632(auVar173),1);
                uVar147 = vcmpps_avx512vl(ZEXT1632(auVar173),auVar231,1);
                auVar232 = vsubps_avx512vl(auVar231,auVar253);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar248._0_4_ =
                     (float)((uint)bVar15 * auVar232._0_4_ | (uint)!bVar15 * auVar231._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar248._4_4_ =
                     (float)((uint)bVar15 * auVar232._4_4_ | (uint)!bVar15 * auVar231._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar248._8_4_ =
                     (float)((uint)bVar15 * auVar232._8_4_ | (uint)!bVar15 * auVar231._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar248._12_4_ =
                     (float)((uint)bVar15 * auVar232._12_4_ | (uint)!bVar15 * auVar231._12_4_);
                bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
                auVar248._16_4_ =
                     (float)((uint)bVar15 * auVar232._16_4_ | (uint)!bVar15 * auVar231._16_4_);
                bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
                auVar248._20_4_ =
                     (float)((uint)bVar15 * auVar232._20_4_ | (uint)!bVar15 * auVar231._20_4_);
                bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
                auVar248._24_4_ =
                     (float)((uint)bVar15 * auVar232._24_4_ | (uint)!bVar15 * auVar231._24_4_);
                bVar15 = SUB81(uVar147 >> 7,0);
                auVar248._28_4_ =
                     (float)((uint)bVar15 * auVar232._28_4_ | (uint)!bVar15 * auVar231._28_4_);
                auVar173 = vfmsub231ps_fma(auVar230,auVar248,auVar254);
                auVar66._8_4_ = 0x395e8083;
                auVar66._0_8_ = 0x395e8083395e8083;
                auVar66._12_4_ = 0x395e8083;
                auVar66._16_4_ = 0x395e8083;
                auVar66._20_4_ = 0x395e8083;
                auVar66._24_4_ = 0x395e8083;
                auVar66._28_4_ = 0x395e8083;
                auVar230 = vfmsub231ps_avx512vl(ZEXT1632(auVar173),auVar248,auVar66);
                auVar392._0_4_ = auVar230._0_4_ * auVar230._0_4_;
                auVar392._4_4_ = auVar230._4_4_ * auVar230._4_4_;
                auVar392._8_4_ = auVar230._8_4_ * auVar230._8_4_;
                auVar392._12_4_ = auVar230._12_4_ * auVar230._12_4_;
                auVar392._16_4_ = auVar230._16_4_ * auVar230._16_4_;
                auVar392._20_4_ = auVar230._20_4_ * auVar230._20_4_;
                auVar392._24_4_ = auVar230._24_4_ * auVar230._24_4_;
                auVar392._28_4_ = 0;
                auVar173 = vfmadd213ps_fma(auVar228,auVar230,auVar255);
                auVar173 = vfmadd213ps_fma(ZEXT1632(auVar173),auVar230,auVar256);
                auVar173 = vfmadd213ps_fma(ZEXT1632(auVar173),auVar230,auVar257);
                auVar173 = vfmadd213ps_fma(ZEXT1632(auVar173),auVar230,auVar258);
                auVar173 = vfmadd213ps_fma(ZEXT1632(auVar173),auVar230,auVar251);
                auVar173 = vfmadd213ps_fma(ZEXT1632(auVar173),auVar392,auVar230);
                auVar325._0_4_ = auVar173._0_4_ + 1.0;
                auVar325._4_4_ = auVar173._4_4_ + 1.0;
                auVar325._8_4_ = auVar173._8_4_ + 1.0;
                auVar325._12_4_ = auVar173._12_4_ + 1.0;
                auVar325._16_4_ = 0x3f800000;
                auVar325._20_4_ = 0x3f800000;
                auVar325._24_4_ = 0x3f800000;
                auVar325._28_4_ = 0x3f800000;
                auVar393._0_4_ = (int)auVar248._0_4_;
                auVar393._4_4_ = (int)auVar248._4_4_;
                auVar393._8_4_ = (int)auVar248._8_4_;
                auVar393._12_4_ = (int)auVar248._12_4_;
                auVar393._16_4_ = (int)auVar248._16_4_;
                auVar393._20_4_ = (int)auVar248._20_4_;
                auVar393._24_4_ = (int)auVar248._24_4_;
                auVar393._28_4_ = (int)auVar248._28_4_;
                auVar230 = vpslld_avx2(auVar393,0x17);
                auVar230 = vpaddd_avx2(auVar259,auVar230);
                auVar173 = vfmadd213ps_fma(auVar230,auVar325,auVar253);
                auVar230 = vrcpps_avx(ZEXT1632(auVar173));
                auVar173 = vfmsub213ps_fma(ZEXT1632(auVar173),auVar230,auVar253);
                auVar173 = vfnmadd132ps_fma(ZEXT1632(auVar173),auVar230,auVar230);
                auVar230 = ZEXT1632(auVar173);
                break;
              case 5:
                auVar230 = vminps_avx(auVar231,auVar249);
                auVar230 = vmaxps_avx(auVar230,auVar250);
                auVar173 = vfmadd213ps_fma(auVar252,auVar230,auVar251);
                auVar231 = vroundps_avx(ZEXT1632(auVar173),1);
                uVar147 = vcmpps_avx512vl(ZEXT1632(auVar173),auVar231,1);
                auVar232 = vsubps_avx512vl(auVar231,auVar253);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar243._0_4_ =
                     (float)((uint)bVar15 * auVar232._0_4_ | (uint)!bVar15 * auVar231._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar243._4_4_ =
                     (float)((uint)bVar15 * auVar232._4_4_ | (uint)!bVar15 * auVar231._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar243._8_4_ =
                     (float)((uint)bVar15 * auVar232._8_4_ | (uint)!bVar15 * auVar231._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar243._12_4_ =
                     (float)((uint)bVar15 * auVar232._12_4_ | (uint)!bVar15 * auVar231._12_4_);
                bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
                auVar243._16_4_ =
                     (float)((uint)bVar15 * auVar232._16_4_ | (uint)!bVar15 * auVar231._16_4_);
                bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
                auVar243._20_4_ =
                     (float)((uint)bVar15 * auVar232._20_4_ | (uint)!bVar15 * auVar231._20_4_);
                bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
                auVar243._24_4_ =
                     (float)((uint)bVar15 * auVar232._24_4_ | (uint)!bVar15 * auVar231._24_4_);
                bVar15 = SUB81(uVar147 >> 7,0);
                auVar243._28_4_ =
                     (float)((uint)bVar15 * auVar232._28_4_ | (uint)!bVar15 * auVar231._28_4_);
                auVar173 = vfmsub231ps_fma(auVar230,auVar243,auVar254);
                auVar173 = vfnmsub231ps_fma(ZEXT1632(auVar173),auVar243,auVar260);
                auVar231 = ZEXT1632(auVar173);
                auVar230 = vfmadd213ps_avx512vl(auVar228,auVar231,auVar255);
                auVar230 = vfmadd213ps_avx512vl(auVar230,auVar231,auVar256);
                auVar230 = vfmadd213ps_avx512vl(auVar230,auVar231,auVar257);
                auVar231 = ZEXT1632(auVar173);
                auVar230 = vfmadd213ps_avx512vl(auVar230,auVar231,auVar258);
                auVar230 = vfmadd213ps_avx512vl(auVar230,auVar231,auVar251);
                auVar230 = vfmadd213ps_avx512vl
                                     (auVar230,ZEXT1632(CONCAT412(auVar173._12_4_ * auVar173._12_4_,
                                                                  CONCAT48(auVar173._8_4_ *
                                                                           auVar173._8_4_,
                                                                           CONCAT44(auVar173._4_4_ *
                                                                                    auVar173._4_4_,
                                                                                    auVar173._0_4_ *
                                                                                    auVar173._0_4_))
                                                                 )),auVar231);
                auVar231 = vaddps_avx512vl(auVar230,auVar253);
                auVar422._0_4_ = (int)auVar243._0_4_;
                auVar422._4_4_ = (int)auVar243._4_4_;
                auVar422._8_4_ = (int)auVar243._8_4_;
                auVar422._12_4_ = (int)auVar243._12_4_;
                auVar422._16_4_ = (int)auVar243._16_4_;
                auVar422._20_4_ = (int)auVar243._20_4_;
                auVar422._24_4_ = (int)auVar243._24_4_;
                auVar422._28_4_ = (int)auVar243._28_4_;
                auVar230 = vpslld_avx2(auVar422,0x17);
                auVar230 = vpaddd_avx2(auVar230,auVar259);
                auVar173 = vfmadd213ps_fma(auVar230,auVar231,auVar253);
                uVar147 = vcmpps_avx512vl(ZEXT1632(auVar173),ZEXT1632(auVar172),2);
                auVar231._8_4_ = 0x800000;
                auVar231._0_8_ = 0x80000000800000;
                auVar231._12_4_ = 0x800000;
                auVar231._16_4_ = 0x800000;
                auVar231._20_4_ = 0x800000;
                auVar231._24_4_ = 0x800000;
                auVar231._28_4_ = 0x800000;
                auVar230 = vmaxps_avx512vl(ZEXT1632(auVar173),auVar231);
                auVar423 = vpsrld_avx2(auVar230,0x17);
                auVar493._8_4_ = 0x807fffff;
                auVar493._0_8_ = 0x807fffff807fffff;
                auVar493._12_4_ = 0x807fffff;
                auVar493._16_4_ = 0x807fffff;
                auVar493._20_4_ = 0x807fffff;
                auVar493._24_4_ = 0x807fffff;
                auVar493._28_4_ = 0x807fffff;
                auVar234._8_4_ = 0x3f000000;
                auVar234._0_8_ = 0x3f0000003f000000;
                auVar234._12_4_ = 0x3f000000;
                auVar234._16_4_ = 0x3f000000;
                auVar234._20_4_ = 0x3f000000;
                auVar234._24_4_ = 0x3f000000;
                auVar234._28_4_ = 0x3f000000;
                auVar230 = vpternlogd_avx512vl(auVar230,auVar493,auVar234,0xea);
                auVar235._8_4_ = 0x3f3504f3;
                auVar235._0_8_ = 0x3f3504f33f3504f3;
                auVar235._12_4_ = 0x3f3504f3;
                auVar235._16_4_ = 0x3f3504f3;
                auVar235._20_4_ = 0x3f3504f3;
                auVar235._24_4_ = 0x3f3504f3;
                auVar235._28_4_ = 0x3f3504f3;
                uVar163 = vcmpps_avx512vl(auVar230,auVar235,1);
                auVar232 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
                auVar231 = vaddps_avx512vl(auVar230,auVar232);
                auVar233 = vaddps_avx512vl(auVar231,auVar230);
                bVar15 = (bool)((byte)uVar163 & 1);
                auVar244._0_4_ =
                     (float)((uint)bVar15 * auVar233._0_4_ | (uint)!bVar15 * auVar231._0_4_);
                bVar15 = (bool)((byte)(uVar163 >> 1) & 1);
                auVar244._4_4_ =
                     (float)((uint)bVar15 * auVar233._4_4_ | (uint)!bVar15 * auVar231._4_4_);
                bVar15 = (bool)((byte)(uVar163 >> 2) & 1);
                auVar244._8_4_ =
                     (float)((uint)bVar15 * auVar233._8_4_ | (uint)!bVar15 * auVar231._8_4_);
                bVar15 = (bool)((byte)(uVar163 >> 3) & 1);
                auVar244._12_4_ =
                     (float)((uint)bVar15 * auVar233._12_4_ | (uint)!bVar15 * auVar231._12_4_);
                bVar15 = (bool)((byte)(uVar163 >> 4) & 1);
                auVar244._16_4_ =
                     (float)((uint)bVar15 * auVar233._16_4_ | (uint)!bVar15 * auVar231._16_4_);
                bVar15 = (bool)((byte)(uVar163 >> 5) & 1);
                auVar244._20_4_ =
                     (float)((uint)bVar15 * auVar233._20_4_ | (uint)!bVar15 * auVar231._20_4_);
                bVar15 = (bool)((byte)(uVar163 >> 6) & 1);
                auVar244._24_4_ =
                     (float)((uint)bVar15 * auVar233._24_4_ | (uint)!bVar15 * auVar231._24_4_);
                bVar15 = SUB81(uVar163 >> 7,0);
                auVar244._28_4_ = (uint)bVar15 * auVar233._28_4_ | (uint)!bVar15 * auVar231._28_4_;
                auVar111._4_4_ = auVar244._4_4_ * auVar244._4_4_;
                auVar111._0_4_ = auVar244._0_4_ * auVar244._0_4_;
                auVar111._8_4_ = auVar244._8_4_ * auVar244._8_4_;
                auVar111._12_4_ = auVar244._12_4_ * auVar244._12_4_;
                auVar111._16_4_ = auVar244._16_4_ * auVar244._16_4_;
                auVar111._20_4_ = auVar244._20_4_ * auVar244._20_4_;
                auVar111._24_4_ = auVar244._24_4_ * auVar244._24_4_;
                auVar111._28_4_ = auVar230._28_4_;
                auVar230 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
                auVar236._8_4_ = 0xbdebd1b8;
                auVar236._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar236._12_4_ = 0xbdebd1b8;
                auVar236._16_4_ = 0xbdebd1b8;
                auVar236._20_4_ = 0xbdebd1b8;
                auVar236._24_4_ = 0xbdebd1b8;
                auVar236._28_4_ = 0xbdebd1b8;
                auVar230 = vfmadd213ps_avx512vl(auVar230,auVar244,auVar236);
                auVar237._8_4_ = 0x3def251a;
                auVar237._0_8_ = 0x3def251a3def251a;
                auVar237._12_4_ = 0x3def251a;
                auVar237._16_4_ = 0x3def251a;
                auVar237._20_4_ = 0x3def251a;
                auVar237._24_4_ = 0x3def251a;
                auVar237._28_4_ = 0x3def251a;
                auVar230 = vfmadd213ps_avx512vl(auVar230,auVar244,auVar237);
                auVar238._8_4_ = 0xbdfe5d4f;
                auVar238._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar238._12_4_ = 0xbdfe5d4f;
                auVar238._16_4_ = 0xbdfe5d4f;
                auVar238._20_4_ = 0xbdfe5d4f;
                auVar238._24_4_ = 0xbdfe5d4f;
                auVar238._28_4_ = 0xbdfe5d4f;
                auVar230 = vfmadd213ps_avx512vl(auVar230,auVar244,auVar238);
                auVar239._8_4_ = 0x3e11e9bf;
                auVar239._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar239._12_4_ = 0x3e11e9bf;
                auVar239._16_4_ = 0x3e11e9bf;
                auVar239._20_4_ = 0x3e11e9bf;
                auVar239._24_4_ = 0x3e11e9bf;
                auVar239._28_4_ = 0x3e11e9bf;
                auVar230 = vfmadd213ps_avx512vl(auVar230,auVar244,auVar239);
                auVar240._8_4_ = 0xbe2aae50;
                auVar240._0_8_ = 0xbe2aae50be2aae50;
                auVar240._12_4_ = 0xbe2aae50;
                auVar240._16_4_ = 0xbe2aae50;
                auVar240._20_4_ = 0xbe2aae50;
                auVar240._24_4_ = 0xbe2aae50;
                auVar240._28_4_ = 0xbe2aae50;
                auVar230 = vfmadd213ps_avx512vl(auVar230,auVar244,auVar240);
                auVar241._8_4_ = 0x3e4cceac;
                auVar241._0_8_ = 0x3e4cceac3e4cceac;
                auVar241._12_4_ = 0x3e4cceac;
                auVar241._16_4_ = 0x3e4cceac;
                auVar241._20_4_ = 0x3e4cceac;
                auVar241._24_4_ = 0x3e4cceac;
                auVar241._28_4_ = 0x3e4cceac;
                auVar230 = vfmadd213ps_avx512vl(auVar230,auVar244,auVar241);
                auVar242._8_4_ = 0xbe7ffffc;
                auVar242._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar242._12_4_ = 0xbe7ffffc;
                auVar242._16_4_ = 0xbe7ffffc;
                auVar242._20_4_ = 0xbe7ffffc;
                auVar242._24_4_ = 0xbe7ffffc;
                auVar242._28_4_ = 0xbe7ffffc;
                auVar230 = vfmadd213ps_avx512vl(auVar230,auVar244,auVar242);
                auVar63._8_4_ = 0x3eaaaaaa;
                auVar63._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar63._12_4_ = 0x3eaaaaaa;
                auVar63._16_4_ = 0x3eaaaaaa;
                auVar63._20_4_ = 0x3eaaaaaa;
                auVar63._24_4_ = 0x3eaaaaaa;
                auVar63._28_4_ = 0x3eaaaaaa;
                auVar230 = vfmadd213ps_avx512vl(auVar230,auVar244,auVar63);
                auVar231 = vmulps_avx512vl(auVar111,auVar244);
                auVar231 = vmulps_avx512vl(auVar231,auVar230);
                auVar64._8_4_ = 0xffffff82;
                auVar64._0_8_ = 0xffffff82ffffff82;
                auVar64._12_4_ = 0xffffff82;
                auVar64._16_4_ = 0xffffff82;
                auVar64._20_4_ = 0xffffff82;
                auVar64._24_4_ = 0xffffff82;
                auVar64._28_4_ = 0xffffff82;
                auVar230 = vpaddd_avx512vl(auVar423,auVar64);
                auVar230 = vcvtdq2ps_avx(auVar230);
                auVar233 = vsubps_avx512vl(auVar230,auVar253);
                bVar15 = (bool)((byte)uVar163 & 1);
                auVar245._0_4_ = (uint)bVar15 * auVar233._0_4_ | (uint)!bVar15 * auVar230._0_4_;
                bVar15 = (bool)((byte)(uVar163 >> 1) & 1);
                auVar245._4_4_ = (uint)bVar15 * auVar233._4_4_ | (uint)!bVar15 * auVar230._4_4_;
                bVar15 = (bool)((byte)(uVar163 >> 2) & 1);
                auVar245._8_4_ = (uint)bVar15 * auVar233._8_4_ | (uint)!bVar15 * auVar230._8_4_;
                bVar15 = (bool)((byte)(uVar163 >> 3) & 1);
                auVar245._12_4_ = (uint)bVar15 * auVar233._12_4_ | (uint)!bVar15 * auVar230._12_4_;
                bVar15 = (bool)((byte)(uVar163 >> 4) & 1);
                auVar245._16_4_ = (uint)bVar15 * auVar233._16_4_ | (uint)!bVar15 * auVar230._16_4_;
                bVar15 = (bool)((byte)(uVar163 >> 5) & 1);
                auVar245._20_4_ = (uint)bVar15 * auVar233._20_4_ | (uint)!bVar15 * auVar230._20_4_;
                bVar15 = (bool)((byte)(uVar163 >> 6) & 1);
                auVar245._24_4_ = (uint)bVar15 * auVar233._24_4_ | (uint)!bVar15 * auVar230._24_4_;
                bVar15 = SUB81(uVar163 >> 7,0);
                auVar245._28_4_ = (uint)bVar15 * auVar233._28_4_ | (uint)!bVar15 * auVar230._28_4_;
                auVar230 = vfmadd231ps_avx512vl(auVar231,auVar245,auVar260);
                auVar230 = vfmsub231ps_avx512vl(auVar230,auVar251,auVar111);
                auVar230 = vsubps_avx512vl(auVar230,auVar244);
                auVar173 = vfmsub231ps_fma(auVar230,auVar254,auVar245);
                auVar230 = vmulps_avx512vl(ZEXT1632(auVar173),auVar229);
                auVar231 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar246._0_4_ = (uint)bVar15 * auVar231._0_4_ | (uint)!bVar15 * auVar230._0_4_;
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar246._4_4_ = (uint)bVar15 * auVar231._4_4_ | (uint)!bVar15 * auVar230._4_4_;
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar246._8_4_ = (uint)bVar15 * auVar231._8_4_ | (uint)!bVar15 * auVar230._8_4_;
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar246._12_4_ = (uint)bVar15 * auVar231._12_4_ | (uint)!bVar15 * auVar230._12_4_;
                bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
                auVar246._16_4_ = (uint)bVar15 * auVar231._16_4_ | (uint)!bVar15 * auVar230._16_4_;
                bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
                auVar246._20_4_ = (uint)bVar15 * auVar231._20_4_ | (uint)!bVar15 * auVar230._20_4_;
                bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
                auVar246._24_4_ = (uint)bVar15 * auVar231._24_4_ | (uint)!bVar15 * auVar230._24_4_;
                bVar15 = SUB81(uVar147 >> 7,0);
                auVar246._28_4_ = (uint)bVar15 * auVar231._28_4_ | (uint)!bVar15 * auVar230._28_4_;
                auVar230 = vminps_avx(auVar246,auVar249);
                auVar230 = vmaxps_avx(auVar230,auVar250);
                auVar173 = vfmadd213ps_fma(auVar252,auVar230,auVar251);
                auVar231 = vroundps_avx(ZEXT1632(auVar173),1);
                uVar147 = vcmpps_avx512vl(ZEXT1632(auVar173),auVar231,1);
                auVar233 = vsubps_avx512vl(auVar231,auVar253);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar247._0_4_ =
                     (float)((uint)bVar15 * auVar233._0_4_ | (uint)!bVar15 * auVar231._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar247._4_4_ =
                     (float)((uint)bVar15 * auVar233._4_4_ | (uint)!bVar15 * auVar231._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar247._8_4_ =
                     (float)((uint)bVar15 * auVar233._8_4_ | (uint)!bVar15 * auVar231._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar247._12_4_ =
                     (float)((uint)bVar15 * auVar233._12_4_ | (uint)!bVar15 * auVar231._12_4_);
                bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
                auVar247._16_4_ =
                     (float)((uint)bVar15 * auVar233._16_4_ | (uint)!bVar15 * auVar231._16_4_);
                bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
                auVar247._20_4_ =
                     (float)((uint)bVar15 * auVar233._20_4_ | (uint)!bVar15 * auVar231._20_4_);
                bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
                auVar247._24_4_ =
                     (float)((uint)bVar15 * auVar233._24_4_ | (uint)!bVar15 * auVar231._24_4_);
                bVar15 = SUB81(uVar147 >> 7,0);
                auVar247._28_4_ =
                     (float)((uint)bVar15 * auVar233._28_4_ | (uint)!bVar15 * auVar231._28_4_);
                auVar173 = vfmsub231ps_fma(auVar230,auVar247,auVar254);
                auVar173 = vfnmsub231ps_fma(ZEXT1632(auVar173),auVar247,auVar260);
                auVar231 = ZEXT1632(auVar173);
                auVar230 = vfmadd213ps_avx512vl(auVar228,auVar231,auVar255);
                auVar230 = vfmadd213ps_avx512vl(auVar230,auVar231,auVar256);
                auVar230 = vfmadd213ps_avx512vl(auVar230,auVar231,auVar257);
                auVar231 = ZEXT1632(auVar173);
                auVar230 = vfmadd213ps_avx512vl(auVar230,auVar231,auVar258);
                auVar230 = vfmadd213ps_avx512vl(auVar230,auVar231,auVar251);
                auVar230 = vfmadd213ps_avx512vl
                                     (auVar230,ZEXT1632(CONCAT412(auVar173._12_4_ * auVar173._12_4_,
                                                                  CONCAT48(auVar173._8_4_ *
                                                                           auVar173._8_4_,
                                                                           CONCAT44(auVar173._4_4_ *
                                                                                    auVar173._4_4_,
                                                                                    auVar173._0_4_ *
                                                                                    auVar173._0_4_))
                                                                 )),auVar231);
                auVar231 = vaddps_avx512vl(auVar230,auVar253);
                auVar424._0_4_ = (int)auVar247._0_4_;
                auVar424._4_4_ = (int)auVar247._4_4_;
                auVar424._8_4_ = (int)auVar247._8_4_;
                auVar424._12_4_ = (int)auVar247._12_4_;
                auVar424._16_4_ = (int)auVar247._16_4_;
                auVar424._20_4_ = (int)auVar247._20_4_;
                auVar424._24_4_ = (int)auVar247._24_4_;
                auVar424._28_4_ = (int)auVar247._28_4_;
                auVar230 = vpslld_avx2(auVar424,0x17);
                auVar230 = vpaddd_avx2(auVar230,auVar259);
                auVar173 = vfmadd213ps_fma(auVar230,auVar231,auVar253);
                auVar231 = vrcpps_avx(ZEXT1632(auVar173));
                auVar173 = vfmsub213ps_fma(ZEXT1632(auVar173),auVar231,auVar253);
                auVar173 = vfnmadd132ps_fma(ZEXT1632(auVar173),auVar231,auVar231);
                auVar232 = vfnmadd213ps_avx512vl(ZEXT1632(auVar173),auVar229,auVar232);
                auVar230._4_4_ = auVar232._4_4_ * auVar282._4_4_;
                auVar230._0_4_ = auVar232._0_4_ * auVar282._0_4_;
                auVar230._8_4_ = auVar232._8_4_ * auVar282._8_4_;
                auVar230._12_4_ = auVar232._12_4_ * auVar282._12_4_;
                auVar230._16_4_ = auVar232._16_4_ * auVar282._16_4_;
                auVar230._20_4_ = auVar232._20_4_ * auVar282._20_4_;
                auVar230._24_4_ = auVar232._24_4_ * auVar282._24_4_;
                auVar230._28_4_ = auVar231._28_4_;
                break;
              case 6:
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar233._4_4_ = uVar10;
                auVar233._0_4_ = uVar10;
                auVar233._8_4_ = uVar10;
                auVar233._12_4_ = uVar10;
                auVar233._16_4_ = uVar10;
                auVar233._20_4_ = uVar10;
                auVar233._24_4_ = uVar10;
                auVar233._28_4_ = uVar10;
                uVar10 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var145))[1];
                auVar232._4_4_ = uVar10;
                auVar232._0_4_ = uVar10;
                auVar232._8_4_ = uVar10;
                auVar232._12_4_ = uVar10;
                auVar232._16_4_ = uVar10;
                auVar232._20_4_ = uVar10;
                auVar232._24_4_ = uVar10;
                auVar232._28_4_ = uVar10;
                auVar230 = vfmadd213ps_avx512vl(auVar233,auVar231,auVar232);
                auVar230 = vmaxps_avx512vl(auVar230,ZEXT1632(auVar172));
                auVar231 = vminps_avx(auVar230,auVar253);
                auVar230._4_4_ = auVar231._4_4_ * auVar282._4_4_;
                auVar230._0_4_ = auVar231._0_4_ * auVar282._0_4_;
                auVar230._8_4_ = auVar231._8_4_ * auVar282._8_4_;
                auVar230._12_4_ = auVar231._12_4_ * auVar282._12_4_;
                auVar230._16_4_ = auVar231._16_4_ * auVar282._16_4_;
                auVar230._20_4_ = auVar231._20_4_ * auVar282._20_4_;
                auVar230._24_4_ = auVar231._24_4_ * auVar282._24_4_;
                auVar230._28_4_ = auVar231._28_4_;
              }
            }
            *(undefined1 (*) [32])local_1c0 = auVar230;
            local_1c0 = local_1c0 + 4;
            iVar135 = iVar135 + 1;
          }
          uVar147 = (ulong)(uVar137 + 1);
        }
      }
    }
    afVar132 = _ps512_cephes_log_p8;
    afVar131 = _ps512_cephes_log_p7;
    afVar130 = _ps512_cephes_log_p6;
    afVar129 = _ps512_cephes_log_p5;
    afVar128 = _ps512_cephes_log_p4;
    afVar127 = _ps512_cephes_log_p3;
    afVar126 = _ps512_cephes_log_p2;
    afVar125 = _ps512_cephes_exp_p5;
    afVar124 = _ps512_cephes_exp_p4;
    afVar123 = _ps512_cephes_exp_p3;
    afVar122 = _ps512_cephes_exp_p2;
    afVar121 = _ps512_cephes_exp_p1;
    afVar120 = _ps512_cephes_exp_p0;
    afVar119 = _ps512_cephes_LOG2EF;
    afVar118 = _ps512_exp_lo;
    afVar117 = _ps512_exp_hi;
    afVar116 = _ps512_1;
    if ((iVar170 == 4) && (uVar150 == 0x10)) {
      p_Var145 = pp_Var149[-3];
      uVar171 = *(uint *)(&this->field_0xd4 + (long)p_Var145);
      uVar134 = *(uint *)(&this->field_0xd8 + (long)p_Var145);
      iVar156 = *(int *)(&this->field_0xdc + (long)p_Var145);
      iVar8 = *(int *)(&this->field_0xe0 + (long)p_Var145);
      iVar151 = *(int *)(&this->field_0xe4 + (long)p_Var145);
      iVar167 = *(int *)(&this->field_0xe8 + (long)p_Var145);
      uVar10 = *(undefined4 *)(&this->field_0x114 + (long)p_Var145);
      local_a8._0_8_ = p_Var145;
      lVar153 = *(long *)(&this->field_0x1a8 + (long)p_Var145);
      auVar282 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar283 = vxorps_avx512dq(auVar282,(undefined1  [64])_ps512_cephes_log_q2);
      auVar284 = vxorps_avx512dq(auVar282,(undefined1  [64])_ps512_cephes_log_q1);
      auVar285 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar302 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar282);
      uVar159 = 0;
      uVar164 = 0;
      if (0 < (int)uVar171) {
        uVar164 = (ulong)uVar171;
      }
      uVar157 = 0;
      if (0 < (int)uVar134) {
        uVar157 = (ulong)uVar134;
      }
      uVar154 = (ulong)(uint)local_f8.c;
      if (local_f8.c < 1) {
        uVar154 = uVar159;
      }
      auVar286 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar172 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
      in_ZMM30 = ZEXT1664(auVar172);
      auVar287 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      for (; uVar159 != uVar154; uVar159 = uVar159 + 1) {
        local_1c0 = (_func_int ***)
                    ((long)(_func_int ***)local_f8.data +
                    local_f8.cstep * uVar159 * local_f8.elemsize);
        iVar158 = bottom_blob->w;
        iVar143 = bottom_blob->h;
        uVar147 = 0;
        uVar148 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar148 = uVar147;
        }
        uVar138 = local_f8.w;
        if (local_f8.w < 1) {
          uVar138 = 0;
        }
        uVar155 = local_f8.h;
        if (local_f8.h < 1) {
          uVar155 = 0;
        }
        while (uVar137 = (uint)uVar147, uVar137 != uVar155) {
          iVar144 = (1 - uVar171) * iVar156;
          for (uVar139 = 0; uVar139 != uVar138; uVar139 = uVar139 + 1) {
            if (lVar153 == 0) {
              auVar288 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar288 = *(undefined1 (*) [64])(lVar153 + uVar159 * 0x40);
            }
            pvVar165 = bottom_blob->data;
            lVar168 = (long)(this->weight_data_tm).data +
                      (this->weight_data_tm).cstep * uVar159 * (this->weight_data_tm).elemsize +
                      0xc0;
            for (uVar147 = 0; uVar147 != uVar148; uVar147 = uVar147 + 1) {
              lVar169 = lVar168;
              for (uVar163 = 0; uVar163 != uVar157; uVar163 = uVar163 + 1) {
                iVar135 = (((int)uVar163 - uVar134) + 1) * iVar8 + uVar137;
                if (((-1 < iVar135) && (iVar136 = iVar135 / iVar167, iVar135 % iVar167 == 0)) &&
                   (iVar136 < iVar143)) {
                  lVar115 = (long)iVar136 * (long)bottom_blob->w * bottom_blob->elemsize +
                            bottom_blob->cstep * bottom_blob->elemsize * uVar147;
                  iVar135 = iVar144;
                  for (lVar161 = 0; uVar164 * 0x100 != lVar161; lVar161 = lVar161 + 0x100) {
                    if (((-1 < iVar135) && (iVar136 = iVar135 / iVar151, iVar135 % iVar151 == 0)) &&
                       (iVar136 < iVar158)) {
                      lVar146 = (long)(iVar136 << 2);
                      auVar289 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 + lVar146 * 4 + lVar115
                                                             )));
                      auVar290 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 4)));
                      auVar291 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 8)));
                      auVar292 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0xc)));
                      auVar288 = vfmadd231ps_avx512f(auVar288,auVar289,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0xc0 + lVar161));
                      auVar288 = vfmadd231ps_avx512f(auVar288,auVar290,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x80 + lVar161));
                      auVar288 = vfmadd231ps_avx512f(auVar288,auVar291,
                                                     *(undefined1 (*) [64])
                                                      (lVar169 + -0x40 + lVar161));
                      auVar288 = vfmadd231ps_avx512f(auVar288,auVar292,
                                                     *(undefined1 (*) [64])(lVar169 + lVar161));
                    }
                    iVar135 = iVar135 + iVar156;
                  }
                }
                lVar169 = lVar169 + (long)(int)uVar171 * 0x100;
              }
              lVar168 = lVar168 + (long)(int)(uVar171 * uVar134 * 0x40) * 4;
            }
            auVar312 = auVar288;
            switch(uVar10) {
            case 1:
              auVar312 = vmaxps_avx512f(auVar288,in_ZMM30);
              break;
            case 2:
              uVar147 = vcmpps_avx512f(auVar288,in_ZMM30,1);
              uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
              auVar106._4_4_ = uVar1;
              auVar106._0_4_ = uVar1;
              auVar106._8_4_ = uVar1;
              auVar106._12_4_ = uVar1;
              auVar106._16_4_ = uVar1;
              auVar106._20_4_ = uVar1;
              auVar106._24_4_ = uVar1;
              auVar106._28_4_ = uVar1;
              auVar106._32_4_ = uVar1;
              auVar106._36_4_ = uVar1;
              auVar106._40_4_ = uVar1;
              auVar106._44_4_ = uVar1;
              auVar106._48_4_ = uVar1;
              auVar106._52_4_ = uVar1;
              auVar106._56_4_ = uVar1;
              auVar106._60_4_ = uVar1;
              auVar289 = vmulps_avx512f(auVar288,auVar106);
              bVar15 = (bool)((byte)uVar147 & 1);
              auVar312._0_4_ = (uint)bVar15 * auVar289._0_4_ | (uint)!bVar15 * auVar288._0_4_;
              bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
              auVar312._4_4_ = (uint)bVar15 * auVar289._4_4_ | (uint)!bVar15 * auVar288._4_4_;
              bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
              auVar312._8_4_ = (uint)bVar15 * auVar289._8_4_ | (uint)!bVar15 * auVar288._8_4_;
              bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
              auVar312._12_4_ = (uint)bVar15 * auVar289._12_4_ | (uint)!bVar15 * auVar288._12_4_;
              bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
              auVar312._16_4_ = (uint)bVar15 * auVar289._16_4_ | (uint)!bVar15 * auVar288._16_4_;
              bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
              auVar312._20_4_ = (uint)bVar15 * auVar289._20_4_ | (uint)!bVar15 * auVar288._20_4_;
              bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
              auVar312._24_4_ = (uint)bVar15 * auVar289._24_4_ | (uint)!bVar15 * auVar288._24_4_;
              bVar15 = (bool)((byte)(uVar147 >> 7) & 1);
              auVar312._28_4_ = (uint)bVar15 * auVar289._28_4_ | (uint)!bVar15 * auVar288._28_4_;
              bVar15 = (bool)((byte)(uVar147 >> 8) & 1);
              auVar312._32_4_ = (uint)bVar15 * auVar289._32_4_ | (uint)!bVar15 * auVar288._32_4_;
              bVar15 = (bool)((byte)(uVar147 >> 9) & 1);
              auVar312._36_4_ = (uint)bVar15 * auVar289._36_4_ | (uint)!bVar15 * auVar288._36_4_;
              bVar15 = (bool)((byte)(uVar147 >> 10) & 1);
              auVar312._40_4_ = (uint)bVar15 * auVar289._40_4_ | (uint)!bVar15 * auVar288._40_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xb) & 1);
              auVar312._44_4_ = (uint)bVar15 * auVar289._44_4_ | (uint)!bVar15 * auVar288._44_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xc) & 1);
              auVar312._48_4_ = (uint)bVar15 * auVar289._48_4_ | (uint)!bVar15 * auVar288._48_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xd) & 1);
              auVar312._52_4_ = (uint)bVar15 * auVar289._52_4_ | (uint)!bVar15 * auVar288._52_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xe) & 1);
              auVar312._56_4_ = (uint)bVar15 * auVar289._56_4_ | (uint)!bVar15 * auVar288._56_4_;
              bVar15 = SUB81(uVar147 >> 0xf,0);
              auVar312._60_4_ = (uint)bVar15 * auVar289._60_4_ | (uint)!bVar15 * auVar288._60_4_;
              break;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
              auVar104._4_4_ = uVar1;
              auVar104._0_4_ = uVar1;
              auVar104._8_4_ = uVar1;
              auVar104._12_4_ = uVar1;
              auVar104._16_4_ = uVar1;
              auVar104._20_4_ = uVar1;
              auVar104._24_4_ = uVar1;
              auVar104._28_4_ = uVar1;
              auVar104._32_4_ = uVar1;
              auVar104._36_4_ = uVar1;
              auVar104._40_4_ = uVar1;
              auVar104._44_4_ = uVar1;
              auVar104._48_4_ = uVar1;
              auVar104._52_4_ = uVar1;
              auVar104._56_4_ = uVar1;
              auVar104._60_4_ = uVar1;
              auVar288 = vmaxps_avx512f(auVar288,auVar104);
              uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var145))[1];
              auVar105._4_4_ = uVar1;
              auVar105._0_4_ = uVar1;
              auVar105._8_4_ = uVar1;
              auVar105._12_4_ = uVar1;
              auVar105._16_4_ = uVar1;
              auVar105._20_4_ = uVar1;
              auVar105._24_4_ = uVar1;
              auVar105._28_4_ = uVar1;
              auVar105._32_4_ = uVar1;
              auVar105._36_4_ = uVar1;
              auVar105._40_4_ = uVar1;
              auVar105._44_4_ = uVar1;
              auVar105._48_4_ = uVar1;
              auVar105._52_4_ = uVar1;
              auVar105._56_4_ = uVar1;
              auVar105._60_4_ = uVar1;
              auVar312 = vminps_avx512f(auVar288,auVar105);
              break;
            case 4:
              auVar288 = vxorps_avx512dq(auVar288,auVar282);
              auVar288 = vminps_avx512f(auVar288,(undefined1  [64])afVar117);
              auVar288 = vmaxps_avx512f(auVar288,(undefined1  [64])afVar118);
              auVar289 = vfmadd213ps_avx512f((undefined1  [64])afVar119,auVar288,
                                             (undefined1  [64])afVar125);
              auVar290 = vrndscaleps_avx512f(auVar289,1);
              uVar147 = vcmpps_avx512f(auVar289,auVar290,1);
              auVar289 = vsubps_avx512f(auVar290,(undefined1  [64])afVar116);
              bVar15 = (bool)((byte)uVar147 & 1);
              auVar311._0_4_ = (uint)bVar15 * auVar289._0_4_ | (uint)!bVar15 * auVar290._0_4_;
              bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
              auVar311._4_4_ = (uint)bVar15 * auVar289._4_4_ | (uint)!bVar15 * auVar290._4_4_;
              bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
              auVar311._8_4_ = (uint)bVar15 * auVar289._8_4_ | (uint)!bVar15 * auVar290._8_4_;
              bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
              auVar311._12_4_ = (uint)bVar15 * auVar289._12_4_ | (uint)!bVar15 * auVar290._12_4_;
              bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
              auVar311._16_4_ = (uint)bVar15 * auVar289._16_4_ | (uint)!bVar15 * auVar290._16_4_;
              bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
              auVar311._20_4_ = (uint)bVar15 * auVar289._20_4_ | (uint)!bVar15 * auVar290._20_4_;
              bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
              auVar311._24_4_ = (uint)bVar15 * auVar289._24_4_ | (uint)!bVar15 * auVar290._24_4_;
              bVar15 = (bool)((byte)(uVar147 >> 7) & 1);
              auVar311._28_4_ = (uint)bVar15 * auVar289._28_4_ | (uint)!bVar15 * auVar290._28_4_;
              bVar15 = (bool)((byte)(uVar147 >> 8) & 1);
              auVar311._32_4_ = (uint)bVar15 * auVar289._32_4_ | (uint)!bVar15 * auVar290._32_4_;
              bVar15 = (bool)((byte)(uVar147 >> 9) & 1);
              auVar311._36_4_ = (uint)bVar15 * auVar289._36_4_ | (uint)!bVar15 * auVar290._36_4_;
              bVar15 = (bool)((byte)(uVar147 >> 10) & 1);
              auVar311._40_4_ = (uint)bVar15 * auVar289._40_4_ | (uint)!bVar15 * auVar290._40_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xb) & 1);
              auVar311._44_4_ = (uint)bVar15 * auVar289._44_4_ | (uint)!bVar15 * auVar290._44_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xc) & 1);
              auVar311._48_4_ = (uint)bVar15 * auVar289._48_4_ | (uint)!bVar15 * auVar290._48_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xd) & 1);
              auVar311._52_4_ = (uint)bVar15 * auVar289._52_4_ | (uint)!bVar15 * auVar290._52_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xe) & 1);
              auVar311._56_4_ = (uint)bVar15 * auVar289._56_4_ | (uint)!bVar15 * auVar290._56_4_;
              bVar15 = SUB81(uVar147 >> 0xf,0);
              auVar311._60_4_ = (uint)bVar15 * auVar289._60_4_ | (uint)!bVar15 * auVar290._60_4_;
              auVar288 = vfmadd231ps_avx512f(auVar288,auVar311,auVar283);
              auVar288 = vfmadd231ps_avx512f(auVar288,auVar311,auVar284);
              auVar289 = vmulps_avx512f(auVar288,auVar288);
              auVar290 = vfmadd213ps_avx512f(auVar288,(undefined1  [64])afVar120,
                                             (undefined1  [64])afVar121);
              auVar290 = vfmadd213ps_avx512f(auVar290,auVar288,(undefined1  [64])afVar122);
              auVar290 = vfmadd213ps_avx512f(auVar290,auVar288,(undefined1  [64])afVar123);
              auVar290 = vfmadd213ps_avx512f(auVar290,auVar288,(undefined1  [64])afVar124);
              auVar290 = vfmadd213ps_avx512f(auVar290,auVar288,(undefined1  [64])afVar125);
              auVar288 = vfmadd213ps_avx512f(auVar290,auVar289,auVar288);
              auVar288 = vaddps_avx512f(auVar288,(undefined1  [64])afVar116);
              auVar289 = vcvttps2dq_avx512f(auVar311);
              auVar289 = vpaddd_avx512f(auVar289,auVar285);
              auVar289 = vpslld_avx512f(auVar289,0x17);
              auVar288 = vfmadd213ps_avx512f(auVar289,auVar288,auVar286);
              auVar289 = vrcp14ps_avx512f(auVar288);
              auVar288 = vfmsub213ps_avx512f(auVar288,auVar289,auVar286);
              auVar312 = vfnmadd132ps_avx512vl(auVar288,auVar289,auVar289);
              break;
            case 5:
              auVar289 = vminps_avx512f(auVar288,(undefined1  [64])afVar117);
              auVar289 = vmaxps_avx512f(auVar289,(undefined1  [64])afVar118);
              auVar290 = vfmadd213ps_avx512f((undefined1  [64])afVar119,auVar289,
                                             (undefined1  [64])afVar125);
              auVar291 = vrndscaleps_avx512f(auVar290,1);
              uVar147 = vcmpps_avx512f(auVar290,auVar291,1);
              auVar290 = vsubps_avx512f(auVar291,(undefined1  [64])afVar116);
              bVar15 = (bool)((byte)uVar147 & 1);
              auVar306._0_4_ = (uint)bVar15 * auVar290._0_4_ | (uint)!bVar15 * auVar291._0_4_;
              bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
              auVar306._4_4_ = (uint)bVar15 * auVar290._4_4_ | (uint)!bVar15 * auVar291._4_4_;
              bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
              auVar306._8_4_ = (uint)bVar15 * auVar290._8_4_ | (uint)!bVar15 * auVar291._8_4_;
              bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
              auVar306._12_4_ = (uint)bVar15 * auVar290._12_4_ | (uint)!bVar15 * auVar291._12_4_;
              bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
              auVar306._16_4_ = (uint)bVar15 * auVar290._16_4_ | (uint)!bVar15 * auVar291._16_4_;
              bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
              auVar306._20_4_ = (uint)bVar15 * auVar290._20_4_ | (uint)!bVar15 * auVar291._20_4_;
              bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
              auVar306._24_4_ = (uint)bVar15 * auVar290._24_4_ | (uint)!bVar15 * auVar291._24_4_;
              bVar15 = (bool)((byte)(uVar147 >> 7) & 1);
              auVar306._28_4_ = (uint)bVar15 * auVar290._28_4_ | (uint)!bVar15 * auVar291._28_4_;
              bVar15 = (bool)((byte)(uVar147 >> 8) & 1);
              auVar306._32_4_ = (uint)bVar15 * auVar290._32_4_ | (uint)!bVar15 * auVar291._32_4_;
              bVar15 = (bool)((byte)(uVar147 >> 9) & 1);
              auVar306._36_4_ = (uint)bVar15 * auVar290._36_4_ | (uint)!bVar15 * auVar291._36_4_;
              bVar15 = (bool)((byte)(uVar147 >> 10) & 1);
              auVar306._40_4_ = (uint)bVar15 * auVar290._40_4_ | (uint)!bVar15 * auVar291._40_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xb) & 1);
              auVar306._44_4_ = (uint)bVar15 * auVar290._44_4_ | (uint)!bVar15 * auVar291._44_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xc) & 1);
              auVar306._48_4_ = (uint)bVar15 * auVar290._48_4_ | (uint)!bVar15 * auVar291._48_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xd) & 1);
              auVar306._52_4_ = (uint)bVar15 * auVar290._52_4_ | (uint)!bVar15 * auVar291._52_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xe) & 1);
              auVar306._56_4_ = (uint)bVar15 * auVar290._56_4_ | (uint)!bVar15 * auVar291._56_4_;
              bVar15 = SUB81(uVar147 >> 0xf,0);
              auVar306._60_4_ = (uint)bVar15 * auVar290._60_4_ | (uint)!bVar15 * auVar291._60_4_;
              auVar289 = vfmadd231ps_avx512f(auVar289,auVar306,auVar283);
              auVar289 = vfmadd231ps_avx512f(auVar289,auVar306,auVar284);
              auVar290 = vmulps_avx512f(auVar289,auVar289);
              auVar291 = vfmadd213ps_avx512f(auVar289,(undefined1  [64])afVar120,
                                             (undefined1  [64])afVar121);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar122);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar123);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar124);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar125);
              auVar289 = vfmadd213ps_avx512f(auVar291,auVar290,auVar289);
              auVar289 = vaddps_avx512f(auVar289,(undefined1  [64])afVar116);
              auVar290 = vcvttps2dq_avx512f(auVar306);
              auVar290 = vpaddd_avx512f(auVar290,auVar285);
              auVar290 = vpslld_avx512f(auVar290,0x17);
              auVar289 = vfmadd213ps_avx512f(auVar290,auVar289,auVar286);
              auVar290 = vmaxps_avx512f(auVar289,(undefined1  [64])_ps512_min_norm_pos);
              auVar291 = vpsrld_avx512f(auVar290,0x17);
              auVar290 = vpternlogd_avx512f(auVar290,(undefined1  [64])afVar125,
                                            (undefined1  [64])_ps512_inv_mant_mask,0xec);
              uVar147 = vcmpps_avx512f(auVar290,(undefined1  [64])_ps512_cephes_SQRTHF,1);
              auVar292 = vsubps_avx512f(auVar290,(undefined1  [64])afVar116);
              auVar290 = vaddps_avx512f(auVar292,auVar290);
              bVar15 = (bool)((byte)uVar147 & 1);
              auVar307._0_4_ = (uint)bVar15 * auVar290._0_4_ | (uint)!bVar15 * auVar292._0_4_;
              bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
              auVar307._4_4_ = (uint)bVar15 * auVar290._4_4_ | (uint)!bVar15 * auVar292._4_4_;
              bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
              auVar307._8_4_ = (uint)bVar15 * auVar290._8_4_ | (uint)!bVar15 * auVar292._8_4_;
              bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
              auVar307._12_4_ = (uint)bVar15 * auVar290._12_4_ | (uint)!bVar15 * auVar292._12_4_;
              bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
              auVar307._16_4_ = (uint)bVar15 * auVar290._16_4_ | (uint)!bVar15 * auVar292._16_4_;
              bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
              auVar307._20_4_ = (uint)bVar15 * auVar290._20_4_ | (uint)!bVar15 * auVar292._20_4_;
              bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
              auVar307._24_4_ = (uint)bVar15 * auVar290._24_4_ | (uint)!bVar15 * auVar292._24_4_;
              bVar15 = (bool)((byte)(uVar147 >> 7) & 1);
              auVar307._28_4_ = (uint)bVar15 * auVar290._28_4_ | (uint)!bVar15 * auVar292._28_4_;
              bVar16 = (byte)(uVar147 >> 8);
              bVar15 = (bool)(bVar16 & 1);
              auVar307._32_4_ = (uint)bVar15 * auVar290._32_4_ | (uint)!bVar15 * auVar292._32_4_;
              bVar15 = (bool)((byte)(uVar147 >> 9) & 1);
              auVar307._36_4_ = (uint)bVar15 * auVar290._36_4_ | (uint)!bVar15 * auVar292._36_4_;
              bVar15 = (bool)((byte)(uVar147 >> 10) & 1);
              auVar307._40_4_ = (uint)bVar15 * auVar290._40_4_ | (uint)!bVar15 * auVar292._40_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xb) & 1);
              auVar307._44_4_ = (uint)bVar15 * auVar290._44_4_ | (uint)!bVar15 * auVar292._44_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xc) & 1);
              auVar307._48_4_ = (uint)bVar15 * auVar290._48_4_ | (uint)!bVar15 * auVar292._48_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xd) & 1);
              auVar307._52_4_ = (uint)bVar15 * auVar290._52_4_ | (uint)!bVar15 * auVar292._52_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xe) & 1);
              auVar307._56_4_ = (uint)bVar15 * auVar290._56_4_ | (uint)!bVar15 * auVar292._56_4_;
              bVar15 = SUB81(uVar147 >> 0xf,0);
              auVar307._60_4_ = (uint)bVar15 * auVar290._60_4_ | (uint)!bVar15 * auVar292._60_4_;
              auVar290 = vmulps_avx512f(auVar307,auVar307);
              auVar292 = vfmadd132ps_avx512f(auVar307,(undefined1  [64])_ps512_cephes_log_p1,
                                             (undefined1  [64])_ps512_cephes_log_p0);
              auVar292 = vfmadd213ps_avx512f(auVar292,auVar307,(undefined1  [64])afVar126);
              auVar292 = vfmadd213ps_avx512f(auVar292,auVar307,(undefined1  [64])afVar127);
              auVar292 = vfmadd213ps_avx512f(auVar292,auVar307,(undefined1  [64])afVar128);
              auVar292 = vfmadd213ps_avx512f(auVar292,auVar307,(undefined1  [64])afVar129);
              auVar292 = vfmadd213ps_avx512f(auVar292,auVar307,(undefined1  [64])afVar130);
              auVar292 = vfmadd213ps_avx512f(auVar292,auVar307,(undefined1  [64])afVar131);
              auVar292 = vfmadd213ps_avx512f(auVar292,auVar307,(undefined1  [64])afVar132);
              auVar293 = vmulps_avx512f(auVar290,auVar307);
              auVar292 = vfmadd213ps_avx512f(auVar293,auVar292,auVar307);
              uVar163 = vcmpps_avx512f(auVar289,in_ZMM30,2);
              auVar289 = vpsubd_avx512f(auVar291,auVar285);
              auVar289 = vcvtdq2ps_avx512f(auVar289);
              auVar291 = vaddps_avx512f(auVar289,(undefined1  [64])afVar116);
              bVar15 = (bool)((byte)uVar147 & 1);
              auVar308._0_4_ = (uint)bVar15 * auVar289._0_4_ | (uint)!bVar15 * auVar291._0_4_;
              bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
              auVar308._4_4_ = (uint)bVar15 * auVar289._4_4_ | (uint)!bVar15 * auVar291._4_4_;
              bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
              auVar308._8_4_ = (uint)bVar15 * auVar289._8_4_ | (uint)!bVar15 * auVar291._8_4_;
              bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
              auVar308._12_4_ = (uint)bVar15 * auVar289._12_4_ | (uint)!bVar15 * auVar291._12_4_;
              bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
              auVar308._16_4_ = (uint)bVar15 * auVar289._16_4_ | (uint)!bVar15 * auVar291._16_4_;
              bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
              auVar308._20_4_ = (uint)bVar15 * auVar289._20_4_ | (uint)!bVar15 * auVar291._20_4_;
              bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
              auVar308._24_4_ = (uint)bVar15 * auVar289._24_4_ | (uint)!bVar15 * auVar291._24_4_;
              bVar15 = (bool)((byte)(uVar147 >> 7) & 1);
              auVar308._28_4_ = (uint)bVar15 * auVar289._28_4_ | (uint)!bVar15 * auVar291._28_4_;
              bVar15 = (bool)(bVar16 & 1);
              auVar308._32_4_ = (uint)bVar15 * auVar289._32_4_ | (uint)!bVar15 * auVar291._32_4_;
              bVar15 = (bool)((byte)(uVar147 >> 9) & 1);
              auVar308._36_4_ = (uint)bVar15 * auVar289._36_4_ | (uint)!bVar15 * auVar291._36_4_;
              bVar15 = (bool)((byte)(uVar147 >> 10) & 1);
              auVar308._40_4_ = (uint)bVar15 * auVar289._40_4_ | (uint)!bVar15 * auVar291._40_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xb) & 1);
              auVar308._44_4_ = (uint)bVar15 * auVar289._44_4_ | (uint)!bVar15 * auVar291._44_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xc) & 1);
              auVar308._48_4_ = (uint)bVar15 * auVar289._48_4_ | (uint)!bVar15 * auVar291._48_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xd) & 1);
              auVar308._52_4_ = (uint)bVar15 * auVar289._52_4_ | (uint)!bVar15 * auVar291._52_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xe) & 1);
              auVar308._56_4_ = (uint)bVar15 * auVar289._56_4_ | (uint)!bVar15 * auVar291._56_4_;
              bVar15 = SUB81(uVar147 >> 0xf,0);
              auVar308._60_4_ = (uint)bVar15 * auVar289._60_4_ | (uint)!bVar15 * auVar291._60_4_;
              auVar289 = vfmadd231ps_avx512f(auVar292,auVar308,
                                             (undefined1  [64])_ps512_cephes_log_q1);
              auVar289 = vfmadd231ps_avx512f(auVar289,auVar302,auVar290);
              auVar289 = vfmadd231ps_avx512f(auVar289,auVar308,
                                             (undefined1  [64])_ps512_cephes_log_q2);
              auVar289 = vmulps_avx512f(auVar289,auVar287);
              auVar290 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
              bVar15 = (bool)((byte)uVar163 & 1);
              auVar309._0_4_ = (uint)bVar15 * auVar290._0_4_ | (uint)!bVar15 * auVar289._0_4_;
              bVar15 = (bool)((byte)(uVar163 >> 1) & 1);
              auVar309._4_4_ = (uint)bVar15 * auVar290._4_4_ | (uint)!bVar15 * auVar289._4_4_;
              bVar15 = (bool)((byte)(uVar163 >> 2) & 1);
              auVar309._8_4_ = (uint)bVar15 * auVar290._8_4_ | (uint)!bVar15 * auVar289._8_4_;
              bVar15 = (bool)((byte)(uVar163 >> 3) & 1);
              auVar309._12_4_ = (uint)bVar15 * auVar290._12_4_ | (uint)!bVar15 * auVar289._12_4_;
              bVar15 = (bool)((byte)(uVar163 >> 4) & 1);
              auVar309._16_4_ = (uint)bVar15 * auVar290._16_4_ | (uint)!bVar15 * auVar289._16_4_;
              bVar15 = (bool)((byte)(uVar163 >> 5) & 1);
              auVar309._20_4_ = (uint)bVar15 * auVar290._20_4_ | (uint)!bVar15 * auVar289._20_4_;
              bVar15 = (bool)((byte)(uVar163 >> 6) & 1);
              auVar309._24_4_ = (uint)bVar15 * auVar290._24_4_ | (uint)!bVar15 * auVar289._24_4_;
              bVar15 = (bool)((byte)(uVar163 >> 7) & 1);
              auVar309._28_4_ = (uint)bVar15 * auVar290._28_4_ | (uint)!bVar15 * auVar289._28_4_;
              bVar15 = (bool)((byte)(uVar163 >> 8) & 1);
              auVar309._32_4_ = (uint)bVar15 * auVar290._32_4_ | (uint)!bVar15 * auVar289._32_4_;
              bVar15 = (bool)((byte)(uVar163 >> 9) & 1);
              auVar309._36_4_ = (uint)bVar15 * auVar290._36_4_ | (uint)!bVar15 * auVar289._36_4_;
              bVar15 = (bool)((byte)(uVar163 >> 10) & 1);
              auVar309._40_4_ = (uint)bVar15 * auVar290._40_4_ | (uint)!bVar15 * auVar289._40_4_;
              bVar15 = (bool)((byte)(uVar163 >> 0xb) & 1);
              auVar309._44_4_ = (uint)bVar15 * auVar290._44_4_ | (uint)!bVar15 * auVar289._44_4_;
              bVar15 = (bool)((byte)(uVar163 >> 0xc) & 1);
              auVar309._48_4_ = (uint)bVar15 * auVar290._48_4_ | (uint)!bVar15 * auVar289._48_4_;
              bVar15 = (bool)((byte)(uVar163 >> 0xd) & 1);
              auVar309._52_4_ = (uint)bVar15 * auVar290._52_4_ | (uint)!bVar15 * auVar289._52_4_;
              bVar15 = (bool)((byte)(uVar163 >> 0xe) & 1);
              auVar309._56_4_ = (uint)bVar15 * auVar290._56_4_ | (uint)!bVar15 * auVar289._56_4_;
              bVar15 = SUB81(uVar163 >> 0xf,0);
              auVar309._60_4_ = (uint)bVar15 * auVar290._60_4_ | (uint)!bVar15 * auVar289._60_4_;
              auVar289 = vminps_avx512f(auVar309,(undefined1  [64])afVar117);
              auVar289 = vmaxps_avx512f(auVar289,(undefined1  [64])afVar118);
              auVar290 = vfmadd213ps_avx512f((undefined1  [64])afVar119,auVar289,
                                             (undefined1  [64])afVar125);
              auVar291 = vrndscaleps_avx512f(auVar290,1);
              uVar147 = vcmpps_avx512f(auVar290,auVar291,1);
              auVar290 = vsubps_avx512f(auVar291,(undefined1  [64])afVar116);
              bVar15 = (bool)((byte)uVar147 & 1);
              auVar310._0_4_ = (uint)bVar15 * auVar290._0_4_ | (uint)!bVar15 * auVar291._0_4_;
              bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
              auVar310._4_4_ = (uint)bVar15 * auVar290._4_4_ | (uint)!bVar15 * auVar291._4_4_;
              bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
              auVar310._8_4_ = (uint)bVar15 * auVar290._8_4_ | (uint)!bVar15 * auVar291._8_4_;
              bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
              auVar310._12_4_ = (uint)bVar15 * auVar290._12_4_ | (uint)!bVar15 * auVar291._12_4_;
              bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
              auVar310._16_4_ = (uint)bVar15 * auVar290._16_4_ | (uint)!bVar15 * auVar291._16_4_;
              bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
              auVar310._20_4_ = (uint)bVar15 * auVar290._20_4_ | (uint)!bVar15 * auVar291._20_4_;
              bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
              auVar310._24_4_ = (uint)bVar15 * auVar290._24_4_ | (uint)!bVar15 * auVar291._24_4_;
              bVar15 = (bool)((byte)(uVar147 >> 7) & 1);
              auVar310._28_4_ = (uint)bVar15 * auVar290._28_4_ | (uint)!bVar15 * auVar291._28_4_;
              bVar15 = (bool)((byte)(uVar147 >> 8) & 1);
              auVar310._32_4_ = (uint)bVar15 * auVar290._32_4_ | (uint)!bVar15 * auVar291._32_4_;
              bVar15 = (bool)((byte)(uVar147 >> 9) & 1);
              auVar310._36_4_ = (uint)bVar15 * auVar290._36_4_ | (uint)!bVar15 * auVar291._36_4_;
              bVar15 = (bool)((byte)(uVar147 >> 10) & 1);
              auVar310._40_4_ = (uint)bVar15 * auVar290._40_4_ | (uint)!bVar15 * auVar291._40_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xb) & 1);
              auVar310._44_4_ = (uint)bVar15 * auVar290._44_4_ | (uint)!bVar15 * auVar291._44_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xc) & 1);
              auVar310._48_4_ = (uint)bVar15 * auVar290._48_4_ | (uint)!bVar15 * auVar291._48_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xd) & 1);
              auVar310._52_4_ = (uint)bVar15 * auVar290._52_4_ | (uint)!bVar15 * auVar291._52_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xe) & 1);
              auVar310._56_4_ = (uint)bVar15 * auVar290._56_4_ | (uint)!bVar15 * auVar291._56_4_;
              bVar15 = SUB81(uVar147 >> 0xf,0);
              auVar310._60_4_ = (uint)bVar15 * auVar290._60_4_ | (uint)!bVar15 * auVar291._60_4_;
              auVar289 = vfmadd231ps_avx512f(auVar289,auVar310,auVar283);
              auVar289 = vfmadd231ps_avx512f(auVar289,auVar310,auVar284);
              auVar290 = vmulps_avx512f(auVar289,auVar289);
              auVar291 = vfmadd213ps_avx512f(auVar289,(undefined1  [64])afVar120,
                                             (undefined1  [64])afVar121);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar122);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar123);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar124);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar125);
              auVar289 = vfmadd213ps_avx512f(auVar291,auVar290,auVar289);
              auVar289 = vaddps_avx512f(auVar289,(undefined1  [64])afVar116);
              auVar290 = vcvttps2dq_avx512f(auVar310);
              auVar290 = vpaddd_avx512f(auVar290,auVar285);
              auVar290 = vpslld_avx512f(auVar290,0x17);
              auVar289 = vfmadd213ps_avx512f(auVar290,auVar289,auVar286);
              auVar290 = vrcp14ps_avx512f(auVar289);
              auVar289 = vfmsub213ps_avx512f(auVar289,auVar290,auVar286);
              auVar289 = vfnmadd132ps_avx512vl(auVar289,auVar290,auVar290);
              auVar289 = vfnmsub213ps_avx512f(auVar289,auVar287,auVar286);
              auVar312 = vmulps_avx512f(auVar289,auVar288);
              break;
            case 6:
              auVar289 = vbroadcastss_avx512f
                                   (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var145)));
              uVar141 = (*(uint **)(&this->field_0x118 + (long)p_Var145))[1];
              auVar103._4_4_ = uVar141;
              auVar103._0_4_ = uVar141;
              auVar103._8_4_ = uVar141;
              auVar103._12_4_ = uVar141;
              auVar103._16_4_ = uVar141;
              auVar103._20_4_ = uVar141;
              auVar103._24_4_ = uVar141;
              auVar103._28_4_ = uVar141;
              auVar103._32_4_ = uVar141;
              auVar103._36_4_ = uVar141;
              auVar103._40_4_ = uVar141;
              auVar103._44_4_ = uVar141;
              auVar103._48_4_ = uVar141;
              auVar103._52_4_ = uVar141;
              auVar103._56_4_ = uVar141;
              auVar103._60_4_ = uVar141;
              auVar289 = vfmadd213ps_avx512f(auVar289,auVar288,auVar103);
              auVar289 = vmaxps_avx512f(auVar289,in_ZMM30);
              auVar289 = vminps_avx512f(auVar289,auVar286);
              auVar312 = vmulps_avx512f(auVar289,auVar288);
            }
            *(undefined1 (*) [64])local_1c0 = auVar312;
            local_1c0 = local_1c0 + 8;
            iVar144 = iVar144 + 1;
          }
          uVar147 = (ulong)(uVar137 + 1);
        }
      }
    }
    if ((iVar170 == 0x10) && (uVar150 == 4)) {
      p_Var145 = pp_Var149[-3];
      uVar171 = *(uint *)(&this->field_0xd4 + (long)p_Var145);
      uVar134 = *(uint *)(&this->field_0xd8 + (long)p_Var145);
      iVar156 = *(int *)(&this->field_0xdc + (long)p_Var145);
      iVar8 = *(int *)(&this->field_0xe0 + (long)p_Var145);
      iVar151 = *(int *)(&this->field_0xe4 + (long)p_Var145);
      iVar167 = *(int *)(&this->field_0xe8 + (long)p_Var145);
      iVar158 = *(int *)(&this->field_0x114 + (long)p_Var145);
      local_a8._0_8_ = p_Var145;
      lVar153 = *(long *)(&this->field_0x1a8 + (long)p_Var145);
      uVar159 = 0;
      uVar164 = 0;
      if (0 < (int)uVar171) {
        uVar164 = (ulong)uVar171;
      }
      uVar157 = 0;
      if (0 < (int)uVar134) {
        uVar157 = (ulong)uVar134;
      }
      uVar154 = (ulong)(uint)local_f8.c;
      if (local_f8.c < 1) {
        uVar154 = uVar159;
      }
      auVar195._8_4_ = 0x42b0c0a5;
      auVar195._0_8_ = 0x42b0c0a542b0c0a5;
      auVar195._12_4_ = 0x42b0c0a5;
      auVar196._8_4_ = 0xc2b0c0a5;
      auVar196._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar196._12_4_ = 0xc2b0c0a5;
      auVar197._8_4_ = 0x3f000000;
      auVar197._0_8_ = 0x3f0000003f000000;
      auVar197._12_4_ = 0x3f000000;
      auVar198._8_4_ = 0x3fb8aa3b;
      auVar198._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar198._12_4_ = 0x3fb8aa3b;
      auVar199._8_4_ = 0x3f800000;
      auVar199._0_8_ = 0x3f8000003f800000;
      auVar199._12_4_ = 0x3f800000;
      auVar200._8_4_ = 0x3f318000;
      auVar200._0_8_ = 0x3f3180003f318000;
      auVar200._12_4_ = 0x3f318000;
      auVar172 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar201._8_4_ = 0x3ab743ce;
      auVar201._0_8_ = 0x3ab743ce3ab743ce;
      auVar201._12_4_ = 0x3ab743ce;
      auVar202._8_4_ = 0x3c088908;
      auVar202._0_8_ = 0x3c0889083c088908;
      auVar202._12_4_ = 0x3c088908;
      auVar206._8_4_ = 0x3d2aa9c1;
      auVar206._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar206._12_4_ = 0x3d2aa9c1;
      auVar203._8_4_ = 0x3e2aaaaa;
      auVar203._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar203._12_4_ = 0x3e2aaaaa;
      auVar204._8_4_ = 0x3f800000;
      auVar204._0_8_ = 0x3f8000003f800000;
      auVar204._12_4_ = 0x3f800000;
      auVar205._8_4_ = 0xb95e8083;
      auVar205._0_8_ = 0xb95e8083b95e8083;
      auVar205._12_4_ = 0xb95e8083;
      auVar173 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
      in_ZMM30 = ZEXT1664(auVar173);
      auVar174 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      for (; uVar159 != uVar154; uVar159 = uVar159 + 1) {
        local_1c0 = (_func_int ***)
                    ((long)(_func_int ***)local_f8.data +
                    local_f8.cstep * uVar159 * local_f8.elemsize);
        iVar143 = bottom_blob->w;
        iVar144 = bottom_blob->h;
        uVar147 = 0;
        uVar148 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar148 = uVar147;
        }
        uVar138 = local_f8.w;
        if (local_f8.w < 1) {
          uVar138 = 0;
        }
        uVar155 = local_f8.h;
        if (local_f8.h < 1) {
          uVar155 = 0;
        }
        while (uVar137 = (uint)uVar147, uVar137 != uVar155) {
          iVar135 = (1 - uVar171) * iVar156;
          for (uVar139 = 0; uVar139 != uVar138; uVar139 = uVar139 + 1) {
            if (lVar153 == 0) {
              auVar188 = ZEXT816(0) << 0x40;
            }
            else {
              auVar188 = *(undefined1 (*) [16])(lVar153 + uVar159 * 0x10);
            }
            auVar282 = ZEXT1664(auVar188);
            pvVar165 = bottom_blob->data;
            lVar168 = (long)(this->weight_data_tm).data +
                      (this->weight_data_tm).cstep * uVar159 * (this->weight_data_tm).elemsize +
                      0xf0;
            for (uVar147 = 0; uVar147 != uVar148; uVar147 = uVar147 + 1) {
              lVar169 = lVar168;
              for (uVar163 = 0; uVar163 != uVar157; uVar163 = uVar163 + 1) {
                iVar136 = (((int)uVar163 - uVar134) + 1) * iVar8 + uVar137;
                if (((-1 < iVar136) && (iVar140 = iVar136 / iVar167, iVar136 % iVar167 == 0)) &&
                   (iVar140 < iVar144)) {
                  lVar115 = (long)iVar140 * (long)bottom_blob->w * bottom_blob->elemsize +
                            bottom_blob->cstep * bottom_blob->elemsize * uVar147;
                  iVar136 = iVar135;
                  for (lVar161 = 0; uVar164 * 0x100 != lVar161; lVar161 = lVar161 + 0x100) {
                    if (((-1 < iVar136) && (iVar140 = iVar136 / iVar151, iVar136 % iVar151 == 0)) &&
                       (iVar140 < iVar143)) {
                      lVar146 = (long)(iVar140 << 4);
                      uVar10 = *(undefined4 *)((long)pvVar165 + lVar146 * 4 + lVar115);
                      auVar188._4_4_ = uVar10;
                      auVar188._0_4_ = uVar10;
                      auVar188._8_4_ = uVar10;
                      auVar188._12_4_ = uVar10;
                      uVar10 = *(undefined4 *)((long)pvVar165 + lVar146 * 4 + lVar115 + 4);
                      auVar406._4_4_ = uVar10;
                      auVar406._0_4_ = uVar10;
                      auVar406._8_4_ = uVar10;
                      auVar406._12_4_ = uVar10;
                      uVar10 = *(undefined4 *)((long)pvVar165 + lVar146 * 4 + lVar115 + 8);
                      auVar469._4_4_ = uVar10;
                      auVar469._0_4_ = uVar10;
                      auVar469._8_4_ = uVar10;
                      auVar469._12_4_ = uVar10;
                      auVar175 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0xc)));
                      auVar176 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x10)));
                      auVar177 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x14)));
                      auVar178 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x18)));
                      auVar179 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x1c)));
                      auVar180 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x20)));
                      auVar181 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x24)));
                      auVar182 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x28)));
                      auVar183 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x2c)));
                      auVar184 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x30)));
                      auVar185 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x34)));
                      auVar186 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x38)));
                      auVar187 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x3c)));
                      auVar188 = vfmadd231ps_fma(auVar282._0_16_,auVar188,
                                                 *(undefined1 (*) [16])(lVar169 + -0xf0 + lVar161));
                      auVar188 = vfmadd231ps_fma(auVar188,auVar406,
                                                 *(undefined1 (*) [16])(lVar169 + -0xe0 + lVar161));
                      auVar188 = vfmadd231ps_fma(auVar188,auVar469,
                                                 *(undefined1 (*) [16])(lVar169 + -0xd0 + lVar161));
                      auVar188 = vfmadd231ps_avx512vl
                                           (auVar188,auVar175,
                                            *(undefined1 (*) [16])(lVar169 + -0xc0 + lVar161));
                      auVar188 = vfmadd231ps_avx512vl
                                           (auVar188,auVar176,
                                            *(undefined1 (*) [16])(lVar169 + -0xb0 + lVar161));
                      auVar188 = vfmadd231ps_avx512vl
                                           (auVar188,auVar177,
                                            *(undefined1 (*) [16])(lVar169 + -0xa0 + lVar161));
                      auVar188 = vfmadd231ps_avx512vl
                                           (auVar188,auVar178,
                                            *(undefined1 (*) [16])(lVar169 + -0x90 + lVar161));
                      auVar188 = vfmadd231ps_avx512vl
                                           (auVar188,auVar179,
                                            *(undefined1 (*) [16])(lVar169 + -0x80 + lVar161));
                      auVar188 = vfmadd231ps_avx512vl
                                           (auVar188,auVar180,
                                            *(undefined1 (*) [16])(lVar169 + -0x70 + lVar161));
                      auVar188 = vfmadd231ps_avx512vl
                                           (auVar188,auVar181,
                                            *(undefined1 (*) [16])(lVar169 + -0x60 + lVar161));
                      auVar188 = vfmadd231ps_avx512vl
                                           (auVar188,auVar182,
                                            *(undefined1 (*) [16])(lVar169 + -0x50 + lVar161));
                      auVar188 = vfmadd231ps_avx512vl
                                           (auVar188,auVar183,
                                            *(undefined1 (*) [16])(lVar169 + -0x40 + lVar161));
                      auVar188 = vfmadd231ps_avx512vl
                                           (auVar188,auVar184,
                                            *(undefined1 (*) [16])(lVar169 + -0x30 + lVar161));
                      auVar188 = vfmadd231ps_avx512vl
                                           (auVar188,auVar185,
                                            *(undefined1 (*) [16])(lVar169 + -0x20 + lVar161));
                      auVar188 = vfmadd231ps_avx512vl
                                           (auVar188,auVar186,
                                            *(undefined1 (*) [16])(lVar169 + -0x10 + lVar161));
                      auVar188 = vfmadd231ps_avx512vl
                                           (auVar188,auVar187,
                                            *(undefined1 (*) [16])(lVar169 + lVar161));
                      auVar282 = ZEXT1664(auVar188);
                    }
                    iVar136 = iVar136 + iVar156;
                  }
                }
                lVar169 = lVar169 + (long)(int)uVar171 * 0x100;
              }
              lVar168 = lVar168 + (long)(int)(uVar171 * uVar134 * 0x40) * 4;
            }
            auVar188 = auVar282._0_16_;
            auVar175 = auVar188;
            if (iVar158 - 1U < 6) {
              auVar175 = vmaxps_avx512vl(auVar188,auVar173);
              switch(iVar158) {
              case 2:
                auVar188 = vminps_avx512vl(auVar188,auVar173);
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar25._4_4_ = uVar10;
                auVar25._0_4_ = uVar10;
                auVar25._8_4_ = uVar10;
                auVar25._12_4_ = uVar10;
                auVar175 = vfmadd231ps_avx512vl(auVar175,auVar188,auVar25);
                break;
              case 3:
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar23._4_4_ = uVar10;
                auVar23._0_4_ = uVar10;
                auVar23._8_4_ = uVar10;
                auVar23._12_4_ = uVar10;
                auVar188 = vmaxps_avx512vl(auVar188,auVar23);
                uVar10 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var145))[1];
                auVar24._4_4_ = uVar10;
                auVar24._0_4_ = uVar10;
                auVar24._8_4_ = uVar10;
                auVar24._12_4_ = uVar10;
                auVar175 = vminps_avx512vl(auVar188,auVar24);
                break;
              case 4:
                auVar21._8_4_ = 0x80000000;
                auVar21._0_8_ = 0x8000000080000000;
                auVar21._12_4_ = 0x80000000;
                auVar188 = vxorps_avx512vl(auVar188,auVar21);
                auVar188 = vminps_avx(auVar188,auVar195);
                auVar175 = vmaxps_avx(auVar188,auVar196);
                auVar176 = vfmadd231ps_fma(auVar197,auVar175,auVar198);
                auVar474._0_4_ = (int)auVar176._0_4_;
                auVar474._4_4_ = (int)auVar176._4_4_;
                auVar474._8_4_ = (int)auVar176._8_4_;
                auVar474._12_4_ = (int)auVar176._12_4_;
                auVar188 = vcvtdq2ps_avx(auVar474);
                uVar147 = vcmpps_avx512vl(auVar176,auVar188,1);
                auVar176 = vsubps_avx512vl(auVar188,auVar199);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar194._0_4_ =
                     (float)((uint)bVar15 * auVar176._0_4_ | (uint)!bVar15 * auVar188._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar194._4_4_ =
                     (float)((uint)bVar15 * auVar176._4_4_ | (uint)!bVar15 * auVar188._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar194._8_4_ =
                     (float)((uint)bVar15 * auVar176._8_4_ | (uint)!bVar15 * auVar188._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar194._12_4_ =
                     (float)((uint)bVar15 * auVar176._12_4_ | (uint)!bVar15 * auVar188._12_4_);
                auVar188 = vfmsub231ps_fma(auVar175,auVar194,auVar200);
                auVar22._8_4_ = 0x395e8083;
                auVar22._0_8_ = 0x395e8083395e8083;
                auVar22._12_4_ = 0x395e8083;
                auVar175 = vfmsub231ps_avx512vl(auVar188,auVar194,auVar22);
                auVar372._0_4_ = auVar175._0_4_ * auVar175._0_4_;
                auVar372._4_4_ = auVar175._4_4_ * auVar175._4_4_;
                auVar372._8_4_ = auVar175._8_4_ * auVar175._8_4_;
                auVar372._12_4_ = auVar175._12_4_ * auVar175._12_4_;
                auVar188 = vfmadd213ps_fma(auVar172,auVar175,auVar201);
                auVar188 = vfmadd213ps_fma(auVar188,auVar175,auVar202);
                auVar188 = vfmadd213ps_fma(auVar188,auVar175,auVar206);
                auVar188 = vfmadd213ps_fma(auVar188,auVar175,auVar203);
                auVar188 = vfmadd213ps_fma(auVar188,auVar175,auVar197);
                auVar188 = vfmadd213ps_fma(auVar188,auVar372,auVar175);
                auVar321._0_4_ = auVar188._0_4_ + 1.0;
                auVar321._4_4_ = auVar188._4_4_ + 1.0;
                auVar321._8_4_ = auVar188._8_4_ + 1.0;
                auVar321._12_4_ = auVar188._12_4_ + 1.0;
                auVar373._0_4_ = (int)auVar194._0_4_;
                auVar373._4_4_ = (int)auVar194._4_4_;
                auVar373._8_4_ = (int)auVar194._8_4_;
                auVar373._12_4_ = (int)auVar194._12_4_;
                auVar188 = vpslld_avx(auVar373,0x17);
                auVar188 = vpaddd_avx(auVar204,auVar188);
                auVar175 = vfmadd213ps_fma(auVar188,auVar321,auVar199);
                auVar188 = vrcpps_avx(auVar175);
                auVar175 = vfmsub213ps_fma(auVar175,auVar188,auVar199);
                auVar175 = vfnmadd132ps_fma(auVar175,auVar188,auVar188);
                break;
              case 5:
                auVar175 = vminps_avx(auVar188,auVar195);
                auVar176 = vmaxps_avx(auVar175,auVar196);
                auVar177 = vfmadd213ps_fma(auVar198,auVar176,auVar197);
                auVar470._0_4_ = (int)auVar177._0_4_;
                auVar470._4_4_ = (int)auVar177._4_4_;
                auVar470._8_4_ = (int)auVar177._8_4_;
                auVar470._12_4_ = (int)auVar177._12_4_;
                auVar175 = vcvtdq2ps_avx(auVar470);
                uVar147 = vcmpps_avx512vl(auVar177,auVar175,1);
                auVar177 = vsubps_avx512vl(auVar175,auVar199);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar189._0_4_ =
                     (float)((uint)bVar15 * auVar177._0_4_ | (uint)!bVar15 * auVar175._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar189._4_4_ =
                     (float)((uint)bVar15 * auVar177._4_4_ | (uint)!bVar15 * auVar175._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar189._8_4_ =
                     (float)((uint)bVar15 * auVar177._8_4_ | (uint)!bVar15 * auVar175._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar189._12_4_ =
                     (float)((uint)bVar15 * auVar177._12_4_ | (uint)!bVar15 * auVar175._12_4_);
                auVar175 = vfmsub231ps_fma(auVar176,auVar189,auVar200);
                auVar175 = vfnmsub231ps_fma(auVar175,auVar189,auVar205);
                auVar407._0_4_ = auVar175._0_4_ * auVar175._0_4_;
                auVar407._4_4_ = auVar175._4_4_ * auVar175._4_4_;
                auVar407._8_4_ = auVar175._8_4_ * auVar175._8_4_;
                auVar407._12_4_ = auVar175._12_4_ * auVar175._12_4_;
                auVar176 = vfmadd213ps_avx512vl(auVar172,auVar175,auVar201);
                auVar176 = vfmadd213ps_avx512vl(auVar176,auVar175,auVar202);
                auVar176 = vfmadd213ps_avx512vl(auVar176,auVar175,auVar206);
                auVar176 = vfmadd213ps_avx512vl(auVar176,auVar175,auVar203);
                auVar176 = vfmadd213ps_avx512vl(auVar176,auVar175,auVar197);
                auVar175 = vfmadd213ps_avx512vl(auVar176,auVar407,auVar175);
                auVar176 = vaddps_avx512vl(auVar175,auVar199);
                auVar408._0_4_ = (int)auVar189._0_4_;
                auVar408._4_4_ = (int)auVar189._4_4_;
                auVar408._8_4_ = (int)auVar189._8_4_;
                auVar408._12_4_ = (int)auVar189._12_4_;
                auVar175 = vpslld_avx(auVar408,0x17);
                auVar175 = vpaddd_avx(auVar175,auVar204);
                auVar175 = vfmadd213ps_fma(auVar175,auVar176,auVar199);
                uVar147 = vcmpps_avx512vl(auVar175,auVar173,2);
                auVar178._8_4_ = 0x800000;
                auVar178._0_8_ = 0x80000000800000;
                auVar178._12_4_ = 0x800000;
                auVar175 = vmaxps_avx512vl(auVar175,auVar178);
                auVar177 = vpsrld_avx(auVar175,0x17);
                auVar471._8_4_ = 0x807fffff;
                auVar471._0_8_ = 0x807fffff807fffff;
                auVar471._12_4_ = 0x807fffff;
                auVar179._8_4_ = 0x3f000000;
                auVar179._0_8_ = 0x3f0000003f000000;
                auVar179._12_4_ = 0x3f000000;
                auVar175 = vpternlogd_avx512vl(auVar175,auVar471,auVar179,0xea);
                auVar180._8_4_ = 0x3f3504f3;
                auVar180._0_8_ = 0x3f3504f33f3504f3;
                auVar180._12_4_ = 0x3f3504f3;
                uVar163 = vcmpps_avx512vl(auVar175,auVar180,1);
                auVar181._8_4_ = 0xbf800000;
                auVar181._0_8_ = 0xbf800000bf800000;
                auVar181._12_4_ = 0xbf800000;
                auVar176 = vaddps_avx512vl(auVar175,auVar181);
                auVar175 = vaddps_avx512vl(auVar176,auVar175);
                bVar15 = (bool)((byte)uVar163 & 1);
                auVar190._0_4_ =
                     (float)((uint)bVar15 * auVar175._0_4_ | (uint)!bVar15 * auVar176._0_4_);
                bVar15 = (bool)((byte)(uVar163 >> 1) & 1);
                auVar190._4_4_ =
                     (float)((uint)bVar15 * auVar175._4_4_ | (uint)!bVar15 * auVar176._4_4_);
                bVar15 = (bool)((byte)(uVar163 >> 2) & 1);
                auVar190._8_4_ =
                     (float)((uint)bVar15 * auVar175._8_4_ | (uint)!bVar15 * auVar176._8_4_);
                bVar15 = (bool)((byte)(uVar163 >> 3) & 1);
                auVar190._12_4_ =
                     (float)((uint)bVar15 * auVar175._12_4_ | (uint)!bVar15 * auVar176._12_4_);
                auVar370._0_4_ = auVar190._0_4_ * auVar190._0_4_;
                auVar370._4_4_ = auVar190._4_4_ * auVar190._4_4_;
                auVar370._8_4_ = auVar190._8_4_ * auVar190._8_4_;
                auVar370._12_4_ = auVar190._12_4_ * auVar190._12_4_;
                auVar175 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
                auVar182._8_4_ = 0xbdebd1b8;
                auVar182._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar182._12_4_ = 0xbdebd1b8;
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar190,auVar182);
                auVar183._8_4_ = 0x3def251a;
                auVar183._0_8_ = 0x3def251a3def251a;
                auVar183._12_4_ = 0x3def251a;
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar190,auVar183);
                auVar184._8_4_ = 0xbdfe5d4f;
                auVar184._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar184._12_4_ = 0xbdfe5d4f;
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar190,auVar184);
                auVar185._8_4_ = 0x3e11e9bf;
                auVar185._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar185._12_4_ = 0x3e11e9bf;
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar190,auVar185);
                auVar186._8_4_ = 0xbe2aae50;
                auVar186._0_8_ = 0xbe2aae50be2aae50;
                auVar186._12_4_ = 0xbe2aae50;
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar190,auVar186);
                auVar187._8_4_ = 0x3e4cceac;
                auVar187._0_8_ = 0x3e4cceac3e4cceac;
                auVar187._12_4_ = 0x3e4cceac;
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar190,auVar187);
                auVar18._8_4_ = 0xbe7ffffc;
                auVar18._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar18._12_4_ = 0xbe7ffffc;
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar190,auVar18);
                auVar19._8_4_ = 0x3eaaaaaa;
                auVar19._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar19._12_4_ = 0x3eaaaaaa;
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar190,auVar19);
                auVar176 = vmulps_avx512vl(auVar370,auVar190);
                auVar176 = vmulps_avx512vl(auVar176,auVar175);
                auVar20._8_4_ = 0xffffff82;
                auVar20._0_8_ = 0xffffff82ffffff82;
                auVar20._12_4_ = 0xffffff82;
                auVar175 = vpaddd_avx512vl(auVar177,auVar20);
                auVar175 = vcvtdq2ps_avx(auVar175);
                auVar177 = vsubps_avx512vl(auVar175,auVar199);
                bVar15 = (bool)((byte)uVar163 & 1);
                auVar191._0_4_ = (uint)bVar15 * auVar177._0_4_ | (uint)!bVar15 * auVar175._0_4_;
                bVar15 = (bool)((byte)(uVar163 >> 1) & 1);
                auVar191._4_4_ = (uint)bVar15 * auVar177._4_4_ | (uint)!bVar15 * auVar175._4_4_;
                bVar15 = (bool)((byte)(uVar163 >> 2) & 1);
                auVar191._8_4_ = (uint)bVar15 * auVar177._8_4_ | (uint)!bVar15 * auVar175._8_4_;
                bVar15 = (bool)((byte)(uVar163 >> 3) & 1);
                auVar191._12_4_ = (uint)bVar15 * auVar177._12_4_ | (uint)!bVar15 * auVar175._12_4_;
                auVar175 = vfmadd231ps_avx512vl(auVar176,auVar191,auVar205);
                auVar175 = vfmsub231ps_avx512vl(auVar175,auVar197,auVar370);
                auVar175 = vsubps_avx512vl(auVar175,auVar190);
                auVar175 = vfnmadd231ps_fma(auVar175,auVar200,auVar191);
                auVar176 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar192._0_4_ =
                     (uint)bVar15 * auVar176._0_4_ |
                     (uint)!bVar15 * (int)(auVar175._0_4_ + auVar175._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar192._4_4_ =
                     (uint)bVar15 * auVar176._4_4_ |
                     (uint)!bVar15 * (int)(auVar175._4_4_ + auVar175._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar192._8_4_ =
                     (uint)bVar15 * auVar176._8_4_ |
                     (uint)!bVar15 * (int)(auVar175._8_4_ + auVar175._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar192._12_4_ =
                     (uint)bVar15 * auVar176._12_4_ |
                     (uint)!bVar15 * (int)(auVar175._12_4_ + auVar175._12_4_);
                auVar175 = vminps_avx(auVar192,auVar195);
                auVar176 = vmaxps_avx(auVar175,auVar196);
                auVar177 = vfmadd213ps_fma(auVar198,auVar176,auVar197);
                auVar472._0_4_ = (int)auVar177._0_4_;
                auVar472._4_4_ = (int)auVar177._4_4_;
                auVar472._8_4_ = (int)auVar177._8_4_;
                auVar472._12_4_ = (int)auVar177._12_4_;
                auVar175 = vcvtdq2ps_avx(auVar472);
                uVar147 = vcmpps_avx512vl(auVar177,auVar175,1);
                auVar177 = vsubps_avx512vl(auVar175,auVar199);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar193._0_4_ =
                     (float)((uint)bVar15 * auVar177._0_4_ | (uint)!bVar15 * auVar175._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar193._4_4_ =
                     (float)((uint)bVar15 * auVar177._4_4_ | (uint)!bVar15 * auVar175._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar193._8_4_ =
                     (float)((uint)bVar15 * auVar177._8_4_ | (uint)!bVar15 * auVar175._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar193._12_4_ =
                     (float)((uint)bVar15 * auVar177._12_4_ | (uint)!bVar15 * auVar175._12_4_);
                auVar175 = vfmsub231ps_fma(auVar176,auVar193,auVar200);
                auVar175 = vfnmsub231ps_fma(auVar175,auVar193,auVar205);
                auVar409._0_4_ = auVar175._0_4_ * auVar175._0_4_;
                auVar409._4_4_ = auVar175._4_4_ * auVar175._4_4_;
                auVar409._8_4_ = auVar175._8_4_ * auVar175._8_4_;
                auVar409._12_4_ = auVar175._12_4_ * auVar175._12_4_;
                auVar176 = vfmadd213ps_avx512vl(auVar172,auVar175,auVar201);
                auVar176 = vfmadd213ps_avx512vl(auVar176,auVar175,auVar202);
                auVar176 = vfmadd213ps_avx512vl(auVar176,auVar175,auVar206);
                auVar176 = vfmadd213ps_avx512vl(auVar176,auVar175,auVar203);
                auVar176 = vfmadd213ps_avx512vl(auVar176,auVar175,auVar197);
                auVar175 = vfmadd213ps_avx512vl(auVar176,auVar409,auVar175);
                auVar176 = vaddps_avx512vl(auVar175,auVar199);
                auVar371._0_4_ = (int)auVar193._0_4_;
                auVar371._4_4_ = (int)auVar193._4_4_;
                auVar371._8_4_ = (int)auVar193._8_4_;
                auVar371._12_4_ = (int)auVar193._12_4_;
                auVar175 = vpslld_avx(auVar371,0x17);
                auVar175 = vpaddd_avx(auVar204,auVar175);
                auVar176 = vfmadd213ps_fma(auVar175,auVar176,auVar199);
                auVar175 = vrcpps_avx(auVar176);
                auVar473._0_4_ = auVar175._0_4_ + auVar175._0_4_;
                auVar473._4_4_ = auVar175._4_4_ + auVar175._4_4_;
                auVar473._8_4_ = auVar175._8_4_ + auVar175._8_4_;
                auVar473._12_4_ = auVar175._12_4_ + auVar175._12_4_;
                auVar176 = vfmsub213ps_avx512vl(auVar176,auVar473,auVar174);
                auVar175 = vfnmadd213ps_fma(auVar176,auVar175,auVar473);
                auVar175 = vfmsub213ps_fma(auVar175,auVar188,auVar188);
                break;
              case 6:
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar177._4_4_ = uVar10;
                auVar177._0_4_ = uVar10;
                auVar177._8_4_ = uVar10;
                auVar177._12_4_ = uVar10;
                uVar10 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var145))[1];
                auVar176._4_4_ = uVar10;
                auVar176._0_4_ = uVar10;
                auVar176._8_4_ = uVar10;
                auVar176._12_4_ = uVar10;
                auVar188 = vfmadd213ps_avx512vl(auVar177,auVar188,auVar176);
                auVar188 = vmaxps_avx512vl(auVar188,auVar173);
                auVar188 = vminps_avx(auVar188,auVar199);
                auVar175._0_4_ = auVar188._0_4_ * auVar282._0_4_;
                auVar175._4_4_ = auVar188._4_4_ * auVar282._4_4_;
                auVar175._8_4_ = auVar188._8_4_ * auVar282._8_4_;
                auVar175._12_4_ = auVar188._12_4_ * auVar282._12_4_;
              }
            }
            *(undefined1 (*) [16])local_1c0 = auVar175;
            local_1c0 = local_1c0 + 2;
            iVar135 = iVar135 + 1;
          }
          uVar147 = (ulong)(uVar137 + 1);
        }
      }
    }
    afVar132 = _ps512_cephes_log_p8;
    afVar131 = _ps512_cephes_log_p7;
    afVar130 = _ps512_cephes_log_p6;
    afVar129 = _ps512_cephes_log_p5;
    afVar128 = _ps512_cephes_log_p4;
    afVar127 = _ps512_cephes_log_p3;
    afVar126 = _ps512_cephes_log_p2;
    afVar125 = _ps512_cephes_exp_p5;
    afVar124 = _ps512_cephes_exp_p4;
    afVar123 = _ps512_cephes_exp_p3;
    afVar122 = _ps512_cephes_exp_p2;
    afVar121 = _ps512_cephes_exp_p1;
    afVar120 = _ps512_cephes_exp_p0;
    afVar119 = _ps512_cephes_LOG2EF;
    afVar118 = _ps512_exp_lo;
    afVar117 = _ps512_exp_hi;
    afVar116 = _ps512_1;
    if ((iVar170 == 1) && (uVar150 == 0x10)) {
      p_Var145 = pp_Var149[-3];
      uVar171 = *(uint *)(&this->field_0xd4 + (long)p_Var145);
      uVar134 = *(uint *)(&this->field_0xd8 + (long)p_Var145);
      iVar156 = *(int *)(&this->field_0xdc + (long)p_Var145);
      iVar8 = *(int *)(&this->field_0xe0 + (long)p_Var145);
      iVar151 = *(int *)(&this->field_0xe4 + (long)p_Var145);
      iVar167 = *(int *)(&this->field_0xe8 + (long)p_Var145);
      uVar10 = *(undefined4 *)(&this->field_0x114 + (long)p_Var145);
      local_a8._0_8_ = p_Var145;
      lVar153 = *(long *)(&this->field_0x1a8 + (long)p_Var145);
      auVar282 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar283 = vxorps_avx512dq(auVar282,(undefined1  [64])_ps512_cephes_log_q2);
      auVar284 = vxorps_avx512dq(auVar282,(undefined1  [64])_ps512_cephes_log_q1);
      auVar285 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar302 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar282);
      uVar159 = 0;
      if (0 < (int)uVar171) {
        uVar159 = (ulong)uVar171;
      }
      uVar164 = 0;
      if (0 < (int)uVar134) {
        uVar164 = (ulong)uVar134;
      }
      uVar138 = local_f8.c;
      if (local_f8.c < 1) {
        uVar138 = 0;
      }
      uVar157 = 0;
      auVar286 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar172 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
      in_ZMM30 = ZEXT1664(auVar172);
      auVar287 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      for (; uVar157 != uVar138; uVar157 = uVar157 + 1) {
        local_1c0 = (_func_int ***)
                    ((long)(_func_int ***)local_f8.data +
                    local_f8.cstep * uVar157 * local_f8.elemsize);
        iVar158 = bottom_blob->w;
        iVar143 = bottom_blob->h;
        uVar148 = 0;
        uVar154 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar154 = uVar148;
        }
        uVar155 = local_f8.w;
        if (local_f8.w < 1) {
          uVar155 = 0;
        }
        uVar137 = local_f8.h;
        if (local_f8.h < 1) {
          uVar137 = 0;
        }
        while (uVar139 = (uint)uVar148, uVar139 != uVar137) {
          iVar144 = (1 - uVar171) * iVar156;
          for (uVar141 = 0; uVar141 != uVar155; uVar141 = uVar141 + 1) {
            if (lVar153 == 0) {
              auVar288 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar288 = *(undefined1 (*) [64])(lVar153 + uVar157 * 0x40);
            }
            pvVar165 = (void *)((this->weight_data_tm).cstep * uVar157 *
                                (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data)
            ;
            for (uVar148 = 0; uVar148 != uVar154; uVar148 = uVar148 + 1) {
              pvVar166 = pvVar165;
              for (uVar147 = 0; uVar147 != uVar164; uVar147 = uVar147 + 1) {
                iVar135 = (((int)uVar147 - uVar134) + 1) * iVar8 + uVar139;
                if (((-1 < iVar135) && (iVar136 = iVar135 / iVar167, iVar135 % iVar167 == 0)) &&
                   (iVar136 < iVar143)) {
                  iVar135 = iVar144;
                  for (lVar168 = 0; uVar159 * 0x40 != lVar168; lVar168 = lVar168 + 0x40) {
                    if (((-1 < iVar135) && (iVar140 = iVar135 / iVar151, iVar135 % iVar151 == 0)) &&
                       (iVar140 < iVar158)) {
                      auVar289 = vbroadcastss_avx512f
                                           (ZEXT416(*(uint *)((long)bottom_blob->data +
                                                             (long)iVar140 * 4 +
                                                             (long)iVar136 *
                                                             (long)bottom_blob->w *
                                                             bottom_blob->elemsize +
                                                             bottom_blob->cstep *
                                                             bottom_blob->elemsize * uVar148)));
                      auVar288 = vfmadd231ps_avx512f(auVar288,auVar289,
                                                     *(undefined1 (*) [64])
                                                      ((long)pvVar166 + lVar168));
                    }
                    iVar135 = iVar135 + iVar156;
                  }
                }
                pvVar166 = (void *)((long)pvVar166 + (long)(int)uVar171 * 0x40);
              }
              pvVar165 = (void *)((long)pvVar165 + (long)(int)(uVar171 * uVar134 * 0x10) * 4);
            }
            auVar319 = auVar288;
            switch(uVar10) {
            case 1:
              auVar319 = vmaxps_avx512f(auVar288,in_ZMM30);
              break;
            case 2:
              uVar148 = vcmpps_avx512f(auVar288,in_ZMM30,1);
              uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
              auVar110._4_4_ = uVar1;
              auVar110._0_4_ = uVar1;
              auVar110._8_4_ = uVar1;
              auVar110._12_4_ = uVar1;
              auVar110._16_4_ = uVar1;
              auVar110._20_4_ = uVar1;
              auVar110._24_4_ = uVar1;
              auVar110._28_4_ = uVar1;
              auVar110._32_4_ = uVar1;
              auVar110._36_4_ = uVar1;
              auVar110._40_4_ = uVar1;
              auVar110._44_4_ = uVar1;
              auVar110._48_4_ = uVar1;
              auVar110._52_4_ = uVar1;
              auVar110._56_4_ = uVar1;
              auVar110._60_4_ = uVar1;
              auVar289 = vmulps_avx512f(auVar288,auVar110);
              bVar15 = (bool)((byte)uVar148 & 1);
              auVar319._0_4_ = (uint)bVar15 * auVar289._0_4_ | (uint)!bVar15 * auVar288._0_4_;
              bVar15 = (bool)((byte)(uVar148 >> 1) & 1);
              auVar319._4_4_ = (uint)bVar15 * auVar289._4_4_ | (uint)!bVar15 * auVar288._4_4_;
              bVar15 = (bool)((byte)(uVar148 >> 2) & 1);
              auVar319._8_4_ = (uint)bVar15 * auVar289._8_4_ | (uint)!bVar15 * auVar288._8_4_;
              bVar15 = (bool)((byte)(uVar148 >> 3) & 1);
              auVar319._12_4_ = (uint)bVar15 * auVar289._12_4_ | (uint)!bVar15 * auVar288._12_4_;
              bVar15 = (bool)((byte)(uVar148 >> 4) & 1);
              auVar319._16_4_ = (uint)bVar15 * auVar289._16_4_ | (uint)!bVar15 * auVar288._16_4_;
              bVar15 = (bool)((byte)(uVar148 >> 5) & 1);
              auVar319._20_4_ = (uint)bVar15 * auVar289._20_4_ | (uint)!bVar15 * auVar288._20_4_;
              bVar15 = (bool)((byte)(uVar148 >> 6) & 1);
              auVar319._24_4_ = (uint)bVar15 * auVar289._24_4_ | (uint)!bVar15 * auVar288._24_4_;
              bVar15 = (bool)((byte)(uVar148 >> 7) & 1);
              auVar319._28_4_ = (uint)bVar15 * auVar289._28_4_ | (uint)!bVar15 * auVar288._28_4_;
              bVar15 = (bool)((byte)(uVar148 >> 8) & 1);
              auVar319._32_4_ = (uint)bVar15 * auVar289._32_4_ | (uint)!bVar15 * auVar288._32_4_;
              bVar15 = (bool)((byte)(uVar148 >> 9) & 1);
              auVar319._36_4_ = (uint)bVar15 * auVar289._36_4_ | (uint)!bVar15 * auVar288._36_4_;
              bVar15 = (bool)((byte)(uVar148 >> 10) & 1);
              auVar319._40_4_ = (uint)bVar15 * auVar289._40_4_ | (uint)!bVar15 * auVar288._40_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xb) & 1);
              auVar319._44_4_ = (uint)bVar15 * auVar289._44_4_ | (uint)!bVar15 * auVar288._44_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xc) & 1);
              auVar319._48_4_ = (uint)bVar15 * auVar289._48_4_ | (uint)!bVar15 * auVar288._48_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xd) & 1);
              auVar319._52_4_ = (uint)bVar15 * auVar289._52_4_ | (uint)!bVar15 * auVar288._52_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xe) & 1);
              auVar319._56_4_ = (uint)bVar15 * auVar289._56_4_ | (uint)!bVar15 * auVar288._56_4_;
              bVar15 = SUB81(uVar148 >> 0xf,0);
              auVar319._60_4_ = (uint)bVar15 * auVar289._60_4_ | (uint)!bVar15 * auVar288._60_4_;
              break;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
              auVar108._4_4_ = uVar1;
              auVar108._0_4_ = uVar1;
              auVar108._8_4_ = uVar1;
              auVar108._12_4_ = uVar1;
              auVar108._16_4_ = uVar1;
              auVar108._20_4_ = uVar1;
              auVar108._24_4_ = uVar1;
              auVar108._28_4_ = uVar1;
              auVar108._32_4_ = uVar1;
              auVar108._36_4_ = uVar1;
              auVar108._40_4_ = uVar1;
              auVar108._44_4_ = uVar1;
              auVar108._48_4_ = uVar1;
              auVar108._52_4_ = uVar1;
              auVar108._56_4_ = uVar1;
              auVar108._60_4_ = uVar1;
              auVar288 = vmaxps_avx512f(auVar288,auVar108);
              uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var145))[1];
              auVar109._4_4_ = uVar1;
              auVar109._0_4_ = uVar1;
              auVar109._8_4_ = uVar1;
              auVar109._12_4_ = uVar1;
              auVar109._16_4_ = uVar1;
              auVar109._20_4_ = uVar1;
              auVar109._24_4_ = uVar1;
              auVar109._28_4_ = uVar1;
              auVar109._32_4_ = uVar1;
              auVar109._36_4_ = uVar1;
              auVar109._40_4_ = uVar1;
              auVar109._44_4_ = uVar1;
              auVar109._48_4_ = uVar1;
              auVar109._52_4_ = uVar1;
              auVar109._56_4_ = uVar1;
              auVar109._60_4_ = uVar1;
              auVar319 = vminps_avx512f(auVar288,auVar109);
              break;
            case 4:
              auVar288 = vxorps_avx512dq(auVar288,auVar282);
              auVar288 = vminps_avx512f(auVar288,(undefined1  [64])afVar117);
              auVar288 = vmaxps_avx512f(auVar288,(undefined1  [64])afVar118);
              auVar289 = vfmadd213ps_avx512f((undefined1  [64])afVar119,auVar288,
                                             (undefined1  [64])afVar125);
              auVar290 = vrndscaleps_avx512f(auVar289,1);
              uVar148 = vcmpps_avx512f(auVar289,auVar290,1);
              auVar289 = vsubps_avx512f(auVar290,(undefined1  [64])afVar116);
              bVar15 = (bool)((byte)uVar148 & 1);
              auVar318._0_4_ = (uint)bVar15 * auVar289._0_4_ | (uint)!bVar15 * auVar290._0_4_;
              bVar15 = (bool)((byte)(uVar148 >> 1) & 1);
              auVar318._4_4_ = (uint)bVar15 * auVar289._4_4_ | (uint)!bVar15 * auVar290._4_4_;
              bVar15 = (bool)((byte)(uVar148 >> 2) & 1);
              auVar318._8_4_ = (uint)bVar15 * auVar289._8_4_ | (uint)!bVar15 * auVar290._8_4_;
              bVar15 = (bool)((byte)(uVar148 >> 3) & 1);
              auVar318._12_4_ = (uint)bVar15 * auVar289._12_4_ | (uint)!bVar15 * auVar290._12_4_;
              bVar15 = (bool)((byte)(uVar148 >> 4) & 1);
              auVar318._16_4_ = (uint)bVar15 * auVar289._16_4_ | (uint)!bVar15 * auVar290._16_4_;
              bVar15 = (bool)((byte)(uVar148 >> 5) & 1);
              auVar318._20_4_ = (uint)bVar15 * auVar289._20_4_ | (uint)!bVar15 * auVar290._20_4_;
              bVar15 = (bool)((byte)(uVar148 >> 6) & 1);
              auVar318._24_4_ = (uint)bVar15 * auVar289._24_4_ | (uint)!bVar15 * auVar290._24_4_;
              bVar15 = (bool)((byte)(uVar148 >> 7) & 1);
              auVar318._28_4_ = (uint)bVar15 * auVar289._28_4_ | (uint)!bVar15 * auVar290._28_4_;
              bVar15 = (bool)((byte)(uVar148 >> 8) & 1);
              auVar318._32_4_ = (uint)bVar15 * auVar289._32_4_ | (uint)!bVar15 * auVar290._32_4_;
              bVar15 = (bool)((byte)(uVar148 >> 9) & 1);
              auVar318._36_4_ = (uint)bVar15 * auVar289._36_4_ | (uint)!bVar15 * auVar290._36_4_;
              bVar15 = (bool)((byte)(uVar148 >> 10) & 1);
              auVar318._40_4_ = (uint)bVar15 * auVar289._40_4_ | (uint)!bVar15 * auVar290._40_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xb) & 1);
              auVar318._44_4_ = (uint)bVar15 * auVar289._44_4_ | (uint)!bVar15 * auVar290._44_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xc) & 1);
              auVar318._48_4_ = (uint)bVar15 * auVar289._48_4_ | (uint)!bVar15 * auVar290._48_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xd) & 1);
              auVar318._52_4_ = (uint)bVar15 * auVar289._52_4_ | (uint)!bVar15 * auVar290._52_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xe) & 1);
              auVar318._56_4_ = (uint)bVar15 * auVar289._56_4_ | (uint)!bVar15 * auVar290._56_4_;
              bVar15 = SUB81(uVar148 >> 0xf,0);
              auVar318._60_4_ = (uint)bVar15 * auVar289._60_4_ | (uint)!bVar15 * auVar290._60_4_;
              auVar288 = vfmadd231ps_avx512f(auVar288,auVar318,auVar283);
              auVar288 = vfmadd231ps_avx512f(auVar288,auVar318,auVar284);
              auVar289 = vmulps_avx512f(auVar288,auVar288);
              auVar290 = vfmadd213ps_avx512f(auVar288,(undefined1  [64])afVar120,
                                             (undefined1  [64])afVar121);
              auVar290 = vfmadd213ps_avx512f(auVar290,auVar288,(undefined1  [64])afVar122);
              auVar290 = vfmadd213ps_avx512f(auVar290,auVar288,(undefined1  [64])afVar123);
              auVar290 = vfmadd213ps_avx512f(auVar290,auVar288,(undefined1  [64])afVar124);
              auVar290 = vfmadd213ps_avx512f(auVar290,auVar288,(undefined1  [64])afVar125);
              auVar288 = vfmadd213ps_avx512f(auVar290,auVar289,auVar288);
              auVar288 = vaddps_avx512f(auVar288,(undefined1  [64])afVar116);
              auVar289 = vcvttps2dq_avx512f(auVar318);
              auVar289 = vpaddd_avx512f(auVar289,auVar285);
              auVar289 = vpslld_avx512f(auVar289,0x17);
              auVar288 = vfmadd213ps_avx512f(auVar289,auVar288,auVar286);
              auVar289 = vrcp14ps_avx512f(auVar288);
              auVar288 = vfmsub213ps_avx512f(auVar288,auVar289,auVar286);
              auVar319 = vfnmadd132ps_avx512vl(auVar288,auVar289,auVar289);
              break;
            case 5:
              auVar289 = vminps_avx512f(auVar288,(undefined1  [64])afVar117);
              auVar289 = vmaxps_avx512f(auVar289,(undefined1  [64])afVar118);
              auVar290 = vfmadd213ps_avx512f((undefined1  [64])afVar119,auVar289,
                                             (undefined1  [64])afVar125);
              auVar291 = vrndscaleps_avx512f(auVar290,1);
              uVar148 = vcmpps_avx512f(auVar290,auVar291,1);
              auVar290 = vsubps_avx512f(auVar291,(undefined1  [64])afVar116);
              bVar15 = (bool)((byte)uVar148 & 1);
              auVar313._0_4_ = (uint)bVar15 * auVar290._0_4_ | (uint)!bVar15 * auVar291._0_4_;
              bVar15 = (bool)((byte)(uVar148 >> 1) & 1);
              auVar313._4_4_ = (uint)bVar15 * auVar290._4_4_ | (uint)!bVar15 * auVar291._4_4_;
              bVar15 = (bool)((byte)(uVar148 >> 2) & 1);
              auVar313._8_4_ = (uint)bVar15 * auVar290._8_4_ | (uint)!bVar15 * auVar291._8_4_;
              bVar15 = (bool)((byte)(uVar148 >> 3) & 1);
              auVar313._12_4_ = (uint)bVar15 * auVar290._12_4_ | (uint)!bVar15 * auVar291._12_4_;
              bVar15 = (bool)((byte)(uVar148 >> 4) & 1);
              auVar313._16_4_ = (uint)bVar15 * auVar290._16_4_ | (uint)!bVar15 * auVar291._16_4_;
              bVar15 = (bool)((byte)(uVar148 >> 5) & 1);
              auVar313._20_4_ = (uint)bVar15 * auVar290._20_4_ | (uint)!bVar15 * auVar291._20_4_;
              bVar15 = (bool)((byte)(uVar148 >> 6) & 1);
              auVar313._24_4_ = (uint)bVar15 * auVar290._24_4_ | (uint)!bVar15 * auVar291._24_4_;
              bVar15 = (bool)((byte)(uVar148 >> 7) & 1);
              auVar313._28_4_ = (uint)bVar15 * auVar290._28_4_ | (uint)!bVar15 * auVar291._28_4_;
              bVar15 = (bool)((byte)(uVar148 >> 8) & 1);
              auVar313._32_4_ = (uint)bVar15 * auVar290._32_4_ | (uint)!bVar15 * auVar291._32_4_;
              bVar15 = (bool)((byte)(uVar148 >> 9) & 1);
              auVar313._36_4_ = (uint)bVar15 * auVar290._36_4_ | (uint)!bVar15 * auVar291._36_4_;
              bVar15 = (bool)((byte)(uVar148 >> 10) & 1);
              auVar313._40_4_ = (uint)bVar15 * auVar290._40_4_ | (uint)!bVar15 * auVar291._40_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xb) & 1);
              auVar313._44_4_ = (uint)bVar15 * auVar290._44_4_ | (uint)!bVar15 * auVar291._44_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xc) & 1);
              auVar313._48_4_ = (uint)bVar15 * auVar290._48_4_ | (uint)!bVar15 * auVar291._48_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xd) & 1);
              auVar313._52_4_ = (uint)bVar15 * auVar290._52_4_ | (uint)!bVar15 * auVar291._52_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xe) & 1);
              auVar313._56_4_ = (uint)bVar15 * auVar290._56_4_ | (uint)!bVar15 * auVar291._56_4_;
              bVar15 = SUB81(uVar148 >> 0xf,0);
              auVar313._60_4_ = (uint)bVar15 * auVar290._60_4_ | (uint)!bVar15 * auVar291._60_4_;
              auVar289 = vfmadd231ps_avx512f(auVar289,auVar313,auVar283);
              auVar289 = vfmadd231ps_avx512f(auVar289,auVar313,auVar284);
              auVar290 = vmulps_avx512f(auVar289,auVar289);
              auVar291 = vfmadd213ps_avx512f(auVar289,(undefined1  [64])afVar120,
                                             (undefined1  [64])afVar121);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar122);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar123);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar124);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar125);
              auVar289 = vfmadd213ps_avx512f(auVar291,auVar290,auVar289);
              auVar289 = vaddps_avx512f(auVar289,(undefined1  [64])afVar116);
              auVar290 = vcvttps2dq_avx512f(auVar313);
              auVar290 = vpaddd_avx512f(auVar290,auVar285);
              auVar290 = vpslld_avx512f(auVar290,0x17);
              auVar289 = vfmadd213ps_avx512f(auVar290,auVar289,auVar286);
              auVar290 = vmaxps_avx512f(auVar289,(undefined1  [64])_ps512_min_norm_pos);
              auVar291 = vpsrld_avx512f(auVar290,0x17);
              auVar290 = vpternlogd_avx512f(auVar290,(undefined1  [64])afVar125,
                                            (undefined1  [64])_ps512_inv_mant_mask,0xec);
              uVar148 = vcmpps_avx512f(auVar290,(undefined1  [64])_ps512_cephes_SQRTHF,1);
              auVar292 = vsubps_avx512f(auVar290,(undefined1  [64])afVar116);
              auVar290 = vaddps_avx512f(auVar292,auVar290);
              bVar15 = (bool)((byte)uVar148 & 1);
              auVar314._0_4_ = (uint)bVar15 * auVar290._0_4_ | (uint)!bVar15 * auVar292._0_4_;
              bVar15 = (bool)((byte)(uVar148 >> 1) & 1);
              auVar314._4_4_ = (uint)bVar15 * auVar290._4_4_ | (uint)!bVar15 * auVar292._4_4_;
              bVar15 = (bool)((byte)(uVar148 >> 2) & 1);
              auVar314._8_4_ = (uint)bVar15 * auVar290._8_4_ | (uint)!bVar15 * auVar292._8_4_;
              bVar15 = (bool)((byte)(uVar148 >> 3) & 1);
              auVar314._12_4_ = (uint)bVar15 * auVar290._12_4_ | (uint)!bVar15 * auVar292._12_4_;
              bVar15 = (bool)((byte)(uVar148 >> 4) & 1);
              auVar314._16_4_ = (uint)bVar15 * auVar290._16_4_ | (uint)!bVar15 * auVar292._16_4_;
              bVar15 = (bool)((byte)(uVar148 >> 5) & 1);
              auVar314._20_4_ = (uint)bVar15 * auVar290._20_4_ | (uint)!bVar15 * auVar292._20_4_;
              bVar15 = (bool)((byte)(uVar148 >> 6) & 1);
              auVar314._24_4_ = (uint)bVar15 * auVar290._24_4_ | (uint)!bVar15 * auVar292._24_4_;
              bVar15 = (bool)((byte)(uVar148 >> 7) & 1);
              auVar314._28_4_ = (uint)bVar15 * auVar290._28_4_ | (uint)!bVar15 * auVar292._28_4_;
              bVar16 = (byte)(uVar148 >> 8);
              bVar15 = (bool)(bVar16 & 1);
              auVar314._32_4_ = (uint)bVar15 * auVar290._32_4_ | (uint)!bVar15 * auVar292._32_4_;
              bVar15 = (bool)((byte)(uVar148 >> 9) & 1);
              auVar314._36_4_ = (uint)bVar15 * auVar290._36_4_ | (uint)!bVar15 * auVar292._36_4_;
              bVar15 = (bool)((byte)(uVar148 >> 10) & 1);
              auVar314._40_4_ = (uint)bVar15 * auVar290._40_4_ | (uint)!bVar15 * auVar292._40_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xb) & 1);
              auVar314._44_4_ = (uint)bVar15 * auVar290._44_4_ | (uint)!bVar15 * auVar292._44_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xc) & 1);
              auVar314._48_4_ = (uint)bVar15 * auVar290._48_4_ | (uint)!bVar15 * auVar292._48_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xd) & 1);
              auVar314._52_4_ = (uint)bVar15 * auVar290._52_4_ | (uint)!bVar15 * auVar292._52_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xe) & 1);
              auVar314._56_4_ = (uint)bVar15 * auVar290._56_4_ | (uint)!bVar15 * auVar292._56_4_;
              bVar15 = SUB81(uVar148 >> 0xf,0);
              auVar314._60_4_ = (uint)bVar15 * auVar290._60_4_ | (uint)!bVar15 * auVar292._60_4_;
              auVar290 = vmulps_avx512f(auVar314,auVar314);
              auVar292 = vfmadd132ps_avx512f(auVar314,(undefined1  [64])_ps512_cephes_log_p1,
                                             (undefined1  [64])_ps512_cephes_log_p0);
              auVar292 = vfmadd213ps_avx512f(auVar292,auVar314,(undefined1  [64])afVar126);
              auVar292 = vfmadd213ps_avx512f(auVar292,auVar314,(undefined1  [64])afVar127);
              auVar292 = vfmadd213ps_avx512f(auVar292,auVar314,(undefined1  [64])afVar128);
              auVar292 = vfmadd213ps_avx512f(auVar292,auVar314,(undefined1  [64])afVar129);
              auVar292 = vfmadd213ps_avx512f(auVar292,auVar314,(undefined1  [64])afVar130);
              auVar292 = vfmadd213ps_avx512f(auVar292,auVar314,(undefined1  [64])afVar131);
              auVar292 = vfmadd213ps_avx512f(auVar292,auVar314,(undefined1  [64])afVar132);
              auVar293 = vmulps_avx512f(auVar290,auVar314);
              auVar292 = vfmadd213ps_avx512f(auVar293,auVar292,auVar314);
              uVar147 = vcmpps_avx512f(auVar289,in_ZMM30,2);
              auVar289 = vpsubd_avx512f(auVar291,auVar285);
              auVar289 = vcvtdq2ps_avx512f(auVar289);
              auVar291 = vaddps_avx512f(auVar289,(undefined1  [64])afVar116);
              bVar15 = (bool)((byte)uVar148 & 1);
              auVar315._0_4_ = (uint)bVar15 * auVar289._0_4_ | (uint)!bVar15 * auVar291._0_4_;
              bVar15 = (bool)((byte)(uVar148 >> 1) & 1);
              auVar315._4_4_ = (uint)bVar15 * auVar289._4_4_ | (uint)!bVar15 * auVar291._4_4_;
              bVar15 = (bool)((byte)(uVar148 >> 2) & 1);
              auVar315._8_4_ = (uint)bVar15 * auVar289._8_4_ | (uint)!bVar15 * auVar291._8_4_;
              bVar15 = (bool)((byte)(uVar148 >> 3) & 1);
              auVar315._12_4_ = (uint)bVar15 * auVar289._12_4_ | (uint)!bVar15 * auVar291._12_4_;
              bVar15 = (bool)((byte)(uVar148 >> 4) & 1);
              auVar315._16_4_ = (uint)bVar15 * auVar289._16_4_ | (uint)!bVar15 * auVar291._16_4_;
              bVar15 = (bool)((byte)(uVar148 >> 5) & 1);
              auVar315._20_4_ = (uint)bVar15 * auVar289._20_4_ | (uint)!bVar15 * auVar291._20_4_;
              bVar15 = (bool)((byte)(uVar148 >> 6) & 1);
              auVar315._24_4_ = (uint)bVar15 * auVar289._24_4_ | (uint)!bVar15 * auVar291._24_4_;
              bVar15 = (bool)((byte)(uVar148 >> 7) & 1);
              auVar315._28_4_ = (uint)bVar15 * auVar289._28_4_ | (uint)!bVar15 * auVar291._28_4_;
              bVar15 = (bool)(bVar16 & 1);
              auVar315._32_4_ = (uint)bVar15 * auVar289._32_4_ | (uint)!bVar15 * auVar291._32_4_;
              bVar15 = (bool)((byte)(uVar148 >> 9) & 1);
              auVar315._36_4_ = (uint)bVar15 * auVar289._36_4_ | (uint)!bVar15 * auVar291._36_4_;
              bVar15 = (bool)((byte)(uVar148 >> 10) & 1);
              auVar315._40_4_ = (uint)bVar15 * auVar289._40_4_ | (uint)!bVar15 * auVar291._40_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xb) & 1);
              auVar315._44_4_ = (uint)bVar15 * auVar289._44_4_ | (uint)!bVar15 * auVar291._44_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xc) & 1);
              auVar315._48_4_ = (uint)bVar15 * auVar289._48_4_ | (uint)!bVar15 * auVar291._48_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xd) & 1);
              auVar315._52_4_ = (uint)bVar15 * auVar289._52_4_ | (uint)!bVar15 * auVar291._52_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xe) & 1);
              auVar315._56_4_ = (uint)bVar15 * auVar289._56_4_ | (uint)!bVar15 * auVar291._56_4_;
              bVar15 = SUB81(uVar148 >> 0xf,0);
              auVar315._60_4_ = (uint)bVar15 * auVar289._60_4_ | (uint)!bVar15 * auVar291._60_4_;
              auVar289 = vfmadd231ps_avx512f(auVar292,auVar315,
                                             (undefined1  [64])_ps512_cephes_log_q1);
              auVar289 = vfmadd231ps_avx512f(auVar289,auVar302,auVar290);
              auVar289 = vfmadd231ps_avx512f(auVar289,auVar315,
                                             (undefined1  [64])_ps512_cephes_log_q2);
              auVar289 = vmulps_avx512f(auVar289,auVar287);
              auVar290 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
              bVar15 = (bool)((byte)uVar147 & 1);
              auVar316._0_4_ = (uint)bVar15 * auVar290._0_4_ | (uint)!bVar15 * auVar289._0_4_;
              bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
              auVar316._4_4_ = (uint)bVar15 * auVar290._4_4_ | (uint)!bVar15 * auVar289._4_4_;
              bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
              auVar316._8_4_ = (uint)bVar15 * auVar290._8_4_ | (uint)!bVar15 * auVar289._8_4_;
              bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
              auVar316._12_4_ = (uint)bVar15 * auVar290._12_4_ | (uint)!bVar15 * auVar289._12_4_;
              bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
              auVar316._16_4_ = (uint)bVar15 * auVar290._16_4_ | (uint)!bVar15 * auVar289._16_4_;
              bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
              auVar316._20_4_ = (uint)bVar15 * auVar290._20_4_ | (uint)!bVar15 * auVar289._20_4_;
              bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
              auVar316._24_4_ = (uint)bVar15 * auVar290._24_4_ | (uint)!bVar15 * auVar289._24_4_;
              bVar15 = (bool)((byte)(uVar147 >> 7) & 1);
              auVar316._28_4_ = (uint)bVar15 * auVar290._28_4_ | (uint)!bVar15 * auVar289._28_4_;
              bVar15 = (bool)((byte)(uVar147 >> 8) & 1);
              auVar316._32_4_ = (uint)bVar15 * auVar290._32_4_ | (uint)!bVar15 * auVar289._32_4_;
              bVar15 = (bool)((byte)(uVar147 >> 9) & 1);
              auVar316._36_4_ = (uint)bVar15 * auVar290._36_4_ | (uint)!bVar15 * auVar289._36_4_;
              bVar15 = (bool)((byte)(uVar147 >> 10) & 1);
              auVar316._40_4_ = (uint)bVar15 * auVar290._40_4_ | (uint)!bVar15 * auVar289._40_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xb) & 1);
              auVar316._44_4_ = (uint)bVar15 * auVar290._44_4_ | (uint)!bVar15 * auVar289._44_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xc) & 1);
              auVar316._48_4_ = (uint)bVar15 * auVar290._48_4_ | (uint)!bVar15 * auVar289._48_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xd) & 1);
              auVar316._52_4_ = (uint)bVar15 * auVar290._52_4_ | (uint)!bVar15 * auVar289._52_4_;
              bVar15 = (bool)((byte)(uVar147 >> 0xe) & 1);
              auVar316._56_4_ = (uint)bVar15 * auVar290._56_4_ | (uint)!bVar15 * auVar289._56_4_;
              bVar15 = SUB81(uVar147 >> 0xf,0);
              auVar316._60_4_ = (uint)bVar15 * auVar290._60_4_ | (uint)!bVar15 * auVar289._60_4_;
              auVar289 = vminps_avx512f(auVar316,(undefined1  [64])afVar117);
              auVar289 = vmaxps_avx512f(auVar289,(undefined1  [64])afVar118);
              auVar290 = vfmadd213ps_avx512f((undefined1  [64])afVar119,auVar289,
                                             (undefined1  [64])afVar125);
              auVar291 = vrndscaleps_avx512f(auVar290,1);
              uVar148 = vcmpps_avx512f(auVar290,auVar291,1);
              auVar290 = vsubps_avx512f(auVar291,(undefined1  [64])afVar116);
              bVar15 = (bool)((byte)uVar148 & 1);
              auVar317._0_4_ = (uint)bVar15 * auVar290._0_4_ | (uint)!bVar15 * auVar291._0_4_;
              bVar15 = (bool)((byte)(uVar148 >> 1) & 1);
              auVar317._4_4_ = (uint)bVar15 * auVar290._4_4_ | (uint)!bVar15 * auVar291._4_4_;
              bVar15 = (bool)((byte)(uVar148 >> 2) & 1);
              auVar317._8_4_ = (uint)bVar15 * auVar290._8_4_ | (uint)!bVar15 * auVar291._8_4_;
              bVar15 = (bool)((byte)(uVar148 >> 3) & 1);
              auVar317._12_4_ = (uint)bVar15 * auVar290._12_4_ | (uint)!bVar15 * auVar291._12_4_;
              bVar15 = (bool)((byte)(uVar148 >> 4) & 1);
              auVar317._16_4_ = (uint)bVar15 * auVar290._16_4_ | (uint)!bVar15 * auVar291._16_4_;
              bVar15 = (bool)((byte)(uVar148 >> 5) & 1);
              auVar317._20_4_ = (uint)bVar15 * auVar290._20_4_ | (uint)!bVar15 * auVar291._20_4_;
              bVar15 = (bool)((byte)(uVar148 >> 6) & 1);
              auVar317._24_4_ = (uint)bVar15 * auVar290._24_4_ | (uint)!bVar15 * auVar291._24_4_;
              bVar15 = (bool)((byte)(uVar148 >> 7) & 1);
              auVar317._28_4_ = (uint)bVar15 * auVar290._28_4_ | (uint)!bVar15 * auVar291._28_4_;
              bVar15 = (bool)((byte)(uVar148 >> 8) & 1);
              auVar317._32_4_ = (uint)bVar15 * auVar290._32_4_ | (uint)!bVar15 * auVar291._32_4_;
              bVar15 = (bool)((byte)(uVar148 >> 9) & 1);
              auVar317._36_4_ = (uint)bVar15 * auVar290._36_4_ | (uint)!bVar15 * auVar291._36_4_;
              bVar15 = (bool)((byte)(uVar148 >> 10) & 1);
              auVar317._40_4_ = (uint)bVar15 * auVar290._40_4_ | (uint)!bVar15 * auVar291._40_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xb) & 1);
              auVar317._44_4_ = (uint)bVar15 * auVar290._44_4_ | (uint)!bVar15 * auVar291._44_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xc) & 1);
              auVar317._48_4_ = (uint)bVar15 * auVar290._48_4_ | (uint)!bVar15 * auVar291._48_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xd) & 1);
              auVar317._52_4_ = (uint)bVar15 * auVar290._52_4_ | (uint)!bVar15 * auVar291._52_4_;
              bVar15 = (bool)((byte)(uVar148 >> 0xe) & 1);
              auVar317._56_4_ = (uint)bVar15 * auVar290._56_4_ | (uint)!bVar15 * auVar291._56_4_;
              bVar15 = SUB81(uVar148 >> 0xf,0);
              auVar317._60_4_ = (uint)bVar15 * auVar290._60_4_ | (uint)!bVar15 * auVar291._60_4_;
              auVar289 = vfmadd231ps_avx512f(auVar289,auVar317,auVar283);
              auVar289 = vfmadd231ps_avx512f(auVar289,auVar317,auVar284);
              auVar290 = vmulps_avx512f(auVar289,auVar289);
              auVar291 = vfmadd213ps_avx512f(auVar289,(undefined1  [64])afVar120,
                                             (undefined1  [64])afVar121);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar122);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar123);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar124);
              auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar125);
              auVar289 = vfmadd213ps_avx512f(auVar291,auVar290,auVar289);
              auVar289 = vaddps_avx512f(auVar289,(undefined1  [64])afVar116);
              auVar290 = vcvttps2dq_avx512f(auVar317);
              auVar290 = vpaddd_avx512f(auVar290,auVar285);
              auVar290 = vpslld_avx512f(auVar290,0x17);
              auVar289 = vfmadd213ps_avx512f(auVar290,auVar289,auVar286);
              auVar290 = vrcp14ps_avx512f(auVar289);
              auVar289 = vfmsub213ps_avx512f(auVar289,auVar290,auVar286);
              auVar289 = vfnmadd132ps_avx512vl(auVar289,auVar290,auVar290);
              auVar289 = vfnmsub213ps_avx512f(auVar289,auVar287,auVar286);
              auVar319 = vmulps_avx512f(auVar289,auVar288);
              break;
            case 6:
              auVar289 = vbroadcastss_avx512f
                                   (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var145)));
              uVar2 = (*(uint **)(&this->field_0x118 + (long)p_Var145))[1];
              auVar107._4_4_ = uVar2;
              auVar107._0_4_ = uVar2;
              auVar107._8_4_ = uVar2;
              auVar107._12_4_ = uVar2;
              auVar107._16_4_ = uVar2;
              auVar107._20_4_ = uVar2;
              auVar107._24_4_ = uVar2;
              auVar107._28_4_ = uVar2;
              auVar107._32_4_ = uVar2;
              auVar107._36_4_ = uVar2;
              auVar107._40_4_ = uVar2;
              auVar107._44_4_ = uVar2;
              auVar107._48_4_ = uVar2;
              auVar107._52_4_ = uVar2;
              auVar107._56_4_ = uVar2;
              auVar107._60_4_ = uVar2;
              auVar289 = vfmadd213ps_avx512f(auVar289,auVar288,auVar107);
              auVar289 = vmaxps_avx512f(auVar289,in_ZMM30);
              auVar289 = vminps_avx512f(auVar289,auVar286);
              auVar319 = vmulps_avx512f(auVar289,auVar288);
            }
            *(undefined1 (*) [64])local_1c0 = auVar319;
            local_1c0 = local_1c0 + 8;
            iVar144 = iVar144 + 1;
          }
          uVar148 = (ulong)(uVar139 + 1);
        }
      }
    }
    local_38 = top_blob;
    if ((iVar170 == 0x10) && (uVar150 == 1)) {
      p_Var145 = pp_Var149[-3];
      uVar171 = *(uint *)(&this->field_0xd4 + (long)p_Var145);
      uVar134 = *(uint *)(&this->field_0xd8 + (long)p_Var145);
      iVar156 = *(int *)(&this->field_0xdc + (long)p_Var145);
      iVar8 = *(int *)(&this->field_0x114 + (long)p_Var145);
      local_60 = local_f8.elemsize * local_f8.cstep;
      uVar164 = 0;
      uVar159 = 0;
      if (0 < (int)uVar171) {
        uVar159 = (ulong)uVar171;
      }
      uVar157 = 0;
      if (0 < (int)uVar134) {
        uVar157 = (ulong)uVar134;
      }
      uVar154 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar154 = uVar164;
      }
      uVar138 = local_f8.w;
      if (local_f8.w < 1) {
        uVar138 = 0;
      }
      uVar155 = local_f8.h;
      if (local_f8.h < 1) {
        uVar155 = 0;
      }
      local_58 = (ulong)(uint)local_f8.c;
      if (local_f8.c < 1) {
        local_58 = uVar164;
      }
      iVar151 = *(int *)(&this->field_0xe0 + (long)p_Var145);
      iVar167 = *(int *)(&this->field_0xe4 + (long)p_Var145);
      iVar158 = *(int *)(&this->field_0xe8 + (long)p_Var145);
      lVar153 = *(long *)(&this->field_0x1a8 + (long)p_Var145);
      local_68 = (Allocator *)local_f8.data;
      iVar143 = bottom_blob->w;
      iVar144 = bottom_blob->h;
      for (; uVar164 != local_58; uVar164 = uVar164 + 1) {
        local_1c0 = (_func_int ***)((long)&local_68->_vptr_Allocator + local_60 * uVar164);
        for (uVar137 = 0; uVar137 != uVar155; uVar137 = uVar137 + 1) {
          local_a8._0_8_ = *(undefined8 *)(&this->field_0x118 + (long)p_Var145);
          sVar12 = (this->weight_data_tm).cstep;
          sVar13 = (this->weight_data_tm).elemsize;
          pvVar165 = (this->weight_data_tm).data;
          iVar135 = (1 - uVar171) * iVar156;
          for (uVar139 = 0; uVar139 != uVar138; uVar139 = uVar139 + 1) {
            if (lVar153 == 0) {
              fVar320 = 0.0;
            }
            else {
              fVar320 = *(float *)(lVar153 + uVar164 * 4);
            }
            auVar282 = ZEXT1664(ZEXT816(0) << 0x40);
            pvVar166 = (void *)(sVar12 * uVar164 * sVar13 + (long)pvVar165);
            for (uVar148 = 0; uVar148 != uVar154; uVar148 = uVar148 + 1) {
              pvVar162 = pvVar166;
              for (uVar147 = 0; uVar147 != uVar157; uVar147 = uVar147 + 1) {
                iVar136 = (((int)uVar147 - uVar134) + 1) * iVar151 + uVar137;
                if (((-1 < iVar136) && (iVar140 = iVar136 / iVar158, iVar136 % iVar158 == 0)) &&
                   (iVar140 < iVar144)) {
                  iVar136 = iVar135;
                  for (lVar168 = 0; uVar159 * 0x40 != lVar168; lVar168 = lVar168 + 0x40) {
                    if (((-1 < iVar136) && (iVar142 = iVar136 / iVar167, iVar136 % iVar167 == 0)) &&
                       (iVar142 < iVar143)) {
                      auVar282 = vfmadd231ps_avx512f(auVar282,*(undefined1 (*) [64])
                                                               ((long)bottom_blob->data +
                                                               (long)(iVar142 << 4) * 4 +
                                                               (long)iVar140 *
                                                               (long)bottom_blob->w *
                                                               bottom_blob->elemsize +
                                                               bottom_blob->cstep *
                                                               bottom_blob->elemsize * uVar148),
                                                     *(undefined1 (*) [64])
                                                      ((long)pvVar162 + lVar168));
                    }
                    iVar136 = iVar136 + iVar156;
                  }
                }
                pvVar162 = (void *)((long)pvVar162 + (long)(int)uVar171 * 0x40);
              }
              pvVar166 = (void *)((long)pvVar166 + (long)(int)(uVar171 * uVar134 * 0x10) * 4);
            }
            auVar228 = vextractf64x4_avx512f(auVar282,1);
            fVar338 = auVar282._4_4_ + auVar228._4_4_;
            auVar173._0_4_ = auVar282._0_4_ + auVar228._0_4_ + auVar282._16_4_ + auVar228._16_4_;
            auVar173._4_4_ = fVar338 + fVar338;
            auVar173._8_4_ = auVar282._8_4_ + auVar228._8_4_ + auVar282._24_4_ + auVar228._24_4_;
            auVar173._12_4_ = auVar282._12_4_ + auVar228._12_4_ + auVar282._28_4_ + auVar228._28_4_;
            auVar172 = vshufpd_avx(auVar173,auVar173,1);
            auVar174._0_4_ = auVar172._0_4_ + auVar173._0_4_;
            auVar174._4_4_ = auVar172._4_4_ + auVar173._4_4_;
            auVar174._8_4_ = auVar172._8_4_ + auVar173._8_4_;
            auVar174._12_4_ = auVar172._12_4_ + auVar173._12_4_;
            auVar172 = vmovshdup_avx(auVar174);
            fVar320 = auVar172._0_4_ + fVar320 + auVar174._0_4_;
            fVar338 = fVar320;
            if (iVar8 - 1U < 6) {
              auVar172 = ZEXT416((uint)fVar320);
              switch(iVar8) {
              case 1:
                auVar172 = vmaxss_avx(auVar172,ZEXT416(0));
                fVar338 = auVar172._0_4_;
                break;
              case 2:
                uVar17 = vcmpss_avx512f(auVar172,ZEXT416(0),0xe);
                bVar15 = (bool)((byte)uVar17 & 1);
                fVar338 = (float)((uint)bVar15 * 0x3f800000 +
                                 (uint)!bVar15 * (int)*(float *)local_a8._0_8_) * fVar320;
                break;
              case 3:
                auVar172 = vmaxss_avx(auVar172,ZEXT416((uint)*(float *)local_a8._0_8_));
                fVar338 = auVar172._0_4_;
                if (*(float *)(local_a8._0_8_ + 4) < auVar172._0_4_) {
                  fVar338 = *(float *)(local_a8._0_8_ + 4);
                }
                break;
              case 4:
                auVar172 = vminss_avx(auVar172,SUB6416(ZEXT464(0x42b0c0a5),0));
                auVar26._8_4_ = 0x80000000;
                auVar26._0_8_ = 0x8000000080000000;
                auVar26._12_4_ = 0x80000000;
                auVar173 = vxorps_avx512vl(auVar172,auVar26);
                uVar17 = vcmpss_avx512f(auVar172,ZEXT416(0xc2b0c0a5),1);
                bVar15 = (bool)((byte)uVar17 & 1);
                fVar320 = expf((float)((uint)bVar15 * 0x42b0c0a5 + (uint)!bVar15 * auVar173._0_4_));
                fVar338 = 1.0 / (fVar320 + 1.0);
                break;
              case 5:
                fVar338 = expf(fVar320);
                fVar338 = logf(fVar338 + 1.0);
                fVar338 = tanhf(fVar338);
                fVar338 = fVar338 * fVar320;
                break;
              case 6:
                fVar3 = *(float *)local_a8._0_8_;
                auVar172._8_4_ = 0x80000000;
                auVar172._0_8_ = 0x8000000080000000;
                auVar172._12_4_ = 0x80000000;
                auVar172 = vxorps_avx512vl(ZEXT416((uint)*(float *)(local_a8._0_8_ + 4)),auVar172);
                fVar345 = auVar172._0_4_ / fVar3;
                fVar338 = 0.0;
                if ((fVar345 <= fVar320) && (fVar338 = fVar320, fVar320 <= fVar345 + 1.0 / fVar3)) {
                  auVar172 = vfmadd213ss_fma(ZEXT416((uint)fVar3),ZEXT416((uint)fVar320),
                                             ZEXT416((uint)*(float *)(local_a8._0_8_ + 4)));
                  fVar338 = auVar172._0_4_ * fVar320;
                }
              }
            }
            *(float *)local_1c0 = fVar338;
            local_1c0 = (_func_int ***)((long)local_1c0 + 4);
            iVar135 = iVar135 + 1;
          }
        }
      }
    }
    if ((iVar170 == 8) && (uVar150 == 8)) {
      p_Var145 = pp_Var149[-3];
      uVar171 = *(uint *)(&this->field_0xd4 + (long)p_Var145);
      uVar134 = *(uint *)(&this->field_0xd8 + (long)p_Var145);
      iVar156 = *(int *)(&this->field_0xdc + (long)p_Var145);
      iVar8 = *(int *)(&this->field_0xe0 + (long)p_Var145);
      iVar151 = *(int *)(&this->field_0xe4 + (long)p_Var145);
      iVar167 = *(int *)(&this->field_0xe8 + (long)p_Var145);
      iVar158 = *(int *)(&this->field_0x114 + (long)p_Var145);
      local_a8._0_8_ = p_Var145;
      lVar153 = *(long *)(&this->field_0x1a8 + (long)p_Var145);
      uVar159 = 0;
      uVar164 = 0;
      if (0 < (int)uVar171) {
        uVar164 = (ulong)uVar171;
      }
      uVar157 = 0;
      if (0 < (int)uVar134) {
        uVar157 = (ulong)uVar134;
      }
      uVar154 = (ulong)(uint)local_f8.c;
      if (local_f8.c < 1) {
        uVar154 = uVar159;
      }
      auVar335._8_4_ = 0x42b0c0a5;
      auVar335._0_8_ = 0x42b0c0a542b0c0a5;
      auVar335._12_4_ = 0x42b0c0a5;
      auVar335._16_4_ = 0x42b0c0a5;
      auVar335._20_4_ = 0x42b0c0a5;
      auVar335._24_4_ = 0x42b0c0a5;
      auVar335._28_4_ = 0x42b0c0a5;
      auVar342._8_4_ = 0xc2b0c0a5;
      auVar342._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar342._12_4_ = 0xc2b0c0a5;
      auVar342._16_4_ = 0xc2b0c0a5;
      auVar342._20_4_ = 0xc2b0c0a5;
      auVar342._24_4_ = 0xc2b0c0a5;
      auVar342._28_4_ = 0xc2b0c0a5;
      auVar349._8_4_ = 0x3f000000;
      auVar349._0_8_ = 0x3f0000003f000000;
      auVar349._12_4_ = 0x3f000000;
      auVar349._16_4_ = 0x3f000000;
      auVar349._20_4_ = 0x3f000000;
      auVar349._24_4_ = 0x3f000000;
      auVar349._28_4_ = 0x3f000000;
      auVar355._8_4_ = 0x3fb8aa3b;
      auVar355._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar355._12_4_ = 0x3fb8aa3b;
      auVar355._16_4_ = 0x3fb8aa3b;
      auVar355._20_4_ = 0x3fb8aa3b;
      auVar355._24_4_ = 0x3fb8aa3b;
      auVar355._28_4_ = 0x3fb8aa3b;
      auVar361._8_4_ = 0x3f800000;
      auVar361._0_8_ = 0x3f8000003f800000;
      auVar361._12_4_ = 0x3f800000;
      auVar361._16_4_ = 0x3f800000;
      auVar361._20_4_ = 0x3f800000;
      auVar361._24_4_ = 0x3f800000;
      auVar361._28_4_ = 0x3f800000;
      auVar367._8_4_ = 0x3f318000;
      auVar367._0_8_ = 0x3f3180003f318000;
      auVar367._12_4_ = 0x3f318000;
      auVar367._16_4_ = 0x3f318000;
      auVar367._20_4_ = 0x3f318000;
      auVar367._24_4_ = 0x3f318000;
      auVar367._28_4_ = 0x3f318000;
      auVar228 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar436._8_4_ = 0x3ab743ce;
      auVar436._0_8_ = 0x3ab743ce3ab743ce;
      auVar436._12_4_ = 0x3ab743ce;
      auVar436._16_4_ = 0x3ab743ce;
      auVar436._20_4_ = 0x3ab743ce;
      auVar436._24_4_ = 0x3ab743ce;
      auVar436._28_4_ = 0x3ab743ce;
      auVar442._8_4_ = 0x3c088908;
      auVar442._0_8_ = 0x3c0889083c088908;
      auVar442._12_4_ = 0x3c088908;
      auVar442._16_4_ = 0x3c088908;
      auVar442._20_4_ = 0x3c088908;
      auVar442._24_4_ = 0x3c088908;
      auVar442._28_4_ = 0x3c088908;
      auVar448._8_4_ = 0x3d2aa9c1;
      auVar448._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar448._12_4_ = 0x3d2aa9c1;
      auVar448._16_4_ = 0x3d2aa9c1;
      auVar448._20_4_ = 0x3d2aa9c1;
      auVar448._24_4_ = 0x3d2aa9c1;
      auVar448._28_4_ = 0x3d2aa9c1;
      auVar454._8_4_ = 0x3e2aaaaa;
      auVar454._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar454._12_4_ = 0x3e2aaaaa;
      auVar454._16_4_ = 0x3e2aaaaa;
      auVar454._20_4_ = 0x3e2aaaaa;
      auVar454._24_4_ = 0x3e2aaaaa;
      auVar454._28_4_ = 0x3e2aaaaa;
      auVar460._8_4_ = 0x3f800000;
      auVar460._0_8_ = 0x3f8000003f800000;
      auVar460._12_4_ = 0x3f800000;
      auVar460._16_4_ = 0x3f800000;
      auVar460._20_4_ = 0x3f800000;
      auVar460._24_4_ = 0x3f800000;
      auVar460._28_4_ = 0x3f800000;
      auVar466._8_4_ = 0xb95e8083;
      auVar466._0_8_ = 0xb95e8083b95e8083;
      auVar466._12_4_ = 0xb95e8083;
      auVar466._16_4_ = 0xb95e8083;
      auVar466._20_4_ = 0xb95e8083;
      auVar466._24_4_ = 0xb95e8083;
      auVar466._28_4_ = 0xb95e8083;
      auVar229 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar249 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar250 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar251 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar252 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar253 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar254 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar255 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar172 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
      in_ZMM30 = ZEXT1664(auVar172);
      auVar256 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      for (; uVar159 != uVar154; uVar159 = uVar159 + 1) {
        local_1c0 = (_func_int ***)
                    ((long)(_func_int ***)local_f8.data +
                    local_f8.cstep * uVar159 * local_f8.elemsize);
        iVar143 = bottom_blob->w;
        iVar144 = bottom_blob->h;
        uVar147 = 0;
        uVar148 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar148 = uVar147;
        }
        uVar138 = local_f8.w;
        if (local_f8.w < 1) {
          uVar138 = 0;
        }
        uVar155 = local_f8.h;
        if (local_f8.h < 1) {
          uVar155 = 0;
        }
        while (uVar137 = (uint)uVar147, uVar137 != uVar155) {
          iVar135 = (1 - uVar171) * iVar156;
          for (uVar139 = 0; uVar139 != uVar138; uVar139 = uVar139 + 1) {
            if (lVar153 == 0) {
              auVar282 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar282 = ZEXT3264(*(undefined1 (*) [32])(lVar153 + uVar159 * 0x20));
            }
            pvVar165 = bottom_blob->data;
            lVar168 = (long)(this->weight_data_tm).data +
                      (this->weight_data_tm).cstep * uVar159 * (this->weight_data_tm).elemsize +
                      0xe0;
            for (uVar147 = 0; uVar147 != uVar148; uVar147 = uVar147 + 1) {
              lVar169 = lVar168;
              for (uVar163 = 0; uVar163 != uVar157; uVar163 = uVar163 + 1) {
                iVar136 = (((int)uVar163 - uVar134) + 1) * iVar8 + uVar137;
                if (((-1 < iVar136) && (iVar140 = iVar136 / iVar167, iVar136 % iVar167 == 0)) &&
                   (iVar140 < iVar144)) {
                  lVar115 = (long)iVar140 * (long)bottom_blob->w * bottom_blob->elemsize +
                            bottom_blob->cstep * bottom_blob->elemsize * uVar147;
                  iVar136 = iVar135;
                  for (lVar161 = 0; uVar164 * 0x100 != lVar161; lVar161 = lVar161 + 0x100) {
                    if (((-1 < iVar136) && (iVar140 = iVar136 / iVar151, iVar136 % iVar151 == 0)) &&
                       (iVar140 < iVar143)) {
                      lVar146 = (long)(iVar140 << 3);
                      uVar10 = *(undefined4 *)((long)pvVar165 + lVar146 * 4 + lVar115);
                      auVar394._4_4_ = uVar10;
                      auVar394._0_4_ = uVar10;
                      auVar394._8_4_ = uVar10;
                      auVar394._12_4_ = uVar10;
                      auVar394._16_4_ = uVar10;
                      auVar394._20_4_ = uVar10;
                      auVar394._24_4_ = uVar10;
                      auVar394._28_4_ = uVar10;
                      uVar10 = *(undefined4 *)((long)pvVar165 + lVar146 * 4 + lVar115 + 4);
                      auVar425._4_4_ = uVar10;
                      auVar425._0_4_ = uVar10;
                      auVar425._8_4_ = uVar10;
                      auVar425._12_4_ = uVar10;
                      auVar425._16_4_ = uVar10;
                      auVar425._20_4_ = uVar10;
                      auVar425._24_4_ = uVar10;
                      auVar425._28_4_ = uVar10;
                      uVar10 = *(undefined4 *)((long)pvVar165 + lVar146 * 4 + lVar115 + 8);
                      auVar494._4_4_ = uVar10;
                      auVar494._0_4_ = uVar10;
                      auVar494._8_4_ = uVar10;
                      auVar494._12_4_ = uVar10;
                      auVar494._16_4_ = uVar10;
                      auVar494._20_4_ = uVar10;
                      auVar494._24_4_ = uVar10;
                      auVar494._28_4_ = uVar10;
                      auVar257 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0xc)));
                      auVar258 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x10)));
                      auVar259 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x14)));
                      auVar260 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x18)));
                      auVar230 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x1c)));
                      auVar173 = vfmadd231ps_fma(auVar282._0_32_,auVar394,
                                                 *(undefined1 (*) [32])(lVar169 + -0xe0 + lVar161));
                      auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar425,
                                                 *(undefined1 (*) [32])(lVar169 + -0xc0 + lVar161));
                      auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar494,
                                                 *(undefined1 (*) [32])(lVar169 + -0xa0 + lVar161));
                      auVar257 = vfmadd231ps_avx512vl
                                           (ZEXT1632(auVar173),auVar257,
                                            *(undefined1 (*) [32])(lVar169 + -0x80 + lVar161));
                      auVar257 = vfmadd231ps_avx512vl
                                           (auVar257,auVar258,
                                            *(undefined1 (*) [32])(lVar169 + -0x60 + lVar161));
                      auVar257 = vfmadd231ps_avx512vl
                                           (auVar257,auVar259,
                                            *(undefined1 (*) [32])(lVar169 + -0x40 + lVar161));
                      auVar257 = vfmadd231ps_avx512vl
                                           (auVar257,auVar260,
                                            *(undefined1 (*) [32])(lVar169 + -0x20 + lVar161));
                      auVar257 = vfmadd231ps_avx512vl
                                           (auVar257,auVar230,
                                            *(undefined1 (*) [32])(lVar169 + lVar161));
                      auVar282 = ZEXT3264(auVar257);
                    }
                    iVar136 = iVar136 + iVar156;
                  }
                }
                lVar169 = lVar169 + (long)(int)uVar171 * 0x100;
              }
              lVar168 = lVar168 + (long)(int)(uVar171 * uVar134 * 0x40) * 4;
            }
            auVar257 = auVar282._0_32_;
            auVar261 = auVar257;
            if (iVar158 - 1U < 6) {
              auVar261 = vmaxps_avx512vl(auVar257,ZEXT1632(auVar172));
              switch(iVar158) {
              case 2:
                auVar257 = vminps_avx512vl(auVar257,ZEXT1632(auVar172));
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar81._4_4_ = uVar10;
                auVar81._0_4_ = uVar10;
                auVar81._8_4_ = uVar10;
                auVar81._12_4_ = uVar10;
                auVar81._16_4_ = uVar10;
                auVar81._20_4_ = uVar10;
                auVar81._24_4_ = uVar10;
                auVar81._28_4_ = uVar10;
                auVar261 = vfmadd231ps_avx512vl(auVar261,auVar257,auVar81);
                break;
              case 3:
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar79._4_4_ = uVar10;
                auVar79._0_4_ = uVar10;
                auVar79._8_4_ = uVar10;
                auVar79._12_4_ = uVar10;
                auVar79._16_4_ = uVar10;
                auVar79._20_4_ = uVar10;
                auVar79._24_4_ = uVar10;
                auVar79._28_4_ = uVar10;
                auVar257 = vmaxps_avx512vl(auVar257,auVar79);
                uVar10 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var145))[1];
                auVar80._4_4_ = uVar10;
                auVar80._0_4_ = uVar10;
                auVar80._8_4_ = uVar10;
                auVar80._12_4_ = uVar10;
                auVar80._16_4_ = uVar10;
                auVar80._20_4_ = uVar10;
                auVar80._24_4_ = uVar10;
                auVar80._28_4_ = uVar10;
                auVar261 = vminps_avx512vl(auVar257,auVar80);
                break;
              case 4:
                auVar77._8_4_ = 0x80000000;
                auVar77._0_8_ = 0x8000000080000000;
                auVar77._12_4_ = 0x80000000;
                auVar77._16_4_ = 0x80000000;
                auVar77._20_4_ = 0x80000000;
                auVar77._24_4_ = 0x80000000;
                auVar77._28_4_ = 0x80000000;
                auVar257 = vxorps_avx512vl(auVar257,auVar77);
                auVar257 = vminps_avx(auVar257,auVar335);
                auVar257 = vmaxps_avx(auVar257,auVar342);
                auVar173 = vfmadd231ps_fma(auVar349,auVar257,auVar355);
                auVar258 = vroundps_avx(ZEXT1632(auVar173),1);
                uVar147 = vcmpps_avx512vl(ZEXT1632(auVar173),auVar258,1);
                auVar259 = vsubps_avx512vl(auVar258,auVar361);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar267._0_4_ =
                     (float)((uint)bVar15 * auVar259._0_4_ | (uint)!bVar15 * auVar258._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar267._4_4_ =
                     (float)((uint)bVar15 * auVar259._4_4_ | (uint)!bVar15 * auVar258._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar267._8_4_ =
                     (float)((uint)bVar15 * auVar259._8_4_ | (uint)!bVar15 * auVar258._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar267._12_4_ =
                     (float)((uint)bVar15 * auVar259._12_4_ | (uint)!bVar15 * auVar258._12_4_);
                bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
                auVar267._16_4_ =
                     (float)((uint)bVar15 * auVar259._16_4_ | (uint)!bVar15 * auVar258._16_4_);
                bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
                auVar267._20_4_ =
                     (float)((uint)bVar15 * auVar259._20_4_ | (uint)!bVar15 * auVar258._20_4_);
                bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
                auVar267._24_4_ =
                     (float)((uint)bVar15 * auVar259._24_4_ | (uint)!bVar15 * auVar258._24_4_);
                bVar15 = SUB81(uVar147 >> 7,0);
                auVar267._28_4_ =
                     (float)((uint)bVar15 * auVar259._28_4_ | (uint)!bVar15 * auVar258._28_4_);
                auVar173 = vfmsub231ps_fma(auVar257,auVar267,auVar367);
                auVar78._8_4_ = 0x395e8083;
                auVar78._0_8_ = 0x395e8083395e8083;
                auVar78._12_4_ = 0x395e8083;
                auVar78._16_4_ = 0x395e8083;
                auVar78._20_4_ = 0x395e8083;
                auVar78._24_4_ = 0x395e8083;
                auVar78._28_4_ = 0x395e8083;
                auVar257 = vfmsub231ps_avx512vl(ZEXT1632(auVar173),auVar267,auVar78);
                auVar395._0_4_ = auVar257._0_4_ * auVar257._0_4_;
                auVar395._4_4_ = auVar257._4_4_ * auVar257._4_4_;
                auVar395._8_4_ = auVar257._8_4_ * auVar257._8_4_;
                auVar395._12_4_ = auVar257._12_4_ * auVar257._12_4_;
                auVar395._16_4_ = auVar257._16_4_ * auVar257._16_4_;
                auVar395._20_4_ = auVar257._20_4_ * auVar257._20_4_;
                auVar395._24_4_ = auVar257._24_4_ * auVar257._24_4_;
                auVar395._28_4_ = 0;
                auVar173 = vfmadd213ps_fma(auVar228,auVar257,auVar436);
                auVar173 = vfmadd213ps_fma(ZEXT1632(auVar173),auVar257,auVar442);
                auVar173 = vfmadd213ps_fma(ZEXT1632(auVar173),auVar257,auVar448);
                auVar173 = vfmadd213ps_fma(ZEXT1632(auVar173),auVar257,auVar454);
                auVar173 = vfmadd213ps_fma(ZEXT1632(auVar173),auVar257,auVar349);
                auVar173 = vfmadd213ps_fma(ZEXT1632(auVar173),auVar395,auVar257);
                auVar326._0_4_ = auVar173._0_4_ + 1.0;
                auVar326._4_4_ = auVar173._4_4_ + 1.0;
                auVar326._8_4_ = auVar173._8_4_ + 1.0;
                auVar326._12_4_ = auVar173._12_4_ + 1.0;
                auVar326._16_4_ = 0x3f800000;
                auVar326._20_4_ = 0x3f800000;
                auVar326._24_4_ = 0x3f800000;
                auVar326._28_4_ = 0x3f800000;
                auVar396._0_4_ = (int)auVar267._0_4_;
                auVar396._4_4_ = (int)auVar267._4_4_;
                auVar396._8_4_ = (int)auVar267._8_4_;
                auVar396._12_4_ = (int)auVar267._12_4_;
                auVar396._16_4_ = (int)auVar267._16_4_;
                auVar396._20_4_ = (int)auVar267._20_4_;
                auVar396._24_4_ = (int)auVar267._24_4_;
                auVar396._28_4_ = (int)auVar267._28_4_;
                auVar257 = vpslld_avx2(auVar396,0x17);
                auVar257 = vpaddd_avx2(auVar460,auVar257);
                auVar173 = vfmadd213ps_fma(auVar257,auVar326,auVar361);
                auVar257 = vrcpps_avx(ZEXT1632(auVar173));
                auVar173 = vfmsub213ps_fma(ZEXT1632(auVar173),auVar257,auVar361);
                auVar173 = vfnmadd132ps_fma(ZEXT1632(auVar173),auVar257,auVar257);
                auVar261 = ZEXT1632(auVar173);
                break;
              case 5:
                auVar257 = vminps_avx(auVar257,auVar335);
                auVar257 = vmaxps_avx(auVar257,auVar342);
                auVar173 = vfmadd213ps_fma(auVar355,auVar257,auVar349);
                auVar258 = vroundps_avx(ZEXT1632(auVar173),1);
                uVar147 = vcmpps_avx512vl(ZEXT1632(auVar173),auVar258,1);
                auVar259 = vsubps_avx512vl(auVar258,auVar361);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar262._0_4_ =
                     (float)((uint)bVar15 * auVar259._0_4_ | (uint)!bVar15 * auVar258._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar262._4_4_ =
                     (float)((uint)bVar15 * auVar259._4_4_ | (uint)!bVar15 * auVar258._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar262._8_4_ =
                     (float)((uint)bVar15 * auVar259._8_4_ | (uint)!bVar15 * auVar258._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar262._12_4_ =
                     (float)((uint)bVar15 * auVar259._12_4_ | (uint)!bVar15 * auVar258._12_4_);
                bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
                auVar262._16_4_ =
                     (float)((uint)bVar15 * auVar259._16_4_ | (uint)!bVar15 * auVar258._16_4_);
                bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
                auVar262._20_4_ =
                     (float)((uint)bVar15 * auVar259._20_4_ | (uint)!bVar15 * auVar258._20_4_);
                bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
                auVar262._24_4_ =
                     (float)((uint)bVar15 * auVar259._24_4_ | (uint)!bVar15 * auVar258._24_4_);
                bVar15 = SUB81(uVar147 >> 7,0);
                auVar262._28_4_ =
                     (float)((uint)bVar15 * auVar259._28_4_ | (uint)!bVar15 * auVar258._28_4_);
                auVar173 = vfmsub231ps_fma(auVar257,auVar262,auVar367);
                auVar173 = vfnmsub231ps_fma(ZEXT1632(auVar173),auVar262,auVar466);
                auVar258 = ZEXT1632(auVar173);
                auVar257 = vfmadd213ps_avx512vl(auVar228,auVar258,auVar436);
                auVar257 = vfmadd213ps_avx512vl(auVar257,auVar258,auVar442);
                auVar257 = vfmadd213ps_avx512vl(auVar257,auVar258,auVar448);
                auVar258 = ZEXT1632(auVar173);
                auVar257 = vfmadd213ps_avx512vl(auVar257,auVar258,auVar454);
                auVar257 = vfmadd213ps_avx512vl(auVar257,auVar258,auVar349);
                auVar257 = vfmadd213ps_avx512vl
                                     (auVar257,ZEXT1632(CONCAT412(auVar173._12_4_ * auVar173._12_4_,
                                                                  CONCAT48(auVar173._8_4_ *
                                                                           auVar173._8_4_,
                                                                           CONCAT44(auVar173._4_4_ *
                                                                                    auVar173._4_4_,
                                                                                    auVar173._0_4_ *
                                                                                    auVar173._0_4_))
                                                                 )),auVar258);
                auVar258 = vaddps_avx512vl(auVar257,auVar361);
                auVar426._0_4_ = (int)auVar262._0_4_;
                auVar426._4_4_ = (int)auVar262._4_4_;
                auVar426._8_4_ = (int)auVar262._8_4_;
                auVar426._12_4_ = (int)auVar262._12_4_;
                auVar426._16_4_ = (int)auVar262._16_4_;
                auVar426._20_4_ = (int)auVar262._20_4_;
                auVar426._24_4_ = (int)auVar262._24_4_;
                auVar426._28_4_ = (int)auVar262._28_4_;
                auVar257 = vpslld_avx2(auVar426,0x17);
                auVar257 = vpaddd_avx2(auVar257,auVar460);
                auVar173 = vfmadd213ps_fma(auVar257,auVar258,auVar361);
                uVar147 = vcmpps_avx512vl(ZEXT1632(auVar173),ZEXT1632(auVar172),2);
                auVar71._8_4_ = 0x800000;
                auVar71._0_8_ = 0x80000000800000;
                auVar71._12_4_ = 0x800000;
                auVar71._16_4_ = 0x800000;
                auVar71._20_4_ = 0x800000;
                auVar71._24_4_ = 0x800000;
                auVar71._28_4_ = 0x800000;
                auVar257 = vmaxps_avx512vl(ZEXT1632(auVar173),auVar71);
                auVar260 = vpsrld_avx2(auVar257,0x17);
                auVar495._8_4_ = 0x807fffff;
                auVar495._0_8_ = 0x807fffff807fffff;
                auVar495._12_4_ = 0x807fffff;
                auVar495._16_4_ = 0x807fffff;
                auVar495._20_4_ = 0x807fffff;
                auVar495._24_4_ = 0x807fffff;
                auVar495._28_4_ = 0x807fffff;
                auVar72._8_4_ = 0x3f000000;
                auVar72._0_8_ = 0x3f0000003f000000;
                auVar72._12_4_ = 0x3f000000;
                auVar72._16_4_ = 0x3f000000;
                auVar72._20_4_ = 0x3f000000;
                auVar72._24_4_ = 0x3f000000;
                auVar72._28_4_ = 0x3f000000;
                auVar257 = vpternlogd_avx512vl(auVar257,auVar495,auVar72,0xea);
                auVar73._8_4_ = 0x3f3504f3;
                auVar73._0_8_ = 0x3f3504f33f3504f3;
                auVar73._12_4_ = 0x3f3504f3;
                auVar73._16_4_ = 0x3f3504f3;
                auVar73._20_4_ = 0x3f3504f3;
                auVar73._24_4_ = 0x3f3504f3;
                auVar73._28_4_ = 0x3f3504f3;
                uVar163 = vcmpps_avx512vl(auVar257,auVar73,1);
                auVar258 = vaddps_avx512vl(auVar257,auVar229);
                auVar259 = vaddps_avx512vl(auVar258,auVar257);
                bVar15 = (bool)((byte)uVar163 & 1);
                auVar263._0_4_ =
                     (float)((uint)bVar15 * auVar259._0_4_ | (uint)!bVar15 * auVar258._0_4_);
                bVar15 = (bool)((byte)(uVar163 >> 1) & 1);
                auVar263._4_4_ =
                     (float)((uint)bVar15 * auVar259._4_4_ | (uint)!bVar15 * auVar258._4_4_);
                bVar15 = (bool)((byte)(uVar163 >> 2) & 1);
                auVar263._8_4_ =
                     (float)((uint)bVar15 * auVar259._8_4_ | (uint)!bVar15 * auVar258._8_4_);
                bVar15 = (bool)((byte)(uVar163 >> 3) & 1);
                auVar263._12_4_ =
                     (float)((uint)bVar15 * auVar259._12_4_ | (uint)!bVar15 * auVar258._12_4_);
                bVar15 = (bool)((byte)(uVar163 >> 4) & 1);
                auVar263._16_4_ =
                     (float)((uint)bVar15 * auVar259._16_4_ | (uint)!bVar15 * auVar258._16_4_);
                bVar15 = (bool)((byte)(uVar163 >> 5) & 1);
                auVar263._20_4_ =
                     (float)((uint)bVar15 * auVar259._20_4_ | (uint)!bVar15 * auVar258._20_4_);
                bVar15 = (bool)((byte)(uVar163 >> 6) & 1);
                auVar263._24_4_ =
                     (float)((uint)bVar15 * auVar259._24_4_ | (uint)!bVar15 * auVar258._24_4_);
                bVar15 = SUB81(uVar163 >> 7,0);
                auVar263._28_4_ = (uint)bVar15 * auVar259._28_4_ | (uint)!bVar15 * auVar258._28_4_;
                auVar112._4_4_ = auVar263._4_4_ * auVar263._4_4_;
                auVar112._0_4_ = auVar263._0_4_ * auVar263._0_4_;
                auVar112._8_4_ = auVar263._8_4_ * auVar263._8_4_;
                auVar112._12_4_ = auVar263._12_4_ * auVar263._12_4_;
                auVar112._16_4_ = auVar263._16_4_ * auVar263._16_4_;
                auVar112._20_4_ = auVar263._20_4_ * auVar263._20_4_;
                auVar112._24_4_ = auVar263._24_4_ * auVar263._24_4_;
                auVar112._28_4_ = auVar257._28_4_;
                auVar74._8_4_ = 0xbdebd1b8;
                auVar74._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar74._12_4_ = 0xbdebd1b8;
                auVar74._16_4_ = 0xbdebd1b8;
                auVar74._20_4_ = 0xbdebd1b8;
                auVar74._24_4_ = 0xbdebd1b8;
                auVar74._28_4_ = 0xbdebd1b8;
                auVar257 = vfmadd213ps_avx512vl(auVar249,auVar263,auVar74);
                auVar75._8_4_ = 0x3def251a;
                auVar75._0_8_ = 0x3def251a3def251a;
                auVar75._12_4_ = 0x3def251a;
                auVar75._16_4_ = 0x3def251a;
                auVar75._20_4_ = 0x3def251a;
                auVar75._24_4_ = 0x3def251a;
                auVar75._28_4_ = 0x3def251a;
                auVar257 = vfmadd213ps_avx512vl(auVar257,auVar263,auVar75);
                auVar257 = vfmadd213ps_avx512vl(auVar257,auVar263,auVar250);
                auVar257 = vfmadd213ps_avx512vl(auVar257,auVar263,auVar251);
                auVar257 = vfmadd213ps_avx512vl(auVar257,auVar263,auVar252);
                auVar257 = vfmadd213ps_avx512vl(auVar257,auVar263,auVar253);
                auVar257 = vfmadd213ps_avx512vl(auVar257,auVar263,auVar254);
                auVar257 = vfmadd213ps_avx512vl(auVar257,auVar263,auVar255);
                auVar258 = vmulps_avx512vl(auVar112,auVar263);
                auVar258 = vmulps_avx512vl(auVar258,auVar257);
                auVar76._8_4_ = 0xffffff82;
                auVar76._0_8_ = 0xffffff82ffffff82;
                auVar76._12_4_ = 0xffffff82;
                auVar76._16_4_ = 0xffffff82;
                auVar76._20_4_ = 0xffffff82;
                auVar76._24_4_ = 0xffffff82;
                auVar76._28_4_ = 0xffffff82;
                auVar257 = vpaddd_avx512vl(auVar260,auVar76);
                auVar257 = vcvtdq2ps_avx(auVar257);
                auVar259 = vsubps_avx512vl(auVar257,auVar361);
                bVar15 = (bool)((byte)uVar163 & 1);
                auVar264._0_4_ = (uint)bVar15 * auVar259._0_4_ | (uint)!bVar15 * auVar257._0_4_;
                bVar15 = (bool)((byte)(uVar163 >> 1) & 1);
                auVar264._4_4_ = (uint)bVar15 * auVar259._4_4_ | (uint)!bVar15 * auVar257._4_4_;
                bVar15 = (bool)((byte)(uVar163 >> 2) & 1);
                auVar264._8_4_ = (uint)bVar15 * auVar259._8_4_ | (uint)!bVar15 * auVar257._8_4_;
                bVar15 = (bool)((byte)(uVar163 >> 3) & 1);
                auVar264._12_4_ = (uint)bVar15 * auVar259._12_4_ | (uint)!bVar15 * auVar257._12_4_;
                bVar15 = (bool)((byte)(uVar163 >> 4) & 1);
                auVar264._16_4_ = (uint)bVar15 * auVar259._16_4_ | (uint)!bVar15 * auVar257._16_4_;
                bVar15 = (bool)((byte)(uVar163 >> 5) & 1);
                auVar264._20_4_ = (uint)bVar15 * auVar259._20_4_ | (uint)!bVar15 * auVar257._20_4_;
                bVar15 = (bool)((byte)(uVar163 >> 6) & 1);
                auVar264._24_4_ = (uint)bVar15 * auVar259._24_4_ | (uint)!bVar15 * auVar257._24_4_;
                bVar15 = SUB81(uVar163 >> 7,0);
                auVar264._28_4_ = (uint)bVar15 * auVar259._28_4_ | (uint)!bVar15 * auVar257._28_4_;
                auVar257 = vfmadd231ps_avx512vl(auVar258,auVar264,auVar466);
                auVar257 = vfmsub231ps_avx512vl(auVar257,auVar349,auVar112);
                auVar257 = vsubps_avx512vl(auVar257,auVar263);
                auVar173 = vfmsub231ps_fma(auVar257,auVar367,auVar264);
                auVar257 = vmulps_avx512vl(ZEXT1632(auVar173),auVar256);
                auVar258 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar265._0_4_ = (uint)bVar15 * auVar258._0_4_ | (uint)!bVar15 * auVar257._0_4_;
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar265._4_4_ = (uint)bVar15 * auVar258._4_4_ | (uint)!bVar15 * auVar257._4_4_;
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar265._8_4_ = (uint)bVar15 * auVar258._8_4_ | (uint)!bVar15 * auVar257._8_4_;
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar265._12_4_ = (uint)bVar15 * auVar258._12_4_ | (uint)!bVar15 * auVar257._12_4_;
                bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
                auVar265._16_4_ = (uint)bVar15 * auVar258._16_4_ | (uint)!bVar15 * auVar257._16_4_;
                bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
                auVar265._20_4_ = (uint)bVar15 * auVar258._20_4_ | (uint)!bVar15 * auVar257._20_4_;
                bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
                auVar265._24_4_ = (uint)bVar15 * auVar258._24_4_ | (uint)!bVar15 * auVar257._24_4_;
                bVar15 = SUB81(uVar147 >> 7,0);
                auVar265._28_4_ = (uint)bVar15 * auVar258._28_4_ | (uint)!bVar15 * auVar257._28_4_;
                auVar257 = vminps_avx(auVar265,auVar335);
                auVar257 = vmaxps_avx(auVar257,auVar342);
                auVar173 = vfmadd213ps_fma(auVar355,auVar257,auVar349);
                auVar258 = vroundps_avx(ZEXT1632(auVar173),1);
                uVar147 = vcmpps_avx512vl(ZEXT1632(auVar173),auVar258,1);
                auVar259 = vsubps_avx512vl(auVar258,auVar361);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar266._0_4_ =
                     (float)((uint)bVar15 * auVar259._0_4_ | (uint)!bVar15 * auVar258._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar266._4_4_ =
                     (float)((uint)bVar15 * auVar259._4_4_ | (uint)!bVar15 * auVar258._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar266._8_4_ =
                     (float)((uint)bVar15 * auVar259._8_4_ | (uint)!bVar15 * auVar258._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar266._12_4_ =
                     (float)((uint)bVar15 * auVar259._12_4_ | (uint)!bVar15 * auVar258._12_4_);
                bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
                auVar266._16_4_ =
                     (float)((uint)bVar15 * auVar259._16_4_ | (uint)!bVar15 * auVar258._16_4_);
                bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
                auVar266._20_4_ =
                     (float)((uint)bVar15 * auVar259._20_4_ | (uint)!bVar15 * auVar258._20_4_);
                bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
                auVar266._24_4_ =
                     (float)((uint)bVar15 * auVar259._24_4_ | (uint)!bVar15 * auVar258._24_4_);
                bVar15 = SUB81(uVar147 >> 7,0);
                auVar266._28_4_ =
                     (float)((uint)bVar15 * auVar259._28_4_ | (uint)!bVar15 * auVar258._28_4_);
                auVar173 = vfmsub231ps_fma(auVar257,auVar266,auVar367);
                auVar173 = vfnmsub231ps_fma(ZEXT1632(auVar173),auVar266,auVar466);
                auVar258 = ZEXT1632(auVar173);
                auVar257 = vfmadd213ps_avx512vl(auVar228,auVar258,auVar436);
                auVar257 = vfmadd213ps_avx512vl(auVar257,auVar258,auVar442);
                auVar257 = vfmadd213ps_avx512vl(auVar257,auVar258,auVar448);
                auVar258 = ZEXT1632(auVar173);
                auVar257 = vfmadd213ps_avx512vl(auVar257,auVar258,auVar454);
                auVar257 = vfmadd213ps_avx512vl(auVar257,auVar258,auVar349);
                auVar257 = vfmadd213ps_avx512vl
                                     (auVar257,ZEXT1632(CONCAT412(auVar173._12_4_ * auVar173._12_4_,
                                                                  CONCAT48(auVar173._8_4_ *
                                                                           auVar173._8_4_,
                                                                           CONCAT44(auVar173._4_4_ *
                                                                                    auVar173._4_4_,
                                                                                    auVar173._0_4_ *
                                                                                    auVar173._0_4_))
                                                                 )),auVar258);
                auVar258 = vaddps_avx512vl(auVar257,auVar361);
                auVar427._0_4_ = (int)auVar266._0_4_;
                auVar427._4_4_ = (int)auVar266._4_4_;
                auVar427._8_4_ = (int)auVar266._8_4_;
                auVar427._12_4_ = (int)auVar266._12_4_;
                auVar427._16_4_ = (int)auVar266._16_4_;
                auVar427._20_4_ = (int)auVar266._20_4_;
                auVar427._24_4_ = (int)auVar266._24_4_;
                auVar427._28_4_ = (int)auVar266._28_4_;
                auVar257 = vpslld_avx2(auVar427,0x17);
                auVar257 = vpaddd_avx2(auVar257,auVar460);
                auVar173 = vfmadd213ps_fma(auVar257,auVar258,auVar361);
                auVar257 = vrcpps_avx(ZEXT1632(auVar173));
                auVar173 = vfmsub213ps_fma(ZEXT1632(auVar173),auVar257,auVar361);
                auVar173 = vfnmadd132ps_fma(ZEXT1632(auVar173),auVar257,auVar257);
                auVar258 = vfnmadd213ps_avx512vl(ZEXT1632(auVar173),auVar256,auVar229);
                auVar261._4_4_ = auVar258._4_4_ * auVar282._4_4_;
                auVar261._0_4_ = auVar258._0_4_ * auVar282._0_4_;
                auVar261._8_4_ = auVar258._8_4_ * auVar282._8_4_;
                auVar261._12_4_ = auVar258._12_4_ * auVar282._12_4_;
                auVar261._16_4_ = auVar258._16_4_ * auVar282._16_4_;
                auVar261._20_4_ = auVar258._20_4_ * auVar282._20_4_;
                auVar261._24_4_ = auVar258._24_4_ * auVar282._24_4_;
                auVar261._28_4_ = auVar257._28_4_;
                break;
              case 6:
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar397._4_4_ = uVar10;
                auVar397._0_4_ = uVar10;
                auVar397._8_4_ = uVar10;
                auVar397._12_4_ = uVar10;
                auVar397._16_4_ = uVar10;
                auVar397._20_4_ = uVar10;
                auVar397._24_4_ = uVar10;
                auVar397._28_4_ = uVar10;
                uVar10 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var145))[1];
                auVar70._4_4_ = uVar10;
                auVar70._0_4_ = uVar10;
                auVar70._8_4_ = uVar10;
                auVar70._12_4_ = uVar10;
                auVar70._16_4_ = uVar10;
                auVar70._20_4_ = uVar10;
                auVar70._24_4_ = uVar10;
                auVar70._28_4_ = uVar10;
                auVar257 = vfmadd213ps_avx512vl(auVar397,auVar257,auVar70);
                auVar257 = vmaxps_avx512vl(auVar257,ZEXT1632(auVar172));
                auVar257 = vminps_avx(auVar257,auVar361);
                auVar261._4_4_ = auVar257._4_4_ * auVar282._4_4_;
                auVar261._0_4_ = auVar257._0_4_ * auVar282._0_4_;
                auVar261._8_4_ = auVar257._8_4_ * auVar282._8_4_;
                auVar261._12_4_ = auVar257._12_4_ * auVar282._12_4_;
                auVar261._16_4_ = auVar257._16_4_ * auVar282._16_4_;
                auVar261._20_4_ = auVar257._20_4_ * auVar282._20_4_;
                auVar261._24_4_ = auVar257._24_4_ * auVar282._24_4_;
                auVar261._28_4_ = auVar257._28_4_;
              }
            }
            *(undefined1 (*) [32])local_1c0 = auVar261;
            local_1c0 = local_1c0 + 4;
            iVar135 = iVar135 + 1;
          }
          uVar147 = (ulong)(uVar137 + 1);
        }
      }
    }
    if ((iVar170 == 4) && (uVar150 == 8)) {
      p_Var145 = pp_Var149[-3];
      uVar171 = *(uint *)(&this->field_0xd4 + (long)p_Var145);
      uVar134 = *(uint *)(&this->field_0xd8 + (long)p_Var145);
      iVar156 = *(int *)(&this->field_0xdc + (long)p_Var145);
      iVar8 = *(int *)(&this->field_0xe0 + (long)p_Var145);
      iVar151 = *(int *)(&this->field_0xe4 + (long)p_Var145);
      iVar167 = *(int *)(&this->field_0xe8 + (long)p_Var145);
      iVar158 = *(int *)(&this->field_0x114 + (long)p_Var145);
      local_a8._0_8_ = p_Var145;
      lVar153 = *(long *)(&this->field_0x1a8 + (long)p_Var145);
      uVar159 = 0;
      uVar164 = 0;
      if (0 < (int)uVar171) {
        uVar164 = (ulong)uVar171;
      }
      uVar157 = 0;
      if (0 < (int)uVar134) {
        uVar157 = (ulong)uVar134;
      }
      uVar154 = (ulong)(uint)local_f8.c;
      if (local_f8.c < 1) {
        uVar154 = uVar159;
      }
      auVar336._8_4_ = 0x42b0c0a5;
      auVar336._0_8_ = 0x42b0c0a542b0c0a5;
      auVar336._12_4_ = 0x42b0c0a5;
      auVar336._16_4_ = 0x42b0c0a5;
      auVar336._20_4_ = 0x42b0c0a5;
      auVar336._24_4_ = 0x42b0c0a5;
      auVar336._28_4_ = 0x42b0c0a5;
      auVar343._8_4_ = 0xc2b0c0a5;
      auVar343._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar343._12_4_ = 0xc2b0c0a5;
      auVar343._16_4_ = 0xc2b0c0a5;
      auVar343._20_4_ = 0xc2b0c0a5;
      auVar343._24_4_ = 0xc2b0c0a5;
      auVar343._28_4_ = 0xc2b0c0a5;
      auVar350._8_4_ = 0x3f000000;
      auVar350._0_8_ = 0x3f0000003f000000;
      auVar350._12_4_ = 0x3f000000;
      auVar350._16_4_ = 0x3f000000;
      auVar350._20_4_ = 0x3f000000;
      auVar350._24_4_ = 0x3f000000;
      auVar350._28_4_ = 0x3f000000;
      auVar356._8_4_ = 0x3fb8aa3b;
      auVar356._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar356._12_4_ = 0x3fb8aa3b;
      auVar356._16_4_ = 0x3fb8aa3b;
      auVar356._20_4_ = 0x3fb8aa3b;
      auVar356._24_4_ = 0x3fb8aa3b;
      auVar356._28_4_ = 0x3fb8aa3b;
      auVar362._8_4_ = 0x3f800000;
      auVar362._0_8_ = 0x3f8000003f800000;
      auVar362._12_4_ = 0x3f800000;
      auVar362._16_4_ = 0x3f800000;
      auVar362._20_4_ = 0x3f800000;
      auVar362._24_4_ = 0x3f800000;
      auVar362._28_4_ = 0x3f800000;
      auVar368._8_4_ = 0x3f318000;
      auVar368._0_8_ = 0x3f3180003f318000;
      auVar368._12_4_ = 0x3f318000;
      auVar368._16_4_ = 0x3f318000;
      auVar368._20_4_ = 0x3f318000;
      auVar368._24_4_ = 0x3f318000;
      auVar368._28_4_ = 0x3f318000;
      auVar228 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar437._8_4_ = 0x3ab743ce;
      auVar437._0_8_ = 0x3ab743ce3ab743ce;
      auVar437._12_4_ = 0x3ab743ce;
      auVar437._16_4_ = 0x3ab743ce;
      auVar437._20_4_ = 0x3ab743ce;
      auVar437._24_4_ = 0x3ab743ce;
      auVar437._28_4_ = 0x3ab743ce;
      auVar443._8_4_ = 0x3c088908;
      auVar443._0_8_ = 0x3c0889083c088908;
      auVar443._12_4_ = 0x3c088908;
      auVar443._16_4_ = 0x3c088908;
      auVar443._20_4_ = 0x3c088908;
      auVar443._24_4_ = 0x3c088908;
      auVar443._28_4_ = 0x3c088908;
      auVar449._8_4_ = 0x3d2aa9c1;
      auVar449._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar449._12_4_ = 0x3d2aa9c1;
      auVar449._16_4_ = 0x3d2aa9c1;
      auVar449._20_4_ = 0x3d2aa9c1;
      auVar449._24_4_ = 0x3d2aa9c1;
      auVar449._28_4_ = 0x3d2aa9c1;
      auVar455._8_4_ = 0x3e2aaaaa;
      auVar455._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar455._12_4_ = 0x3e2aaaaa;
      auVar455._16_4_ = 0x3e2aaaaa;
      auVar455._20_4_ = 0x3e2aaaaa;
      auVar455._24_4_ = 0x3e2aaaaa;
      auVar455._28_4_ = 0x3e2aaaaa;
      auVar461._8_4_ = 0x3f800000;
      auVar461._0_8_ = 0x3f8000003f800000;
      auVar461._12_4_ = 0x3f800000;
      auVar461._16_4_ = 0x3f800000;
      auVar461._20_4_ = 0x3f800000;
      auVar461._24_4_ = 0x3f800000;
      auVar461._28_4_ = 0x3f800000;
      auVar467._8_4_ = 0xb95e8083;
      auVar467._0_8_ = 0xb95e8083b95e8083;
      auVar467._12_4_ = 0xb95e8083;
      auVar467._16_4_ = 0xb95e8083;
      auVar467._20_4_ = 0xb95e8083;
      auVar467._24_4_ = 0xb95e8083;
      auVar467._28_4_ = 0xb95e8083;
      auVar229 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      auVar249 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar250 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar251 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar252 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar253 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar254 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar255 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar256 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar257 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar258 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar172 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
      in_ZMM30 = ZEXT1664(auVar172);
      auVar259 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      for (; uVar159 != uVar154; uVar159 = uVar159 + 1) {
        local_1c0 = (_func_int ***)
                    ((long)(_func_int ***)local_f8.data +
                    local_f8.cstep * uVar159 * local_f8.elemsize);
        iVar143 = bottom_blob->w;
        iVar144 = bottom_blob->h;
        uVar147 = 0;
        uVar148 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar148 = uVar147;
        }
        uVar138 = local_f8.w;
        if (local_f8.w < 1) {
          uVar138 = 0;
        }
        uVar155 = local_f8.h;
        if (local_f8.h < 1) {
          uVar155 = 0;
        }
        while (uVar137 = (uint)uVar147, uVar137 != uVar155) {
          iVar135 = (1 - uVar171) * iVar156;
          for (uVar139 = 0; uVar139 != uVar138; uVar139 = uVar139 + 1) {
            if (lVar153 == 0) {
              auVar282 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar282 = ZEXT3264(*(undefined1 (*) [32])(lVar153 + uVar159 * 0x20));
            }
            pvVar165 = bottom_blob->data;
            lVar168 = (long)(this->weight_data_tm).data +
                      (this->weight_data_tm).cstep * uVar159 * (this->weight_data_tm).elemsize +
                      0x60;
            for (uVar147 = 0; uVar147 != uVar148; uVar147 = uVar147 + 1) {
              lVar169 = lVar168;
              for (uVar163 = 0; uVar163 != uVar157; uVar163 = uVar163 + 1) {
                iVar136 = (((int)uVar163 - uVar134) + 1) * iVar8 + uVar137;
                if (((-1 < iVar136) && (iVar140 = iVar136 / iVar167, iVar136 % iVar167 == 0)) &&
                   (iVar140 < iVar144)) {
                  lVar115 = (long)iVar140 * (long)bottom_blob->w * bottom_blob->elemsize +
                            bottom_blob->cstep * bottom_blob->elemsize * uVar147;
                  iVar136 = iVar135;
                  for (lVar161 = 0; uVar164 * 0x80 != lVar161; lVar161 = lVar161 + 0x80) {
                    if (((-1 < iVar136) && (iVar140 = iVar136 / iVar151, iVar136 % iVar151 == 0)) &&
                       (iVar140 < iVar143)) {
                      lVar146 = (long)(iVar140 << 2);
                      uVar10 = *(undefined4 *)((long)pvVar165 + lVar146 * 4 + lVar115);
                      auVar398._4_4_ = uVar10;
                      auVar398._0_4_ = uVar10;
                      auVar398._8_4_ = uVar10;
                      auVar398._12_4_ = uVar10;
                      auVar398._16_4_ = uVar10;
                      auVar398._20_4_ = uVar10;
                      auVar398._24_4_ = uVar10;
                      auVar398._28_4_ = uVar10;
                      uVar10 = *(undefined4 *)((long)pvVar165 + lVar146 * 4 + lVar115 + 4);
                      auVar428._4_4_ = uVar10;
                      auVar428._0_4_ = uVar10;
                      auVar428._8_4_ = uVar10;
                      auVar428._12_4_ = uVar10;
                      auVar428._16_4_ = uVar10;
                      auVar428._20_4_ = uVar10;
                      auVar428._24_4_ = uVar10;
                      auVar428._28_4_ = uVar10;
                      uVar10 = *(undefined4 *)((long)pvVar165 + lVar146 * 4 + lVar115 + 8);
                      auVar496._4_4_ = uVar10;
                      auVar496._0_4_ = uVar10;
                      auVar496._8_4_ = uVar10;
                      auVar496._12_4_ = uVar10;
                      auVar496._16_4_ = uVar10;
                      auVar496._20_4_ = uVar10;
                      auVar496._24_4_ = uVar10;
                      auVar496._28_4_ = uVar10;
                      auVar260 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0xc)));
                      auVar173 = vfmadd231ps_fma(auVar282._0_32_,auVar398,
                                                 *(undefined1 (*) [32])(lVar169 + -0x60 + lVar161));
                      auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar428,
                                                 *(undefined1 (*) [32])(lVar169 + -0x40 + lVar161));
                      auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar496,
                                                 *(undefined1 (*) [32])(lVar169 + -0x20 + lVar161));
                      auVar260 = vfmadd231ps_avx512vl
                                           (ZEXT1632(auVar173),auVar260,
                                            *(undefined1 (*) [32])(lVar169 + lVar161));
                      auVar282 = ZEXT3264(auVar260);
                    }
                    iVar136 = iVar136 + iVar156;
                  }
                }
                lVar169 = lVar169 + (long)(int)uVar171 * 0x80;
              }
              lVar168 = lVar168 + (long)(int)(uVar171 * uVar134 * 0x20) * 4;
            }
            auVar260 = auVar282._0_32_;
            auVar268 = auVar260;
            if (iVar158 - 1U < 6) {
              auVar268 = vmaxps_avx512vl(auVar260,ZEXT1632(auVar172));
              switch(iVar158) {
              case 2:
                auVar260 = vminps_avx512vl(auVar260,ZEXT1632(auVar172));
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar90._4_4_ = uVar10;
                auVar90._0_4_ = uVar10;
                auVar90._8_4_ = uVar10;
                auVar90._12_4_ = uVar10;
                auVar90._16_4_ = uVar10;
                auVar90._20_4_ = uVar10;
                auVar90._24_4_ = uVar10;
                auVar90._28_4_ = uVar10;
                auVar268 = vfmadd231ps_avx512vl(auVar268,auVar260,auVar90);
                break;
              case 3:
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar88._4_4_ = uVar10;
                auVar88._0_4_ = uVar10;
                auVar88._8_4_ = uVar10;
                auVar88._12_4_ = uVar10;
                auVar88._16_4_ = uVar10;
                auVar88._20_4_ = uVar10;
                auVar88._24_4_ = uVar10;
                auVar88._28_4_ = uVar10;
                auVar260 = vmaxps_avx512vl(auVar260,auVar88);
                uVar10 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var145))[1];
                auVar89._4_4_ = uVar10;
                auVar89._0_4_ = uVar10;
                auVar89._8_4_ = uVar10;
                auVar89._12_4_ = uVar10;
                auVar89._16_4_ = uVar10;
                auVar89._20_4_ = uVar10;
                auVar89._24_4_ = uVar10;
                auVar89._28_4_ = uVar10;
                auVar268 = vminps_avx512vl(auVar260,auVar89);
                break;
              case 4:
                auVar86._8_4_ = 0x80000000;
                auVar86._0_8_ = 0x8000000080000000;
                auVar86._12_4_ = 0x80000000;
                auVar86._16_4_ = 0x80000000;
                auVar86._20_4_ = 0x80000000;
                auVar86._24_4_ = 0x80000000;
                auVar86._28_4_ = 0x80000000;
                auVar260 = vxorps_avx512vl(auVar260,auVar86);
                auVar260 = vminps_avx(auVar260,auVar336);
                auVar260 = vmaxps_avx(auVar260,auVar343);
                auVar173 = vfmadd231ps_fma(auVar350,auVar260,auVar356);
                auVar230 = vroundps_avx(ZEXT1632(auVar173),1);
                uVar147 = vcmpps_avx512vl(ZEXT1632(auVar173),auVar230,1);
                auVar231 = vsubps_avx512vl(auVar230,auVar362);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar274._0_4_ =
                     (float)((uint)bVar15 * auVar231._0_4_ | (uint)!bVar15 * auVar230._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar274._4_4_ =
                     (float)((uint)bVar15 * auVar231._4_4_ | (uint)!bVar15 * auVar230._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar274._8_4_ =
                     (float)((uint)bVar15 * auVar231._8_4_ | (uint)!bVar15 * auVar230._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar274._12_4_ =
                     (float)((uint)bVar15 * auVar231._12_4_ | (uint)!bVar15 * auVar230._12_4_);
                bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
                auVar274._16_4_ =
                     (float)((uint)bVar15 * auVar231._16_4_ | (uint)!bVar15 * auVar230._16_4_);
                bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
                auVar274._20_4_ =
                     (float)((uint)bVar15 * auVar231._20_4_ | (uint)!bVar15 * auVar230._20_4_);
                bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
                auVar274._24_4_ =
                     (float)((uint)bVar15 * auVar231._24_4_ | (uint)!bVar15 * auVar230._24_4_);
                bVar15 = SUB81(uVar147 >> 7,0);
                auVar274._28_4_ =
                     (float)((uint)bVar15 * auVar231._28_4_ | (uint)!bVar15 * auVar230._28_4_);
                auVar173 = vfmsub231ps_fma(auVar260,auVar274,auVar368);
                auVar87._8_4_ = 0x395e8083;
                auVar87._0_8_ = 0x395e8083395e8083;
                auVar87._12_4_ = 0x395e8083;
                auVar87._16_4_ = 0x395e8083;
                auVar87._20_4_ = 0x395e8083;
                auVar87._24_4_ = 0x395e8083;
                auVar87._28_4_ = 0x395e8083;
                auVar260 = vfmsub231ps_avx512vl(ZEXT1632(auVar173),auVar274,auVar87);
                auVar399._0_4_ = auVar260._0_4_ * auVar260._0_4_;
                auVar399._4_4_ = auVar260._4_4_ * auVar260._4_4_;
                auVar399._8_4_ = auVar260._8_4_ * auVar260._8_4_;
                auVar399._12_4_ = auVar260._12_4_ * auVar260._12_4_;
                auVar399._16_4_ = auVar260._16_4_ * auVar260._16_4_;
                auVar399._20_4_ = auVar260._20_4_ * auVar260._20_4_;
                auVar399._24_4_ = auVar260._24_4_ * auVar260._24_4_;
                auVar399._28_4_ = 0;
                auVar173 = vfmadd213ps_fma(auVar228,auVar260,auVar437);
                auVar173 = vfmadd213ps_fma(ZEXT1632(auVar173),auVar260,auVar443);
                auVar173 = vfmadd213ps_fma(ZEXT1632(auVar173),auVar260,auVar449);
                auVar173 = vfmadd213ps_fma(ZEXT1632(auVar173),auVar260,auVar455);
                auVar173 = vfmadd213ps_fma(ZEXT1632(auVar173),auVar260,auVar350);
                auVar173 = vfmadd213ps_fma(ZEXT1632(auVar173),auVar399,auVar260);
                auVar327._0_4_ = auVar173._0_4_ + 1.0;
                auVar327._4_4_ = auVar173._4_4_ + 1.0;
                auVar327._8_4_ = auVar173._8_4_ + 1.0;
                auVar327._12_4_ = auVar173._12_4_ + 1.0;
                auVar327._16_4_ = 0x3f800000;
                auVar327._20_4_ = 0x3f800000;
                auVar327._24_4_ = 0x3f800000;
                auVar327._28_4_ = 0x3f800000;
                auVar400._0_4_ = (int)auVar274._0_4_;
                auVar400._4_4_ = (int)auVar274._4_4_;
                auVar400._8_4_ = (int)auVar274._8_4_;
                auVar400._12_4_ = (int)auVar274._12_4_;
                auVar400._16_4_ = (int)auVar274._16_4_;
                auVar400._20_4_ = (int)auVar274._20_4_;
                auVar400._24_4_ = (int)auVar274._24_4_;
                auVar400._28_4_ = (int)auVar274._28_4_;
                auVar260 = vpslld_avx2(auVar400,0x17);
                auVar260 = vpaddd_avx2(auVar461,auVar260);
                auVar173 = vfmadd213ps_fma(auVar260,auVar327,auVar362);
                auVar260 = vrcpps_avx(ZEXT1632(auVar173));
                auVar173 = vfmsub213ps_fma(ZEXT1632(auVar173),auVar260,auVar362);
                auVar173 = vfnmadd132ps_fma(ZEXT1632(auVar173),auVar260,auVar260);
                auVar268 = ZEXT1632(auVar173);
                break;
              case 5:
                auVar260 = vminps_avx(auVar260,auVar336);
                auVar260 = vmaxps_avx(auVar260,auVar343);
                auVar173 = vfmadd213ps_fma(auVar356,auVar260,auVar350);
                auVar230 = vroundps_avx(ZEXT1632(auVar173),1);
                uVar147 = vcmpps_avx512vl(ZEXT1632(auVar173),auVar230,1);
                auVar231 = vsubps_avx512vl(auVar230,auVar362);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar269._0_4_ =
                     (float)((uint)bVar15 * auVar231._0_4_ | (uint)!bVar15 * auVar230._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar269._4_4_ =
                     (float)((uint)bVar15 * auVar231._4_4_ | (uint)!bVar15 * auVar230._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar269._8_4_ =
                     (float)((uint)bVar15 * auVar231._8_4_ | (uint)!bVar15 * auVar230._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar269._12_4_ =
                     (float)((uint)bVar15 * auVar231._12_4_ | (uint)!bVar15 * auVar230._12_4_);
                bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
                auVar269._16_4_ =
                     (float)((uint)bVar15 * auVar231._16_4_ | (uint)!bVar15 * auVar230._16_4_);
                bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
                auVar269._20_4_ =
                     (float)((uint)bVar15 * auVar231._20_4_ | (uint)!bVar15 * auVar230._20_4_);
                bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
                auVar269._24_4_ =
                     (float)((uint)bVar15 * auVar231._24_4_ | (uint)!bVar15 * auVar230._24_4_);
                bVar15 = SUB81(uVar147 >> 7,0);
                auVar269._28_4_ =
                     (float)((uint)bVar15 * auVar231._28_4_ | (uint)!bVar15 * auVar230._28_4_);
                auVar173 = vfmsub231ps_fma(auVar260,auVar269,auVar368);
                auVar173 = vfnmsub231ps_fma(ZEXT1632(auVar173),auVar269,auVar467);
                auVar230 = ZEXT1632(auVar173);
                auVar260 = vfmadd213ps_avx512vl(auVar228,auVar230,auVar437);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar230,auVar443);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar230,auVar449);
                auVar230 = ZEXT1632(auVar173);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar230,auVar455);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar230,auVar350);
                auVar260 = vfmadd213ps_avx512vl
                                     (auVar260,ZEXT1632(CONCAT412(auVar173._12_4_ * auVar173._12_4_,
                                                                  CONCAT48(auVar173._8_4_ *
                                                                           auVar173._8_4_,
                                                                           CONCAT44(auVar173._4_4_ *
                                                                                    auVar173._4_4_,
                                                                                    auVar173._0_4_ *
                                                                                    auVar173._0_4_))
                                                                 )),auVar230);
                auVar230 = vaddps_avx512vl(auVar260,auVar362);
                auVar429._0_4_ = (int)auVar269._0_4_;
                auVar429._4_4_ = (int)auVar269._4_4_;
                auVar429._8_4_ = (int)auVar269._8_4_;
                auVar429._12_4_ = (int)auVar269._12_4_;
                auVar429._16_4_ = (int)auVar269._16_4_;
                auVar429._20_4_ = (int)auVar269._20_4_;
                auVar429._24_4_ = (int)auVar269._24_4_;
                auVar429._28_4_ = (int)auVar269._28_4_;
                auVar260 = vpslld_avx2(auVar429,0x17);
                auVar260 = vpaddd_avx2(auVar260,auVar461);
                auVar173 = vfmadd213ps_fma(auVar260,auVar230,auVar362);
                uVar147 = vcmpps_avx512vl(ZEXT1632(auVar173),ZEXT1632(auVar172),2);
                auVar83._8_4_ = 0x800000;
                auVar83._0_8_ = 0x80000000800000;
                auVar83._12_4_ = 0x800000;
                auVar83._16_4_ = 0x800000;
                auVar83._20_4_ = 0x800000;
                auVar83._24_4_ = 0x800000;
                auVar83._28_4_ = 0x800000;
                auVar260 = vmaxps_avx512vl(ZEXT1632(auVar173),auVar83);
                auVar232 = vpsrld_avx2(auVar260,0x17);
                auVar497._8_4_ = 0x807fffff;
                auVar497._0_8_ = 0x807fffff807fffff;
                auVar497._12_4_ = 0x807fffff;
                auVar497._16_4_ = 0x807fffff;
                auVar497._20_4_ = 0x807fffff;
                auVar497._24_4_ = 0x807fffff;
                auVar497._28_4_ = 0x807fffff;
                auVar84._8_4_ = 0x3f000000;
                auVar84._0_8_ = 0x3f0000003f000000;
                auVar84._12_4_ = 0x3f000000;
                auVar84._16_4_ = 0x3f000000;
                auVar84._20_4_ = 0x3f000000;
                auVar84._24_4_ = 0x3f000000;
                auVar84._28_4_ = 0x3f000000;
                auVar260 = vpternlogd_avx512vl(auVar260,auVar497,auVar84,0xea);
                uVar163 = vcmpps_avx512vl(auVar260,auVar229,1);
                auVar230 = vaddps_avx512vl(auVar260,auVar249);
                auVar231 = vaddps_avx512vl(auVar230,auVar260);
                bVar15 = (bool)((byte)uVar163 & 1);
                auVar270._0_4_ =
                     (float)((uint)bVar15 * auVar231._0_4_ | (uint)!bVar15 * auVar230._0_4_);
                bVar15 = (bool)((byte)(uVar163 >> 1) & 1);
                auVar270._4_4_ =
                     (float)((uint)bVar15 * auVar231._4_4_ | (uint)!bVar15 * auVar230._4_4_);
                bVar15 = (bool)((byte)(uVar163 >> 2) & 1);
                auVar270._8_4_ =
                     (float)((uint)bVar15 * auVar231._8_4_ | (uint)!bVar15 * auVar230._8_4_);
                bVar15 = (bool)((byte)(uVar163 >> 3) & 1);
                auVar270._12_4_ =
                     (float)((uint)bVar15 * auVar231._12_4_ | (uint)!bVar15 * auVar230._12_4_);
                bVar15 = (bool)((byte)(uVar163 >> 4) & 1);
                auVar270._16_4_ =
                     (float)((uint)bVar15 * auVar231._16_4_ | (uint)!bVar15 * auVar230._16_4_);
                bVar15 = (bool)((byte)(uVar163 >> 5) & 1);
                auVar270._20_4_ =
                     (float)((uint)bVar15 * auVar231._20_4_ | (uint)!bVar15 * auVar230._20_4_);
                bVar15 = (bool)((byte)(uVar163 >> 6) & 1);
                auVar270._24_4_ =
                     (float)((uint)bVar15 * auVar231._24_4_ | (uint)!bVar15 * auVar230._24_4_);
                bVar15 = SUB81(uVar163 >> 7,0);
                auVar270._28_4_ = (uint)bVar15 * auVar231._28_4_ | (uint)!bVar15 * auVar230._28_4_;
                auVar113._4_4_ = auVar270._4_4_ * auVar270._4_4_;
                auVar113._0_4_ = auVar270._0_4_ * auVar270._0_4_;
                auVar113._8_4_ = auVar270._8_4_ * auVar270._8_4_;
                auVar113._12_4_ = auVar270._12_4_ * auVar270._12_4_;
                auVar113._16_4_ = auVar270._16_4_ * auVar270._16_4_;
                auVar113._20_4_ = auVar270._20_4_ * auVar270._20_4_;
                auVar113._24_4_ = auVar270._24_4_ * auVar270._24_4_;
                auVar113._28_4_ = auVar260._28_4_;
                auVar260 = vfmadd213ps_avx512vl(auVar250,auVar270,auVar251);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar270,auVar252);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar270,auVar253);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar270,auVar254);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar270,auVar255);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar270,auVar256);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar270,auVar257);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar270,auVar258);
                auVar230 = vmulps_avx512vl(auVar113,auVar270);
                auVar230 = vmulps_avx512vl(auVar230,auVar260);
                auVar85._8_4_ = 0xffffff82;
                auVar85._0_8_ = 0xffffff82ffffff82;
                auVar85._12_4_ = 0xffffff82;
                auVar85._16_4_ = 0xffffff82;
                auVar85._20_4_ = 0xffffff82;
                auVar85._24_4_ = 0xffffff82;
                auVar85._28_4_ = 0xffffff82;
                auVar260 = vpaddd_avx512vl(auVar232,auVar85);
                auVar260 = vcvtdq2ps_avx(auVar260);
                auVar231 = vsubps_avx512vl(auVar260,auVar362);
                bVar15 = (bool)((byte)uVar163 & 1);
                auVar271._0_4_ = (uint)bVar15 * auVar231._0_4_ | (uint)!bVar15 * auVar260._0_4_;
                bVar15 = (bool)((byte)(uVar163 >> 1) & 1);
                auVar271._4_4_ = (uint)bVar15 * auVar231._4_4_ | (uint)!bVar15 * auVar260._4_4_;
                bVar15 = (bool)((byte)(uVar163 >> 2) & 1);
                auVar271._8_4_ = (uint)bVar15 * auVar231._8_4_ | (uint)!bVar15 * auVar260._8_4_;
                bVar15 = (bool)((byte)(uVar163 >> 3) & 1);
                auVar271._12_4_ = (uint)bVar15 * auVar231._12_4_ | (uint)!bVar15 * auVar260._12_4_;
                bVar15 = (bool)((byte)(uVar163 >> 4) & 1);
                auVar271._16_4_ = (uint)bVar15 * auVar231._16_4_ | (uint)!bVar15 * auVar260._16_4_;
                bVar15 = (bool)((byte)(uVar163 >> 5) & 1);
                auVar271._20_4_ = (uint)bVar15 * auVar231._20_4_ | (uint)!bVar15 * auVar260._20_4_;
                bVar15 = (bool)((byte)(uVar163 >> 6) & 1);
                auVar271._24_4_ = (uint)bVar15 * auVar231._24_4_ | (uint)!bVar15 * auVar260._24_4_;
                bVar15 = SUB81(uVar163 >> 7,0);
                auVar271._28_4_ = (uint)bVar15 * auVar231._28_4_ | (uint)!bVar15 * auVar260._28_4_;
                auVar260 = vfmadd231ps_avx512vl(auVar230,auVar271,auVar467);
                auVar260 = vfmsub231ps_avx512vl(auVar260,auVar350,auVar113);
                auVar260 = vsubps_avx512vl(auVar260,auVar270);
                auVar173 = vfmsub231ps_fma(auVar260,auVar368,auVar271);
                auVar260 = vmulps_avx512vl(ZEXT1632(auVar173),auVar259);
                auVar230 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar272._0_4_ = (uint)bVar15 * auVar230._0_4_ | (uint)!bVar15 * auVar260._0_4_;
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar272._4_4_ = (uint)bVar15 * auVar230._4_4_ | (uint)!bVar15 * auVar260._4_4_;
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar272._8_4_ = (uint)bVar15 * auVar230._8_4_ | (uint)!bVar15 * auVar260._8_4_;
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar272._12_4_ = (uint)bVar15 * auVar230._12_4_ | (uint)!bVar15 * auVar260._12_4_;
                bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
                auVar272._16_4_ = (uint)bVar15 * auVar230._16_4_ | (uint)!bVar15 * auVar260._16_4_;
                bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
                auVar272._20_4_ = (uint)bVar15 * auVar230._20_4_ | (uint)!bVar15 * auVar260._20_4_;
                bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
                auVar272._24_4_ = (uint)bVar15 * auVar230._24_4_ | (uint)!bVar15 * auVar260._24_4_;
                bVar15 = SUB81(uVar147 >> 7,0);
                auVar272._28_4_ = (uint)bVar15 * auVar230._28_4_ | (uint)!bVar15 * auVar260._28_4_;
                auVar260 = vminps_avx(auVar272,auVar336);
                auVar260 = vmaxps_avx(auVar260,auVar343);
                auVar173 = vfmadd213ps_fma(auVar356,auVar260,auVar350);
                auVar230 = vroundps_avx(ZEXT1632(auVar173),1);
                uVar147 = vcmpps_avx512vl(ZEXT1632(auVar173),auVar230,1);
                auVar231 = vsubps_avx512vl(auVar230,auVar362);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar273._0_4_ =
                     (float)((uint)bVar15 * auVar231._0_4_ | (uint)!bVar15 * auVar230._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar273._4_4_ =
                     (float)((uint)bVar15 * auVar231._4_4_ | (uint)!bVar15 * auVar230._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar273._8_4_ =
                     (float)((uint)bVar15 * auVar231._8_4_ | (uint)!bVar15 * auVar230._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar273._12_4_ =
                     (float)((uint)bVar15 * auVar231._12_4_ | (uint)!bVar15 * auVar230._12_4_);
                bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
                auVar273._16_4_ =
                     (float)((uint)bVar15 * auVar231._16_4_ | (uint)!bVar15 * auVar230._16_4_);
                bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
                auVar273._20_4_ =
                     (float)((uint)bVar15 * auVar231._20_4_ | (uint)!bVar15 * auVar230._20_4_);
                bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
                auVar273._24_4_ =
                     (float)((uint)bVar15 * auVar231._24_4_ | (uint)!bVar15 * auVar230._24_4_);
                bVar15 = SUB81(uVar147 >> 7,0);
                auVar273._28_4_ =
                     (float)((uint)bVar15 * auVar231._28_4_ | (uint)!bVar15 * auVar230._28_4_);
                auVar173 = vfmsub231ps_fma(auVar260,auVar273,auVar368);
                auVar173 = vfnmsub231ps_fma(ZEXT1632(auVar173),auVar273,auVar467);
                auVar230 = ZEXT1632(auVar173);
                auVar260 = vfmadd213ps_avx512vl(auVar228,auVar230,auVar437);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar230,auVar443);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar230,auVar449);
                auVar230 = ZEXT1632(auVar173);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar230,auVar455);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar230,auVar350);
                auVar260 = vfmadd213ps_avx512vl
                                     (auVar260,ZEXT1632(CONCAT412(auVar173._12_4_ * auVar173._12_4_,
                                                                  CONCAT48(auVar173._8_4_ *
                                                                           auVar173._8_4_,
                                                                           CONCAT44(auVar173._4_4_ *
                                                                                    auVar173._4_4_,
                                                                                    auVar173._0_4_ *
                                                                                    auVar173._0_4_))
                                                                 )),auVar230);
                auVar230 = vaddps_avx512vl(auVar260,auVar362);
                auVar430._0_4_ = (int)auVar273._0_4_;
                auVar430._4_4_ = (int)auVar273._4_4_;
                auVar430._8_4_ = (int)auVar273._8_4_;
                auVar430._12_4_ = (int)auVar273._12_4_;
                auVar430._16_4_ = (int)auVar273._16_4_;
                auVar430._20_4_ = (int)auVar273._20_4_;
                auVar430._24_4_ = (int)auVar273._24_4_;
                auVar430._28_4_ = (int)auVar273._28_4_;
                auVar260 = vpslld_avx2(auVar430,0x17);
                auVar260 = vpaddd_avx2(auVar260,auVar461);
                auVar173 = vfmadd213ps_fma(auVar260,auVar230,auVar362);
                auVar260 = vrcpps_avx(ZEXT1632(auVar173));
                auVar173 = vfmsub213ps_fma(ZEXT1632(auVar173),auVar260,auVar362);
                auVar173 = vfnmadd132ps_fma(ZEXT1632(auVar173),auVar260,auVar260);
                auVar230 = vfnmadd213ps_avx512vl(ZEXT1632(auVar173),auVar259,auVar249);
                auVar268._4_4_ = auVar230._4_4_ * auVar282._4_4_;
                auVar268._0_4_ = auVar230._0_4_ * auVar282._0_4_;
                auVar268._8_4_ = auVar230._8_4_ * auVar282._8_4_;
                auVar268._12_4_ = auVar230._12_4_ * auVar282._12_4_;
                auVar268._16_4_ = auVar230._16_4_ * auVar282._16_4_;
                auVar268._20_4_ = auVar230._20_4_ * auVar282._20_4_;
                auVar268._24_4_ = auVar230._24_4_ * auVar282._24_4_;
                auVar268._28_4_ = auVar260._28_4_;
                break;
              case 6:
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar401._4_4_ = uVar10;
                auVar401._0_4_ = uVar10;
                auVar401._8_4_ = uVar10;
                auVar401._12_4_ = uVar10;
                auVar401._16_4_ = uVar10;
                auVar401._20_4_ = uVar10;
                auVar401._24_4_ = uVar10;
                auVar401._28_4_ = uVar10;
                uVar10 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var145))[1];
                auVar82._4_4_ = uVar10;
                auVar82._0_4_ = uVar10;
                auVar82._8_4_ = uVar10;
                auVar82._12_4_ = uVar10;
                auVar82._16_4_ = uVar10;
                auVar82._20_4_ = uVar10;
                auVar82._24_4_ = uVar10;
                auVar82._28_4_ = uVar10;
                auVar260 = vfmadd213ps_avx512vl(auVar401,auVar260,auVar82);
                auVar260 = vmaxps_avx512vl(auVar260,ZEXT1632(auVar172));
                auVar260 = vminps_avx(auVar260,auVar362);
                auVar268._4_4_ = auVar260._4_4_ * auVar282._4_4_;
                auVar268._0_4_ = auVar260._0_4_ * auVar282._0_4_;
                auVar268._8_4_ = auVar260._8_4_ * auVar282._8_4_;
                auVar268._12_4_ = auVar260._12_4_ * auVar282._12_4_;
                auVar268._16_4_ = auVar260._16_4_ * auVar282._16_4_;
                auVar268._20_4_ = auVar260._20_4_ * auVar282._20_4_;
                auVar268._24_4_ = auVar260._24_4_ * auVar282._24_4_;
                auVar268._28_4_ = auVar260._28_4_;
              }
            }
            *(undefined1 (*) [32])local_1c0 = auVar268;
            local_1c0 = local_1c0 + 4;
            iVar135 = iVar135 + 1;
          }
          uVar147 = (ulong)(uVar137 + 1);
        }
      }
    }
    if ((iVar170 == 8) && (uVar150 == 4)) {
      p_Var145 = pp_Var149[-3];
      uVar171 = *(uint *)(&this->field_0xd4 + (long)p_Var145);
      uVar134 = *(uint *)(&this->field_0xd8 + (long)p_Var145);
      iVar156 = *(int *)(&this->field_0xdc + (long)p_Var145);
      iVar8 = *(int *)(&this->field_0xe0 + (long)p_Var145);
      iVar151 = *(int *)(&this->field_0xe4 + (long)p_Var145);
      iVar167 = *(int *)(&this->field_0xe8 + (long)p_Var145);
      iVar158 = *(int *)(&this->field_0x114 + (long)p_Var145);
      local_a8._0_8_ = p_Var145;
      lVar153 = *(long *)(&this->field_0x1a8 + (long)p_Var145);
      uVar159 = 0;
      uVar164 = 0;
      if (0 < (int)uVar171) {
        uVar164 = (ulong)uVar171;
      }
      uVar157 = 0;
      if (0 < (int)uVar134) {
        uVar157 = (ulong)uVar134;
      }
      uVar154 = (ulong)(uint)local_f8.c;
      if (local_f8.c < 1) {
        uVar154 = uVar159;
      }
      auVar329._8_4_ = 0x42b0c0a5;
      auVar329._0_8_ = 0x42b0c0a542b0c0a5;
      auVar329._12_4_ = 0x42b0c0a5;
      auVar339._8_4_ = 0xc2b0c0a5;
      auVar339._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar339._12_4_ = 0xc2b0c0a5;
      auVar346._8_4_ = 0x3f000000;
      auVar346._0_8_ = 0x3f0000003f000000;
      auVar346._12_4_ = 0x3f000000;
      auVar352._8_4_ = 0x3fb8aa3b;
      auVar352._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar352._12_4_ = 0x3fb8aa3b;
      auVar358._8_4_ = 0x3f800000;
      auVar358._0_8_ = 0x3f8000003f800000;
      auVar358._12_4_ = 0x3f800000;
      auVar364._8_4_ = 0x3f318000;
      auVar364._0_8_ = 0x3f3180003f318000;
      auVar364._12_4_ = 0x3f318000;
      auVar172 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar433._8_4_ = 0x3ab743ce;
      auVar433._0_8_ = 0x3ab743ce3ab743ce;
      auVar433._12_4_ = 0x3ab743ce;
      auVar439._8_4_ = 0x3c088908;
      auVar439._0_8_ = 0x3c0889083c088908;
      auVar439._12_4_ = 0x3c088908;
      auVar445._8_4_ = 0x3d2aa9c1;
      auVar445._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar445._12_4_ = 0x3d2aa9c1;
      auVar451._8_4_ = 0x3e2aaaaa;
      auVar451._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar451._12_4_ = 0x3e2aaaaa;
      auVar457._8_4_ = 0x3f800000;
      auVar457._0_8_ = 0x3f8000003f800000;
      auVar457._12_4_ = 0x3f800000;
      auVar463._8_4_ = 0xb95e8083;
      auVar463._0_8_ = 0xb95e8083b95e8083;
      auVar463._12_4_ = 0xb95e8083;
      auVar173 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar174 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar195 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar196 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar197 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar198 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar199 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar200 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar201 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
      in_ZMM30 = ZEXT1664(auVar201);
      auVar202 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      for (; uVar159 != uVar154; uVar159 = uVar159 + 1) {
        local_1c0 = (_func_int ***)
                    ((long)(_func_int ***)local_f8.data +
                    local_f8.cstep * uVar159 * local_f8.elemsize);
        iVar143 = bottom_blob->w;
        iVar144 = bottom_blob->h;
        uVar147 = 0;
        uVar148 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar148 = uVar147;
        }
        uVar138 = local_f8.w;
        if (local_f8.w < 1) {
          uVar138 = 0;
        }
        uVar155 = local_f8.h;
        if (local_f8.h < 1) {
          uVar155 = 0;
        }
        while (uVar137 = (uint)uVar147, uVar137 != uVar155) {
          iVar135 = (1 - uVar171) * iVar156;
          for (uVar139 = 0; uVar139 != uVar138; uVar139 = uVar139 + 1) {
            if (lVar153 == 0) {
              auVar206 = ZEXT816(0) << 0x40;
            }
            else {
              auVar206 = *(undefined1 (*) [16])(lVar153 + uVar159 * 0x10);
            }
            auVar282 = ZEXT1664(auVar206);
            pvVar165 = bottom_blob->data;
            lVar168 = (long)(this->weight_data_tm).data +
                      (this->weight_data_tm).cstep * uVar159 * (this->weight_data_tm).elemsize +
                      0x70;
            for (uVar147 = 0; uVar147 != uVar148; uVar147 = uVar147 + 1) {
              lVar169 = lVar168;
              for (uVar163 = 0; uVar163 != uVar157; uVar163 = uVar163 + 1) {
                iVar136 = (((int)uVar163 - uVar134) + 1) * iVar8 + uVar137;
                if (((-1 < iVar136) && (iVar140 = iVar136 / iVar167, iVar136 % iVar167 == 0)) &&
                   (iVar140 < iVar144)) {
                  lVar115 = (long)iVar140 * (long)bottom_blob->w * bottom_blob->elemsize +
                            bottom_blob->cstep * bottom_blob->elemsize * uVar147;
                  iVar136 = iVar135;
                  for (lVar161 = 0; uVar164 * 0x80 != lVar161; lVar161 = lVar161 + 0x80) {
                    if (((-1 < iVar136) && (iVar140 = iVar136 / iVar151, iVar136 % iVar151 == 0)) &&
                       (iVar140 < iVar143)) {
                      lVar146 = (long)(iVar140 << 3);
                      uVar10 = *(undefined4 *)((long)pvVar165 + lVar146 * 4 + lVar115);
                      auVar374._4_4_ = uVar10;
                      auVar374._0_4_ = uVar10;
                      auVar374._8_4_ = uVar10;
                      auVar374._12_4_ = uVar10;
                      uVar10 = *(undefined4 *)((long)pvVar165 + lVar146 * 4 + lVar115 + 4);
                      auVar410._4_4_ = uVar10;
                      auVar410._0_4_ = uVar10;
                      auVar410._8_4_ = uVar10;
                      auVar410._12_4_ = uVar10;
                      uVar10 = *(undefined4 *)((long)pvVar165 + lVar146 * 4 + lVar115 + 8);
                      auVar475._4_4_ = uVar10;
                      auVar475._0_4_ = uVar10;
                      auVar475._8_4_ = uVar10;
                      auVar475._12_4_ = uVar10;
                      auVar203 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0xc)));
                      auVar204 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x10)));
                      auVar205 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x14)));
                      auVar188 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x18)));
                      auVar175 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0x1c)));
                      auVar206 = vfmadd231ps_fma(auVar282._0_16_,auVar374,
                                                 *(undefined1 (*) [16])(lVar169 + -0x70 + lVar161));
                      auVar206 = vfmadd231ps_fma(auVar206,auVar410,
                                                 *(undefined1 (*) [16])(lVar169 + -0x60 + lVar161));
                      auVar206 = vfmadd231ps_fma(auVar206,auVar475,
                                                 *(undefined1 (*) [16])(lVar169 + -0x50 + lVar161));
                      auVar206 = vfmadd231ps_avx512vl
                                           (auVar206,auVar203,
                                            *(undefined1 (*) [16])(lVar169 + -0x40 + lVar161));
                      auVar206 = vfmadd231ps_avx512vl
                                           (auVar206,auVar204,
                                            *(undefined1 (*) [16])(lVar169 + -0x30 + lVar161));
                      auVar206 = vfmadd231ps_avx512vl
                                           (auVar206,auVar205,
                                            *(undefined1 (*) [16])(lVar169 + -0x20 + lVar161));
                      auVar206 = vfmadd231ps_avx512vl
                                           (auVar206,auVar188,
                                            *(undefined1 (*) [16])(lVar169 + -0x10 + lVar161));
                      auVar206 = vfmadd231ps_avx512vl
                                           (auVar206,auVar175,
                                            *(undefined1 (*) [16])(lVar169 + lVar161));
                      auVar282 = ZEXT1664(auVar206);
                    }
                    iVar136 = iVar136 + iVar156;
                  }
                }
                lVar169 = lVar169 + (long)(int)uVar171 * 0x80;
              }
              lVar168 = lVar168 + (long)(int)(uVar171 * uVar134 * 0x20) * 4;
            }
            auVar206 = auVar282._0_16_;
            auVar207 = auVar206;
            if (iVar158 - 1U < 6) {
              auVar207 = vmaxps_avx512vl(auVar206,auVar201);
              switch(iVar158) {
              case 2:
                auVar206 = vminps_avx512vl(auVar206,auVar201);
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar38._4_4_ = uVar10;
                auVar38._0_4_ = uVar10;
                auVar38._8_4_ = uVar10;
                auVar38._12_4_ = uVar10;
                auVar207 = vfmadd231ps_avx512vl(auVar207,auVar206,auVar38);
                break;
              case 3:
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar36._4_4_ = uVar10;
                auVar36._0_4_ = uVar10;
                auVar36._8_4_ = uVar10;
                auVar36._12_4_ = uVar10;
                auVar206 = vmaxps_avx512vl(auVar206,auVar36);
                uVar10 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var145))[1];
                auVar37._4_4_ = uVar10;
                auVar37._0_4_ = uVar10;
                auVar37._8_4_ = uVar10;
                auVar37._12_4_ = uVar10;
                auVar207 = vminps_avx512vl(auVar206,auVar37);
                break;
              case 4:
                auVar34._8_4_ = 0x80000000;
                auVar34._0_8_ = 0x8000000080000000;
                auVar34._12_4_ = 0x80000000;
                auVar206 = vxorps_avx512vl(auVar206,auVar34);
                auVar206 = vminps_avx(auVar206,auVar329);
                auVar203 = vmaxps_avx(auVar206,auVar339);
                auVar204 = vfmadd231ps_fma(auVar346,auVar203,auVar352);
                auVar480._0_4_ = (int)auVar204._0_4_;
                auVar480._4_4_ = (int)auVar204._4_4_;
                auVar480._8_4_ = (int)auVar204._8_4_;
                auVar480._12_4_ = (int)auVar204._12_4_;
                auVar206 = vcvtdq2ps_avx(auVar480);
                uVar147 = vcmpps_avx512vl(auVar204,auVar206,1);
                auVar204 = vsubps_avx512vl(auVar206,auVar358);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar213._0_4_ =
                     (float)((uint)bVar15 * auVar204._0_4_ | (uint)!bVar15 * auVar206._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar213._4_4_ =
                     (float)((uint)bVar15 * auVar204._4_4_ | (uint)!bVar15 * auVar206._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar213._8_4_ =
                     (float)((uint)bVar15 * auVar204._8_4_ | (uint)!bVar15 * auVar206._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar213._12_4_ =
                     (float)((uint)bVar15 * auVar204._12_4_ | (uint)!bVar15 * auVar206._12_4_);
                auVar206 = vfmsub231ps_fma(auVar203,auVar213,auVar364);
                auVar35._8_4_ = 0x395e8083;
                auVar35._0_8_ = 0x395e8083395e8083;
                auVar35._12_4_ = 0x395e8083;
                auVar203 = vfmsub231ps_avx512vl(auVar206,auVar213,auVar35);
                auVar377._0_4_ = auVar203._0_4_ * auVar203._0_4_;
                auVar377._4_4_ = auVar203._4_4_ * auVar203._4_4_;
                auVar377._8_4_ = auVar203._8_4_ * auVar203._8_4_;
                auVar377._12_4_ = auVar203._12_4_ * auVar203._12_4_;
                auVar206 = vfmadd213ps_fma(auVar172,auVar203,auVar433);
                auVar206 = vfmadd213ps_fma(auVar206,auVar203,auVar439);
                auVar206 = vfmadd213ps_fma(auVar206,auVar203,auVar445);
                auVar206 = vfmadd213ps_fma(auVar206,auVar203,auVar451);
                auVar206 = vfmadd213ps_fma(auVar206,auVar203,auVar346);
                auVar206 = vfmadd213ps_fma(auVar206,auVar377,auVar203);
                auVar322._0_4_ = auVar206._0_4_ + 1.0;
                auVar322._4_4_ = auVar206._4_4_ + 1.0;
                auVar322._8_4_ = auVar206._8_4_ + 1.0;
                auVar322._12_4_ = auVar206._12_4_ + 1.0;
                auVar378._0_4_ = (int)auVar213._0_4_;
                auVar378._4_4_ = (int)auVar213._4_4_;
                auVar378._8_4_ = (int)auVar213._8_4_;
                auVar378._12_4_ = (int)auVar213._12_4_;
                auVar206 = vpslld_avx(auVar378,0x17);
                auVar206 = vpaddd_avx(auVar457,auVar206);
                auVar203 = vfmadd213ps_fma(auVar206,auVar322,auVar358);
                auVar206 = vrcpps_avx(auVar203);
                auVar203 = vfmsub213ps_fma(auVar203,auVar206,auVar358);
                auVar207 = vfnmadd132ps_fma(auVar203,auVar206,auVar206);
                break;
              case 5:
                auVar203 = vminps_avx(auVar206,auVar329);
                auVar204 = vmaxps_avx(auVar203,auVar339);
                auVar205 = vfmadd213ps_fma(auVar352,auVar204,auVar346);
                auVar476._0_4_ = (int)auVar205._0_4_;
                auVar476._4_4_ = (int)auVar205._4_4_;
                auVar476._8_4_ = (int)auVar205._8_4_;
                auVar476._12_4_ = (int)auVar205._12_4_;
                auVar203 = vcvtdq2ps_avx(auVar476);
                uVar147 = vcmpps_avx512vl(auVar205,auVar203,1);
                auVar205 = vsubps_avx512vl(auVar203,auVar358);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar208._0_4_ =
                     (float)((uint)bVar15 * auVar205._0_4_ | (uint)!bVar15 * auVar203._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar208._4_4_ =
                     (float)((uint)bVar15 * auVar205._4_4_ | (uint)!bVar15 * auVar203._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar208._8_4_ =
                     (float)((uint)bVar15 * auVar205._8_4_ | (uint)!bVar15 * auVar203._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar208._12_4_ =
                     (float)((uint)bVar15 * auVar205._12_4_ | (uint)!bVar15 * auVar203._12_4_);
                auVar203 = vfmsub231ps_fma(auVar204,auVar208,auVar364);
                auVar203 = vfnmsub231ps_fma(auVar203,auVar208,auVar463);
                auVar411._0_4_ = auVar203._0_4_ * auVar203._0_4_;
                auVar411._4_4_ = auVar203._4_4_ * auVar203._4_4_;
                auVar411._8_4_ = auVar203._8_4_ * auVar203._8_4_;
                auVar411._12_4_ = auVar203._12_4_ * auVar203._12_4_;
                auVar204 = vfmadd213ps_avx512vl(auVar172,auVar203,auVar433);
                auVar204 = vfmadd213ps_avx512vl(auVar204,auVar203,auVar439);
                auVar204 = vfmadd213ps_avx512vl(auVar204,auVar203,auVar445);
                auVar204 = vfmadd213ps_avx512vl(auVar204,auVar203,auVar451);
                auVar204 = vfmadd213ps_avx512vl(auVar204,auVar203,auVar346);
                auVar203 = vfmadd213ps_avx512vl(auVar204,auVar411,auVar203);
                auVar204 = vaddps_avx512vl(auVar203,auVar358);
                auVar412._0_4_ = (int)auVar208._0_4_;
                auVar412._4_4_ = (int)auVar208._4_4_;
                auVar412._8_4_ = (int)auVar208._8_4_;
                auVar412._12_4_ = (int)auVar208._12_4_;
                auVar203 = vpslld_avx(auVar412,0x17);
                auVar203 = vpaddd_avx(auVar203,auVar457);
                auVar203 = vfmadd213ps_fma(auVar203,auVar204,auVar358);
                uVar147 = vcmpps_avx512vl(auVar203,auVar201,2);
                auVar28._8_4_ = 0x800000;
                auVar28._0_8_ = 0x80000000800000;
                auVar28._12_4_ = 0x800000;
                auVar203 = vmaxps_avx512vl(auVar203,auVar28);
                auVar205 = vpsrld_avx(auVar203,0x17);
                auVar477._8_4_ = 0x807fffff;
                auVar477._0_8_ = 0x807fffff807fffff;
                auVar477._12_4_ = 0x807fffff;
                auVar29._8_4_ = 0x3f000000;
                auVar29._0_8_ = 0x3f0000003f000000;
                auVar29._12_4_ = 0x3f000000;
                auVar203 = vpternlogd_avx512vl(auVar203,auVar477,auVar29,0xea);
                auVar30._8_4_ = 0x3f3504f3;
                auVar30._0_8_ = 0x3f3504f33f3504f3;
                auVar30._12_4_ = 0x3f3504f3;
                uVar163 = vcmpps_avx512vl(auVar203,auVar30,1);
                auVar31._8_4_ = 0xbf800000;
                auVar31._0_8_ = 0xbf800000bf800000;
                auVar31._12_4_ = 0xbf800000;
                auVar204 = vaddps_avx512vl(auVar203,auVar31);
                auVar203 = vaddps_avx512vl(auVar204,auVar203);
                bVar15 = (bool)((byte)uVar163 & 1);
                auVar209._0_4_ =
                     (float)((uint)bVar15 * auVar203._0_4_ | (uint)!bVar15 * auVar204._0_4_);
                bVar15 = (bool)((byte)(uVar163 >> 1) & 1);
                auVar209._4_4_ =
                     (float)((uint)bVar15 * auVar203._4_4_ | (uint)!bVar15 * auVar204._4_4_);
                bVar15 = (bool)((byte)(uVar163 >> 2) & 1);
                auVar209._8_4_ =
                     (float)((uint)bVar15 * auVar203._8_4_ | (uint)!bVar15 * auVar204._8_4_);
                bVar15 = (bool)((byte)(uVar163 >> 3) & 1);
                auVar209._12_4_ =
                     (float)((uint)bVar15 * auVar203._12_4_ | (uint)!bVar15 * auVar204._12_4_);
                auVar375._0_4_ = auVar209._0_4_ * auVar209._0_4_;
                auVar375._4_4_ = auVar209._4_4_ * auVar209._4_4_;
                auVar375._8_4_ = auVar209._8_4_ * auVar209._8_4_;
                auVar375._12_4_ = auVar209._12_4_ * auVar209._12_4_;
                auVar32._8_4_ = 0xbdebd1b8;
                auVar32._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar32._12_4_ = 0xbdebd1b8;
                auVar203 = vfmadd213ps_avx512vl(auVar173,auVar209,auVar32);
                auVar203 = vfmadd213ps_avx512vl(auVar203,auVar209,auVar174);
                auVar203 = vfmadd213ps_avx512vl(auVar203,auVar209,auVar195);
                auVar203 = vfmadd213ps_avx512vl(auVar203,auVar209,auVar196);
                auVar203 = vfmadd213ps_avx512vl(auVar203,auVar209,auVar197);
                auVar203 = vfmadd213ps_avx512vl(auVar203,auVar209,auVar198);
                auVar203 = vfmadd213ps_avx512vl(auVar203,auVar209,auVar199);
                auVar203 = vfmadd213ps_avx512vl(auVar203,auVar209,auVar200);
                auVar204 = vmulps_avx512vl(auVar375,auVar209);
                auVar204 = vmulps_avx512vl(auVar204,auVar203);
                auVar33._8_4_ = 0xffffff82;
                auVar33._0_8_ = 0xffffff82ffffff82;
                auVar33._12_4_ = 0xffffff82;
                auVar203 = vpaddd_avx512vl(auVar205,auVar33);
                auVar203 = vcvtdq2ps_avx(auVar203);
                auVar205 = vsubps_avx512vl(auVar203,auVar358);
                bVar15 = (bool)((byte)uVar163 & 1);
                auVar210._0_4_ = (uint)bVar15 * auVar205._0_4_ | (uint)!bVar15 * auVar203._0_4_;
                bVar15 = (bool)((byte)(uVar163 >> 1) & 1);
                auVar210._4_4_ = (uint)bVar15 * auVar205._4_4_ | (uint)!bVar15 * auVar203._4_4_;
                bVar15 = (bool)((byte)(uVar163 >> 2) & 1);
                auVar210._8_4_ = (uint)bVar15 * auVar205._8_4_ | (uint)!bVar15 * auVar203._8_4_;
                bVar15 = (bool)((byte)(uVar163 >> 3) & 1);
                auVar210._12_4_ = (uint)bVar15 * auVar205._12_4_ | (uint)!bVar15 * auVar203._12_4_;
                auVar203 = vfmadd231ps_avx512vl(auVar204,auVar210,auVar463);
                auVar203 = vfmsub231ps_avx512vl(auVar203,auVar346,auVar375);
                auVar203 = vsubps_avx512vl(auVar203,auVar209);
                auVar203 = vfnmadd231ps_fma(auVar203,auVar364,auVar210);
                auVar204 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar211._0_4_ =
                     (uint)bVar15 * auVar204._0_4_ |
                     (uint)!bVar15 * (int)(auVar203._0_4_ + auVar203._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar211._4_4_ =
                     (uint)bVar15 * auVar204._4_4_ |
                     (uint)!bVar15 * (int)(auVar203._4_4_ + auVar203._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar211._8_4_ =
                     (uint)bVar15 * auVar204._8_4_ |
                     (uint)!bVar15 * (int)(auVar203._8_4_ + auVar203._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar211._12_4_ =
                     (uint)bVar15 * auVar204._12_4_ |
                     (uint)!bVar15 * (int)(auVar203._12_4_ + auVar203._12_4_);
                auVar203 = vminps_avx(auVar211,auVar329);
                auVar204 = vmaxps_avx(auVar203,auVar339);
                auVar205 = vfmadd213ps_fma(auVar352,auVar204,auVar346);
                auVar478._0_4_ = (int)auVar205._0_4_;
                auVar478._4_4_ = (int)auVar205._4_4_;
                auVar478._8_4_ = (int)auVar205._8_4_;
                auVar478._12_4_ = (int)auVar205._12_4_;
                auVar203 = vcvtdq2ps_avx(auVar478);
                uVar147 = vcmpps_avx512vl(auVar205,auVar203,1);
                auVar205 = vsubps_avx512vl(auVar203,auVar358);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar212._0_4_ =
                     (float)((uint)bVar15 * auVar205._0_4_ | (uint)!bVar15 * auVar203._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar212._4_4_ =
                     (float)((uint)bVar15 * auVar205._4_4_ | (uint)!bVar15 * auVar203._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar212._8_4_ =
                     (float)((uint)bVar15 * auVar205._8_4_ | (uint)!bVar15 * auVar203._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar212._12_4_ =
                     (float)((uint)bVar15 * auVar205._12_4_ | (uint)!bVar15 * auVar203._12_4_);
                auVar203 = vfmsub231ps_fma(auVar204,auVar212,auVar364);
                auVar203 = vfnmsub231ps_fma(auVar203,auVar212,auVar463);
                auVar413._0_4_ = auVar203._0_4_ * auVar203._0_4_;
                auVar413._4_4_ = auVar203._4_4_ * auVar203._4_4_;
                auVar413._8_4_ = auVar203._8_4_ * auVar203._8_4_;
                auVar413._12_4_ = auVar203._12_4_ * auVar203._12_4_;
                auVar204 = vfmadd213ps_avx512vl(auVar172,auVar203,auVar433);
                auVar204 = vfmadd213ps_avx512vl(auVar204,auVar203,auVar439);
                auVar204 = vfmadd213ps_avx512vl(auVar204,auVar203,auVar445);
                auVar204 = vfmadd213ps_avx512vl(auVar204,auVar203,auVar451);
                auVar204 = vfmadd213ps_avx512vl(auVar204,auVar203,auVar346);
                auVar203 = vfmadd213ps_avx512vl(auVar204,auVar413,auVar203);
                auVar204 = vaddps_avx512vl(auVar203,auVar358);
                auVar376._0_4_ = (int)auVar212._0_4_;
                auVar376._4_4_ = (int)auVar212._4_4_;
                auVar376._8_4_ = (int)auVar212._8_4_;
                auVar376._12_4_ = (int)auVar212._12_4_;
                auVar203 = vpslld_avx(auVar376,0x17);
                auVar203 = vpaddd_avx(auVar457,auVar203);
                auVar204 = vfmadd213ps_fma(auVar203,auVar204,auVar358);
                auVar203 = vrcpps_avx(auVar204);
                auVar479._0_4_ = auVar203._0_4_ + auVar203._0_4_;
                auVar479._4_4_ = auVar203._4_4_ + auVar203._4_4_;
                auVar479._8_4_ = auVar203._8_4_ + auVar203._8_4_;
                auVar479._12_4_ = auVar203._12_4_ + auVar203._12_4_;
                auVar204 = vfmsub213ps_avx512vl(auVar204,auVar479,auVar202);
                auVar203 = vfnmadd213ps_fma(auVar204,auVar203,auVar479);
                auVar207 = vfmsub213ps_fma(auVar203,auVar206,auVar206);
                break;
              case 6:
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar379._4_4_ = uVar10;
                auVar379._0_4_ = uVar10;
                auVar379._8_4_ = uVar10;
                auVar379._12_4_ = uVar10;
                uVar10 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var145))[1];
                auVar27._4_4_ = uVar10;
                auVar27._0_4_ = uVar10;
                auVar27._8_4_ = uVar10;
                auVar27._12_4_ = uVar10;
                auVar206 = vfmadd213ps_avx512vl(auVar379,auVar206,auVar27);
                auVar206 = vmaxps_avx512vl(auVar206,auVar201);
                auVar206 = vminps_avx(auVar206,auVar358);
                auVar207._0_4_ = auVar206._0_4_ * auVar282._0_4_;
                auVar207._4_4_ = auVar206._4_4_ * auVar282._4_4_;
                auVar207._8_4_ = auVar206._8_4_ * auVar282._8_4_;
                auVar207._12_4_ = auVar206._12_4_ * auVar282._12_4_;
              }
            }
            *(undefined1 (*) [16])local_1c0 = auVar207;
            local_1c0 = local_1c0 + 2;
            iVar135 = iVar135 + 1;
          }
          uVar147 = (ulong)(uVar137 + 1);
        }
      }
    }
    if ((iVar170 == 1) && (uVar150 == 8)) {
      p_Var145 = pp_Var149[-3];
      uVar171 = *(uint *)(&this->field_0xd4 + (long)p_Var145);
      uVar134 = *(uint *)(&this->field_0xd8 + (long)p_Var145);
      iVar156 = *(int *)(&this->field_0xdc + (long)p_Var145);
      iVar8 = *(int *)(&this->field_0xe0 + (long)p_Var145);
      iVar151 = *(int *)(&this->field_0xe4 + (long)p_Var145);
      iVar167 = *(int *)(&this->field_0xe8 + (long)p_Var145);
      iVar158 = *(int *)(&this->field_0x114 + (long)p_Var145);
      local_a8._0_8_ = p_Var145;
      lVar153 = *(long *)(&this->field_0x1a8 + (long)p_Var145);
      uVar159 = 0;
      uVar164 = 0;
      if (0 < (int)uVar171) {
        uVar164 = (ulong)uVar171;
      }
      uVar157 = 0;
      if (0 < (int)uVar134) {
        uVar157 = (ulong)uVar134;
      }
      uVar154 = (ulong)(uint)local_f8.c;
      if (local_f8.c < 1) {
        uVar154 = uVar159;
      }
      auVar337._8_4_ = 0x42b0c0a5;
      auVar337._0_8_ = 0x42b0c0a542b0c0a5;
      auVar337._12_4_ = 0x42b0c0a5;
      auVar337._16_4_ = 0x42b0c0a5;
      auVar337._20_4_ = 0x42b0c0a5;
      auVar337._24_4_ = 0x42b0c0a5;
      auVar337._28_4_ = 0x42b0c0a5;
      auVar344._8_4_ = 0xc2b0c0a5;
      auVar344._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar344._12_4_ = 0xc2b0c0a5;
      auVar344._16_4_ = 0xc2b0c0a5;
      auVar344._20_4_ = 0xc2b0c0a5;
      auVar344._24_4_ = 0xc2b0c0a5;
      auVar344._28_4_ = 0xc2b0c0a5;
      auVar351._8_4_ = 0x3f000000;
      auVar351._0_8_ = 0x3f0000003f000000;
      auVar351._12_4_ = 0x3f000000;
      auVar351._16_4_ = 0x3f000000;
      auVar351._20_4_ = 0x3f000000;
      auVar351._24_4_ = 0x3f000000;
      auVar351._28_4_ = 0x3f000000;
      auVar357._8_4_ = 0x3fb8aa3b;
      auVar357._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar357._12_4_ = 0x3fb8aa3b;
      auVar357._16_4_ = 0x3fb8aa3b;
      auVar357._20_4_ = 0x3fb8aa3b;
      auVar357._24_4_ = 0x3fb8aa3b;
      auVar357._28_4_ = 0x3fb8aa3b;
      auVar363._8_4_ = 0x3f800000;
      auVar363._0_8_ = 0x3f8000003f800000;
      auVar363._12_4_ = 0x3f800000;
      auVar363._16_4_ = 0x3f800000;
      auVar363._20_4_ = 0x3f800000;
      auVar363._24_4_ = 0x3f800000;
      auVar363._28_4_ = 0x3f800000;
      auVar369._8_4_ = 0x3f318000;
      auVar369._0_8_ = 0x3f3180003f318000;
      auVar369._12_4_ = 0x3f318000;
      auVar369._16_4_ = 0x3f318000;
      auVar369._20_4_ = 0x3f318000;
      auVar369._24_4_ = 0x3f318000;
      auVar369._28_4_ = 0x3f318000;
      auVar228 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar438._8_4_ = 0x3ab743ce;
      auVar438._0_8_ = 0x3ab743ce3ab743ce;
      auVar438._12_4_ = 0x3ab743ce;
      auVar438._16_4_ = 0x3ab743ce;
      auVar438._20_4_ = 0x3ab743ce;
      auVar438._24_4_ = 0x3ab743ce;
      auVar438._28_4_ = 0x3ab743ce;
      auVar444._8_4_ = 0x3c088908;
      auVar444._0_8_ = 0x3c0889083c088908;
      auVar444._12_4_ = 0x3c088908;
      auVar444._16_4_ = 0x3c088908;
      auVar444._20_4_ = 0x3c088908;
      auVar444._24_4_ = 0x3c088908;
      auVar444._28_4_ = 0x3c088908;
      auVar450._8_4_ = 0x3d2aa9c1;
      auVar450._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar450._12_4_ = 0x3d2aa9c1;
      auVar450._16_4_ = 0x3d2aa9c1;
      auVar450._20_4_ = 0x3d2aa9c1;
      auVar450._24_4_ = 0x3d2aa9c1;
      auVar450._28_4_ = 0x3d2aa9c1;
      auVar456._8_4_ = 0x3e2aaaaa;
      auVar456._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar456._12_4_ = 0x3e2aaaaa;
      auVar456._16_4_ = 0x3e2aaaaa;
      auVar456._20_4_ = 0x3e2aaaaa;
      auVar456._24_4_ = 0x3e2aaaaa;
      auVar456._28_4_ = 0x3e2aaaaa;
      auVar462._8_4_ = 0x3f800000;
      auVar462._0_8_ = 0x3f8000003f800000;
      auVar462._12_4_ = 0x3f800000;
      auVar462._16_4_ = 0x3f800000;
      auVar462._20_4_ = 0x3f800000;
      auVar462._24_4_ = 0x3f800000;
      auVar462._28_4_ = 0x3f800000;
      auVar468._8_4_ = 0xb95e8083;
      auVar468._0_8_ = 0xb95e8083b95e8083;
      auVar468._12_4_ = 0xb95e8083;
      auVar468._16_4_ = 0xb95e8083;
      auVar468._20_4_ = 0xb95e8083;
      auVar468._24_4_ = 0xb95e8083;
      auVar468._28_4_ = 0xb95e8083;
      auVar229 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      auVar249 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar250 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar251 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar252 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar253 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar254 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar255 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar256 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar257 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar258 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar172 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
      in_ZMM30 = ZEXT1664(auVar172);
      auVar259 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      for (; uVar159 != uVar154; uVar159 = uVar159 + 1) {
        local_1c0 = (_func_int ***)
                    ((long)(_func_int ***)local_f8.data +
                    local_f8.cstep * uVar159 * local_f8.elemsize);
        iVar143 = bottom_blob->w;
        iVar144 = bottom_blob->h;
        uVar147 = 0;
        uVar148 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar148 = uVar147;
        }
        uVar138 = local_f8.w;
        if (local_f8.w < 1) {
          uVar138 = 0;
        }
        uVar155 = local_f8.h;
        if (local_f8.h < 1) {
          uVar155 = 0;
        }
        while (uVar137 = (uint)uVar147, uVar137 != uVar155) {
          iVar135 = (1 - uVar171) * iVar156;
          for (uVar139 = 0; uVar139 != uVar138; uVar139 = uVar139 + 1) {
            if (lVar153 == 0) {
              auVar282 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar282 = ZEXT3264(*(undefined1 (*) [32])(lVar153 + uVar159 * 0x20));
            }
            pvVar165 = (void *)((this->weight_data_tm).cstep * uVar159 *
                                (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data)
            ;
            for (uVar147 = 0; uVar147 != uVar148; uVar147 = uVar147 + 1) {
              pvVar166 = pvVar165;
              for (uVar163 = 0; uVar163 != uVar157; uVar163 = uVar163 + 1) {
                iVar136 = (((int)uVar163 - uVar134) + 1) * iVar8 + uVar137;
                if (((-1 < iVar136) && (iVar140 = iVar136 / iVar167, iVar136 % iVar167 == 0)) &&
                   (iVar140 < iVar144)) {
                  iVar136 = iVar135;
                  for (lVar168 = 0; uVar164 * 0x20 != lVar168; lVar168 = lVar168 + 0x20) {
                    if (((-1 < iVar136) && (iVar142 = iVar136 / iVar151, iVar136 % iVar151 == 0)) &&
                       (iVar142 < iVar143)) {
                      uVar10 = *(undefined4 *)
                                ((long)bottom_blob->data +
                                (long)iVar142 * 4 +
                                (long)iVar140 * (long)bottom_blob->w * bottom_blob->elemsize +
                                bottom_blob->cstep * bottom_blob->elemsize * uVar147);
                      auVar402._4_4_ = uVar10;
                      auVar402._0_4_ = uVar10;
                      auVar402._8_4_ = uVar10;
                      auVar402._12_4_ = uVar10;
                      auVar402._16_4_ = uVar10;
                      auVar402._20_4_ = uVar10;
                      auVar402._24_4_ = uVar10;
                      auVar402._28_4_ = uVar10;
                      auVar173 = vfmadd231ps_fma(auVar282._0_32_,auVar402,
                                                 *(undefined1 (*) [32])((long)pvVar166 + lVar168));
                      auVar282 = ZEXT1664(auVar173);
                    }
                    iVar136 = iVar136 + iVar156;
                  }
                }
                pvVar166 = (void *)((long)pvVar166 + (long)(int)uVar171 * 0x20);
              }
              pvVar165 = (void *)((long)pvVar165 + (long)(int)(uVar171 * uVar134 * 8) * 4);
            }
            auVar260 = auVar282._0_32_;
            auVar275 = auVar260;
            if (iVar158 - 1U < 6) {
              auVar275 = vmaxps_avx512vl(auVar260,ZEXT1632(auVar172));
              switch(iVar158) {
              case 2:
                auVar260 = vminps_avx512vl(auVar260,ZEXT1632(auVar172));
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar99._4_4_ = uVar10;
                auVar99._0_4_ = uVar10;
                auVar99._8_4_ = uVar10;
                auVar99._12_4_ = uVar10;
                auVar99._16_4_ = uVar10;
                auVar99._20_4_ = uVar10;
                auVar99._24_4_ = uVar10;
                auVar99._28_4_ = uVar10;
                auVar275 = vfmadd231ps_avx512vl(auVar275,auVar260,auVar99);
                break;
              case 3:
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar97._4_4_ = uVar10;
                auVar97._0_4_ = uVar10;
                auVar97._8_4_ = uVar10;
                auVar97._12_4_ = uVar10;
                auVar97._16_4_ = uVar10;
                auVar97._20_4_ = uVar10;
                auVar97._24_4_ = uVar10;
                auVar97._28_4_ = uVar10;
                auVar260 = vmaxps_avx512vl(auVar260,auVar97);
                uVar10 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var145))[1];
                auVar98._4_4_ = uVar10;
                auVar98._0_4_ = uVar10;
                auVar98._8_4_ = uVar10;
                auVar98._12_4_ = uVar10;
                auVar98._16_4_ = uVar10;
                auVar98._20_4_ = uVar10;
                auVar98._24_4_ = uVar10;
                auVar98._28_4_ = uVar10;
                auVar275 = vminps_avx512vl(auVar260,auVar98);
                break;
              case 4:
                auVar95._8_4_ = 0x80000000;
                auVar95._0_8_ = 0x8000000080000000;
                auVar95._12_4_ = 0x80000000;
                auVar95._16_4_ = 0x80000000;
                auVar95._20_4_ = 0x80000000;
                auVar95._24_4_ = 0x80000000;
                auVar95._28_4_ = 0x80000000;
                auVar260 = vxorps_avx512vl(auVar260,auVar95);
                auVar260 = vminps_avx(auVar260,auVar337);
                auVar260 = vmaxps_avx(auVar260,auVar344);
                auVar173 = vfmadd231ps_fma(auVar351,auVar260,auVar357);
                auVar230 = vroundps_avx(ZEXT1632(auVar173),1);
                uVar147 = vcmpps_avx512vl(ZEXT1632(auVar173),auVar230,1);
                auVar231 = vsubps_avx512vl(auVar230,auVar363);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar281._0_4_ =
                     (float)((uint)bVar15 * auVar231._0_4_ | (uint)!bVar15 * auVar230._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar281._4_4_ =
                     (float)((uint)bVar15 * auVar231._4_4_ | (uint)!bVar15 * auVar230._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar281._8_4_ =
                     (float)((uint)bVar15 * auVar231._8_4_ | (uint)!bVar15 * auVar230._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar281._12_4_ =
                     (float)((uint)bVar15 * auVar231._12_4_ | (uint)!bVar15 * auVar230._12_4_);
                bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
                auVar281._16_4_ =
                     (float)((uint)bVar15 * auVar231._16_4_ | (uint)!bVar15 * auVar230._16_4_);
                bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
                auVar281._20_4_ =
                     (float)((uint)bVar15 * auVar231._20_4_ | (uint)!bVar15 * auVar230._20_4_);
                bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
                auVar281._24_4_ =
                     (float)((uint)bVar15 * auVar231._24_4_ | (uint)!bVar15 * auVar230._24_4_);
                bVar15 = SUB81(uVar147 >> 7,0);
                auVar281._28_4_ =
                     (float)((uint)bVar15 * auVar231._28_4_ | (uint)!bVar15 * auVar230._28_4_);
                auVar173 = vfmsub231ps_fma(auVar260,auVar281,auVar369);
                auVar96._8_4_ = 0x395e8083;
                auVar96._0_8_ = 0x395e8083395e8083;
                auVar96._12_4_ = 0x395e8083;
                auVar96._16_4_ = 0x395e8083;
                auVar96._20_4_ = 0x395e8083;
                auVar96._24_4_ = 0x395e8083;
                auVar96._28_4_ = 0x395e8083;
                auVar260 = vfmsub231ps_avx512vl(ZEXT1632(auVar173),auVar281,auVar96);
                auVar403._0_4_ = auVar260._0_4_ * auVar260._0_4_;
                auVar403._4_4_ = auVar260._4_4_ * auVar260._4_4_;
                auVar403._8_4_ = auVar260._8_4_ * auVar260._8_4_;
                auVar403._12_4_ = auVar260._12_4_ * auVar260._12_4_;
                auVar403._16_4_ = auVar260._16_4_ * auVar260._16_4_;
                auVar403._20_4_ = auVar260._20_4_ * auVar260._20_4_;
                auVar403._24_4_ = auVar260._24_4_ * auVar260._24_4_;
                auVar403._28_4_ = 0;
                auVar173 = vfmadd213ps_fma(auVar228,auVar260,auVar438);
                auVar173 = vfmadd213ps_fma(ZEXT1632(auVar173),auVar260,auVar444);
                auVar173 = vfmadd213ps_fma(ZEXT1632(auVar173),auVar260,auVar450);
                auVar173 = vfmadd213ps_fma(ZEXT1632(auVar173),auVar260,auVar456);
                auVar173 = vfmadd213ps_fma(ZEXT1632(auVar173),auVar260,auVar351);
                auVar173 = vfmadd213ps_fma(ZEXT1632(auVar173),auVar403,auVar260);
                auVar328._0_4_ = auVar173._0_4_ + 1.0;
                auVar328._4_4_ = auVar173._4_4_ + 1.0;
                auVar328._8_4_ = auVar173._8_4_ + 1.0;
                auVar328._12_4_ = auVar173._12_4_ + 1.0;
                auVar328._16_4_ = 0x3f800000;
                auVar328._20_4_ = 0x3f800000;
                auVar328._24_4_ = 0x3f800000;
                auVar328._28_4_ = 0x3f800000;
                auVar404._0_4_ = (int)auVar281._0_4_;
                auVar404._4_4_ = (int)auVar281._4_4_;
                auVar404._8_4_ = (int)auVar281._8_4_;
                auVar404._12_4_ = (int)auVar281._12_4_;
                auVar404._16_4_ = (int)auVar281._16_4_;
                auVar404._20_4_ = (int)auVar281._20_4_;
                auVar404._24_4_ = (int)auVar281._24_4_;
                auVar404._28_4_ = (int)auVar281._28_4_;
                auVar260 = vpslld_avx2(auVar404,0x17);
                auVar260 = vpaddd_avx2(auVar462,auVar260);
                auVar173 = vfmadd213ps_fma(auVar260,auVar328,auVar363);
                auVar260 = vrcpps_avx(ZEXT1632(auVar173));
                auVar173 = vfmsub213ps_fma(ZEXT1632(auVar173),auVar260,auVar363);
                auVar173 = vfnmadd132ps_fma(ZEXT1632(auVar173),auVar260,auVar260);
                auVar275 = ZEXT1632(auVar173);
                break;
              case 5:
                auVar260 = vminps_avx(auVar260,auVar337);
                auVar260 = vmaxps_avx(auVar260,auVar344);
                auVar173 = vfmadd213ps_fma(auVar357,auVar260,auVar351);
                auVar230 = vroundps_avx(ZEXT1632(auVar173),1);
                uVar147 = vcmpps_avx512vl(ZEXT1632(auVar173),auVar230,1);
                auVar231 = vsubps_avx512vl(auVar230,auVar363);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar276._0_4_ =
                     (float)((uint)bVar15 * auVar231._0_4_ | (uint)!bVar15 * auVar230._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar276._4_4_ =
                     (float)((uint)bVar15 * auVar231._4_4_ | (uint)!bVar15 * auVar230._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar276._8_4_ =
                     (float)((uint)bVar15 * auVar231._8_4_ | (uint)!bVar15 * auVar230._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar276._12_4_ =
                     (float)((uint)bVar15 * auVar231._12_4_ | (uint)!bVar15 * auVar230._12_4_);
                bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
                auVar276._16_4_ =
                     (float)((uint)bVar15 * auVar231._16_4_ | (uint)!bVar15 * auVar230._16_4_);
                bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
                auVar276._20_4_ =
                     (float)((uint)bVar15 * auVar231._20_4_ | (uint)!bVar15 * auVar230._20_4_);
                bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
                auVar276._24_4_ =
                     (float)((uint)bVar15 * auVar231._24_4_ | (uint)!bVar15 * auVar230._24_4_);
                bVar15 = SUB81(uVar147 >> 7,0);
                auVar276._28_4_ =
                     (float)((uint)bVar15 * auVar231._28_4_ | (uint)!bVar15 * auVar230._28_4_);
                auVar173 = vfmsub231ps_fma(auVar260,auVar276,auVar369);
                auVar173 = vfnmsub231ps_fma(ZEXT1632(auVar173),auVar276,auVar468);
                auVar230 = ZEXT1632(auVar173);
                auVar260 = vfmadd213ps_avx512vl(auVar228,auVar230,auVar438);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar230,auVar444);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar230,auVar450);
                auVar230 = ZEXT1632(auVar173);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar230,auVar456);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar230,auVar351);
                auVar260 = vfmadd213ps_avx512vl
                                     (auVar260,ZEXT1632(CONCAT412(auVar173._12_4_ * auVar173._12_4_,
                                                                  CONCAT48(auVar173._8_4_ *
                                                                           auVar173._8_4_,
                                                                           CONCAT44(auVar173._4_4_ *
                                                                                    auVar173._4_4_,
                                                                                    auVar173._0_4_ *
                                                                                    auVar173._0_4_))
                                                                 )),auVar230);
                auVar230 = vaddps_avx512vl(auVar260,auVar363);
                auVar431._0_4_ = (int)auVar276._0_4_;
                auVar431._4_4_ = (int)auVar276._4_4_;
                auVar431._8_4_ = (int)auVar276._8_4_;
                auVar431._12_4_ = (int)auVar276._12_4_;
                auVar431._16_4_ = (int)auVar276._16_4_;
                auVar431._20_4_ = (int)auVar276._20_4_;
                auVar431._24_4_ = (int)auVar276._24_4_;
                auVar431._28_4_ = (int)auVar276._28_4_;
                auVar260 = vpslld_avx2(auVar431,0x17);
                auVar260 = vpaddd_avx2(auVar260,auVar462);
                auVar173 = vfmadd213ps_fma(auVar260,auVar230,auVar363);
                uVar147 = vcmpps_avx512vl(ZEXT1632(auVar173),ZEXT1632(auVar172),2);
                auVar92._8_4_ = 0x800000;
                auVar92._0_8_ = 0x80000000800000;
                auVar92._12_4_ = 0x800000;
                auVar92._16_4_ = 0x800000;
                auVar92._20_4_ = 0x800000;
                auVar92._24_4_ = 0x800000;
                auVar92._28_4_ = 0x800000;
                auVar260 = vmaxps_avx512vl(ZEXT1632(auVar173),auVar92);
                auVar232 = vpsrld_avx2(auVar260,0x17);
                auVar498._8_4_ = 0x807fffff;
                auVar498._0_8_ = 0x807fffff807fffff;
                auVar498._12_4_ = 0x807fffff;
                auVar498._16_4_ = 0x807fffff;
                auVar498._20_4_ = 0x807fffff;
                auVar498._24_4_ = 0x807fffff;
                auVar498._28_4_ = 0x807fffff;
                auVar93._8_4_ = 0x3f000000;
                auVar93._0_8_ = 0x3f0000003f000000;
                auVar93._12_4_ = 0x3f000000;
                auVar93._16_4_ = 0x3f000000;
                auVar93._20_4_ = 0x3f000000;
                auVar93._24_4_ = 0x3f000000;
                auVar93._28_4_ = 0x3f000000;
                auVar260 = vpternlogd_avx512vl(auVar260,auVar498,auVar93,0xea);
                uVar163 = vcmpps_avx512vl(auVar260,auVar229,1);
                auVar230 = vaddps_avx512vl(auVar260,auVar249);
                auVar231 = vaddps_avx512vl(auVar230,auVar260);
                bVar15 = (bool)((byte)uVar163 & 1);
                auVar277._0_4_ =
                     (float)((uint)bVar15 * auVar231._0_4_ | (uint)!bVar15 * auVar230._0_4_);
                bVar15 = (bool)((byte)(uVar163 >> 1) & 1);
                auVar277._4_4_ =
                     (float)((uint)bVar15 * auVar231._4_4_ | (uint)!bVar15 * auVar230._4_4_);
                bVar15 = (bool)((byte)(uVar163 >> 2) & 1);
                auVar277._8_4_ =
                     (float)((uint)bVar15 * auVar231._8_4_ | (uint)!bVar15 * auVar230._8_4_);
                bVar15 = (bool)((byte)(uVar163 >> 3) & 1);
                auVar277._12_4_ =
                     (float)((uint)bVar15 * auVar231._12_4_ | (uint)!bVar15 * auVar230._12_4_);
                bVar15 = (bool)((byte)(uVar163 >> 4) & 1);
                auVar277._16_4_ =
                     (float)((uint)bVar15 * auVar231._16_4_ | (uint)!bVar15 * auVar230._16_4_);
                bVar15 = (bool)((byte)(uVar163 >> 5) & 1);
                auVar277._20_4_ =
                     (float)((uint)bVar15 * auVar231._20_4_ | (uint)!bVar15 * auVar230._20_4_);
                bVar15 = (bool)((byte)(uVar163 >> 6) & 1);
                auVar277._24_4_ =
                     (float)((uint)bVar15 * auVar231._24_4_ | (uint)!bVar15 * auVar230._24_4_);
                bVar15 = SUB81(uVar163 >> 7,0);
                auVar277._28_4_ = (uint)bVar15 * auVar231._28_4_ | (uint)!bVar15 * auVar230._28_4_;
                auVar114._4_4_ = auVar277._4_4_ * auVar277._4_4_;
                auVar114._0_4_ = auVar277._0_4_ * auVar277._0_4_;
                auVar114._8_4_ = auVar277._8_4_ * auVar277._8_4_;
                auVar114._12_4_ = auVar277._12_4_ * auVar277._12_4_;
                auVar114._16_4_ = auVar277._16_4_ * auVar277._16_4_;
                auVar114._20_4_ = auVar277._20_4_ * auVar277._20_4_;
                auVar114._24_4_ = auVar277._24_4_ * auVar277._24_4_;
                auVar114._28_4_ = auVar260._28_4_;
                auVar260 = vfmadd213ps_avx512vl(auVar250,auVar277,auVar251);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar277,auVar252);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar277,auVar253);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar277,auVar254);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar277,auVar255);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar277,auVar256);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar277,auVar257);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar277,auVar258);
                auVar230 = vmulps_avx512vl(auVar114,auVar277);
                auVar230 = vmulps_avx512vl(auVar230,auVar260);
                auVar94._8_4_ = 0xffffff82;
                auVar94._0_8_ = 0xffffff82ffffff82;
                auVar94._12_4_ = 0xffffff82;
                auVar94._16_4_ = 0xffffff82;
                auVar94._20_4_ = 0xffffff82;
                auVar94._24_4_ = 0xffffff82;
                auVar94._28_4_ = 0xffffff82;
                auVar260 = vpaddd_avx512vl(auVar232,auVar94);
                auVar260 = vcvtdq2ps_avx(auVar260);
                auVar231 = vsubps_avx512vl(auVar260,auVar363);
                bVar15 = (bool)((byte)uVar163 & 1);
                auVar278._0_4_ = (uint)bVar15 * auVar231._0_4_ | (uint)!bVar15 * auVar260._0_4_;
                bVar15 = (bool)((byte)(uVar163 >> 1) & 1);
                auVar278._4_4_ = (uint)bVar15 * auVar231._4_4_ | (uint)!bVar15 * auVar260._4_4_;
                bVar15 = (bool)((byte)(uVar163 >> 2) & 1);
                auVar278._8_4_ = (uint)bVar15 * auVar231._8_4_ | (uint)!bVar15 * auVar260._8_4_;
                bVar15 = (bool)((byte)(uVar163 >> 3) & 1);
                auVar278._12_4_ = (uint)bVar15 * auVar231._12_4_ | (uint)!bVar15 * auVar260._12_4_;
                bVar15 = (bool)((byte)(uVar163 >> 4) & 1);
                auVar278._16_4_ = (uint)bVar15 * auVar231._16_4_ | (uint)!bVar15 * auVar260._16_4_;
                bVar15 = (bool)((byte)(uVar163 >> 5) & 1);
                auVar278._20_4_ = (uint)bVar15 * auVar231._20_4_ | (uint)!bVar15 * auVar260._20_4_;
                bVar15 = (bool)((byte)(uVar163 >> 6) & 1);
                auVar278._24_4_ = (uint)bVar15 * auVar231._24_4_ | (uint)!bVar15 * auVar260._24_4_;
                bVar15 = SUB81(uVar163 >> 7,0);
                auVar278._28_4_ = (uint)bVar15 * auVar231._28_4_ | (uint)!bVar15 * auVar260._28_4_;
                auVar260 = vfmadd231ps_avx512vl(auVar230,auVar278,auVar468);
                auVar260 = vfmsub231ps_avx512vl(auVar260,auVar351,auVar114);
                auVar260 = vsubps_avx512vl(auVar260,auVar277);
                auVar173 = vfmsub231ps_fma(auVar260,auVar369,auVar278);
                auVar260 = vmulps_avx512vl(ZEXT1632(auVar173),auVar259);
                auVar230 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar279._0_4_ = (uint)bVar15 * auVar230._0_4_ | (uint)!bVar15 * auVar260._0_4_;
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar279._4_4_ = (uint)bVar15 * auVar230._4_4_ | (uint)!bVar15 * auVar260._4_4_;
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar279._8_4_ = (uint)bVar15 * auVar230._8_4_ | (uint)!bVar15 * auVar260._8_4_;
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar279._12_4_ = (uint)bVar15 * auVar230._12_4_ | (uint)!bVar15 * auVar260._12_4_;
                bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
                auVar279._16_4_ = (uint)bVar15 * auVar230._16_4_ | (uint)!bVar15 * auVar260._16_4_;
                bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
                auVar279._20_4_ = (uint)bVar15 * auVar230._20_4_ | (uint)!bVar15 * auVar260._20_4_;
                bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
                auVar279._24_4_ = (uint)bVar15 * auVar230._24_4_ | (uint)!bVar15 * auVar260._24_4_;
                bVar15 = SUB81(uVar147 >> 7,0);
                auVar279._28_4_ = (uint)bVar15 * auVar230._28_4_ | (uint)!bVar15 * auVar260._28_4_;
                auVar260 = vminps_avx(auVar279,auVar337);
                auVar260 = vmaxps_avx(auVar260,auVar344);
                auVar173 = vfmadd213ps_fma(auVar357,auVar260,auVar351);
                auVar230 = vroundps_avx(ZEXT1632(auVar173),1);
                uVar147 = vcmpps_avx512vl(ZEXT1632(auVar173),auVar230,1);
                auVar231 = vsubps_avx512vl(auVar230,auVar363);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar280._0_4_ =
                     (float)((uint)bVar15 * auVar231._0_4_ | (uint)!bVar15 * auVar230._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar280._4_4_ =
                     (float)((uint)bVar15 * auVar231._4_4_ | (uint)!bVar15 * auVar230._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar280._8_4_ =
                     (float)((uint)bVar15 * auVar231._8_4_ | (uint)!bVar15 * auVar230._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar280._12_4_ =
                     (float)((uint)bVar15 * auVar231._12_4_ | (uint)!bVar15 * auVar230._12_4_);
                bVar15 = (bool)((byte)(uVar147 >> 4) & 1);
                auVar280._16_4_ =
                     (float)((uint)bVar15 * auVar231._16_4_ | (uint)!bVar15 * auVar230._16_4_);
                bVar15 = (bool)((byte)(uVar147 >> 5) & 1);
                auVar280._20_4_ =
                     (float)((uint)bVar15 * auVar231._20_4_ | (uint)!bVar15 * auVar230._20_4_);
                bVar15 = (bool)((byte)(uVar147 >> 6) & 1);
                auVar280._24_4_ =
                     (float)((uint)bVar15 * auVar231._24_4_ | (uint)!bVar15 * auVar230._24_4_);
                bVar15 = SUB81(uVar147 >> 7,0);
                auVar280._28_4_ =
                     (float)((uint)bVar15 * auVar231._28_4_ | (uint)!bVar15 * auVar230._28_4_);
                auVar173 = vfmsub231ps_fma(auVar260,auVar280,auVar369);
                auVar173 = vfnmsub231ps_fma(ZEXT1632(auVar173),auVar280,auVar468);
                auVar230 = ZEXT1632(auVar173);
                auVar260 = vfmadd213ps_avx512vl(auVar228,auVar230,auVar438);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar230,auVar444);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar230,auVar450);
                auVar230 = ZEXT1632(auVar173);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar230,auVar456);
                auVar260 = vfmadd213ps_avx512vl(auVar260,auVar230,auVar351);
                auVar260 = vfmadd213ps_avx512vl
                                     (auVar260,ZEXT1632(CONCAT412(auVar173._12_4_ * auVar173._12_4_,
                                                                  CONCAT48(auVar173._8_4_ *
                                                                           auVar173._8_4_,
                                                                           CONCAT44(auVar173._4_4_ *
                                                                                    auVar173._4_4_,
                                                                                    auVar173._0_4_ *
                                                                                    auVar173._0_4_))
                                                                 )),auVar230);
                auVar230 = vaddps_avx512vl(auVar260,auVar363);
                auVar432._0_4_ = (int)auVar280._0_4_;
                auVar432._4_4_ = (int)auVar280._4_4_;
                auVar432._8_4_ = (int)auVar280._8_4_;
                auVar432._12_4_ = (int)auVar280._12_4_;
                auVar432._16_4_ = (int)auVar280._16_4_;
                auVar432._20_4_ = (int)auVar280._20_4_;
                auVar432._24_4_ = (int)auVar280._24_4_;
                auVar432._28_4_ = (int)auVar280._28_4_;
                auVar260 = vpslld_avx2(auVar432,0x17);
                auVar260 = vpaddd_avx2(auVar260,auVar462);
                auVar173 = vfmadd213ps_fma(auVar260,auVar230,auVar363);
                auVar260 = vrcpps_avx(ZEXT1632(auVar173));
                auVar173 = vfmsub213ps_fma(ZEXT1632(auVar173),auVar260,auVar363);
                auVar173 = vfnmadd132ps_fma(ZEXT1632(auVar173),auVar260,auVar260);
                auVar230 = vfnmadd213ps_avx512vl(ZEXT1632(auVar173),auVar259,auVar249);
                auVar275._4_4_ = auVar230._4_4_ * auVar282._4_4_;
                auVar275._0_4_ = auVar230._0_4_ * auVar282._0_4_;
                auVar275._8_4_ = auVar230._8_4_ * auVar282._8_4_;
                auVar275._12_4_ = auVar230._12_4_ * auVar282._12_4_;
                auVar275._16_4_ = auVar230._16_4_ * auVar282._16_4_;
                auVar275._20_4_ = auVar230._20_4_ * auVar282._20_4_;
                auVar275._24_4_ = auVar230._24_4_ * auVar282._24_4_;
                auVar275._28_4_ = auVar260._28_4_;
                break;
              case 6:
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar405._4_4_ = uVar10;
                auVar405._0_4_ = uVar10;
                auVar405._8_4_ = uVar10;
                auVar405._12_4_ = uVar10;
                auVar405._16_4_ = uVar10;
                auVar405._20_4_ = uVar10;
                auVar405._24_4_ = uVar10;
                auVar405._28_4_ = uVar10;
                uVar10 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var145))[1];
                auVar91._4_4_ = uVar10;
                auVar91._0_4_ = uVar10;
                auVar91._8_4_ = uVar10;
                auVar91._12_4_ = uVar10;
                auVar91._16_4_ = uVar10;
                auVar91._20_4_ = uVar10;
                auVar91._24_4_ = uVar10;
                auVar91._28_4_ = uVar10;
                auVar260 = vfmadd213ps_avx512vl(auVar405,auVar260,auVar91);
                auVar260 = vmaxps_avx512vl(auVar260,ZEXT1632(auVar172));
                auVar260 = vminps_avx(auVar260,auVar363);
                auVar275._4_4_ = auVar260._4_4_ * auVar282._4_4_;
                auVar275._0_4_ = auVar260._0_4_ * auVar282._0_4_;
                auVar275._8_4_ = auVar260._8_4_ * auVar282._8_4_;
                auVar275._12_4_ = auVar260._12_4_ * auVar282._12_4_;
                auVar275._16_4_ = auVar260._16_4_ * auVar282._16_4_;
                auVar275._20_4_ = auVar260._20_4_ * auVar282._20_4_;
                auVar275._24_4_ = auVar260._24_4_ * auVar282._24_4_;
                auVar275._28_4_ = auVar260._28_4_;
              }
            }
            *(undefined1 (*) [32])local_1c0 = auVar275;
            local_1c0 = local_1c0 + 4;
            iVar135 = iVar135 + 1;
          }
          uVar147 = (ulong)(uVar137 + 1);
        }
      }
    }
    auVar172 = in_ZMM30._0_16_;
    if ((iVar170 == 8) && (uVar150 == 1)) {
      p_Var145 = pp_Var149[-3];
      uVar171 = *(uint *)(&this->field_0xd4 + (long)p_Var145);
      uVar134 = *(uint *)(&this->field_0xd8 + (long)p_Var145);
      iVar156 = *(int *)(&this->field_0xdc + (long)p_Var145);
      iVar8 = *(int *)(&this->field_0x114 + (long)p_Var145);
      local_60 = local_f8.elemsize * local_f8.cstep;
      uVar164 = 0;
      uVar159 = 0;
      if (0 < (int)uVar171) {
        uVar159 = (ulong)uVar171;
      }
      uVar157 = 0;
      if (0 < (int)uVar134) {
        uVar157 = (ulong)uVar134;
      }
      uVar154 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar154 = uVar164;
      }
      uVar138 = local_f8.w;
      if (local_f8.w < 1) {
        uVar138 = 0;
      }
      uVar155 = local_f8.h;
      if (local_f8.h < 1) {
        uVar155 = 0;
      }
      local_58 = (ulong)(uint)local_f8.c;
      if (local_f8.c < 1) {
        local_58 = uVar164;
      }
      iVar151 = *(int *)(&this->field_0xe0 + (long)p_Var145);
      iVar167 = *(int *)(&this->field_0xe4 + (long)p_Var145);
      iVar158 = *(int *)(&this->field_0xe8 + (long)p_Var145);
      lVar153 = *(long *)(&this->field_0x1a8 + (long)p_Var145);
      local_68 = (Allocator *)local_f8.data;
      iVar143 = bottom_blob->w;
      iVar144 = bottom_blob->h;
      for (; auVar172 = in_ZMM30._0_16_, uVar164 != local_58; uVar164 = uVar164 + 1) {
        local_1c0 = (_func_int ***)((long)&local_68->_vptr_Allocator + local_60 * uVar164);
        for (uVar137 = 0; uVar137 != uVar155; uVar137 = uVar137 + 1) {
          local_a8._0_8_ = *(undefined8 *)(&this->field_0x118 + (long)p_Var145);
          sVar12 = (this->weight_data_tm).cstep;
          sVar13 = (this->weight_data_tm).elemsize;
          pvVar165 = (this->weight_data_tm).data;
          iVar135 = (1 - uVar171) * iVar156;
          for (uVar139 = 0; uVar139 != uVar138; uVar139 = uVar139 + 1) {
            if (lVar153 == 0) {
              fVar320 = 0.0;
            }
            else {
              fVar320 = *(float *)(lVar153 + uVar164 * 4);
            }
            auVar282 = ZEXT1664(ZEXT816(0) << 0x40);
            pvVar166 = (void *)(sVar12 * uVar164 * sVar13 + (long)pvVar165);
            for (uVar148 = 0; uVar148 != uVar154; uVar148 = uVar148 + 1) {
              pvVar162 = pvVar166;
              for (uVar147 = 0; uVar147 != uVar157; uVar147 = uVar147 + 1) {
                iVar136 = (((int)uVar147 - uVar134) + 1) * iVar151 + uVar137;
                if (((-1 < iVar136) && (iVar140 = iVar136 / iVar158, iVar136 % iVar158 == 0)) &&
                   (iVar140 < iVar144)) {
                  iVar136 = iVar135;
                  for (lVar168 = 0; uVar159 * 0x20 != lVar168; lVar168 = lVar168 + 0x20) {
                    if (((-1 < iVar136) && (iVar142 = iVar136 / iVar167, iVar136 % iVar167 == 0)) &&
                       (iVar142 < iVar143)) {
                      auVar172 = vfmadd231ps_fma(auVar282._0_32_,
                                                 *(undefined1 (*) [32])
                                                  ((long)bottom_blob->data +
                                                  (long)(iVar142 << 3) * 4 +
                                                  (long)iVar140 *
                                                  (long)bottom_blob->w * bottom_blob->elemsize +
                                                  bottom_blob->cstep * bottom_blob->elemsize *
                                                  uVar148),
                                                 *(undefined1 (*) [32])((long)pvVar162 + lVar168));
                      auVar282 = ZEXT1664(auVar172);
                    }
                    iVar136 = iVar136 + iVar156;
                  }
                }
                pvVar162 = (void *)((long)pvVar162 + (long)(int)uVar171 * 0x20);
              }
              pvVar166 = (void *)((long)pvVar166 + (long)(int)(uVar171 * uVar134 * 8) * 4);
            }
            auVar330._0_4_ = auVar282._16_4_ + auVar282._0_4_;
            auVar330._4_4_ = auVar282._20_4_ + auVar282._4_4_;
            auVar330._8_4_ = auVar282._24_4_ + auVar282._8_4_;
            auVar330._12_4_ = auVar282._28_4_ + auVar282._12_4_;
            auVar172 = vshufpd_avx(auVar330,auVar330,1);
            auVar331._0_4_ = auVar172._0_4_ + auVar330._0_4_;
            auVar331._4_4_ = auVar172._4_4_ + auVar330._4_4_;
            auVar331._8_4_ = auVar172._8_4_ + auVar330._8_4_;
            auVar331._12_4_ = auVar172._12_4_ + auVar330._12_4_;
            auVar172 = vmovshdup_avx(auVar331);
            fVar320 = auVar172._0_4_ + fVar320 + auVar331._0_4_;
            fVar338 = fVar320;
            if (iVar8 - 1U < 6) {
              auVar172 = ZEXT416((uint)fVar320);
              switch(iVar8) {
              case 1:
                auVar172 = vmaxss_avx(auVar172,ZEXT416(0));
                fVar338 = auVar172._0_4_;
                break;
              case 2:
                uVar17 = vcmpss_avx512f(auVar172,ZEXT416(0),0xe);
                bVar15 = (bool)((byte)uVar17 & 1);
                fVar338 = (float)((uint)bVar15 * 0x3f800000 +
                                 (uint)!bVar15 * (int)*(float *)local_a8._0_8_) * fVar320;
                break;
              case 3:
                auVar172 = vmaxss_avx(auVar172,ZEXT416((uint)*(float *)local_a8._0_8_));
                fVar338 = auVar172._0_4_;
                if (*(float *)(local_a8._0_8_ + 4) < auVar172._0_4_) {
                  fVar338 = *(float *)(local_a8._0_8_ + 4);
                }
                break;
              case 4:
                auVar172 = vminss_avx(auVar172,SUB6416(ZEXT464(0x42b0c0a5),0));
                auVar40._8_4_ = 0x80000000;
                auVar40._0_8_ = 0x8000000080000000;
                auVar40._12_4_ = 0x80000000;
                auVar173 = vxorps_avx512vl(auVar172,auVar40);
                uVar17 = vcmpss_avx512f(auVar172,ZEXT416(0xc2b0c0a5),1);
                bVar15 = (bool)((byte)uVar17 & 1);
                fVar320 = expf((float)((uint)bVar15 * 0x42b0c0a5 + (uint)!bVar15 * auVar173._0_4_));
                fVar338 = 1.0 / (fVar320 + 1.0);
                break;
              case 5:
                fVar338 = expf(fVar320);
                fVar338 = logf(fVar338 + 1.0);
                fVar338 = tanhf(fVar338);
                fVar338 = fVar338 * fVar320;
                break;
              case 6:
                fVar3 = *(float *)local_a8._0_8_;
                auVar39._8_4_ = 0x80000000;
                auVar39._0_8_ = 0x8000000080000000;
                auVar39._12_4_ = 0x80000000;
                auVar172 = vxorps_avx512vl(ZEXT416((uint)*(float *)(local_a8._0_8_ + 4)),auVar39);
                fVar345 = auVar172._0_4_ / fVar3;
                fVar338 = 0.0;
                if ((fVar345 <= fVar320) && (fVar338 = fVar320, fVar320 <= fVar345 + 1.0 / fVar3)) {
                  auVar172 = vfmadd213ss_fma(ZEXT416((uint)fVar3),ZEXT416((uint)fVar320),
                                             ZEXT416((uint)*(float *)(local_a8._0_8_ + 4)));
                  fVar338 = auVar172._0_4_ * fVar320;
                }
              }
            }
            *(float *)local_1c0 = fVar338;
            local_1c0 = (_func_int ***)((long)local_1c0 + 4);
            iVar135 = iVar135 + 1;
          }
        }
      }
    }
    if ((iVar170 == 4) && (uVar150 == 4)) {
      p_Var145 = pp_Var149[-3];
      uVar171 = *(uint *)(&this->field_0xd4 + (long)p_Var145);
      uVar134 = *(uint *)(&this->field_0xd8 + (long)p_Var145);
      iVar156 = *(int *)(&this->field_0xdc + (long)p_Var145);
      iVar8 = *(int *)(&this->field_0xe0 + (long)p_Var145);
      iVar151 = *(int *)(&this->field_0xe4 + (long)p_Var145);
      iVar167 = *(int *)(&this->field_0xe8 + (long)p_Var145);
      iVar158 = *(int *)(&this->field_0x114 + (long)p_Var145);
      local_a8._0_8_ = p_Var145;
      lVar153 = *(long *)(&this->field_0x1a8 + (long)p_Var145);
      uVar159 = 0;
      uVar164 = 0;
      if (0 < (int)uVar171) {
        uVar164 = (ulong)uVar171;
      }
      uVar157 = 0;
      if (0 < (int)uVar134) {
        uVar157 = (ulong)uVar134;
      }
      uVar154 = (ulong)(uint)local_f8.c;
      if (local_f8.c < 1) {
        uVar154 = uVar159;
      }
      auVar332._8_4_ = 0x42b0c0a5;
      auVar332._0_8_ = 0x42b0c0a542b0c0a5;
      auVar332._12_4_ = 0x42b0c0a5;
      auVar340._8_4_ = 0xc2b0c0a5;
      auVar340._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar340._12_4_ = 0xc2b0c0a5;
      auVar347._8_4_ = 0x3f000000;
      auVar347._0_8_ = 0x3f0000003f000000;
      auVar347._12_4_ = 0x3f000000;
      auVar353._8_4_ = 0x3fb8aa3b;
      auVar353._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar353._12_4_ = 0x3fb8aa3b;
      auVar359._8_4_ = 0x3f800000;
      auVar359._0_8_ = 0x3f8000003f800000;
      auVar359._12_4_ = 0x3f800000;
      auVar365._8_4_ = 0x3f318000;
      auVar365._0_8_ = 0x3f3180003f318000;
      auVar365._12_4_ = 0x3f318000;
      auVar173 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar434._8_4_ = 0x3ab743ce;
      auVar434._0_8_ = 0x3ab743ce3ab743ce;
      auVar434._12_4_ = 0x3ab743ce;
      auVar440._8_4_ = 0x3c088908;
      auVar440._0_8_ = 0x3c0889083c088908;
      auVar440._12_4_ = 0x3c088908;
      auVar446._8_4_ = 0x3d2aa9c1;
      auVar446._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar446._12_4_ = 0x3d2aa9c1;
      auVar452._8_4_ = 0x3e2aaaaa;
      auVar452._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar452._12_4_ = 0x3e2aaaaa;
      auVar458._8_4_ = 0x3f800000;
      auVar458._0_8_ = 0x3f8000003f800000;
      auVar458._12_4_ = 0x3f800000;
      auVar464._8_4_ = 0xb95e8083;
      auVar464._0_8_ = 0xb95e8083b95e8083;
      auVar464._12_4_ = 0xb95e8083;
      auVar174 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      auVar195 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar196 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar197 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar198 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar199 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar200 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar201 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar202 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar206 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar203 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar172 = vxorps_avx512vl(auVar172,auVar172);
      auVar204 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      for (; uVar159 != uVar154; uVar159 = uVar159 + 1) {
        local_1c0 = (_func_int ***)
                    ((long)(_func_int ***)local_f8.data +
                    local_f8.cstep * uVar159 * local_f8.elemsize);
        iVar143 = bottom_blob->w;
        iVar144 = bottom_blob->h;
        uVar147 = 0;
        uVar148 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar148 = uVar147;
        }
        uVar138 = local_f8.w;
        if (local_f8.w < 1) {
          uVar138 = 0;
        }
        uVar155 = local_f8.h;
        if (local_f8.h < 1) {
          uVar155 = 0;
        }
        while (uVar137 = (uint)uVar147, uVar137 != uVar155) {
          iVar135 = (1 - uVar171) * iVar156;
          for (uVar139 = 0; uVar139 != uVar138; uVar139 = uVar139 + 1) {
            if (lVar153 == 0) {
              auVar205 = ZEXT816(0) << 0x40;
            }
            else {
              auVar205 = *(undefined1 (*) [16])(lVar153 + uVar159 * 0x10);
            }
            auVar282 = ZEXT1664(auVar205);
            pvVar165 = bottom_blob->data;
            lVar168 = (long)(this->weight_data_tm).data +
                      (this->weight_data_tm).cstep * uVar159 * (this->weight_data_tm).elemsize +
                      0x30;
            for (uVar147 = 0; uVar147 != uVar148; uVar147 = uVar147 + 1) {
              lVar169 = lVar168;
              for (uVar163 = 0; uVar163 != uVar157; uVar163 = uVar163 + 1) {
                iVar136 = (((int)uVar163 - uVar134) + 1) * iVar8 + uVar137;
                if (((-1 < iVar136) && (iVar140 = iVar136 / iVar167, iVar136 % iVar167 == 0)) &&
                   (iVar140 < iVar144)) {
                  lVar115 = (long)iVar140 * (long)bottom_blob->w * bottom_blob->elemsize +
                            bottom_blob->cstep * bottom_blob->elemsize * uVar147;
                  iVar136 = iVar135;
                  for (lVar161 = 0; uVar164 * 0x40 != lVar161; lVar161 = lVar161 + 0x40) {
                    if (((-1 < iVar136) && (iVar140 = iVar136 / iVar151, iVar136 % iVar151 == 0)) &&
                       (iVar140 < iVar143)) {
                      lVar146 = (long)(iVar140 << 2);
                      uVar10 = *(undefined4 *)((long)pvVar165 + lVar146 * 4 + lVar115);
                      auVar380._4_4_ = uVar10;
                      auVar380._0_4_ = uVar10;
                      auVar380._8_4_ = uVar10;
                      auVar380._12_4_ = uVar10;
                      uVar10 = *(undefined4 *)((long)pvVar165 + lVar146 * 4 + lVar115 + 4);
                      auVar414._4_4_ = uVar10;
                      auVar414._0_4_ = uVar10;
                      auVar414._8_4_ = uVar10;
                      auVar414._12_4_ = uVar10;
                      uVar10 = *(undefined4 *)((long)pvVar165 + lVar146 * 4 + lVar115 + 8);
                      auVar481._4_4_ = uVar10;
                      auVar481._0_4_ = uVar10;
                      auVar481._8_4_ = uVar10;
                      auVar481._12_4_ = uVar10;
                      auVar188 = vbroadcastss_avx512vl
                                           (ZEXT416(*(uint *)((long)pvVar165 +
                                                             lVar146 * 4 + lVar115 + 0xc)));
                      auVar205 = vfmadd231ps_fma(auVar282._0_16_,auVar380,
                                                 *(undefined1 (*) [16])(lVar169 + -0x30 + lVar161));
                      auVar205 = vfmadd231ps_fma(auVar205,auVar414,
                                                 *(undefined1 (*) [16])(lVar169 + -0x20 + lVar161));
                      auVar205 = vfmadd231ps_fma(auVar205,auVar481,
                                                 *(undefined1 (*) [16])(lVar169 + -0x10 + lVar161));
                      auVar205 = vfmadd231ps_avx512vl
                                           (auVar205,auVar188,
                                            *(undefined1 (*) [16])(lVar169 + lVar161));
                      auVar282 = ZEXT1664(auVar205);
                    }
                    iVar136 = iVar136 + iVar156;
                  }
                }
                lVar169 = lVar169 + (long)(int)uVar171 * 0x40;
              }
              lVar168 = lVar168 + (long)(int)(uVar171 * uVar134 * 0x10) * 4;
            }
            auVar205 = auVar282._0_16_;
            auVar214 = auVar205;
            if (iVar158 - 1U < 6) {
              auVar214 = vmaxps_avx512vl(auVar205,auVar172);
              switch(iVar158) {
              case 2:
                auVar205 = vminps_avx512vl(auVar205,auVar172);
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar49._4_4_ = uVar10;
                auVar49._0_4_ = uVar10;
                auVar49._8_4_ = uVar10;
                auVar49._12_4_ = uVar10;
                auVar214 = vfmadd231ps_avx512vl(auVar214,auVar205,auVar49);
                break;
              case 3:
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar47._4_4_ = uVar10;
                auVar47._0_4_ = uVar10;
                auVar47._8_4_ = uVar10;
                auVar47._12_4_ = uVar10;
                auVar205 = vmaxps_avx512vl(auVar205,auVar47);
                uVar10 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var145))[1];
                auVar48._4_4_ = uVar10;
                auVar48._0_4_ = uVar10;
                auVar48._8_4_ = uVar10;
                auVar48._12_4_ = uVar10;
                auVar214 = vminps_avx512vl(auVar205,auVar48);
                break;
              case 4:
                auVar45._8_4_ = 0x80000000;
                auVar45._0_8_ = 0x8000000080000000;
                auVar45._12_4_ = 0x80000000;
                auVar205 = vxorps_avx512vl(auVar205,auVar45);
                auVar205 = vminps_avx(auVar205,auVar332);
                auVar188 = vmaxps_avx(auVar205,auVar340);
                auVar175 = vfmadd231ps_fma(auVar347,auVar188,auVar353);
                auVar486._0_4_ = (int)auVar175._0_4_;
                auVar486._4_4_ = (int)auVar175._4_4_;
                auVar486._8_4_ = (int)auVar175._8_4_;
                auVar486._12_4_ = (int)auVar175._12_4_;
                auVar205 = vcvtdq2ps_avx(auVar486);
                uVar147 = vcmpps_avx512vl(auVar175,auVar205,1);
                auVar175 = vsubps_avx512vl(auVar205,auVar359);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar220._0_4_ =
                     (float)((uint)bVar15 * auVar175._0_4_ | (uint)!bVar15 * auVar205._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar220._4_4_ =
                     (float)((uint)bVar15 * auVar175._4_4_ | (uint)!bVar15 * auVar205._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar220._8_4_ =
                     (float)((uint)bVar15 * auVar175._8_4_ | (uint)!bVar15 * auVar205._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar220._12_4_ =
                     (float)((uint)bVar15 * auVar175._12_4_ | (uint)!bVar15 * auVar205._12_4_);
                auVar205 = vfmsub231ps_fma(auVar188,auVar220,auVar365);
                auVar46._8_4_ = 0x395e8083;
                auVar46._0_8_ = 0x395e8083395e8083;
                auVar46._12_4_ = 0x395e8083;
                auVar188 = vfmsub231ps_avx512vl(auVar205,auVar220,auVar46);
                auVar383._0_4_ = auVar188._0_4_ * auVar188._0_4_;
                auVar383._4_4_ = auVar188._4_4_ * auVar188._4_4_;
                auVar383._8_4_ = auVar188._8_4_ * auVar188._8_4_;
                auVar383._12_4_ = auVar188._12_4_ * auVar188._12_4_;
                auVar205 = vfmadd213ps_fma(auVar173,auVar188,auVar434);
                auVar205 = vfmadd213ps_fma(auVar205,auVar188,auVar440);
                auVar205 = vfmadd213ps_fma(auVar205,auVar188,auVar446);
                auVar205 = vfmadd213ps_fma(auVar205,auVar188,auVar452);
                auVar205 = vfmadd213ps_fma(auVar205,auVar188,auVar347);
                auVar205 = vfmadd213ps_fma(auVar205,auVar383,auVar188);
                auVar323._0_4_ = auVar205._0_4_ + 1.0;
                auVar323._4_4_ = auVar205._4_4_ + 1.0;
                auVar323._8_4_ = auVar205._8_4_ + 1.0;
                auVar323._12_4_ = auVar205._12_4_ + 1.0;
                auVar384._0_4_ = (int)auVar220._0_4_;
                auVar384._4_4_ = (int)auVar220._4_4_;
                auVar384._8_4_ = (int)auVar220._8_4_;
                auVar384._12_4_ = (int)auVar220._12_4_;
                auVar205 = vpslld_avx(auVar384,0x17);
                auVar205 = vpaddd_avx(auVar458,auVar205);
                auVar188 = vfmadd213ps_fma(auVar205,auVar323,auVar359);
                auVar205 = vrcpps_avx(auVar188);
                auVar188 = vfmsub213ps_fma(auVar188,auVar205,auVar359);
                auVar214 = vfnmadd132ps_fma(auVar188,auVar205,auVar205);
                break;
              case 5:
                auVar188 = vminps_avx(auVar205,auVar332);
                auVar175 = vmaxps_avx(auVar188,auVar340);
                auVar176 = vfmadd213ps_fma(auVar353,auVar175,auVar347);
                auVar482._0_4_ = (int)auVar176._0_4_;
                auVar482._4_4_ = (int)auVar176._4_4_;
                auVar482._8_4_ = (int)auVar176._8_4_;
                auVar482._12_4_ = (int)auVar176._12_4_;
                auVar188 = vcvtdq2ps_avx(auVar482);
                uVar147 = vcmpps_avx512vl(auVar176,auVar188,1);
                auVar176 = vsubps_avx512vl(auVar188,auVar359);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar215._0_4_ =
                     (float)((uint)bVar15 * auVar176._0_4_ | (uint)!bVar15 * auVar188._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar215._4_4_ =
                     (float)((uint)bVar15 * auVar176._4_4_ | (uint)!bVar15 * auVar188._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar215._8_4_ =
                     (float)((uint)bVar15 * auVar176._8_4_ | (uint)!bVar15 * auVar188._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar215._12_4_ =
                     (float)((uint)bVar15 * auVar176._12_4_ | (uint)!bVar15 * auVar188._12_4_);
                auVar188 = vfmsub231ps_fma(auVar175,auVar215,auVar365);
                auVar188 = vfnmsub231ps_fma(auVar188,auVar215,auVar464);
                auVar415._0_4_ = auVar188._0_4_ * auVar188._0_4_;
                auVar415._4_4_ = auVar188._4_4_ * auVar188._4_4_;
                auVar415._8_4_ = auVar188._8_4_ * auVar188._8_4_;
                auVar415._12_4_ = auVar188._12_4_ * auVar188._12_4_;
                auVar175 = vfmadd213ps_avx512vl(auVar173,auVar188,auVar434);
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar188,auVar440);
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar188,auVar446);
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar188,auVar452);
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar188,auVar347);
                auVar188 = vfmadd213ps_avx512vl(auVar175,auVar415,auVar188);
                auVar175 = vaddps_avx512vl(auVar188,auVar359);
                auVar416._0_4_ = (int)auVar215._0_4_;
                auVar416._4_4_ = (int)auVar215._4_4_;
                auVar416._8_4_ = (int)auVar215._8_4_;
                auVar416._12_4_ = (int)auVar215._12_4_;
                auVar188 = vpslld_avx(auVar416,0x17);
                auVar188 = vpaddd_avx(auVar188,auVar458);
                auVar188 = vfmadd213ps_fma(auVar188,auVar175,auVar359);
                uVar147 = vcmpps_avx512vl(auVar188,auVar172,2);
                auVar42._8_4_ = 0x800000;
                auVar42._0_8_ = 0x80000000800000;
                auVar42._12_4_ = 0x800000;
                auVar188 = vmaxps_avx512vl(auVar188,auVar42);
                auVar176 = vpsrld_avx(auVar188,0x17);
                auVar483._8_4_ = 0x807fffff;
                auVar483._0_8_ = 0x807fffff807fffff;
                auVar483._12_4_ = 0x807fffff;
                auVar43._8_4_ = 0x3f000000;
                auVar43._0_8_ = 0x3f0000003f000000;
                auVar43._12_4_ = 0x3f000000;
                auVar188 = vpternlogd_avx512vl(auVar188,auVar483,auVar43,0xea);
                uVar163 = vcmpps_avx512vl(auVar188,auVar174,1);
                auVar175 = vaddps_avx512vl(auVar188,auVar195);
                auVar188 = vaddps_avx512vl(auVar175,auVar188);
                bVar15 = (bool)((byte)uVar163 & 1);
                auVar216._0_4_ =
                     (float)((uint)bVar15 * auVar188._0_4_ | (uint)!bVar15 * auVar175._0_4_);
                bVar15 = (bool)((byte)(uVar163 >> 1) & 1);
                auVar216._4_4_ =
                     (float)((uint)bVar15 * auVar188._4_4_ | (uint)!bVar15 * auVar175._4_4_);
                bVar15 = (bool)((byte)(uVar163 >> 2) & 1);
                auVar216._8_4_ =
                     (float)((uint)bVar15 * auVar188._8_4_ | (uint)!bVar15 * auVar175._8_4_);
                bVar15 = (bool)((byte)(uVar163 >> 3) & 1);
                auVar216._12_4_ =
                     (float)((uint)bVar15 * auVar188._12_4_ | (uint)!bVar15 * auVar175._12_4_);
                auVar381._0_4_ = auVar216._0_4_ * auVar216._0_4_;
                auVar381._4_4_ = auVar216._4_4_ * auVar216._4_4_;
                auVar381._8_4_ = auVar216._8_4_ * auVar216._8_4_;
                auVar381._12_4_ = auVar216._12_4_ * auVar216._12_4_;
                auVar188 = vfmadd213ps_avx512vl(auVar196,auVar216,auVar197);
                auVar188 = vfmadd213ps_avx512vl(auVar188,auVar216,auVar198);
                auVar188 = vfmadd213ps_avx512vl(auVar188,auVar216,auVar199);
                auVar188 = vfmadd213ps_avx512vl(auVar188,auVar216,auVar200);
                auVar188 = vfmadd213ps_avx512vl(auVar188,auVar216,auVar201);
                auVar188 = vfmadd213ps_avx512vl(auVar188,auVar216,auVar202);
                auVar188 = vfmadd213ps_avx512vl(auVar188,auVar216,auVar206);
                auVar188 = vfmadd213ps_avx512vl(auVar188,auVar216,auVar203);
                auVar175 = vmulps_avx512vl(auVar381,auVar216);
                auVar175 = vmulps_avx512vl(auVar175,auVar188);
                auVar44._8_4_ = 0xffffff82;
                auVar44._0_8_ = 0xffffff82ffffff82;
                auVar44._12_4_ = 0xffffff82;
                auVar188 = vpaddd_avx512vl(auVar176,auVar44);
                auVar188 = vcvtdq2ps_avx(auVar188);
                auVar176 = vsubps_avx512vl(auVar188,auVar359);
                bVar15 = (bool)((byte)uVar163 & 1);
                auVar217._0_4_ = (uint)bVar15 * auVar176._0_4_ | (uint)!bVar15 * auVar188._0_4_;
                bVar15 = (bool)((byte)(uVar163 >> 1) & 1);
                auVar217._4_4_ = (uint)bVar15 * auVar176._4_4_ | (uint)!bVar15 * auVar188._4_4_;
                bVar15 = (bool)((byte)(uVar163 >> 2) & 1);
                auVar217._8_4_ = (uint)bVar15 * auVar176._8_4_ | (uint)!bVar15 * auVar188._8_4_;
                bVar15 = (bool)((byte)(uVar163 >> 3) & 1);
                auVar217._12_4_ = (uint)bVar15 * auVar176._12_4_ | (uint)!bVar15 * auVar188._12_4_;
                auVar188 = vfmadd231ps_avx512vl(auVar175,auVar217,auVar464);
                auVar188 = vfmsub231ps_avx512vl(auVar188,auVar347,auVar381);
                auVar188 = vsubps_avx512vl(auVar188,auVar216);
                auVar188 = vfnmadd231ps_fma(auVar188,auVar365,auVar217);
                auVar175 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar218._0_4_ =
                     (uint)bVar15 * auVar175._0_4_ |
                     (uint)!bVar15 * (int)(auVar188._0_4_ + auVar188._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar218._4_4_ =
                     (uint)bVar15 * auVar175._4_4_ |
                     (uint)!bVar15 * (int)(auVar188._4_4_ + auVar188._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar218._8_4_ =
                     (uint)bVar15 * auVar175._8_4_ |
                     (uint)!bVar15 * (int)(auVar188._8_4_ + auVar188._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar218._12_4_ =
                     (uint)bVar15 * auVar175._12_4_ |
                     (uint)!bVar15 * (int)(auVar188._12_4_ + auVar188._12_4_);
                auVar188 = vminps_avx(auVar218,auVar332);
                auVar175 = vmaxps_avx(auVar188,auVar340);
                auVar176 = vfmadd213ps_fma(auVar353,auVar175,auVar347);
                auVar484._0_4_ = (int)auVar176._0_4_;
                auVar484._4_4_ = (int)auVar176._4_4_;
                auVar484._8_4_ = (int)auVar176._8_4_;
                auVar484._12_4_ = (int)auVar176._12_4_;
                auVar188 = vcvtdq2ps_avx(auVar484);
                uVar147 = vcmpps_avx512vl(auVar176,auVar188,1);
                auVar176 = vsubps_avx512vl(auVar188,auVar359);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar219._0_4_ =
                     (float)((uint)bVar15 * auVar176._0_4_ | (uint)!bVar15 * auVar188._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar219._4_4_ =
                     (float)((uint)bVar15 * auVar176._4_4_ | (uint)!bVar15 * auVar188._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar219._8_4_ =
                     (float)((uint)bVar15 * auVar176._8_4_ | (uint)!bVar15 * auVar188._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar219._12_4_ =
                     (float)((uint)bVar15 * auVar176._12_4_ | (uint)!bVar15 * auVar188._12_4_);
                auVar188 = vfmsub231ps_fma(auVar175,auVar219,auVar365);
                auVar188 = vfnmsub231ps_fma(auVar188,auVar219,auVar464);
                auVar417._0_4_ = auVar188._0_4_ * auVar188._0_4_;
                auVar417._4_4_ = auVar188._4_4_ * auVar188._4_4_;
                auVar417._8_4_ = auVar188._8_4_ * auVar188._8_4_;
                auVar417._12_4_ = auVar188._12_4_ * auVar188._12_4_;
                auVar175 = vfmadd213ps_avx512vl(auVar173,auVar188,auVar434);
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar188,auVar440);
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar188,auVar446);
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar188,auVar452);
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar188,auVar347);
                auVar188 = vfmadd213ps_avx512vl(auVar175,auVar417,auVar188);
                auVar175 = vaddps_avx512vl(auVar188,auVar359);
                auVar382._0_4_ = (int)auVar219._0_4_;
                auVar382._4_4_ = (int)auVar219._4_4_;
                auVar382._8_4_ = (int)auVar219._8_4_;
                auVar382._12_4_ = (int)auVar219._12_4_;
                auVar188 = vpslld_avx(auVar382,0x17);
                auVar188 = vpaddd_avx(auVar458,auVar188);
                auVar175 = vfmadd213ps_fma(auVar188,auVar175,auVar359);
                auVar188 = vrcpps_avx(auVar175);
                auVar485._0_4_ = auVar188._0_4_ + auVar188._0_4_;
                auVar485._4_4_ = auVar188._4_4_ + auVar188._4_4_;
                auVar485._8_4_ = auVar188._8_4_ + auVar188._8_4_;
                auVar485._12_4_ = auVar188._12_4_ + auVar188._12_4_;
                auVar175 = vfmsub213ps_avx512vl(auVar175,auVar485,auVar204);
                auVar188 = vfnmadd213ps_fma(auVar175,auVar188,auVar485);
                auVar214 = vfmsub213ps_fma(auVar188,auVar205,auVar205);
                break;
              case 6:
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar385._4_4_ = uVar10;
                auVar385._0_4_ = uVar10;
                auVar385._8_4_ = uVar10;
                auVar385._12_4_ = uVar10;
                uVar10 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var145))[1];
                auVar41._4_4_ = uVar10;
                auVar41._0_4_ = uVar10;
                auVar41._8_4_ = uVar10;
                auVar41._12_4_ = uVar10;
                auVar205 = vfmadd213ps_avx512vl(auVar385,auVar205,auVar41);
                auVar205 = vmaxps_avx512vl(auVar205,auVar172);
                auVar205 = vminps_avx(auVar205,auVar359);
                auVar214._0_4_ = auVar205._0_4_ * auVar282._0_4_;
                auVar214._4_4_ = auVar205._4_4_ * auVar282._4_4_;
                auVar214._8_4_ = auVar205._8_4_ * auVar282._8_4_;
                auVar214._12_4_ = auVar205._12_4_ * auVar282._12_4_;
              }
            }
            *(undefined1 (*) [16])local_1c0 = auVar214;
            local_1c0 = local_1c0 + 2;
            iVar135 = iVar135 + 1;
          }
          uVar147 = (ulong)(uVar137 + 1);
        }
      }
    }
    if ((iVar170 == 1) && (uVar150 == 4)) {
      p_Var145 = pp_Var149[-3];
      uVar171 = *(uint *)(&this->field_0xd4 + (long)p_Var145);
      uVar134 = *(uint *)(&this->field_0xd8 + (long)p_Var145);
      iVar156 = *(int *)(&this->field_0xdc + (long)p_Var145);
      iVar8 = *(int *)(&this->field_0xe0 + (long)p_Var145);
      iVar151 = *(int *)(&this->field_0xe4 + (long)p_Var145);
      iVar167 = *(int *)(&this->field_0xe8 + (long)p_Var145);
      iVar158 = *(int *)(&this->field_0x114 + (long)p_Var145);
      local_a8._0_8_ = p_Var145;
      lVar153 = *(long *)(&this->field_0x1a8 + (long)p_Var145);
      uVar159 = 0;
      uVar164 = 0;
      if (0 < (int)uVar171) {
        uVar164 = (ulong)uVar171;
      }
      uVar157 = 0;
      if (0 < (int)uVar134) {
        uVar157 = (ulong)uVar134;
      }
      uVar154 = (ulong)(uint)local_f8.c;
      if (local_f8.c < 1) {
        uVar154 = uVar159;
      }
      auVar333._8_4_ = 0x42b0c0a5;
      auVar333._0_8_ = 0x42b0c0a542b0c0a5;
      auVar333._12_4_ = 0x42b0c0a5;
      auVar341._8_4_ = 0xc2b0c0a5;
      auVar341._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar341._12_4_ = 0xc2b0c0a5;
      auVar348._8_4_ = 0x3f000000;
      auVar348._0_8_ = 0x3f0000003f000000;
      auVar348._12_4_ = 0x3f000000;
      auVar354._8_4_ = 0x3fb8aa3b;
      auVar354._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar354._12_4_ = 0x3fb8aa3b;
      auVar360._8_4_ = 0x3f800000;
      auVar360._0_8_ = 0x3f8000003f800000;
      auVar360._12_4_ = 0x3f800000;
      auVar366._8_4_ = 0x3f318000;
      auVar366._0_8_ = 0x3f3180003f318000;
      auVar366._12_4_ = 0x3f318000;
      auVar173 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar435._8_4_ = 0x3ab743ce;
      auVar435._0_8_ = 0x3ab743ce3ab743ce;
      auVar435._12_4_ = 0x3ab743ce;
      auVar441._8_4_ = 0x3c088908;
      auVar441._0_8_ = 0x3c0889083c088908;
      auVar441._12_4_ = 0x3c088908;
      auVar447._8_4_ = 0x3d2aa9c1;
      auVar447._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar447._12_4_ = 0x3d2aa9c1;
      auVar453._8_4_ = 0x3e2aaaaa;
      auVar453._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar453._12_4_ = 0x3e2aaaaa;
      auVar459._8_4_ = 0x3f800000;
      auVar459._0_8_ = 0x3f8000003f800000;
      auVar459._12_4_ = 0x3f800000;
      auVar465._8_4_ = 0xb95e8083;
      auVar465._0_8_ = 0xb95e8083b95e8083;
      auVar465._12_4_ = 0xb95e8083;
      auVar174 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      auVar195 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar196 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar197 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar198 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar199 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar200 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar201 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar202 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar206 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar203 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar172 = vxorps_avx512vl(auVar172,auVar172);
      auVar204 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      for (; uVar159 != uVar154; uVar159 = uVar159 + 1) {
        local_1c0 = (_func_int ***)
                    ((long)(_func_int ***)local_f8.data +
                    local_f8.cstep * uVar159 * local_f8.elemsize);
        iVar143 = bottom_blob->w;
        iVar144 = bottom_blob->h;
        uVar147 = 0;
        uVar148 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar148 = uVar147;
        }
        uVar138 = local_f8.w;
        if (local_f8.w < 1) {
          uVar138 = 0;
        }
        uVar155 = local_f8.h;
        if (local_f8.h < 1) {
          uVar155 = 0;
        }
        while (uVar137 = (uint)uVar147, uVar137 != uVar155) {
          iVar135 = (1 - uVar171) * iVar156;
          for (uVar139 = 0; uVar139 != uVar138; uVar139 = uVar139 + 1) {
            if (lVar153 == 0) {
              auVar205 = ZEXT816(0) << 0x40;
            }
            else {
              auVar205 = *(undefined1 (*) [16])(lVar153 + uVar159 * 0x10);
            }
            auVar282 = ZEXT1664(auVar205);
            pvVar165 = (void *)((this->weight_data_tm).cstep * uVar159 *
                                (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data)
            ;
            for (uVar147 = 0; uVar147 != uVar148; uVar147 = uVar147 + 1) {
              pvVar166 = pvVar165;
              for (uVar163 = 0; uVar163 != uVar157; uVar163 = uVar163 + 1) {
                iVar136 = (((int)uVar163 - uVar134) + 1) * iVar8 + uVar137;
                if (((-1 < iVar136) && (iVar140 = iVar136 / iVar167, iVar136 % iVar167 == 0)) &&
                   (iVar140 < iVar144)) {
                  iVar136 = iVar135;
                  for (lVar168 = 0; uVar164 * 0x10 != lVar168; lVar168 = lVar168 + 0x10) {
                    if (((-1 < iVar136) && (iVar142 = iVar136 / iVar151, iVar136 % iVar151 == 0)) &&
                       (iVar142 < iVar143)) {
                      uVar10 = *(undefined4 *)
                                ((long)bottom_blob->data +
                                (long)iVar142 * 4 +
                                (long)iVar140 * (long)bottom_blob->w * bottom_blob->elemsize +
                                bottom_blob->cstep * bottom_blob->elemsize * uVar147);
                      auVar386._4_4_ = uVar10;
                      auVar386._0_4_ = uVar10;
                      auVar386._8_4_ = uVar10;
                      auVar386._12_4_ = uVar10;
                      auVar205 = vfmadd231ps_fma(auVar282._0_16_,auVar386,
                                                 *(undefined1 (*) [16])((long)pvVar166 + lVar168));
                      auVar282 = ZEXT1664(auVar205);
                    }
                    iVar136 = iVar136 + iVar156;
                  }
                }
                pvVar166 = (void *)((long)pvVar166 + (long)(int)uVar171 * 0x10);
              }
              pvVar165 = (void *)((long)pvVar165 + (long)(int)(uVar171 * uVar134 * 4) * 4);
            }
            auVar205 = auVar282._0_16_;
            auVar221 = auVar205;
            if (iVar158 - 1U < 6) {
              auVar221 = vmaxps_avx512vl(auVar205,auVar172);
              switch(iVar158) {
              case 2:
                auVar205 = vminps_avx512vl(auVar205,auVar172);
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar58._4_4_ = uVar10;
                auVar58._0_4_ = uVar10;
                auVar58._8_4_ = uVar10;
                auVar58._12_4_ = uVar10;
                auVar221 = vfmadd231ps_avx512vl(auVar221,auVar205,auVar58);
                break;
              case 3:
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar56._4_4_ = uVar10;
                auVar56._0_4_ = uVar10;
                auVar56._8_4_ = uVar10;
                auVar56._12_4_ = uVar10;
                auVar205 = vmaxps_avx512vl(auVar205,auVar56);
                uVar10 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var145))[1];
                auVar57._4_4_ = uVar10;
                auVar57._0_4_ = uVar10;
                auVar57._8_4_ = uVar10;
                auVar57._12_4_ = uVar10;
                auVar221 = vminps_avx512vl(auVar205,auVar57);
                break;
              case 4:
                auVar54._8_4_ = 0x80000000;
                auVar54._0_8_ = 0x8000000080000000;
                auVar54._12_4_ = 0x80000000;
                auVar205 = vxorps_avx512vl(auVar205,auVar54);
                auVar205 = vminps_avx(auVar205,auVar333);
                auVar188 = vmaxps_avx(auVar205,auVar341);
                auVar175 = vfmadd231ps_fma(auVar348,auVar188,auVar354);
                auVar491._0_4_ = (int)auVar175._0_4_;
                auVar491._4_4_ = (int)auVar175._4_4_;
                auVar491._8_4_ = (int)auVar175._8_4_;
                auVar491._12_4_ = (int)auVar175._12_4_;
                auVar205 = vcvtdq2ps_avx(auVar491);
                uVar147 = vcmpps_avx512vl(auVar175,auVar205,1);
                auVar175 = vsubps_avx512vl(auVar205,auVar360);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar227._0_4_ =
                     (float)((uint)bVar15 * auVar175._0_4_ | (uint)!bVar15 * auVar205._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar227._4_4_ =
                     (float)((uint)bVar15 * auVar175._4_4_ | (uint)!bVar15 * auVar205._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar227._8_4_ =
                     (float)((uint)bVar15 * auVar175._8_4_ | (uint)!bVar15 * auVar205._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar227._12_4_ =
                     (float)((uint)bVar15 * auVar175._12_4_ | (uint)!bVar15 * auVar205._12_4_);
                auVar205 = vfmsub231ps_fma(auVar188,auVar227,auVar366);
                auVar55._8_4_ = 0x395e8083;
                auVar55._0_8_ = 0x395e8083395e8083;
                auVar55._12_4_ = 0x395e8083;
                auVar188 = vfmsub231ps_avx512vl(auVar205,auVar227,auVar55);
                auVar389._0_4_ = auVar188._0_4_ * auVar188._0_4_;
                auVar389._4_4_ = auVar188._4_4_ * auVar188._4_4_;
                auVar389._8_4_ = auVar188._8_4_ * auVar188._8_4_;
                auVar389._12_4_ = auVar188._12_4_ * auVar188._12_4_;
                auVar205 = vfmadd213ps_fma(auVar173,auVar188,auVar435);
                auVar205 = vfmadd213ps_fma(auVar205,auVar188,auVar441);
                auVar205 = vfmadd213ps_fma(auVar205,auVar188,auVar447);
                auVar205 = vfmadd213ps_fma(auVar205,auVar188,auVar453);
                auVar205 = vfmadd213ps_fma(auVar205,auVar188,auVar348);
                auVar205 = vfmadd213ps_fma(auVar205,auVar389,auVar188);
                auVar324._0_4_ = auVar205._0_4_ + 1.0;
                auVar324._4_4_ = auVar205._4_4_ + 1.0;
                auVar324._8_4_ = auVar205._8_4_ + 1.0;
                auVar324._12_4_ = auVar205._12_4_ + 1.0;
                auVar390._0_4_ = (int)auVar227._0_4_;
                auVar390._4_4_ = (int)auVar227._4_4_;
                auVar390._8_4_ = (int)auVar227._8_4_;
                auVar390._12_4_ = (int)auVar227._12_4_;
                auVar205 = vpslld_avx(auVar390,0x17);
                auVar205 = vpaddd_avx(auVar459,auVar205);
                auVar188 = vfmadd213ps_fma(auVar205,auVar324,auVar360);
                auVar205 = vrcpps_avx(auVar188);
                auVar188 = vfmsub213ps_fma(auVar188,auVar205,auVar360);
                auVar221 = vfnmadd132ps_fma(auVar188,auVar205,auVar205);
                break;
              case 5:
                auVar188 = vminps_avx(auVar205,auVar333);
                auVar175 = vmaxps_avx(auVar188,auVar341);
                auVar176 = vfmadd213ps_fma(auVar354,auVar175,auVar348);
                auVar487._0_4_ = (int)auVar176._0_4_;
                auVar487._4_4_ = (int)auVar176._4_4_;
                auVar487._8_4_ = (int)auVar176._8_4_;
                auVar487._12_4_ = (int)auVar176._12_4_;
                auVar188 = vcvtdq2ps_avx(auVar487);
                uVar147 = vcmpps_avx512vl(auVar176,auVar188,1);
                auVar176 = vsubps_avx512vl(auVar188,auVar360);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar222._0_4_ =
                     (float)((uint)bVar15 * auVar176._0_4_ | (uint)!bVar15 * auVar188._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar222._4_4_ =
                     (float)((uint)bVar15 * auVar176._4_4_ | (uint)!bVar15 * auVar188._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar222._8_4_ =
                     (float)((uint)bVar15 * auVar176._8_4_ | (uint)!bVar15 * auVar188._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar222._12_4_ =
                     (float)((uint)bVar15 * auVar176._12_4_ | (uint)!bVar15 * auVar188._12_4_);
                auVar188 = vfmsub231ps_fma(auVar175,auVar222,auVar366);
                auVar188 = vfnmsub231ps_fma(auVar188,auVar222,auVar465);
                auVar418._0_4_ = auVar188._0_4_ * auVar188._0_4_;
                auVar418._4_4_ = auVar188._4_4_ * auVar188._4_4_;
                auVar418._8_4_ = auVar188._8_4_ * auVar188._8_4_;
                auVar418._12_4_ = auVar188._12_4_ * auVar188._12_4_;
                auVar175 = vfmadd213ps_avx512vl(auVar173,auVar188,auVar435);
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar188,auVar441);
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar188,auVar447);
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar188,auVar453);
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar188,auVar348);
                auVar188 = vfmadd213ps_avx512vl(auVar175,auVar418,auVar188);
                auVar175 = vaddps_avx512vl(auVar188,auVar360);
                auVar419._0_4_ = (int)auVar222._0_4_;
                auVar419._4_4_ = (int)auVar222._4_4_;
                auVar419._8_4_ = (int)auVar222._8_4_;
                auVar419._12_4_ = (int)auVar222._12_4_;
                auVar188 = vpslld_avx(auVar419,0x17);
                auVar188 = vpaddd_avx(auVar188,auVar459);
                auVar188 = vfmadd213ps_fma(auVar188,auVar175,auVar360);
                uVar147 = vcmpps_avx512vl(auVar188,auVar172,2);
                auVar51._8_4_ = 0x800000;
                auVar51._0_8_ = 0x80000000800000;
                auVar51._12_4_ = 0x800000;
                auVar188 = vmaxps_avx512vl(auVar188,auVar51);
                auVar176 = vpsrld_avx(auVar188,0x17);
                auVar488._8_4_ = 0x807fffff;
                auVar488._0_8_ = 0x807fffff807fffff;
                auVar488._12_4_ = 0x807fffff;
                auVar52._8_4_ = 0x3f000000;
                auVar52._0_8_ = 0x3f0000003f000000;
                auVar52._12_4_ = 0x3f000000;
                auVar188 = vpternlogd_avx512vl(auVar188,auVar488,auVar52,0xea);
                uVar163 = vcmpps_avx512vl(auVar188,auVar174,1);
                auVar175 = vaddps_avx512vl(auVar188,auVar195);
                auVar188 = vaddps_avx512vl(auVar175,auVar188);
                bVar15 = (bool)((byte)uVar163 & 1);
                auVar223._0_4_ =
                     (float)((uint)bVar15 * auVar188._0_4_ | (uint)!bVar15 * auVar175._0_4_);
                bVar15 = (bool)((byte)(uVar163 >> 1) & 1);
                auVar223._4_4_ =
                     (float)((uint)bVar15 * auVar188._4_4_ | (uint)!bVar15 * auVar175._4_4_);
                bVar15 = (bool)((byte)(uVar163 >> 2) & 1);
                auVar223._8_4_ =
                     (float)((uint)bVar15 * auVar188._8_4_ | (uint)!bVar15 * auVar175._8_4_);
                bVar15 = (bool)((byte)(uVar163 >> 3) & 1);
                auVar223._12_4_ =
                     (float)((uint)bVar15 * auVar188._12_4_ | (uint)!bVar15 * auVar175._12_4_);
                auVar387._0_4_ = auVar223._0_4_ * auVar223._0_4_;
                auVar387._4_4_ = auVar223._4_4_ * auVar223._4_4_;
                auVar387._8_4_ = auVar223._8_4_ * auVar223._8_4_;
                auVar387._12_4_ = auVar223._12_4_ * auVar223._12_4_;
                auVar188 = vfmadd213ps_avx512vl(auVar196,auVar223,auVar197);
                auVar188 = vfmadd213ps_avx512vl(auVar188,auVar223,auVar198);
                auVar188 = vfmadd213ps_avx512vl(auVar188,auVar223,auVar199);
                auVar188 = vfmadd213ps_avx512vl(auVar188,auVar223,auVar200);
                auVar188 = vfmadd213ps_avx512vl(auVar188,auVar223,auVar201);
                auVar188 = vfmadd213ps_avx512vl(auVar188,auVar223,auVar202);
                auVar188 = vfmadd213ps_avx512vl(auVar188,auVar223,auVar206);
                auVar188 = vfmadd213ps_avx512vl(auVar188,auVar223,auVar203);
                auVar175 = vmulps_avx512vl(auVar387,auVar223);
                auVar175 = vmulps_avx512vl(auVar175,auVar188);
                auVar53._8_4_ = 0xffffff82;
                auVar53._0_8_ = 0xffffff82ffffff82;
                auVar53._12_4_ = 0xffffff82;
                auVar188 = vpaddd_avx512vl(auVar176,auVar53);
                auVar188 = vcvtdq2ps_avx(auVar188);
                auVar176 = vsubps_avx512vl(auVar188,auVar360);
                bVar15 = (bool)((byte)uVar163 & 1);
                auVar224._0_4_ = (uint)bVar15 * auVar176._0_4_ | (uint)!bVar15 * auVar188._0_4_;
                bVar15 = (bool)((byte)(uVar163 >> 1) & 1);
                auVar224._4_4_ = (uint)bVar15 * auVar176._4_4_ | (uint)!bVar15 * auVar188._4_4_;
                bVar15 = (bool)((byte)(uVar163 >> 2) & 1);
                auVar224._8_4_ = (uint)bVar15 * auVar176._8_4_ | (uint)!bVar15 * auVar188._8_4_;
                bVar15 = (bool)((byte)(uVar163 >> 3) & 1);
                auVar224._12_4_ = (uint)bVar15 * auVar176._12_4_ | (uint)!bVar15 * auVar188._12_4_;
                auVar188 = vfmadd231ps_avx512vl(auVar175,auVar224,auVar465);
                auVar188 = vfmsub231ps_avx512vl(auVar188,auVar348,auVar387);
                auVar188 = vsubps_avx512vl(auVar188,auVar223);
                auVar188 = vfnmadd231ps_fma(auVar188,auVar366,auVar224);
                auVar175 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar225._0_4_ =
                     (uint)bVar15 * auVar175._0_4_ |
                     (uint)!bVar15 * (int)(auVar188._0_4_ + auVar188._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar225._4_4_ =
                     (uint)bVar15 * auVar175._4_4_ |
                     (uint)!bVar15 * (int)(auVar188._4_4_ + auVar188._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar225._8_4_ =
                     (uint)bVar15 * auVar175._8_4_ |
                     (uint)!bVar15 * (int)(auVar188._8_4_ + auVar188._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar225._12_4_ =
                     (uint)bVar15 * auVar175._12_4_ |
                     (uint)!bVar15 * (int)(auVar188._12_4_ + auVar188._12_4_);
                auVar188 = vminps_avx(auVar225,auVar333);
                auVar175 = vmaxps_avx(auVar188,auVar341);
                auVar176 = vfmadd213ps_fma(auVar354,auVar175,auVar348);
                auVar489._0_4_ = (int)auVar176._0_4_;
                auVar489._4_4_ = (int)auVar176._4_4_;
                auVar489._8_4_ = (int)auVar176._8_4_;
                auVar489._12_4_ = (int)auVar176._12_4_;
                auVar188 = vcvtdq2ps_avx(auVar489);
                uVar147 = vcmpps_avx512vl(auVar176,auVar188,1);
                auVar176 = vsubps_avx512vl(auVar188,auVar360);
                bVar15 = (bool)((byte)uVar147 & 1);
                auVar226._0_4_ =
                     (float)((uint)bVar15 * auVar176._0_4_ | (uint)!bVar15 * auVar188._0_4_);
                bVar15 = (bool)((byte)(uVar147 >> 1) & 1);
                auVar226._4_4_ =
                     (float)((uint)bVar15 * auVar176._4_4_ | (uint)!bVar15 * auVar188._4_4_);
                bVar15 = (bool)((byte)(uVar147 >> 2) & 1);
                auVar226._8_4_ =
                     (float)((uint)bVar15 * auVar176._8_4_ | (uint)!bVar15 * auVar188._8_4_);
                bVar15 = (bool)((byte)(uVar147 >> 3) & 1);
                auVar226._12_4_ =
                     (float)((uint)bVar15 * auVar176._12_4_ | (uint)!bVar15 * auVar188._12_4_);
                auVar188 = vfmsub231ps_fma(auVar175,auVar226,auVar366);
                auVar188 = vfnmsub231ps_fma(auVar188,auVar226,auVar465);
                auVar420._0_4_ = auVar188._0_4_ * auVar188._0_4_;
                auVar420._4_4_ = auVar188._4_4_ * auVar188._4_4_;
                auVar420._8_4_ = auVar188._8_4_ * auVar188._8_4_;
                auVar420._12_4_ = auVar188._12_4_ * auVar188._12_4_;
                auVar175 = vfmadd213ps_avx512vl(auVar173,auVar188,auVar435);
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar188,auVar441);
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar188,auVar447);
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar188,auVar453);
                auVar175 = vfmadd213ps_avx512vl(auVar175,auVar188,auVar348);
                auVar188 = vfmadd213ps_avx512vl(auVar175,auVar420,auVar188);
                auVar175 = vaddps_avx512vl(auVar188,auVar360);
                auVar388._0_4_ = (int)auVar226._0_4_;
                auVar388._4_4_ = (int)auVar226._4_4_;
                auVar388._8_4_ = (int)auVar226._8_4_;
                auVar388._12_4_ = (int)auVar226._12_4_;
                auVar188 = vpslld_avx(auVar388,0x17);
                auVar188 = vpaddd_avx(auVar459,auVar188);
                auVar175 = vfmadd213ps_fma(auVar188,auVar175,auVar360);
                auVar188 = vrcpps_avx(auVar175);
                auVar490._0_4_ = auVar188._0_4_ + auVar188._0_4_;
                auVar490._4_4_ = auVar188._4_4_ + auVar188._4_4_;
                auVar490._8_4_ = auVar188._8_4_ + auVar188._8_4_;
                auVar490._12_4_ = auVar188._12_4_ + auVar188._12_4_;
                auVar175 = vfmsub213ps_avx512vl(auVar175,auVar490,auVar204);
                auVar188 = vfnmadd213ps_fma(auVar175,auVar188,auVar490);
                auVar221 = vfmsub213ps_fma(auVar188,auVar205,auVar205);
                break;
              case 6:
                uVar10 = **(undefined4 **)(&this->field_0x118 + (long)p_Var145);
                auVar391._4_4_ = uVar10;
                auVar391._0_4_ = uVar10;
                auVar391._8_4_ = uVar10;
                auVar391._12_4_ = uVar10;
                uVar10 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var145))[1];
                auVar50._4_4_ = uVar10;
                auVar50._0_4_ = uVar10;
                auVar50._8_4_ = uVar10;
                auVar50._12_4_ = uVar10;
                auVar205 = vfmadd213ps_avx512vl(auVar391,auVar205,auVar50);
                auVar205 = vmaxps_avx512vl(auVar205,auVar172);
                auVar205 = vminps_avx(auVar205,auVar360);
                auVar221._0_4_ = auVar205._0_4_ * auVar282._0_4_;
                auVar221._4_4_ = auVar205._4_4_ * auVar282._4_4_;
                auVar221._8_4_ = auVar205._8_4_ * auVar282._8_4_;
                auVar221._12_4_ = auVar205._12_4_ * auVar282._12_4_;
              }
            }
            *(undefined1 (*) [16])local_1c0 = auVar221;
            local_1c0 = local_1c0 + 2;
            iVar135 = iVar135 + 1;
          }
          uVar147 = (ulong)(uVar137 + 1);
        }
      }
    }
    if ((iVar170 == 4) && (uVar150 == 1)) {
      p_Var145 = pp_Var149[-3];
      uVar171 = *(uint *)(&this->field_0xd4 + (long)p_Var145);
      uVar134 = *(uint *)(&this->field_0xd8 + (long)p_Var145);
      iVar156 = *(int *)(&this->field_0xdc + (long)p_Var145);
      iVar8 = *(int *)(&this->field_0x114 + (long)p_Var145);
      local_60 = local_f8.elemsize * local_f8.cstep;
      uVar164 = 0;
      uVar159 = 0;
      if (0 < (int)uVar171) {
        uVar159 = (ulong)uVar171;
      }
      uVar157 = 0;
      if (0 < (int)uVar134) {
        uVar157 = (ulong)uVar134;
      }
      uVar154 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar154 = uVar164;
      }
      uVar138 = local_f8.w;
      if (local_f8.w < 1) {
        uVar138 = 0;
      }
      uVar155 = local_f8.h;
      if (local_f8.h < 1) {
        uVar155 = 0;
      }
      local_58 = (ulong)(uint)local_f8.c;
      if (local_f8.c < 1) {
        local_58 = uVar164;
      }
      iVar151 = *(int *)(&this->field_0xe0 + (long)p_Var145);
      iVar167 = *(int *)(&this->field_0xe4 + (long)p_Var145);
      iVar158 = *(int *)(&this->field_0xe8 + (long)p_Var145);
      lVar153 = *(long *)(&this->field_0x1a8 + (long)p_Var145);
      local_68 = (Allocator *)local_f8.data;
      iVar143 = bottom_blob->w;
      iVar144 = bottom_blob->h;
      for (; uVar164 != local_58; uVar164 = uVar164 + 1) {
        local_1c0 = (_func_int ***)((long)&local_68->_vptr_Allocator + local_60 * uVar164);
        for (uVar137 = 0; uVar137 != uVar155; uVar137 = uVar137 + 1) {
          local_a8._0_8_ = *(undefined8 *)(&this->field_0x118 + (long)p_Var145);
          sVar12 = (this->weight_data_tm).cstep;
          sVar13 = (this->weight_data_tm).elemsize;
          pvVar165 = (this->weight_data_tm).data;
          iVar135 = (1 - uVar171) * iVar156;
          for (uVar139 = 0; uVar139 != uVar138; uVar139 = uVar139 + 1) {
            if (lVar153 == 0) {
              fVar320 = 0.0;
            }
            else {
              fVar320 = *(float *)(lVar153 + uVar164 * 4);
            }
            auVar282 = ZEXT1664(ZEXT816(0) << 0x40);
            pvVar166 = (void *)(sVar12 * uVar164 * sVar13 + (long)pvVar165);
            for (uVar148 = 0; uVar148 != uVar154; uVar148 = uVar148 + 1) {
              pvVar162 = pvVar166;
              for (uVar147 = 0; uVar147 != uVar157; uVar147 = uVar147 + 1) {
                iVar136 = (((int)uVar147 - uVar134) + 1) * iVar151 + uVar137;
                if (((-1 < iVar136) && (iVar140 = iVar136 / iVar158, iVar136 % iVar158 == 0)) &&
                   (iVar140 < iVar144)) {
                  iVar136 = iVar135;
                  for (lVar168 = 0; uVar159 * 0x10 != lVar168; lVar168 = lVar168 + 0x10) {
                    if (((-1 < iVar136) && (iVar142 = iVar136 / iVar167, iVar136 % iVar167 == 0)) &&
                       (iVar142 < iVar143)) {
                      auVar172 = vfmadd231ps_fma(auVar282._0_16_,
                                                 *(undefined1 (*) [16])
                                                  ((long)bottom_blob->data +
                                                  (long)(iVar142 << 2) * 4 +
                                                  (long)iVar140 *
                                                  (long)bottom_blob->w * bottom_blob->elemsize +
                                                  bottom_blob->cstep * bottom_blob->elemsize *
                                                  uVar148),
                                                 *(undefined1 (*) [16])((long)pvVar162 + lVar168));
                      auVar282 = ZEXT1664(auVar172);
                    }
                    iVar136 = iVar136 + iVar156;
                  }
                }
                pvVar162 = (void *)((long)pvVar162 + (long)(int)uVar171 * 0x10);
              }
              pvVar166 = (void *)((long)pvVar166 + (long)(int)(uVar171 * uVar134 * 4) * 4);
            }
            auVar172 = vshufpd_avx(auVar282._0_16_,auVar282._0_16_,1);
            auVar334._0_4_ = auVar172._0_4_ + auVar282._0_4_;
            auVar334._4_4_ = auVar172._4_4_ + auVar282._4_4_;
            auVar334._8_4_ = auVar172._8_4_ + auVar282._8_4_;
            auVar334._12_4_ = auVar172._12_4_ + auVar282._12_4_;
            auVar172 = vmovshdup_avx(auVar334);
            fVar320 = auVar172._0_4_ + fVar320 + auVar334._0_4_;
            fVar338 = fVar320;
            if (iVar8 - 1U < 6) {
              auVar172 = ZEXT416((uint)fVar320);
              switch(iVar8) {
              case 1:
                auVar172 = vmaxss_avx(auVar172,ZEXT416(0));
                fVar338 = auVar172._0_4_;
                break;
              case 2:
                uVar17 = vcmpss_avx512f(auVar172,ZEXT416(0),0xe);
                bVar15 = (bool)((byte)uVar17 & 1);
                fVar338 = (float)((uint)bVar15 * 0x3f800000 +
                                 (uint)!bVar15 * (int)*(float *)local_a8._0_8_) * fVar320;
                break;
              case 3:
                auVar172 = vmaxss_avx(auVar172,ZEXT416((uint)*(float *)local_a8._0_8_));
                fVar338 = auVar172._0_4_;
                if (*(float *)(local_a8._0_8_ + 4) < auVar172._0_4_) {
                  fVar338 = *(float *)(local_a8._0_8_ + 4);
                }
                break;
              case 4:
                auVar172 = vminss_avx(auVar172,SUB6416(ZEXT464(0x42b0c0a5),0));
                auVar60._8_4_ = 0x80000000;
                auVar60._0_8_ = 0x8000000080000000;
                auVar60._12_4_ = 0x80000000;
                auVar173 = vxorps_avx512vl(auVar172,auVar60);
                uVar17 = vcmpss_avx512f(auVar172,ZEXT416(0xc2b0c0a5),1);
                bVar15 = (bool)((byte)uVar17 & 1);
                fVar320 = expf((float)((uint)bVar15 * 0x42b0c0a5 + (uint)!bVar15 * auVar173._0_4_));
                fVar338 = 1.0 / (fVar320 + 1.0);
                break;
              case 5:
                fVar338 = expf(fVar320);
                fVar338 = logf(fVar338 + 1.0);
                fVar338 = tanhf(fVar338);
                fVar338 = fVar338 * fVar320;
                break;
              case 6:
                fVar3 = *(float *)local_a8._0_8_;
                auVar59._8_4_ = 0x80000000;
                auVar59._0_8_ = 0x8000000080000000;
                auVar59._12_4_ = 0x80000000;
                auVar172 = vxorps_avx512vl(ZEXT416((uint)*(float *)(local_a8._0_8_ + 4)),auVar59);
                fVar345 = auVar172._0_4_ / fVar3;
                fVar338 = 0.0;
                if ((fVar345 <= fVar320) && (fVar338 = fVar320, fVar320 <= fVar345 + 1.0 / fVar3)) {
                  auVar172 = vfmadd213ss_fma(ZEXT416((uint)fVar3),ZEXT416((uint)fVar320),
                                             ZEXT416((uint)*(float *)(local_a8._0_8_ + 4)));
                  fVar338 = auVar172._0_4_ * fVar320;
                }
              }
            }
            *(float *)local_1c0 = fVar338;
            local_1c0 = (_func_int ***)((long)local_1c0 + 4);
            iVar135 = iVar135 + 1;
          }
        }
      }
    }
    pvVar165 = local_f8.data;
    pp_Var149 = this->_vptr_Deconvolution_x86_avx512;
    if ((iVar170 == 1) && (uVar150 == 1)) {
      iVar151 = uVar9 * (int)local_48;
      local_a8._0_8_ = local_f8.cstep * local_f8.elemsize;
      iVar156 = bottom_blob->w;
      iVar8 = bottom_blob->h;
      lVar153 = (long)local_f8.w;
      uVar164 = 0;
      uVar159 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar159 = uVar164;
      }
      uVar157 = 0;
      if (0 < local_f8.w) {
        uVar157 = (ulong)(uint)local_f8.w;
      }
      uVar150 = local_f8.h;
      if (local_f8.h < 1) {
        uVar150 = 0;
      }
      for (; (long)uVar164 < (long)*(int *)(&this->field_0xd0 + (long)pp_Var149[-3]);
          uVar164 = uVar164 + 1) {
        local_168 = (_func_int ***)((long)(_func_int ***)pvVar165 + local_a8._0_8_ * uVar164);
        for (uVar171 = 0; uVar171 != uVar150; uVar171 = uVar171 + 1) {
          pp_Var14 = this->_vptr_Deconvolution_x86_avx512;
          sVar12 = (this->weight_data_tm).cstep;
          sVar13 = (this->weight_data_tm).elemsize;
          iVar170 = uVar171 - local_50;
          pvVar166 = (this->weight_data_tm).data;
          for (uVar154 = 0; uVar154 != uVar157; uVar154 = uVar154 + 1) {
            p_Var145 = pp_Var14[-3];
            if (*(int *)(&this->field_0x10c + (long)p_Var145) == 0) {
              auVar282 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar282 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var145) +
                                          uVar164 * 4));
            }
            pvVar162 = (void *)(sVar12 * uVar164 * sVar13 + (long)pvVar166);
            for (uVar148 = 0; uVar148 != uVar159; uVar148 = uVar148 + 1) {
              p_Var152 = this->_vptr_Deconvolution_x86_avx512[-3];
              iVar158 = 0;
              iVar167 = *(int *)(&this->field_0xd8 + (long)p_Var152);
              if (*(int *)(&this->field_0xd8 + (long)p_Var152) < 1) {
                iVar167 = iVar158;
              }
              for (; iVar158 != iVar167; iVar158 = iVar158 + 1) {
                iVar143 = *(int *)(&this->field_0xe0 + (long)p_Var152) * iVar158 + iVar170;
                if (((-1 < iVar143) &&
                    (iVar144 = iVar143 / *(int *)(&this->field_0xe8 + (long)p_Var152),
                    iVar143 % *(int *)(&this->field_0xe8 + (long)p_Var152) == 0)) &&
                   (iVar144 < iVar8)) {
                  uVar9 = *(uint *)(&this->field_0xd4 + (long)p_Var152);
                  uVar147 = 0;
                  if (0 < (int)uVar9) {
                    uVar147 = (ulong)uVar9;
                  }
                  for (uVar163 = 0; uVar147 != uVar163; uVar163 = uVar163 + 1) {
                    iVar143 = *(int *)(&this->field_0xdc + (long)p_Var152) * (int)uVar163 +
                              ((int)uVar154 - local_4c);
                    if (((-1 < iVar143) &&
                        (iVar135 = iVar143 / *(int *)(&this->field_0xe4 + (long)p_Var152),
                        iVar143 % *(int *)(&this->field_0xe4 + (long)p_Var152) == 0)) &&
                       (iVar135 < iVar156)) {
                      auVar172 = vfmadd231ss_fma(auVar282._0_16_,
                                                 ZEXT416(*(uint *)((long)pvVar162 +
                                                                  uVar163 * 4 +
                                                                  (long)(int)(uVar9 * iVar158) * 4))
                                                 ,ZEXT416(*(uint *)((long)bottom_blob->data +
                                                                   (long)iVar135 * 4 +
                                                                   (long)iVar144 *
                                                                   (long)bottom_blob->w *
                                                                   bottom_blob->elemsize +
                                                                   bottom_blob->cstep *
                                                                   bottom_blob->elemsize * uVar148))
                                                );
                      auVar282 = ZEXT1664(auVar172);
                    }
                  }
                }
              }
              pvVar162 = (void *)((long)pvVar162 + (long)iVar151 * 4);
            }
            auVar172 = auVar282._0_16_;
            fVar338 = auVar282._0_4_;
            fVar320 = fVar338;
            switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var145)) {
            case 1:
              auVar172 = vmaxss_avx(auVar172,ZEXT416(0));
              fVar320 = auVar172._0_4_;
              break;
            case 2:
              uVar17 = vcmpss_avx512f(auVar172,ZEXT416(0),0xe);
              bVar15 = (bool)((byte)uVar17 & 1);
              fVar320 = (float)((uint)bVar15 * 0x3f800000 +
                               (uint)!bVar15 * **(int **)(&this->field_0x118 + (long)p_Var145)) *
                        fVar338;
              break;
            case 3:
              fVar338 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var145))[1];
              auVar172 = vmaxss_avx(auVar172,ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var145
                                                                )));
              fVar320 = auVar172._0_4_;
              if (fVar338 < auVar172._0_4_) {
                fVar320 = fVar338;
              }
              break;
            case 4:
              auVar172 = vminss_avx(auVar172,SUB6416(ZEXT464(0x42b0c0a5),0));
              auVar62._8_4_ = 0x80000000;
              auVar62._0_8_ = 0x8000000080000000;
              auVar62._12_4_ = 0x80000000;
              auVar173 = vxorps_avx512vl(auVar172,auVar62);
              uVar17 = vcmpss_avx512f(auVar172,ZEXT416(0xc2b0c0a5),1);
              bVar15 = (bool)((byte)uVar17 & 1);
              fVar320 = expf((float)((uint)bVar15 * 0x42b0c0a5 + (uint)!bVar15 * auVar173._0_4_));
              fVar320 = 1.0 / (fVar320 + 1.0);
              break;
            case 5:
              fVar320 = expf(fVar338);
              fVar320 = logf(fVar320 + 1.0);
              fVar320 = tanhf(fVar320);
              fVar320 = fVar320 * fVar338;
              break;
            case 6:
              fVar3 = **(float **)(&this->field_0x118 + (long)p_Var145);
              auVar61._8_4_ = 0x80000000;
              auVar61._0_8_ = 0x8000000080000000;
              auVar61._12_4_ = 0x80000000;
              auVar174 = ZEXT416((uint)(*(float **)(&this->field_0x118 + (long)p_Var145))[1]);
              auVar173 = vxorps_avx512vl(auVar174,auVar61);
              fVar345 = auVar173._0_4_ / fVar3;
              fVar320 = 0.0;
              if ((fVar345 <= fVar338) && (fVar320 = fVar338, fVar338 <= fVar345 + 1.0 / fVar3)) {
                auVar172 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar172,auVar174);
                fVar320 = auVar172._0_4_ * fVar338;
              }
            }
            *(float *)((long)local_168 + uVar154 * 4) = fVar320;
          }
          local_168 = (_func_int ***)((long)local_168 + lVar153 * 4);
        }
      }
      pp_Var149 = this->_vptr_Deconvolution_x86_avx512;
    }
    pMVar133 = local_38;
    Deconvolution::cut_padding
              ((Deconvolution *)((long)&this->_vptr_Deconvolution_x86_avx512 + (long)pp_Var149[-3]),
               &local_f8,local_38,local_40);
    if ((pMVar133->data == (void *)0x0) || (iVar156 = 0, (long)pMVar133->c * pMVar133->cstep == 0))
    {
      iVar156 = -100;
    }
  }
  piVar11 = (int *)CONCAT44(local_f8.refcount._4_4_,(int)local_f8.refcount);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        free(local_f8.data);
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar156;
}

Assistant:

int Deconvolution_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX__

    if (elempack == 4 && out_elempack == 4)
    {
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}